

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O1

int __thiscall ncnn::Reduction::forward(Reduction *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  size_t sVar4;
  size_t sVar5;
  undefined1 uVar6;
  int *piVar7;
  byte bVar8;
  byte bVar9;
  int i_9;
  int iVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  Mat *pMVar16;
  Mat *pMVar17;
  size_t sVar18;
  Mat *pMVar19;
  long lVar20;
  size_t sVar21;
  size_t sVar22;
  Mat *pMVar23;
  ulong uVar24;
  byte bVar25;
  char cVar26;
  byte bVar27;
  undefined4 uVar28;
  Mat *pMVar29;
  long lVar30;
  byte bVar31;
  byte bVar32;
  uint uVar33;
  uint uVar34;
  ulong uVar35;
  Allocator *pAVar36;
  ulong uVar37;
  Mat *pMVar38;
  void *pvVar39;
  ulong uVar40;
  float *mins_ptr_3;
  ulong uVar41;
  Mat *pMVar42;
  byte bVar43;
  Mat *pMVar44;
  long lVar45;
  ulong uVar46;
  byte bVar47;
  bool reduce_c;
  undefined8 in_R9;
  undefined7 uVar49;
  Mat *pMVar48;
  Allocator *pAVar50;
  int in_R11D;
  ulong uVar51;
  int j_15;
  void *pvVar52;
  uint uVar53;
  void *pvVar54;
  void *pvVar55;
  int unaff_R15D;
  int j;
  long lVar56;
  ulong uVar57;
  Mat *pMVar58;
  bool bVar59;
  float extraout_XMM0_Da;
  float fVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 extraout_XMM0 [16];
  undefined1 extraout_XMM0_00 [16];
  undefined1 extraout_XMM0_01 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 extraout_XMM0_02 [16];
  undefined1 extraout_XMM0_03 [16];
  undefined1 extraout_var [12];
  undefined1 auVar79 [16];
  undefined1 extraout_XMM0_04 [16];
  undefined1 extraout_XMM0_05 [16];
  undefined1 extraout_XMM0_06 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 extraout_XMM0_07 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 extraout_XMM0_08 [16];
  undefined1 extraout_XMM0_09 [16];
  undefined1 extraout_XMM0_10 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 extraout_XMM0_11 [16];
  undefined1 extraout_XMM0_12 [16];
  undefined1 extraout_XMM0_13 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 extraout_XMM0_14 [16];
  undefined1 extraout_XMM0_15 [16];
  undefined1 extraout_var_00 [12];
  undefined1 extraout_XMM0_16 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 extraout_XMM0_17 [16];
  undefined1 extraout_XMM0_18 [16];
  undefined1 extraout_var_01 [12];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 extraout_XMM0_19 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 extraout_XMM0_20 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 extraout_XMM0_21 [16];
  undefined1 extraout_XMM0_22 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 extraout_XMM0_23 [16];
  undefined1 extraout_XMM0_24 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 extraout_XMM0_25 [16];
  undefined1 extraout_var_02 [12];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 extraout_XMM0_26 [16];
  undefined1 extraout_XMM0_27 [16];
  undefined1 extraout_XMM0_28 [16];
  undefined1 auVar152 [16];
  undefined1 extraout_XMM0_29 [16];
  undefined1 extraout_XMM0_30 [16];
  undefined1 extraout_var_03 [12];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 extraout_XMM0_31 [16];
  undefined1 extraout_XMM0_32 [16];
  undefined1 extraout_var_04 [12];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 extraout_XMM0_33 [16];
  undefined1 extraout_XMM0_34 [16];
  undefined1 extraout_var_05 [12];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  float in_XMM1_Da;
  float fVar161;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  int iVar265;
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  int size;
  int size_6;
  int axes_flag [4];
  Option *in_stack_fffffffffffffeb8;
  Mat *local_130;
  void *local_128;
  Mat *local_120;
  Mat *local_118;
  Mat *local_110;
  Mat *local_f8;
  void *local_f0;
  Mat *local_e8;
  Mat *local_d0;
  Mat local_b8;
  void *local_68;
  void *local_60;
  void *local_58;
  void *local_50;
  undefined1 local_48 [16];
  void *local_38;
  long lVar266;
  
  uVar12 = bottom_blob->dims;
  fVar60 = 0.0;
  fVar161 = 0.0;
  local_48 = (undefined1  [16])0x0;
  uVar49 = (undefined7)((ulong)in_R9 >> 8);
  pMVar42 = top_blob;
  if (this->reduce_all == 0) {
    pMVar16 = (Mat *)(long)(this->axes).w;
    pMVar44 = bottom_blob;
    if (0 < (long)pMVar16) {
      pvVar39 = (this->axes).data;
      pMVar42 = (Mat *)0x0;
      do {
        iVar11 = *(int *)((long)pvVar39 + (long)pMVar42 * 4);
        pMVar44 = (Mat *)(long)(int)((iVar11 >> 0x1f & uVar12) + iVar11);
        *(undefined4 *)(local_48 + (long)pMVar44 * 4) = 1;
        pMVar42 = (Mat *)((long)&pMVar42->data + 1);
      } while (pMVar16 != pMVar42);
    }
    fVar161 = local_48._8_4_;
    switch(uVar12) {
    case 1:
      auVar273 = _DAT_00544250;
      break;
    case 2:
      auVar273._0_4_ = -(uint)((float)local_48._0_4_ == 1.4013e-45);
      auVar273._4_4_ = -(uint)((float)local_48._4_4_ == 1.4013e-45);
      auVar273._8_4_ = -(uint)((float)local_48._4_4_ == 1.4013e-45);
      auVar273._12_4_ = 0xffffffff;
      fVar60 = (float)local_48._0_4_;
      break;
    case 3:
      uVar41 = CONCAT71(uVar49,(float)local_48._0_4_ == 1.4013e-45);
      auVar273._0_4_ = -(uint)((float)local_48._4_4_ == 1.4013e-45);
      auVar273._4_4_ = -(uint)(fVar161 == 1.4013e-45);
      auVar273._8_4_ = -(uint)(fVar161 == 1.4013e-45);
      auVar273._12_4_ = 0xffffffff;
      fVar161 = (float)local_48._4_4_;
      goto LAB_0034b4d3;
    case 4:
      uVar41 = CONCAT71(uVar49,(float)local_48._0_4_ == 1.4013e-45);
      pMVar44 = (Mat *)CONCAT71((int7)((ulong)pMVar44 >> 8),(float)local_48._4_4_ == 1.4013e-45);
      auVar273._0_4_ = -(uint)(fVar161 == 1.4013e-45);
      auVar273._4_4_ = -(uint)(local_48._12_4_ == 1);
      auVar273._8_4_ = -(uint)(local_48._12_4_ == 1);
      auVar273._12_4_ = 0xffffffff;
      goto LAB_0034b4d5;
    default:
      auVar273 = (undefined1  [16])0x0;
    }
    uVar41 = 0;
    fVar161 = fVar60;
LAB_0034b4d3:
    pMVar44 = (Mat *)0x0;
  }
  else {
    uVar41 = CONCAT71(uVar49,1);
    pMVar44 = (Mat *)CONCAT71((int7)((ulong)bottom_blob >> 8),1);
    auVar273 = _DAT_005483c0;
  }
LAB_0034b4d5:
  iVar11 = 0x548410;
  uVar14 = 0x548410;
  iVar10 = (&switchD_0034b4f3::switchdataD_00548410)[(uint)this->operation] + 0x548410;
  lVar56 = auVar273._0_8_;
  lVar20 = auVar273._8_8_;
  bVar59 = SUB81(pMVar44,0);
  reduce_c = SUB81(uVar41,0);
  bVar43 = auVar273[0];
  bVar31 = auVar273[8];
  uVar6 = auVar273[9];
  switch(this->operation) {
  case 0:
    auVar274._0_8_ = lVar56 << 0x3f;
    auVar274._8_8_ = lVar20 << 0x3f;
    uVar28 = movmskpd(0x548410,auVar274);
    iVar11 = reduction<ncnn::reduction_op_add<float>,ncnn::reduction_op_add<float>,ncnn::post_process_identity<float>>
                       (bottom_blob,top_blob,this->coeff,(bool)((byte)uVar28 >> 1),
                        (bool)((byte)uVar28 & 1),bVar59,reduce_c,false,in_XMM1_Da,this->keepdims,opt
                       );
    return iVar11;
  case 1:
    fVar161 = this->coeff;
    uVar6 = (undefined1)this->keepdims;
    auVar278._0_8_ = lVar56 << 0x3f;
    auVar278._8_8_ = lVar20 << 0x3f;
    uVar28 = movmskpd(0x548410,auVar278);
    bVar31 = (byte)uVar28;
    goto LAB_0034b6eb;
  case 2:
    fVar161 = this->coeff;
    auVar276._0_8_ = lVar56 << 0x3f;
    auVar276._8_8_ = lVar20 << 0x3f;
    uVar28 = movmskpd(0x548410,auVar276);
    pMVar44 = top_blob;
    unaff_R15D = reduction_op<ncnn::reduction_op_sumsq<float>,ncnn::reduction_op_add<float>>
                           (bottom_blob,top_blob,fVar161,(bool)((byte)uVar28 >> 1),
                            (bool)((byte)uVar28 & 1),bVar59,reduce_c,this->keepdims,opt);
    break;
  case 3:
    if (3 < uVar12 - 1) {
      iVar10 = 1;
      goto LAB_0034bae8;
    }
    iVar11 = (&switchD_0034b678::switchdataD_0054843c)[uVar12 - 1] + 0x54843c;
    switch(uVar12) {
    case 1:
      iVar10 = bottom_blob->w;
      break;
    case 2:
      auVar69._0_8_ = lVar56 << 0x3f;
      auVar69._8_8_ = lVar20 << 0x3f;
      uVar12 = movmskpd(0x54843c,auVar69);
      iVar10 = 1;
      if ((uVar12 & 2) != 0) {
        iVar10 = bottom_blob->w;
      }
      if ((uVar12 & 1) != 0) {
        iVar10 = iVar10 * bottom_blob->h;
      }
      break;
    case 3:
      uVar2 = bottom_blob->w;
      uVar3 = bottom_blob->h;
      uVar12 = (auVar273._0_4_ << 0x1f) >> 0x1f;
      uVar14 = (auVar273._8_4_ << 0x1f) >> 0x1f;
      uVar12 = ~uVar12 & 1 | uVar3 & uVar12;
      uVar14 = ~uVar14 & 1 | uVar2 & uVar14;
      goto LAB_0034baae;
    case 4:
      auVar68._0_8_ = lVar56 << 0x3f;
      auVar68._8_8_ = lVar20 << 0x3f;
      uVar14 = movmskpd((int)pMVar42,auVar68);
      uVar12 = 1;
      iVar11 = 1;
      if ((uVar14 & 2) != 0) {
        iVar11 = bottom_blob->w;
      }
      iVar10 = 1;
      if ((uVar14 & 1) != 0) {
        iVar10 = bottom_blob->h;
      }
      uVar14 = iVar10 * iVar11;
      if (bVar59 != false) {
        uVar12 = bottom_blob->d;
      }
LAB_0034baae:
      iVar10 = uVar14 * uVar12;
      if (reduce_c != false) {
        iVar10 = iVar10 * bottom_blob->c;
      }
    }
LAB_0034bae8:
    fVar161 = this->coeff;
    auVar280._0_8_ = lVar56 << 0x3f;
    auVar280._8_8_ = lVar20 << 0x3f;
    uVar28 = movmskpd(iVar11,auVar280);
    pMVar44 = top_blob;
    iVar11 = reduction_op<ncnn::reduction_op_add<float>,ncnn::reduction_op_add<float>>
                       (bottom_blob,top_blob,fVar161,(bool)((byte)uVar28 >> 1),
                        (bool)((byte)uVar28 & 1),bVar59,reduce_c,this->keepdims,opt);
    if (iVar11 != 0) {
      return -100;
    }
    fVar161 = fVar161 / (float)iVar10;
    goto LAB_00358760;
  case 4:
    fVar161 = this->coeff;
    iVar11 = this->keepdims;
    pMVar42 = (Mat *)bottom_blob->elemsize;
    if (uVar12 == 2) {
      uVar13 = bottom_blob->w;
      uVar35 = (ulong)uVar13;
      uVar15 = bottom_blob->h;
      pAVar36 = (Allocator *)(ulong)uVar15;
      auVar61._8_4_ = 0xffffffff;
      auVar61._0_8_ = 0xffffffffffffffff;
      auVar61._12_4_ = 0xffffffff;
      auVar62._0_8_ = SUB168(auVar61 ^ auVar273,0) << 0x3f;
      auVar62._8_8_ = SUB168(auVar61 ^ auVar273,8) << 0x3f;
      iVar10 = movmskpd(iVar10,auVar62);
      if (iVar10 == 0) {
        if (iVar11 == 0) {
          Mat::create(top_blob,1,(size_t)pMVar42,opt->blob_allocator);
        }
        else {
          Mat::create(top_blob,1,1,(size_t)pMVar42,opt->blob_allocator);
        }
        pAVar50 = opt->workspace_allocator;
        local_b8.cstep = 0;
        local_b8.data = (void *)0x0;
        local_b8.refcount._0_4_ = 0;
        local_b8.refcount._4_4_ = 0;
        local_b8.elemsize._0_4_ = 0;
        local_b8.elemsize._4_4_ = 0;
        local_b8.elempack = 0;
        local_b8.allocator = (Allocator *)0x0;
        local_b8.dims = 0;
        local_b8.w = 0;
        local_b8.h = 0;
        local_b8.d = 0;
        local_b8.c = 0;
        Mat::create(&local_b8,uVar15,(size_t)pMVar42,pAVar50);
        unaff_R15D = -100;
        if ((local_b8.data != (void *)0x0) &&
           (pAVar50 = (Allocator *)((long)local_b8.c * local_b8.cstep), pAVar50 != (Allocator *)0x0)
           ) {
          if ((int)uVar15 < 1) {
            fVar60 = -3.4028235e+38;
          }
          else {
            pvVar39 = bottom_blob->data;
            iVar10 = bottom_blob->w;
            sVar18 = bottom_blob->elemsize;
            pAVar50 = (Allocator *)0x0;
            do {
              auVar162 = ZEXT816(0xff7fffff);
              if (0 < (int)uVar13) {
                uVar51 = 0;
                auVar162 = ZEXT816(0xff7fffff);
                do {
                  fVar60 = *(float *)((long)pvVar39 + uVar51 * 4);
                  if (auVar162._0_4_ <= fVar60) {
                    auVar162._0_4_ = fVar60;
                  }
                  uVar51 = uVar51 + 1;
                } while (uVar35 != uVar51);
              }
              *(int *)((long)local_b8.data + (long)pAVar50 * 4) = auVar162._0_4_;
              pAVar50 = pAVar50 + 1;
              pvVar39 = (void *)((long)pvVar39 + (long)iVar10 * sVar18);
            } while (pAVar50 != pAVar36);
            fVar60 = -3.4028235e+38;
            pAVar50 = (Allocator *)0x0;
            do {
              fVar1 = *(float *)((long)local_b8.data + (long)pAVar50 * 4);
              if (fVar60 <= fVar1) {
                fVar60 = fVar1;
              }
              pAVar50 = pAVar50 + 1;
            } while (pAVar36 != pAVar50);
          }
          *(float *)top_blob->data = fVar60;
          unaff_R15D = 0;
        }
        uVar14 = (uint)pAVar50;
        piVar7 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            if (local_b8.allocator == (Allocator *)0x0) {
              if (local_b8.data != (void *)0x0) {
                free(local_b8.data);
              }
            }
            else {
              (**(code **)(*(long *)local_b8.allocator + 0x18))();
            }
          }
        }
        uVar41 = uVar41 & 0xffffffff;
        local_b8.cstep = 0;
        local_b8.data = (void *)0x0;
        local_b8.refcount._0_4_ = 0;
        local_b8.refcount._4_4_ = 0;
        local_b8.elemsize._0_4_ = 0;
        local_b8.elemsize._4_4_ = 0;
        local_b8.elempack = 0;
        local_b8.dims = 0;
        local_b8.w = 0;
        local_b8.h = 0;
        local_b8.d = 0;
        local_b8.c = 0;
        bVar59 = false;
        pMVar44 = (Mat *)((ulong)pMVar44 & 0xffffffff);
      }
      else if (((bVar43 | (byte)iVar10 >> 1) & 1) == 0) {
        pAVar50 = opt->blob_allocator;
        if (iVar11 == 0) {
          Mat::create(top_blob,uVar15,(size_t)pMVar42,pAVar50);
          uVar14 = (uint)pAVar50;
        }
        else {
          pMVar16 = pMVar42;
          Mat::create(top_blob,1,uVar15,(size_t)pMVar42,pAVar50);
          uVar14 = (uint)pMVar16;
        }
        if (0 < (int)uVar15) {
          iVar10 = bottom_blob->w;
          sVar18 = bottom_blob->elemsize;
          pvVar39 = bottom_blob->data;
          pvVar55 = top_blob->data;
          pAVar50 = (Allocator *)0x0;
          do {
            auVar165 = ZEXT816(0xff7fffff);
            if (0 < (int)uVar13) {
              uVar51 = 0;
              auVar165 = ZEXT816(0xff7fffff);
              do {
                fVar60 = *(float *)((long)pvVar39 + uVar51 * 4);
                if (auVar165._0_4_ <= fVar60) {
                  auVar165._0_4_ = fVar60;
                }
                uVar51 = uVar51 + 1;
              } while (uVar35 != uVar51);
            }
            *(int *)((long)pvVar55 + (long)pAVar50 * 4) = auVar165._0_4_;
            pAVar50 = pAVar50 + 1;
            pvVar39 = (void *)((long)pvVar39 + (long)iVar10 * sVar18);
          } while (pAVar50 != pAVar36);
          goto LAB_0034caa2;
        }
        bVar59 = false;
        unaff_R15D = 0;
        pMVar44 = (Mat *)((ulong)pMVar44 & 0xffffffff);
        uVar41 = uVar41 & 0xffffffff;
      }
      else {
        bVar25 = bVar31 | (byte)iVar10;
        uVar14 = (uint)CONCAT11(uVar6,bVar25);
        if ((bVar25 & 1) == 0) {
          if (iVar11 == 0) {
            Mat::create(top_blob,uVar13,(size_t)pMVar42,opt->blob_allocator);
          }
          else {
            Mat::create(top_blob,uVar13,1,(size_t)pMVar42,opt->blob_allocator);
          }
          auVar264 = _DAT_00544250;
          auVar67 = _DAT_00544240;
          auVar79 = _DAT_0053f020;
          uVar14 = top_blob->c * (int)top_blob->cstep;
          pvVar39 = (void *)(ulong)uVar14;
          pvVar55 = top_blob->data;
          if (0 < (int)uVar14) {
            pvVar39 = (void *)(ulong)(uVar14 + 3 & 0xfffffffc);
            lVar56 = (ulong)uVar14 - 1;
            auVar70._8_4_ = (int)lVar56;
            auVar70._0_8_ = lVar56;
            auVar70._12_4_ = (int)((ulong)lVar56 >> 0x20);
            pvVar54 = (void *)0x0;
            auVar70 = auVar70 ^ _DAT_0053f020;
            do {
              auVar189._8_4_ = (int)pvVar54;
              auVar189._0_8_ = pvVar54;
              auVar189._12_4_ = (int)((ulong)pvVar54 >> 0x20);
              auVar255 = (auVar189 | auVar264) ^ auVar79;
              iVar10 = auVar70._4_4_;
              if ((bool)(~(iVar10 < auVar255._4_4_ ||
                          auVar70._0_4_ < auVar255._0_4_ && auVar255._4_4_ == iVar10) & 1)) {
                *(undefined4 *)((long)pvVar55 + (long)pvVar54 * 4) = 0xff7fffff;
              }
              if (auVar255._12_4_ <= auVar70._12_4_ &&
                  (auVar255._8_4_ <= auVar70._8_4_ || auVar255._12_4_ != auVar70._12_4_)) {
                *(undefined4 *)((long)pvVar55 + (long)pvVar54 * 4 + 4) = 0xff7fffff;
              }
              auVar255 = (auVar189 | auVar67) ^ auVar79;
              iVar265 = auVar255._4_4_;
              if (iVar265 <= iVar10 && (iVar265 != iVar10 || auVar255._0_4_ <= auVar70._0_4_)) {
                *(undefined4 *)((long)pvVar55 + (long)pvVar54 * 4 + 8) = 0xff7fffff;
                *(undefined4 *)((long)pvVar55 + (long)pvVar54 * 4 + 0xc) = 0xff7fffff;
              }
              pvVar54 = (void *)((long)pvVar54 + 4);
            } while (pvVar39 != pvVar54);
          }
          if (0 < (int)uVar15) {
            pvVar39 = bottom_blob->data;
            iVar10 = bottom_blob->w;
            sVar18 = bottom_blob->elemsize;
            pAVar50 = (Allocator *)0x0;
            do {
              if (0 < (int)uVar13) {
                uVar51 = 0;
                do {
                  fVar1 = *(float *)((long)pvVar39 + uVar51 * 4);
                  fVar60 = *(float *)((long)pvVar55 + uVar51 * 4);
                  if (fVar1 <= fVar60) {
                    fVar1 = fVar60;
                  }
                  *(float *)((long)pvVar55 + uVar51 * 4) = fVar1;
                  uVar51 = uVar51 + 1;
                } while (uVar35 != uVar51);
              }
              pAVar50 = pAVar50 + 1;
              pvVar39 = (void *)((long)pvVar39 + (long)iVar10 * sVar18);
            } while (pAVar50 != pAVar36);
          }
LAB_0034caa2:
          uVar14 = (uint)pvVar39;
          uVar41 = uVar41 & 0xffffffff;
          bVar59 = false;
          unaff_R15D = 0;
          pMVar44 = (Mat *)((ulong)pMVar44 & 0xffffffff);
        }
        else {
          bVar59 = true;
        }
      }
      if (bVar59) goto LAB_0034cabb;
    }
    else {
      if (uVar12 == 1) {
        iVar11 = bottom_blob->w;
        pMVar44 = (Mat *)0x1;
        Mat::create(top_blob,1,(size_t)pMVar42,opt->blob_allocator);
        if ((long)iVar11 < 1) {
          fVar60 = -3.4028235e+38;
        }
        else {
          fVar60 = -3.4028235e+38;
          lVar56 = 0;
          do {
            fVar1 = *(float *)((long)bottom_blob->data + lVar56 * 4);
            if (fVar60 <= fVar1) {
              fVar60 = fVar1;
            }
            lVar56 = lVar56 + 1;
          } while (iVar11 != lVar56);
        }
LAB_0034bc6f:
        *(float *)top_blob->data = fVar60;
      }
      else {
LAB_0034cabb:
        bVar25 = (byte)uVar41;
        if (uVar12 == 3) {
          uVar14 = bottom_blob->w;
          lVar56 = (long)(int)uVar14;
          uVar13 = bottom_blob->h;
          uVar35 = (ulong)uVar13;
          uVar15 = bottom_blob->c;
          pMVar17 = (Mat *)(ulong)uVar15;
          uVar33 = uVar13 * uVar14;
          auVar71._8_4_ = 0xffffffff;
          auVar71._0_8_ = 0xffffffffffffffff;
          auVar71._12_4_ = 0xffffffff;
          auVar72._0_8_ = SUB168(auVar71 ^ auVar273,0) << 0x3f;
          auVar72._8_8_ = SUB168(auVar71 ^ auVar273,8) << 0x3f;
          iVar10 = movmskpd(uVar15,auVar72);
          pMVar16 = (Mat *)(uVar41 & 0xffffffff ^ 1);
          cVar26 = (char)pMVar16;
          if ((iVar10 != 0) || (cVar26 != '\0')) {
            if (iVar10 != 0 || bVar25 != 0) {
              uVar41 = (ulong)uVar14;
              bVar8 = (byte)iVar10 >> 1 | bVar43;
              if ((bVar8 & 1) == 0 && cVar26 == '\0') {
                if (iVar11 == 0) {
                  Mat::create(top_blob,uVar13,(size_t)pMVar42,opt->blob_allocator);
                }
                else {
                  Mat::create(top_blob,1,uVar13,1,(size_t)pMVar42,opt->blob_allocator);
                }
                local_b8.cstep = 0;
                local_b8.data = (Allocator *)0x0;
                local_b8.refcount._0_4_ = 0;
                local_b8.refcount._4_4_ = 0;
                local_b8.elemsize._0_4_ = 0;
                local_b8.elemsize._4_4_ = 0;
                local_b8.elempack = 0;
                local_b8.allocator = (Allocator *)0x0;
                local_b8.dims = 0;
                local_b8.w = 0;
                local_b8.h = 0;
                local_b8.d = 0;
                local_b8.c = 0;
                pMVar16 = pMVar17;
                Mat::create(&local_b8,1,uVar13,uVar15,(size_t)pMVar42,opt->workspace_allocator);
                auVar264 = _DAT_00544250;
                auVar67 = _DAT_00544240;
                auVar79 = _DAT_0053f020;
                unaff_R15D = -100;
                if (((Allocator *)local_b8.data != (Allocator *)0x0) &&
                   (pMVar16 = (Mat *)local_b8.cstep, local_b8.cstep * (long)local_b8.c != 0)) {
                  uVar33 = (int)local_b8.cstep * local_b8.c;
                  if (0 < (int)uVar33) {
                    lVar20 = (ulong)uVar33 - 1;
                    auVar80._8_4_ = (int)lVar20;
                    auVar80._0_8_ = lVar20;
                    auVar80._12_4_ = (int)((ulong)lVar20 >> 0x20);
                    uVar51 = 0;
                    auVar80 = auVar80 ^ _DAT_0053f020;
                    do {
                      auVar192._8_4_ = (int)uVar51;
                      auVar192._0_8_ = uVar51;
                      auVar192._12_4_ = (int)(uVar51 >> 0x20);
                      auVar255 = (auVar192 | auVar264) ^ auVar79;
                      iVar10 = auVar80._4_4_;
                      if ((bool)(~(iVar10 < auVar255._4_4_ ||
                                  auVar80._0_4_ < auVar255._0_4_ && auVar255._4_4_ == iVar10) & 1))
                      {
                        *(undefined4 *)((long)local_b8.data + uVar51 * 4) = 0xff7fffff;
                      }
                      if (auVar255._12_4_ <= auVar80._12_4_ &&
                          (auVar255._8_4_ <= auVar80._8_4_ || auVar255._12_4_ != auVar80._12_4_)) {
                        *(undefined4 *)((long)local_b8.data + uVar51 * 4 + 4) = 0xff7fffff;
                      }
                      auVar255 = (auVar192 | auVar67) ^ auVar79;
                      iVar265 = auVar255._4_4_;
                      if (iVar265 <= iVar10 &&
                          (iVar265 != iVar10 || auVar255._0_4_ <= auVar80._0_4_)) {
                        *(undefined4 *)((long)local_b8.data + uVar51 * 4 + 8) = 0xff7fffff;
                        *(undefined4 *)((long)local_b8.data + uVar51 * 4 + 0xc) = 0xff7fffff;
                      }
                      uVar51 = uVar51 + 4;
                    } while ((uVar33 + 3 & 0xfffffffc) != uVar51);
                  }
                  if (0 < (int)uVar15) {
                    pvVar39 = bottom_blob->data;
                    sVar18 = bottom_blob->elemsize;
                    sVar21 = bottom_blob->cstep;
                    pMVar29 = (Mat *)0x0;
                    do {
                      if (0 < (int)uVar13) {
                        uVar51 = 0;
                        pvVar55 = pvVar39;
                        do {
                          auVar174 = ZEXT816(0xff7fffff);
                          if (0 < (int)uVar14) {
                            uVar57 = 0;
                            auVar174 = ZEXT816(0xff7fffff);
                            do {
                              fVar60 = *(float *)((long)pvVar55 + uVar57 * 4);
                              if (auVar174._0_4_ <= fVar60) {
                                auVar174._0_4_ = fVar60;
                              }
                              uVar57 = uVar57 + 1;
                            } while (uVar41 != uVar57);
                          }
                          *(int *)((long)local_b8.data +
                                  uVar51 * 4 +
                                  CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize) *
                                  local_b8.cstep * (long)pMVar29) = auVar174._0_4_;
                          uVar51 = uVar51 + 1;
                          pvVar55 = (void *)((long)pvVar55 + lVar56 * 4);
                        } while (uVar51 != uVar35);
                      }
                      pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                      pvVar39 = (void *)((long)pvVar39 + sVar18 * sVar21);
                    } while (pMVar29 != pMVar17);
                  }
                  auVar264 = _DAT_00544250;
                  auVar67 = _DAT_00544240;
                  auVar79 = _DAT_0053f020;
                  uVar14 = top_blob->c * (int)top_blob->cstep;
                  if (0 < (int)uVar14) {
                    pvVar39 = top_blob->data;
                    lVar56 = (ulong)uVar14 - 1;
                    auVar81._8_4_ = (int)lVar56;
                    auVar81._0_8_ = lVar56;
                    auVar81._12_4_ = (int)((ulong)lVar56 >> 0x20);
                    uVar41 = 0;
                    auVar81 = auVar81 ^ _DAT_0053f020;
                    do {
                      auVar193._8_4_ = (int)uVar41;
                      auVar193._0_8_ = uVar41;
                      auVar193._12_4_ = (int)(uVar41 >> 0x20);
                      auVar255 = (auVar193 | auVar264) ^ auVar79;
                      iVar10 = auVar81._4_4_;
                      if ((bool)(~(iVar10 < auVar255._4_4_ ||
                                  auVar81._0_4_ < auVar255._0_4_ && auVar255._4_4_ == iVar10) & 1))
                      {
                        *(undefined4 *)((long)pvVar39 + uVar41 * 4) = 0xff7fffff;
                      }
                      if (auVar255._12_4_ <= auVar81._12_4_ &&
                          (auVar255._8_4_ <= auVar81._8_4_ || auVar255._12_4_ != auVar81._12_4_)) {
                        *(undefined4 *)((long)pvVar39 + uVar41 * 4 + 4) = 0xff7fffff;
                      }
                      auVar255 = (auVar193 | auVar67) ^ auVar79;
                      iVar265 = auVar255._4_4_;
                      if (iVar265 <= iVar10 &&
                          (iVar265 != iVar10 || auVar255._0_4_ <= auVar81._0_4_)) {
                        *(undefined4 *)((long)pvVar39 + uVar41 * 4 + 8) = 0xff7fffff;
                        *(undefined4 *)((long)pvVar39 + uVar41 * 4 + 0xc) = 0xff7fffff;
                      }
                      uVar41 = uVar41 + 4;
                    } while ((uVar14 + 3 & 0xfffffffc) != uVar41);
                  }
                  if (0 < (int)uVar15) {
                    pMVar16 = (Mat *)(local_b8.cstep *
                                     CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize));
                    pvVar39 = top_blob->data;
                    pMVar29 = (Mat *)0x0;
                    pAVar36 = (Allocator *)local_b8.data;
                    do {
                      if (0 < (int)uVar13) {
                        uVar41 = 0;
                        do {
                          fVar60 = *(float *)((long)pvVar39 + uVar41 * 4);
                          fVar1 = *(float *)(pAVar36 + uVar41 * 4);
                          if (*(float *)(pAVar36 + uVar41 * 4) <= fVar60) {
                            fVar1 = fVar60;
                          }
                          *(float *)((long)pvVar39 + uVar41 * 4) = fVar1;
                          uVar41 = uVar41 + 1;
                        } while (uVar35 != uVar41);
                      }
                      pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                      pAVar36 = pAVar36 + (long)pMVar16;
                    } while (pMVar29 != pMVar17);
                  }
                  unaff_R15D = 0;
                }
                piVar7 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
                if (piVar7 != (int *)0x0) {
                  LOCK();
                  *piVar7 = *piVar7 + -1;
                  UNLOCK();
                  if (*piVar7 == 0) {
                    if (local_b8.allocator == (Allocator *)0x0) {
LAB_00350399:
                      if ((Allocator *)local_b8.data != (Allocator *)0x0) {
                        free(local_b8.data);
                      }
                    }
                    else {
                      (**(code **)(*(long *)local_b8.allocator + 0x18))();
                    }
                  }
                }
              }
              else {
                bVar9 = (byte)iVar10 | bVar31;
                if ((bVar9 & 1) != 0 || cVar26 != '\0') {
                  if ((bVar8 & 1) == 0 && bVar25 == 0) {
                    if (iVar11 == 0) {
                      pMVar16 = pMVar42;
                      Mat::create(top_blob,uVar13,uVar15,(size_t)pMVar42,opt->blob_allocator);
                    }
                    else {
                      pMVar16 = pMVar17;
                      Mat::create(top_blob,1,uVar13,uVar15,(size_t)pMVar42,opt->blob_allocator);
                    }
                    if ((int)uVar15 < 1) {
                      bVar59 = false;
                      unaff_R15D = 0;
                    }
                    else {
                      sVar18 = bottom_blob->elemsize;
                      if (iVar11 == 0) {
                        sVar21 = (size_t)top_blob->w;
                      }
                      else {
                        sVar21 = top_blob->cstep;
                      }
                      pvVar39 = bottom_blob->data;
                      sVar22 = top_blob->elemsize;
                      sVar5 = bottom_blob->cstep;
                      pvVar55 = top_blob->data;
                      pMVar29 = (Mat *)0x0;
                      unaff_R15D = 0;
                      do {
                        if (0 < (int)uVar13) {
                          uVar51 = 0;
                          pvVar54 = pvVar39;
                          do {
                            auVar180 = ZEXT816(0xff7fffff);
                            if (0 < (int)uVar14) {
                              uVar57 = 0;
                              auVar180 = ZEXT816(0xff7fffff);
                              do {
                                fVar60 = *(float *)((long)pvVar54 + uVar57 * 4);
                                if (auVar180._0_4_ <= fVar60) {
                                  auVar180._0_4_ = fVar60;
                                }
                                uVar57 = uVar57 + 1;
                              } while (uVar41 != uVar57);
                            }
                            *(int *)((long)pvVar55 + uVar51 * 4 + sVar21 * sVar22 * (long)pMVar29) =
                                 auVar180._0_4_;
                            uVar51 = uVar51 + 1;
                            pvVar54 = (void *)((long)pvVar54 + lVar56 * 4);
                          } while (uVar51 != uVar35);
                        }
                        pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                        pvVar39 = (void *)((long)pvVar39 + sVar18 * sVar5);
                        bVar59 = false;
                        pMVar16 = top_blob;
                      } while (pMVar29 != pMVar17);
                    }
                  }
                  else if (((bVar43 | bVar31) & 1) == 0 && cVar26 == '\0') {
                    if (iVar11 == 0) {
                      pMVar16 = pMVar42;
                      Mat::create(top_blob,uVar14,uVar13,(size_t)pMVar42,opt->blob_allocator);
                    }
                    else {
                      pMVar16 = (Mat *)0x1;
                      Mat::create(top_blob,uVar14,uVar13,1,(size_t)pMVar42,opt->blob_allocator);
                    }
                    auVar264 = _DAT_00544250;
                    auVar67 = _DAT_00544240;
                    auVar79 = _DAT_0053f020;
                    uVar14 = top_blob->c * (int)top_blob->cstep;
                    if (0 < (int)uVar14) {
                      pMVar16 = (Mat *)top_blob->data;
                      lVar56 = (ulong)uVar14 - 1;
                      auVar119._8_4_ = (int)lVar56;
                      auVar119._0_8_ = lVar56;
                      auVar119._12_4_ = (int)((ulong)lVar56 >> 0x20);
                      uVar41 = 0;
                      auVar119 = auVar119 ^ _DAT_0053f020;
                      do {
                        auVar222._8_4_ = (int)uVar41;
                        auVar222._0_8_ = uVar41;
                        auVar222._12_4_ = (int)(uVar41 >> 0x20);
                        auVar255 = (auVar222 | auVar264) ^ auVar79;
                        iVar10 = auVar119._4_4_;
                        if ((bool)(~(iVar10 < auVar255._4_4_ ||
                                    auVar119._0_4_ < auVar255._0_4_ && auVar255._4_4_ == iVar10) & 1
                                  )) {
                          *(undefined4 *)((long)&pMVar16->data + uVar41 * 4) = 0xff7fffff;
                        }
                        if (auVar255._12_4_ <= auVar119._12_4_ &&
                            (auVar255._8_4_ <= auVar119._8_4_ || auVar255._12_4_ != auVar119._12_4_)
                           ) {
                          *(undefined4 *)((long)&pMVar16->data + uVar41 * 4 + 4) = 0xff7fffff;
                        }
                        auVar255 = (auVar222 | auVar67) ^ auVar79;
                        iVar265 = auVar255._4_4_;
                        if (iVar265 <= iVar10 &&
                            (iVar265 != iVar10 || auVar255._0_4_ <= auVar119._0_4_)) {
                          *(undefined4 *)((long)&pMVar16->refcount + uVar41 * 4) = 0xff7fffff;
                          *(undefined4 *)((long)&pMVar16->refcount + uVar41 * 4 + 4) = 0xff7fffff;
                        }
                        uVar41 = uVar41 + 4;
                      } while ((uVar14 + 3 & 0xfffffffc) != uVar41);
                    }
                    if ((int)uVar15 < 1) {
LAB_00354b77:
                      bVar59 = false;
                      unaff_R15D = 0;
                    }
                    else {
                      sVar18 = bottom_blob->elemsize;
                      sVar21 = bottom_blob->cstep;
                      pMVar16 = (Mat *)bottom_blob->data;
                      pvVar39 = top_blob->data;
                      pMVar29 = (Mat *)0x0;
                      unaff_R15D = 0;
                      do {
                        if (0 < (int)uVar33) {
                          uVar41 = 0;
                          do {
                            fVar1 = *(float *)((long)&pMVar16->data + uVar41 * 4);
                            fVar60 = *(float *)((long)pvVar39 + uVar41 * 4);
                            if (fVar1 <= fVar60) {
                              fVar1 = fVar60;
                            }
                            *(float *)((long)pvVar39 + uVar41 * 4) = fVar1;
                            uVar41 = uVar41 + 1;
                          } while (uVar33 != uVar41);
                        }
                        pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                        pMVar16 = (Mat *)((long)&pMVar16->data + sVar18 * sVar21);
                        bVar59 = false;
                      } while (pMVar29 != pMVar17);
                    }
                  }
                  else {
                    bVar59 = true;
                    if ((bVar9 & 1) == 0 && bVar25 == 0) {
                      if (iVar11 == 0) {
                        Mat::create(top_blob,uVar14,uVar15,(size_t)pMVar42,opt->blob_allocator);
                      }
                      else {
                        Mat::create(top_blob,uVar14,1,uVar15,(size_t)pMVar42,opt->blob_allocator);
                      }
                      auVar264 = _DAT_00544250;
                      auVar67 = _DAT_00544240;
                      auVar79 = _DAT_0053f020;
                      sVar18 = top_blob->cstep;
                      uVar33 = top_blob->c * (int)sVar18;
                      pMVar16 = (Mat *)(ulong)uVar33;
                      if (0 < (int)uVar33) {
                        pvVar39 = top_blob->data;
                        pMVar16 = (Mat *)(ulong)(uVar33 + 3 & 0xfffffffc);
                        lVar56 = (ulong)uVar33 - 1;
                        auVar122._8_4_ = (int)lVar56;
                        auVar122._0_8_ = lVar56;
                        auVar122._12_4_ = (int)((ulong)lVar56 >> 0x20);
                        pMVar29 = (Mat *)0x0;
                        auVar122 = auVar122 ^ _DAT_0053f020;
                        do {
                          auVar225._8_4_ = (int)pMVar29;
                          auVar225._0_8_ = pMVar29;
                          auVar225._12_4_ = (int)((ulong)pMVar29 >> 0x20);
                          auVar255 = (auVar225 | auVar264) ^ auVar79;
                          iVar10 = auVar122._4_4_;
                          if ((bool)(~(iVar10 < auVar255._4_4_ ||
                                      auVar122._0_4_ < auVar255._0_4_ && auVar255._4_4_ == iVar10) &
                                    1)) {
                            *(undefined4 *)((long)pvVar39 + (long)pMVar29 * 4) = 0xff7fffff;
                          }
                          if (auVar255._12_4_ <= auVar122._12_4_ &&
                              (auVar255._8_4_ <= auVar122._8_4_ ||
                              auVar255._12_4_ != auVar122._12_4_)) {
                            *(undefined4 *)((long)pvVar39 + (long)pMVar29 * 4 + 4) = 0xff7fffff;
                          }
                          auVar255 = (auVar225 | auVar67) ^ auVar79;
                          iVar265 = auVar255._4_4_;
                          if (iVar265 <= iVar10 &&
                              (iVar265 != iVar10 || auVar255._0_4_ <= auVar122._0_4_)) {
                            *(undefined4 *)((long)pvVar39 + (long)pMVar29 * 4 + 8) = 0xff7fffff;
                            *(undefined4 *)((long)pvVar39 + (long)pMVar29 * 4 + 0xc) = 0xff7fffff;
                          }
                          pMVar29 = (Mat *)((long)&pMVar29->data + 4);
                        } while (pMVar16 != pMVar29);
                      }
                      if ((int)uVar15 < 1) goto LAB_00354b77;
                      pAVar36 = (Allocator *)bottom_blob->data;
                      sVar21 = bottom_blob->elemsize;
                      pvVar39 = top_blob->data;
                      if (iVar11 == 0) {
                        sVar18 = (long)top_blob->w;
                      }
                      sVar22 = top_blob->elemsize;
                      sVar5 = bottom_blob->cstep;
                      pMVar16 = (Mat *)((long)(int)uVar14 * 4);
                      pMVar29 = (Mat *)0x0;
                      unaff_R15D = 0;
                      do {
                        if (0 < (int)uVar13) {
                          uVar15 = 0;
                          pAVar50 = pAVar36;
                          do {
                            if (0 < (int)uVar14) {
                              uVar35 = 0;
                              do {
                                fVar60 = *(float *)((long)pvVar39 + uVar35 * 4);
                                fVar1 = *(float *)(pAVar50 + uVar35 * 4);
                                if (*(float *)(pAVar50 + uVar35 * 4) <= fVar60) {
                                  fVar1 = fVar60;
                                }
                                *(float *)((long)pvVar39 + uVar35 * 4) = fVar1;
                                uVar35 = uVar35 + 1;
                              } while (uVar41 != uVar35);
                            }
                            uVar15 = uVar15 + 1;
                            pAVar50 = pAVar50 + (long)pMVar16;
                          } while (uVar15 != uVar13);
                        }
                        pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                        pAVar36 = pAVar36 + sVar21 * sVar5;
                        pvVar39 = (void *)((long)pvVar39 + sVar18 * sVar22);
                        bVar59 = false;
                      } while (pMVar29 != pMVar17);
                    }
                  }
                  goto LAB_003503d9;
                }
                if (iVar11 == 0) {
                  Mat::create(top_blob,uVar14,(size_t)pMVar42,opt->blob_allocator);
                }
                else {
                  Mat::create(top_blob,uVar14,1,1,(size_t)pMVar42,opt->blob_allocator);
                }
                local_b8.cstep = 0;
                local_b8.data = (Allocator *)0x0;
                local_b8.refcount._0_4_ = 0;
                local_b8.refcount._4_4_ = 0;
                local_b8.elemsize._0_4_ = 0;
                local_b8.elemsize._4_4_ = 0;
                local_b8.elempack = 0;
                local_b8.allocator = (Allocator *)0x0;
                local_b8.dims = 0;
                local_b8.w = 0;
                local_b8.h = 0;
                local_b8.d = 0;
                local_b8.c = 0;
                pMVar16 = pMVar17;
                Mat::create(&local_b8,uVar14,1,uVar15,(size_t)pMVar42,opt->workspace_allocator);
                auVar264 = _DAT_00544250;
                auVar67 = _DAT_00544240;
                auVar79 = _DAT_0053f020;
                unaff_R15D = -100;
                if (((Allocator *)local_b8.data != (Allocator *)0x0) &&
                   (pMVar16 = (Mat *)local_b8.cstep, local_b8.cstep * (long)local_b8.c != 0)) {
                  uVar33 = (int)local_b8.cstep * local_b8.c;
                  if (0 < (int)uVar33) {
                    lVar20 = (ulong)uVar33 - 1;
                    auVar86._8_4_ = (int)lVar20;
                    auVar86._0_8_ = lVar20;
                    auVar86._12_4_ = (int)((ulong)lVar20 >> 0x20);
                    uVar35 = 0;
                    auVar86 = auVar86 ^ _DAT_0053f020;
                    do {
                      auVar198._8_4_ = (int)uVar35;
                      auVar198._0_8_ = uVar35;
                      auVar198._12_4_ = (int)(uVar35 >> 0x20);
                      auVar255 = (auVar198 | auVar264) ^ auVar79;
                      iVar10 = auVar86._4_4_;
                      if ((bool)(~(iVar10 < auVar255._4_4_ ||
                                  auVar86._0_4_ < auVar255._0_4_ && auVar255._4_4_ == iVar10) & 1))
                      {
                        *(undefined4 *)((long)local_b8.data + uVar35 * 4) = 0xff7fffff;
                      }
                      if (auVar255._12_4_ <= auVar86._12_4_ &&
                          (auVar255._8_4_ <= auVar86._8_4_ || auVar255._12_4_ != auVar86._12_4_)) {
                        *(undefined4 *)((long)local_b8.data + uVar35 * 4 + 4) = 0xff7fffff;
                      }
                      auVar255 = (auVar198 | auVar67) ^ auVar79;
                      iVar265 = auVar255._4_4_;
                      if (iVar265 <= iVar10 &&
                          (iVar265 != iVar10 || auVar255._0_4_ <= auVar86._0_4_)) {
                        *(undefined4 *)((long)local_b8.data + uVar35 * 4 + 8) = 0xff7fffff;
                        *(undefined4 *)((long)local_b8.data + uVar35 * 4 + 0xc) = 0xff7fffff;
                      }
                      uVar35 = uVar35 + 4;
                    } while ((uVar33 + 3 & 0xfffffffc) != uVar35);
                  }
                  if (0 < (int)uVar15) {
                    pvVar39 = bottom_blob->data;
                    sVar18 = bottom_blob->elemsize;
                    sVar21 = bottom_blob->cstep;
                    pMVar29 = (Mat *)0x0;
                    pAVar36 = (Allocator *)local_b8.data;
                    do {
                      if (0 < (int)uVar13) {
                        uVar33 = 0;
                        pvVar55 = pvVar39;
                        do {
                          if (0 < (int)uVar14) {
                            uVar35 = 0;
                            do {
                              fVar60 = *(float *)((long)pvVar55 + uVar35 * 4);
                              if (fVar60 <= *(float *)(pAVar36 + uVar35 * 4)) {
                                fVar60 = *(float *)(pAVar36 + uVar35 * 4);
                              }
                              *(float *)(pAVar36 + uVar35 * 4) = fVar60;
                              uVar35 = uVar35 + 1;
                            } while (uVar41 != uVar35);
                          }
                          uVar33 = uVar33 + 1;
                          pvVar55 = (void *)((long)pvVar55 + lVar56 * 4);
                        } while (uVar33 != uVar13);
                      }
                      pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                      pvVar39 = (void *)((long)pvVar39 + sVar18 * sVar21);
                      pAVar36 = pAVar36 + CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize) *
                                          local_b8.cstep;
                    } while (pMVar29 != pMVar17);
                  }
                  auVar264 = _DAT_00544250;
                  auVar67 = _DAT_00544240;
                  auVar79 = _DAT_0053f020;
                  uVar13 = top_blob->c * (int)top_blob->cstep;
                  if (0 < (int)uVar13) {
                    pvVar39 = top_blob->data;
                    lVar56 = (ulong)uVar13 - 1;
                    auVar87._8_4_ = (int)lVar56;
                    auVar87._0_8_ = lVar56;
                    auVar87._12_4_ = (int)((ulong)lVar56 >> 0x20);
                    uVar35 = 0;
                    auVar87 = auVar87 ^ _DAT_0053f020;
                    do {
                      auVar199._8_4_ = (int)uVar35;
                      auVar199._0_8_ = uVar35;
                      auVar199._12_4_ = (int)(uVar35 >> 0x20);
                      auVar255 = (auVar199 | auVar264) ^ auVar79;
                      iVar10 = auVar87._4_4_;
                      if ((bool)(~(iVar10 < auVar255._4_4_ ||
                                  auVar87._0_4_ < auVar255._0_4_ && auVar255._4_4_ == iVar10) & 1))
                      {
                        *(undefined4 *)((long)pvVar39 + uVar35 * 4) = 0xff7fffff;
                      }
                      if (auVar255._12_4_ <= auVar87._12_4_ &&
                          (auVar255._8_4_ <= auVar87._8_4_ || auVar255._12_4_ != auVar87._12_4_)) {
                        *(undefined4 *)((long)pvVar39 + uVar35 * 4 + 4) = 0xff7fffff;
                      }
                      auVar255 = (auVar199 | auVar67) ^ auVar79;
                      iVar265 = auVar255._4_4_;
                      if (iVar265 <= iVar10 &&
                          (iVar265 != iVar10 || auVar255._0_4_ <= auVar87._0_4_)) {
                        *(undefined4 *)((long)pvVar39 + uVar35 * 4 + 8) = 0xff7fffff;
                        *(undefined4 *)((long)pvVar39 + uVar35 * 4 + 0xc) = 0xff7fffff;
                      }
                      uVar35 = uVar35 + 4;
                    } while ((uVar13 + 3 & 0xfffffffc) != uVar35);
                  }
                  if (0 < (int)uVar15) {
                    pMVar16 = (Mat *)(local_b8.cstep *
                                     CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize));
                    pvVar39 = top_blob->data;
                    pMVar29 = (Mat *)0x0;
                    pAVar36 = (Allocator *)local_b8.data;
                    do {
                      if (0 < (int)uVar14) {
                        uVar35 = 0;
                        do {
                          fVar60 = *(float *)((long)pvVar39 + uVar35 * 4);
                          fVar1 = *(float *)(pAVar36 + uVar35 * 4);
                          if (*(float *)(pAVar36 + uVar35 * 4) <= fVar60) {
                            fVar1 = fVar60;
                          }
                          *(float *)((long)pvVar39 + uVar35 * 4) = fVar1;
                          uVar35 = uVar35 + 1;
                        } while (uVar41 != uVar35);
                      }
                      pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                      pAVar36 = pAVar36 + (long)pMVar16;
                    } while (pMVar29 != pMVar17);
                  }
                  unaff_R15D = 0;
                }
                piVar7 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
                if (piVar7 != (int *)0x0) {
                  LOCK();
                  *piVar7 = *piVar7 + -1;
                  UNLOCK();
                  if (*piVar7 == 0) {
                    if (local_b8.allocator == (Allocator *)0x0) goto LAB_00350399;
                    (**(code **)(*(long *)local_b8.allocator + 0x18))();
                  }
                }
              }
              goto LAB_003503b2;
            }
            pMVar16 = (Mat *)opt->blob_allocator;
            if (iVar11 == 0) {
              Mat::create(top_blob,uVar15,(size_t)pMVar42,(Allocator *)pMVar16);
            }
            else {
              pMVar29 = pMVar17;
              Mat::create(top_blob,1,1,uVar15,(size_t)pMVar42,(Allocator *)pMVar16);
              pMVar16 = pMVar29;
            }
            if ((int)uVar15 < 1) {
              bVar59 = false;
              unaff_R15D = 0;
            }
            else {
              pAVar36 = (Allocator *)bottom_blob->data;
              pvVar39 = top_blob->data;
              sVar18 = top_blob->elemsize;
              sVar21 = top_blob->cstep;
              pMVar16 = (Mat *)(bottom_blob->elemsize * bottom_blob->cstep);
              pMVar29 = (Mat *)0x0;
              do {
                auVar169 = ZEXT816(0xff7fffff);
                if (0 < (int)uVar33) {
                  uVar41 = 0;
                  auVar169 = ZEXT816(0xff7fffff);
                  do {
                    if (auVar169._0_4_ <= *(float *)(pAVar36 + uVar41 * 4)) {
                      auVar169._0_4_ = *(float *)(pAVar36 + uVar41 * 4);
                    }
                    uVar41 = uVar41 + 1;
                  } while (uVar33 != uVar41);
                }
                lVar56 = sVar18 * sVar21 * (long)pMVar29;
                if (iVar11 == 0) {
                  lVar56 = (long)pMVar29 * 4;
                }
                *(int *)((long)pvVar39 + lVar56) = auVar169._0_4_;
                pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                pAVar36 = pAVar36 + (long)pMVar16;
              } while (pMVar29 != pMVar17);
              bVar59 = false;
              unaff_R15D = 0;
            }
          }
          else {
            if (iVar11 == 0) {
              Mat::create(top_blob,1,(size_t)pMVar42,opt->blob_allocator);
            }
            else {
              Mat::create(top_blob,1,1,1,(size_t)pMVar42,opt->blob_allocator);
            }
            pMVar16 = (Mat *)opt->workspace_allocator;
            local_b8.cstep = 0;
            local_b8.data = (void *)0x0;
            local_b8.refcount._0_4_ = 0;
            local_b8.refcount._4_4_ = 0;
            local_b8.elemsize._0_4_ = 0;
            local_b8.elemsize._4_4_ = 0;
            local_b8.elempack = 0;
            local_b8.allocator = (Allocator *)0x0;
            local_b8.dims = 0;
            local_b8.w = 0;
            local_b8.h = 0;
            local_b8.d = 0;
            local_b8.c = 0;
            Mat::create(&local_b8,uVar15,(size_t)pMVar42,(Allocator *)pMVar16);
            unaff_R15D = -100;
            if ((local_b8.data != (void *)0x0) &&
               (pMVar16 = (Mat *)((long)local_b8.c * local_b8.cstep), pMVar16 != (Mat *)0x0)) {
              if ((int)uVar15 < 1) {
                fVar60 = -3.4028235e+38;
              }
              else {
                sVar18 = bottom_blob->elemsize;
                sVar21 = bottom_blob->cstep;
                pvVar39 = bottom_blob->data;
                pMVar16 = (Mat *)0x0;
                do {
                  auVar168 = ZEXT816(0xff7fffff);
                  if (0 < (int)uVar33) {
                    uVar41 = 0;
                    auVar168 = ZEXT816(0xff7fffff);
                    do {
                      fVar60 = *(float *)((long)pvVar39 + uVar41 * 4);
                      if (auVar168._0_4_ <= fVar60) {
                        auVar168._0_4_ = fVar60;
                      }
                      uVar41 = uVar41 + 1;
                    } while (uVar33 != uVar41);
                  }
                  *(int *)((long)local_b8.data + (long)pMVar16 * 4) = auVar168._0_4_;
                  pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                  pvVar39 = (void *)((long)pvVar39 + sVar18 * sVar21);
                } while (pMVar16 != pMVar17);
                fVar60 = -3.4028235e+38;
                pMVar16 = (Mat *)0x0;
                do {
                  fVar1 = *(float *)((long)local_b8.data + (long)pMVar16 * 4);
                  if (fVar60 <= fVar1) {
                    fVar60 = fVar1;
                  }
                  pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                } while (pMVar17 != pMVar16);
              }
              *(float *)top_blob->data = fVar60;
              unaff_R15D = 0;
            }
            piVar7 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
            if (piVar7 != (int *)0x0) {
              LOCK();
              *piVar7 = *piVar7 + -1;
              UNLOCK();
              if (*piVar7 == 0) {
                if (local_b8.allocator == (Allocator *)0x0) {
                  if (local_b8.data != (void *)0x0) {
                    free(local_b8.data);
                  }
                }
                else {
                  (**(code **)(*(long *)local_b8.allocator + 0x18))();
                }
              }
            }
LAB_003503b2:
            local_b8.cstep = 0;
            local_b8.data = (void *)0x0;
            local_b8.refcount._0_4_ = 0;
            local_b8.refcount._4_4_ = 0;
            local_b8.elemsize._0_4_ = 0;
            local_b8.elemsize._4_4_ = 0;
            local_b8.elempack = 0;
            local_b8.dims = 0;
            local_b8.w = 0;
            local_b8.h = 0;
            local_b8.d = 0;
            local_b8.c = 0;
            bVar59 = false;
          }
LAB_003503d9:
          uVar14 = (uint)pMVar16;
          pMVar44 = (Mat *)((ulong)pMVar44 & 0xffffffff);
          if (!bVar59) break;
        }
        if (uVar12 == 4) {
          uVar12 = bottom_blob->w;
          lVar56 = (long)(int)uVar12;
          uVar13 = bottom_blob->h;
          uVar35 = (ulong)uVar13;
          uVar15 = bottom_blob->d;
          uVar51 = (ulong)uVar15;
          uVar33 = bottom_blob->c;
          uVar41 = (ulong)uVar33;
          uVar53 = uVar13 * uVar12;
          uVar34 = uVar53 * uVar15;
          auVar93._8_4_ = 0xffffffff;
          auVar93._0_8_ = 0xffffffffffffffff;
          auVar93._12_4_ = 0xffffffff;
          auVar94._0_8_ = SUB168(auVar93 ^ auVar273,0) << 0x3f;
          auVar94._8_8_ = SUB168(auVar93 ^ auVar273,8) << 0x3f;
          iVar10 = movmskpd(uVar14,auVar94);
          bVar59 = iVar10 == 0;
          bVar8 = (byte)pMVar44;
          bVar9 = bVar8 ^ 1;
          bVar32 = bVar25 ^ 1;
          if ((bVar59 && bVar9 == 0) && (bVar32 == 0)) {
            if (iVar11 == 0) {
              Mat::create(top_blob,1,(size_t)pMVar42,opt->blob_allocator);
            }
            else {
              Mat::create(top_blob,1,1,1,1,(size_t)pMVar42,opt->blob_allocator);
            }
            local_b8.cstep = 0;
            local_b8.data = (void *)0x0;
            local_b8.refcount._0_4_ = 0;
            local_b8.refcount._4_4_ = 0;
            local_b8.elemsize._0_4_ = 0;
            local_b8.elemsize._4_4_ = 0;
            local_b8.elempack = 0;
            local_b8.allocator = (Allocator *)0x0;
            local_b8.dims = 0;
            local_b8.w = 0;
            local_b8.h = 0;
            local_b8.d = 0;
            local_b8.c = 0;
            Mat::create(&local_b8,uVar33,(size_t)pMVar42,opt->workspace_allocator);
            unaff_R15D = -100;
            if ((local_b8.data != (void *)0x0) && ((long)local_b8.c * local_b8.cstep != 0)) {
              if ((int)uVar33 < 1) {
                fVar60 = -3.4028235e+38;
              }
              else {
                sVar18 = bottom_blob->elemsize;
                sVar21 = bottom_blob->cstep;
                pvVar39 = bottom_blob->data;
                uVar35 = 0;
                do {
                  fVar60 = -3.4028235e+38;
                  if (0 < (int)uVar34) {
                    uVar51 = 0;
                    fVar60 = -3.4028235e+38;
                    do {
                      fVar1 = *(float *)((long)pvVar39 + uVar51 * 4);
                      if (fVar60 <= fVar1) {
                        fVar60 = fVar1;
                      }
                      uVar51 = uVar51 + 1;
                    } while (uVar34 != uVar51);
                  }
                  *(float *)((long)local_b8.data + uVar35 * 4) = fVar60;
                  uVar35 = uVar35 + 1;
                  pvVar39 = (void *)((long)pvVar39 + sVar18 * sVar21);
                } while (uVar35 != uVar41);
                fVar60 = -3.4028235e+38;
                uVar35 = 0;
                do {
                  fVar1 = *(float *)((long)local_b8.data + uVar35 * 4);
                  if (fVar60 <= fVar1) {
                    fVar60 = fVar1;
                  }
                  uVar35 = uVar35 + 1;
                } while (uVar41 != uVar35);
              }
              *(float *)top_blob->data = fVar60;
              unaff_R15D = 0;
            }
            piVar7 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
            if (piVar7 != (int *)0x0) {
              LOCK();
              *piVar7 = *piVar7 + -1;
              UNLOCK();
              if (*piVar7 == 0) {
                if (local_b8.allocator == (Allocator *)0x0) goto LAB_003586f3;
                (**(code **)(*(long *)local_b8.allocator + 0x18))();
              }
            }
            goto LAB_00358700;
          }
          if ((bVar59 && bVar9 == 0) && bVar25 == 0) {
            if (iVar11 == 0) {
              Mat::create(top_blob,uVar33,(size_t)pMVar42,opt->blob_allocator);
            }
            else {
              Mat::create(top_blob,1,1,1,uVar33,(size_t)pMVar42,opt->blob_allocator);
            }
            if (0 < (int)uVar33) {
              pvVar39 = bottom_blob->data;
              sVar18 = bottom_blob->elemsize;
              pvVar55 = top_blob->data;
              sVar21 = top_blob->elemsize;
              sVar22 = top_blob->cstep;
              sVar5 = bottom_blob->cstep;
              uVar35 = 0;
              do {
                fVar60 = -3.4028235e+38;
                if (0 < (int)uVar34) {
                  uVar51 = 0;
                  fVar60 = -3.4028235e+38;
                  do {
                    fVar1 = *(float *)((long)pvVar39 + uVar51 * 4);
                    if (fVar60 <= fVar1) {
                      fVar60 = fVar1;
                    }
                    uVar51 = uVar51 + 1;
                  } while (uVar34 != uVar51);
                }
                lVar56 = sVar21 * sVar22 * uVar35;
                if (iVar11 == 0) {
                  lVar56 = uVar35 * 4;
                }
                *(float *)((long)pvVar55 + lVar56) = fVar60;
                uVar35 = uVar35 + 1;
                pvVar39 = (void *)((long)pvVar39 + sVar18 * sVar5);
              } while (uVar35 != uVar41);
            }
            goto LAB_003519f4;
          }
          if ((bVar59 && bVar8 == 0) && bVar32 == 0) {
            if (iVar11 == 0) {
              Mat::create(top_blob,uVar15,(size_t)pMVar42,opt->blob_allocator);
            }
            else {
              Mat::create(top_blob,1,1,uVar15,1,(size_t)pMVar42,opt->blob_allocator);
            }
            local_b8.cstep = 0;
            local_b8.data = (void *)0x0;
            local_b8.refcount._0_4_ = 0;
            local_b8.refcount._4_4_ = 0;
            local_b8.elemsize._0_4_ = 0;
            local_b8.elemsize._4_4_ = 0;
            local_b8.elempack = 0;
            local_b8.allocator = (Allocator *)0x0;
            local_b8.dims = 0;
            local_b8.w = 0;
            local_b8.h = 0;
            local_b8.d = 0;
            local_b8.c = 0;
            Mat::create(&local_b8,1,uVar15,uVar33,(size_t)pMVar42,opt->workspace_allocator);
            auVar67 = _DAT_00544250;
            auVar79 = _DAT_00544240;
            auVar273 = _DAT_0053f020;
            unaff_R15D = -100;
            if ((local_b8.data != (void *)0x0) && (local_b8.cstep * (long)local_b8.c != 0)) {
              uVar12 = (int)local_b8.cstep * local_b8.c;
              if (0 < (int)uVar12) {
                lVar56 = (ulong)uVar12 - 1;
                auVar95._8_4_ = (int)lVar56;
                auVar95._0_8_ = lVar56;
                auVar95._12_4_ = (int)((ulong)lVar56 >> 0x20);
                uVar35 = 0;
                auVar95 = auVar95 ^ _DAT_0053f020;
                do {
                  auVar204._8_4_ = (int)uVar35;
                  auVar204._0_8_ = uVar35;
                  auVar204._12_4_ = (int)(uVar35 >> 0x20);
                  auVar264 = (auVar204 | auVar67) ^ auVar273;
                  iVar11 = auVar95._4_4_;
                  if ((bool)(~(auVar264._4_4_ == iVar11 && auVar95._0_4_ < auVar264._0_4_ ||
                              iVar11 < auVar264._4_4_) & 1)) {
                    *(undefined4 *)((long)local_b8.data + uVar35 * 4) = 0xff7fffff;
                  }
                  if ((auVar264._12_4_ != auVar95._12_4_ || auVar264._8_4_ <= auVar95._8_4_) &&
                      auVar264._12_4_ <= auVar95._12_4_) {
                    *(undefined4 *)((long)local_b8.data + uVar35 * 4 + 4) = 0xff7fffff;
                  }
                  auVar264 = (auVar204 | auVar79) ^ auVar273;
                  iVar10 = auVar264._4_4_;
                  if (iVar10 <= iVar11 && (iVar10 != iVar11 || auVar264._0_4_ <= auVar95._0_4_)) {
                    *(undefined4 *)((long)local_b8.data + uVar35 * 4 + 8) = 0xff7fffff;
                    *(undefined4 *)((long)local_b8.data + uVar35 * 4 + 0xc) = 0xff7fffff;
                  }
                  uVar35 = uVar35 + 4;
                } while ((uVar12 + 3 & 0xfffffffc) != uVar35);
              }
              if (0 < (int)uVar33) {
                pvVar39 = bottom_blob->data;
                sVar18 = bottom_blob->elemsize;
                sVar21 = bottom_blob->cstep;
                uVar35 = 0;
                do {
                  if (0 < (int)uVar15) {
                    uVar57 = 0;
                    pvVar55 = pvVar39;
                    do {
                      auVar177 = ZEXT816(0xff7fffff);
                      if (0 < (int)uVar53) {
                        uVar37 = 0;
                        auVar177 = ZEXT816(0xff7fffff);
                        do {
                          fVar60 = *(float *)((long)pvVar55 + uVar37 * 4);
                          if (auVar177._0_4_ <= fVar60) {
                            auVar177._0_4_ = fVar60;
                          }
                          uVar37 = uVar37 + 1;
                        } while (uVar53 != uVar37);
                      }
                      *(int *)((long)local_b8.data +
                              uVar57 * 4 +
                              CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize) *
                              local_b8.cstep * uVar35) = auVar177._0_4_;
                      uVar57 = uVar57 + 1;
                      pvVar55 = (void *)((long)pvVar55 + (long)(int)uVar53 * 4);
                    } while (uVar57 != uVar51);
                  }
                  uVar35 = uVar35 + 1;
                  pvVar39 = (void *)((long)pvVar39 + sVar18 * sVar21);
                } while (uVar35 != uVar41);
              }
              auVar67 = _DAT_00544250;
              auVar79 = _DAT_00544240;
              auVar273 = _DAT_0053f020;
              uVar12 = top_blob->c * (int)top_blob->cstep;
              if (0 < (int)uVar12) {
                pvVar39 = top_blob->data;
                lVar56 = (ulong)uVar12 - 1;
                auVar96._8_4_ = (int)lVar56;
                auVar96._0_8_ = lVar56;
                auVar96._12_4_ = (int)((ulong)lVar56 >> 0x20);
                uVar35 = 0;
                auVar96 = auVar96 ^ _DAT_0053f020;
                do {
                  auVar205._8_4_ = (int)uVar35;
                  auVar205._0_8_ = uVar35;
                  auVar205._12_4_ = (int)(uVar35 >> 0x20);
                  auVar264 = (auVar205 | auVar67) ^ auVar273;
                  iVar11 = auVar96._4_4_;
                  if ((bool)(~(auVar264._4_4_ == iVar11 && auVar96._0_4_ < auVar264._0_4_ ||
                              iVar11 < auVar264._4_4_) & 1)) {
                    *(undefined4 *)((long)pvVar39 + uVar35 * 4) = 0xff7fffff;
                  }
                  if ((auVar264._12_4_ != auVar96._12_4_ || auVar264._8_4_ <= auVar96._8_4_) &&
                      auVar264._12_4_ <= auVar96._12_4_) {
                    *(undefined4 *)((long)pvVar39 + uVar35 * 4 + 4) = 0xff7fffff;
                  }
                  auVar264 = (auVar205 | auVar79) ^ auVar273;
                  iVar10 = auVar264._4_4_;
                  if (iVar10 <= iVar11 && (iVar10 != iVar11 || auVar264._0_4_ <= auVar96._0_4_)) {
                    *(undefined4 *)((long)pvVar39 + uVar35 * 4 + 8) = 0xff7fffff;
                    *(undefined4 *)((long)pvVar39 + uVar35 * 4 + 0xc) = 0xff7fffff;
                  }
                  uVar35 = uVar35 + 4;
                } while ((uVar12 + 3 & 0xfffffffc) != uVar35);
              }
              if (0 < (int)uVar33) {
                pvVar39 = top_blob->data;
                uVar35 = 0;
                pvVar55 = local_b8.data;
                do {
                  if (0 < (int)uVar15) {
                    uVar57 = 0;
                    do {
                      fVar1 = *(float *)((long)pvVar55 + uVar57 * 4);
                      fVar60 = *(float *)((long)pvVar39 + uVar57 * 4);
                      if (fVar1 <= fVar60) {
                        fVar1 = fVar60;
                      }
                      *(float *)((long)pvVar39 + uVar57 * 4) = fVar1;
                      uVar57 = uVar57 + 1;
                    } while (uVar51 != uVar57);
                  }
                  uVar35 = uVar35 + 1;
                  pvVar55 = (void *)((long)pvVar55 +
                                    local_b8.cstep *
                                    CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize));
                } while (uVar35 != uVar41);
              }
              unaff_R15D = 0;
            }
            piVar7 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
            if (piVar7 == (int *)0x0) goto LAB_00358700;
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 != 0) goto LAB_00358700;
            if (local_b8.allocator != (Allocator *)0x0) {
              (**(code **)(*(long *)local_b8.allocator + 0x18))();
              goto LAB_00358700;
            }
            goto LAB_003586f3;
          }
          uVar57 = (ulong)uVar12;
          bVar47 = (byte)iVar10 >> 1 | bVar43;
          if (((bVar47 & 1) != 0 || bVar9 != 0) || bVar32 != 0) {
            bVar27 = (byte)iVar10 | bVar31;
            if (((bVar27 & 1) == 0 && bVar9 == 0) && bVar32 == 0) {
              if (iVar11 == 0) {
                Mat::create(top_blob,uVar12,(size_t)pMVar42,opt->blob_allocator);
              }
              else {
                Mat::create(top_blob,uVar12,1,1,1,(size_t)pMVar42,opt->blob_allocator);
              }
              local_b8.cstep = 0;
              local_b8.data = (void *)0x0;
              local_b8.refcount._0_4_ = 0;
              local_b8.refcount._4_4_ = 0;
              local_b8.elemsize._0_4_ = 0;
              local_b8.elemsize._4_4_ = 0;
              local_b8.elempack = 0;
              local_b8.allocator = (Allocator *)0x0;
              local_b8.dims = 0;
              local_b8.w = 0;
              local_b8.h = 0;
              local_b8.d = 0;
              local_b8.c = 0;
              Mat::create(&local_b8,uVar12,1,uVar33,(size_t)pMVar42,opt->workspace_allocator);
              auVar67 = _DAT_00544250;
              auVar79 = _DAT_00544240;
              auVar273 = _DAT_0053f020;
              unaff_R15D = -100;
              if ((local_b8.data != (void *)0x0) && (local_b8.cstep * (long)local_b8.c != 0)) {
                uVar14 = (int)local_b8.cstep * local_b8.c;
                if (0 < (int)uVar14) {
                  lVar20 = (ulong)uVar14 - 1;
                  auVar113._8_4_ = (int)lVar20;
                  auVar113._0_8_ = lVar20;
                  auVar113._12_4_ = (int)((ulong)lVar20 >> 0x20);
                  uVar35 = 0;
                  auVar113 = auVar113 ^ _DAT_0053f020;
                  do {
                    auVar216._8_4_ = (int)uVar35;
                    auVar216._0_8_ = uVar35;
                    auVar216._12_4_ = (int)(uVar35 >> 0x20);
                    auVar264 = (auVar216 | auVar67) ^ auVar273;
                    iVar11 = auVar113._4_4_;
                    if ((bool)(~(auVar264._4_4_ == iVar11 && auVar113._0_4_ < auVar264._0_4_ ||
                                iVar11 < auVar264._4_4_) & 1)) {
                      *(undefined4 *)((long)local_b8.data + uVar35 * 4) = 0xff7fffff;
                    }
                    if ((auVar264._12_4_ != auVar113._12_4_ || auVar264._8_4_ <= auVar113._8_4_) &&
                        auVar264._12_4_ <= auVar113._12_4_) {
                      *(undefined4 *)((long)local_b8.data + uVar35 * 4 + 4) = 0xff7fffff;
                    }
                    auVar264 = (auVar216 | auVar79) ^ auVar273;
                    iVar10 = auVar264._4_4_;
                    if (iVar10 <= iVar11 && (iVar10 != iVar11 || auVar264._0_4_ <= auVar113._0_4_))
                    {
                      *(undefined4 *)((long)local_b8.data + uVar35 * 4 + 8) = 0xff7fffff;
                      *(undefined4 *)((long)local_b8.data + uVar35 * 4 + 0xc) = 0xff7fffff;
                    }
                    uVar35 = uVar35 + 4;
                  } while ((uVar14 + 3 & 0xfffffffc) != uVar35);
                }
                if (0 < (int)uVar33) {
                  pvVar39 = bottom_blob->data;
                  sVar18 = bottom_blob->elemsize;
                  sVar21 = bottom_blob->cstep;
                  uVar35 = 0;
                  pvVar55 = local_b8.data;
                  do {
                    if (0 < (int)uVar15) {
                      pvVar54 = (void *)(sVar18 * sVar21 * uVar35 + (long)pvVar39);
                      uVar14 = 0;
                      do {
                        if (0 < (int)uVar13) {
                          uVar34 = 0;
                          do {
                            if (0 < (int)uVar12) {
                              uVar51 = 0;
                              do {
                                fVar1 = *(float *)((long)pvVar54 + uVar51 * 4);
                                fVar60 = *(float *)((long)pvVar55 + uVar51 * 4);
                                if (fVar1 <= fVar60) {
                                  fVar1 = fVar60;
                                }
                                *(float *)((long)pvVar55 + uVar51 * 4) = fVar1;
                                uVar51 = uVar51 + 1;
                              } while (uVar57 != uVar51);
                            }
                            pvVar54 = (void *)((long)pvVar54 + lVar56 * 4);
                            uVar34 = uVar34 + 1;
                          } while (uVar34 != uVar13);
                        }
                        uVar14 = uVar14 + 1;
                      } while (uVar14 != uVar15);
                    }
                    uVar35 = uVar35 + 1;
                    pvVar55 = (void *)((long)pvVar55 +
                                      CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize) *
                                      local_b8.cstep);
                  } while (uVar35 != uVar41);
                }
                auVar67 = _DAT_00544250;
                auVar79 = _DAT_00544240;
                auVar273 = _DAT_0053f020;
                uVar14 = top_blob->c * (int)top_blob->cstep;
                if (0 < (int)uVar14) {
                  pvVar39 = top_blob->data;
                  lVar56 = (ulong)uVar14 - 1;
                  auVar114._8_4_ = (int)lVar56;
                  auVar114._0_8_ = lVar56;
                  auVar114._12_4_ = (int)((ulong)lVar56 >> 0x20);
                  uVar35 = 0;
                  auVar114 = auVar114 ^ _DAT_0053f020;
                  do {
                    auVar217._8_4_ = (int)uVar35;
                    auVar217._0_8_ = uVar35;
                    auVar217._12_4_ = (int)(uVar35 >> 0x20);
                    auVar264 = (auVar217 | auVar67) ^ auVar273;
                    iVar11 = auVar114._4_4_;
                    if ((bool)(~(auVar264._4_4_ == iVar11 && auVar114._0_4_ < auVar264._0_4_ ||
                                iVar11 < auVar264._4_4_) & 1)) {
                      *(undefined4 *)((long)pvVar39 + uVar35 * 4) = 0xff7fffff;
                    }
                    if ((auVar264._12_4_ != auVar114._12_4_ || auVar264._8_4_ <= auVar114._8_4_) &&
                        auVar264._12_4_ <= auVar114._12_4_) {
                      *(undefined4 *)((long)pvVar39 + uVar35 * 4 + 4) = 0xff7fffff;
                    }
                    auVar264 = (auVar217 | auVar79) ^ auVar273;
                    iVar10 = auVar264._4_4_;
                    if (iVar10 <= iVar11 && (iVar10 != iVar11 || auVar264._0_4_ <= auVar114._0_4_))
                    {
                      *(undefined4 *)((long)pvVar39 + uVar35 * 4 + 8) = 0xff7fffff;
                      *(undefined4 *)((long)pvVar39 + uVar35 * 4 + 0xc) = 0xff7fffff;
                    }
                    uVar35 = uVar35 + 4;
                  } while ((uVar14 + 3 & 0xfffffffc) != uVar35);
                }
                if (0 < (int)uVar33) {
                  pvVar39 = top_blob->data;
                  uVar35 = 0;
                  pvVar55 = local_b8.data;
                  do {
                    if (0 < (int)uVar12) {
                      uVar51 = 0;
                      do {
                        fVar1 = *(float *)((long)pvVar55 + uVar51 * 4);
                        fVar60 = *(float *)((long)pvVar39 + uVar51 * 4);
                        if (fVar1 <= fVar60) {
                          fVar1 = fVar60;
                        }
                        *(float *)((long)pvVar39 + uVar51 * 4) = fVar1;
                        uVar51 = uVar51 + 1;
                      } while (uVar57 != uVar51);
                    }
                    uVar35 = uVar35 + 1;
                    pvVar55 = (void *)((long)pvVar55 +
                                      local_b8.cstep *
                                      CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize));
                  } while (uVar35 != uVar41);
                }
                unaff_R15D = 0;
              }
              piVar7 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
              if (piVar7 != (int *)0x0) {
                LOCK();
                *piVar7 = *piVar7 + -1;
                UNLOCK();
                if (*piVar7 == 0) {
                  if (local_b8.allocator == (Allocator *)0x0) goto LAB_003586f3;
                  (**(code **)(*(long *)local_b8.allocator + 0x18))();
                }
              }
              goto LAB_00358700;
            }
            if ((bVar59 && bVar8 == 0) && bVar25 == 0) {
              if (iVar11 == 0) {
                Mat::create(top_blob,uVar15,uVar33,(size_t)pMVar42,opt->blob_allocator);
              }
              else {
                Mat::create(top_blob,1,1,uVar15,uVar33,(size_t)pMVar42,opt->blob_allocator);
              }
              if ((int)uVar33 < 1) goto LAB_003519f4;
              sVar18 = bottom_blob->elemsize;
              if (iVar11 == 0) {
                sVar21 = (size_t)top_blob->w;
              }
              else {
                sVar21 = top_blob->cstep;
              }
              pvVar39 = bottom_blob->data;
              sVar22 = top_blob->elemsize;
              sVar5 = bottom_blob->cstep;
              pvVar55 = top_blob->data;
              uVar35 = 0;
              do {
                if (0 < (int)uVar15) {
                  uVar57 = 0;
                  pvVar54 = pvVar39;
                  do {
                    auVar183 = ZEXT816(0xff7fffff);
                    if (0 < (int)uVar53) {
                      uVar37 = 0;
                      auVar183 = ZEXT816(0xff7fffff);
                      do {
                        fVar60 = *(float *)((long)pvVar54 + uVar37 * 4);
                        if (auVar183._0_4_ <= fVar60) {
                          auVar183._0_4_ = fVar60;
                        }
                        uVar37 = uVar37 + 1;
                      } while (uVar53 != uVar37);
                    }
                    *(int *)((long)pvVar55 + uVar57 * 4 + sVar21 * sVar22 * uVar35) = auVar183._0_4_
                    ;
                    uVar57 = uVar57 + 1;
                    pvVar54 = (void *)((long)pvVar54 + (long)(int)uVar53 * 4);
                  } while (uVar57 != uVar51);
                }
                uVar35 = uVar35 + 1;
                pvVar39 = (void *)((long)pvVar39 + sVar18 * sVar5);
                pMVar44 = (Mat *)0x0;
                unaff_R15D = 0;
              } while (uVar35 != uVar41);
              goto LAB_00358727;
            }
            if (((bVar47 & 1) == 0 && bVar8 == 0) && bVar32 == 0) {
              if (iVar11 == 0) {
                Mat::create(top_blob,uVar13,uVar15,(size_t)pMVar42,opt->blob_allocator);
              }
              else {
                Mat::create(top_blob,1,uVar13,uVar15,1,(size_t)pMVar42,opt->blob_allocator);
              }
              local_b8.cstep = 0;
              local_b8.data = (void *)0x0;
              local_b8.refcount._0_4_ = 0;
              local_b8.refcount._4_4_ = 0;
              local_b8.elemsize._0_4_ = 0;
              local_b8.elemsize._4_4_ = 0;
              local_b8.elempack = 0;
              local_b8.allocator = (Allocator *)0x0;
              local_b8.dims = 0;
              local_b8.w = 0;
              local_b8.h = 0;
              local_b8.d = 0;
              local_b8.c = 0;
              Mat::create(&local_b8,uVar13,uVar15,uVar33,(size_t)pMVar42,opt->workspace_allocator);
              auVar67 = _DAT_00544250;
              auVar79 = _DAT_00544240;
              auVar273 = _DAT_0053f020;
              unaff_R15D = -100;
              if ((local_b8.data != (void *)0x0) && (local_b8.cstep * (long)local_b8.c != 0)) {
                uVar14 = (int)local_b8.cstep * local_b8.c;
                if (0 < (int)uVar14) {
                  lVar20 = (ulong)uVar14 - 1;
                  auVar125._8_4_ = (int)lVar20;
                  auVar125._0_8_ = lVar20;
                  auVar125._12_4_ = (int)((ulong)lVar20 >> 0x20);
                  uVar37 = 0;
                  auVar125 = auVar125 ^ _DAT_0053f020;
                  do {
                    auVar228._8_4_ = (int)uVar37;
                    auVar228._0_8_ = uVar37;
                    auVar228._12_4_ = (int)(uVar37 >> 0x20);
                    auVar264 = (auVar228 | auVar67) ^ auVar273;
                    iVar10 = auVar125._4_4_;
                    if ((bool)(~(auVar264._4_4_ == iVar10 && auVar125._0_4_ < auVar264._0_4_ ||
                                iVar10 < auVar264._4_4_) & 1)) {
                      *(undefined4 *)((long)local_b8.data + uVar37 * 4) = 0xff7fffff;
                    }
                    if ((auVar264._12_4_ != auVar125._12_4_ || auVar264._8_4_ <= auVar125._8_4_) &&
                        auVar264._12_4_ <= auVar125._12_4_) {
                      *(undefined4 *)((long)local_b8.data + uVar37 * 4 + 4) = 0xff7fffff;
                    }
                    auVar264 = (auVar228 | auVar79) ^ auVar273;
                    iVar265 = auVar264._4_4_;
                    if (iVar265 <= iVar10 && (iVar265 != iVar10 || auVar264._0_4_ <= auVar125._0_4_)
                       ) {
                      *(undefined4 *)((long)local_b8.data + uVar37 * 4 + 8) = 0xff7fffff;
                      *(undefined4 *)((long)local_b8.data + uVar37 * 4 + 0xc) = 0xff7fffff;
                    }
                    uVar37 = uVar37 + 4;
                  } while ((uVar14 + 3 & 0xfffffffc) != uVar37);
                }
                if (0 < (int)uVar33) {
                  pvVar39 = bottom_blob->data;
                  sVar18 = bottom_blob->elemsize;
                  sVar21 = bottom_blob->cstep;
                  uVar37 = 0;
                  do {
                    if (0 < (int)uVar15) {
                      pvVar55 = (void *)(sVar18 * sVar21 * uVar37 + (long)pvVar39);
                      uVar46 = 0;
                      do {
                        if (0 < (int)uVar13) {
                          lVar20 = (long)local_b8.w *
                                   CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize) * uVar46
                                   + CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize) *
                                     local_b8.cstep * uVar37;
                          uVar40 = 0;
                          do {
                            if (0 < (int)uVar12) {
                              auVar126 = ZEXT416(*(uint *)((long)local_b8.data + uVar40 * 4 + lVar20
                                                          ));
                              uVar24 = 0;
                              do {
                                fVar60 = *(float *)((long)pvVar55 + uVar24 * 4);
                                if (auVar126._0_4_ <= fVar60) {
                                  auVar126._0_4_ = fVar60;
                                }
                                *(int *)((long)local_b8.data + uVar40 * 4 + lVar20) = auVar126._0_4_
                                ;
                                uVar24 = uVar24 + 1;
                              } while (uVar57 != uVar24);
                            }
                            pvVar55 = (void *)((long)pvVar55 + lVar56 * 4);
                            uVar40 = uVar40 + 1;
                          } while (uVar40 != uVar35);
                        }
                        uVar46 = uVar46 + 1;
                      } while (uVar46 != uVar51);
                    }
                    uVar37 = uVar37 + 1;
                  } while (uVar37 != uVar41);
                }
                auVar67 = _DAT_00544250;
                auVar79 = _DAT_00544240;
                auVar273 = _DAT_0053f020;
                uVar12 = top_blob->c * (int)top_blob->cstep;
                if (0 < (int)uVar12) {
                  pvVar39 = top_blob->data;
                  lVar56 = (ulong)uVar12 - 1;
                  auVar127._8_4_ = (int)lVar56;
                  auVar127._0_8_ = lVar56;
                  auVar127._12_4_ = (int)((ulong)lVar56 >> 0x20);
                  uVar57 = 0;
                  auVar127 = auVar127 ^ _DAT_0053f020;
                  do {
                    auVar229._8_4_ = (int)uVar57;
                    auVar229._0_8_ = uVar57;
                    auVar229._12_4_ = (int)(uVar57 >> 0x20);
                    auVar264 = (auVar229 | auVar67) ^ auVar273;
                    iVar10 = auVar127._4_4_;
                    if ((bool)(~(auVar264._4_4_ == iVar10 && auVar127._0_4_ < auVar264._0_4_ ||
                                iVar10 < auVar264._4_4_) & 1)) {
                      *(undefined4 *)((long)pvVar39 + uVar57 * 4) = 0xff7fffff;
                    }
                    if ((auVar264._12_4_ != auVar127._12_4_ || auVar264._8_4_ <= auVar127._8_4_) &&
                        auVar264._12_4_ <= auVar127._12_4_) {
                      *(undefined4 *)((long)pvVar39 + uVar57 * 4 + 4) = 0xff7fffff;
                    }
                    auVar264 = (auVar229 | auVar79) ^ auVar273;
                    iVar265 = auVar264._4_4_;
                    if (iVar265 <= iVar10 && (iVar265 != iVar10 || auVar264._0_4_ <= auVar127._0_4_)
                       ) {
                      *(undefined4 *)((long)pvVar39 + uVar57 * 4 + 8) = 0xff7fffff;
                      *(undefined4 *)((long)pvVar39 + uVar57 * 4 + 0xc) = 0xff7fffff;
                    }
                    uVar57 = uVar57 + 4;
                  } while ((uVar12 + 3 & 0xfffffffc) != uVar57);
                }
                if (0 < (int)uVar33) {
                  uVar57 = 0;
                  pvVar39 = local_b8.data;
                  do {
                    if (0 < (int)uVar15) {
                      iVar10 = 1;
                      if (iVar11 != 0) {
                        iVar10 = top_blob->h;
                      }
                      iVar265 = top_blob->w;
                      sVar18 = top_blob->elemsize;
                      pvVar55 = top_blob->data;
                      uVar37 = 0;
                      pvVar54 = pvVar39;
                      do {
                        if (0 < (int)uVar13) {
                          uVar46 = 0;
                          do {
                            fVar1 = *(float *)((long)pvVar54 + uVar46 * 4);
                            fVar60 = *(float *)((long)pvVar55 + uVar46 * 4);
                            if (fVar1 <= fVar60) {
                              fVar1 = fVar60;
                            }
                            *(float *)((long)pvVar55 + uVar46 * 4) = fVar1;
                            uVar46 = uVar46 + 1;
                          } while (uVar35 != uVar46);
                        }
                        uVar37 = uVar37 + 1;
                        pvVar54 = (void *)((long)pvVar54 +
                                          (long)local_b8.w *
                                          CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize));
                        pvVar55 = (void *)((long)pvVar55 + (long)iVar10 * sVar18 * (long)iVar265);
                      } while (uVar37 != uVar51);
                    }
                    uVar57 = uVar57 + 1;
                    pvVar39 = (void *)((long)pvVar39 +
                                      local_b8.cstep *
                                      CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize));
                  } while (uVar57 != uVar41);
                }
                unaff_R15D = 0;
              }
              piVar7 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
              if (piVar7 != (int *)0x0) {
                LOCK();
                *piVar7 = *piVar7 + -1;
                UNLOCK();
                if (*piVar7 == 0) {
                  if (local_b8.allocator == (Allocator *)0x0) goto LAB_003586f3;
                  (**(code **)(*(long *)local_b8.allocator + 0x18))();
                }
              }
              goto LAB_00358700;
            }
            bVar43 = bVar43 | bVar31;
            if ((bVar9 == 0 && (bVar43 & 1) == 0) && bVar32 == 0) {
              if (iVar11 == 0) {
                Mat::create(top_blob,uVar12,uVar13,(size_t)pMVar42,opt->blob_allocator);
              }
              else {
                Mat::create(top_blob,uVar12,uVar13,1,1,(size_t)pMVar42,opt->blob_allocator);
              }
              local_b8.cstep = 0;
              local_b8.data = (void *)0x0;
              local_b8.refcount._0_4_ = 0;
              local_b8.refcount._4_4_ = 0;
              local_b8.elemsize._0_4_ = 0;
              local_b8.elemsize._4_4_ = 0;
              local_b8.elempack = 0;
              local_b8.allocator = (Allocator *)0x0;
              local_b8.dims = 0;
              local_b8.w = 0;
              local_b8.h = 0;
              local_b8.d = 0;
              local_b8.c = 0;
              Mat::create(&local_b8,uVar12,uVar13,uVar33,(size_t)pMVar42,opt->workspace_allocator);
              auVar67 = _DAT_00544250;
              auVar79 = _DAT_00544240;
              auVar273 = _DAT_0053f020;
              unaff_R15D = -100;
              if ((local_b8.data != (void *)0x0) && (local_b8.cstep * (long)local_b8.c != 0)) {
                uVar14 = (int)local_b8.cstep * local_b8.c;
                if (0 < (int)uVar14) {
                  lVar20 = (ulong)uVar14 - 1;
                  auVar133._8_4_ = (int)lVar20;
                  auVar133._0_8_ = lVar20;
                  auVar133._12_4_ = (int)((ulong)lVar20 >> 0x20);
                  uVar51 = 0;
                  auVar133 = auVar133 ^ _DAT_0053f020;
                  do {
                    auVar234._8_4_ = (int)uVar51;
                    auVar234._0_8_ = uVar51;
                    auVar234._12_4_ = (int)(uVar51 >> 0x20);
                    auVar264 = (auVar234 | auVar67) ^ auVar273;
                    iVar11 = auVar133._4_4_;
                    if ((bool)(~(auVar264._4_4_ == iVar11 && auVar133._0_4_ < auVar264._0_4_ ||
                                iVar11 < auVar264._4_4_) & 1)) {
                      *(undefined4 *)((long)local_b8.data + uVar51 * 4) = 0xff7fffff;
                    }
                    if ((auVar264._12_4_ != auVar133._12_4_ || auVar264._8_4_ <= auVar133._8_4_) &&
                        auVar264._12_4_ <= auVar133._12_4_) {
                      *(undefined4 *)((long)local_b8.data + uVar51 * 4 + 4) = 0xff7fffff;
                    }
                    auVar264 = (auVar234 | auVar79) ^ auVar273;
                    iVar10 = auVar264._4_4_;
                    if (iVar10 <= iVar11 && (iVar10 != iVar11 || auVar264._0_4_ <= auVar133._0_4_))
                    {
                      *(undefined4 *)((long)local_b8.data + uVar51 * 4 + 8) = 0xff7fffff;
                      *(undefined4 *)((long)local_b8.data + uVar51 * 4 + 0xc) = 0xff7fffff;
                    }
                    uVar51 = uVar51 + 4;
                  } while ((uVar14 + 3 & 0xfffffffc) != uVar51);
                }
                if (0 < (int)uVar33) {
                  pvVar39 = bottom_blob->data;
                  sVar18 = bottom_blob->elemsize;
                  sVar21 = bottom_blob->cstep;
                  uVar51 = 0;
                  pvVar55 = local_b8.data;
                  do {
                    if (0 < (int)uVar15) {
                      pvVar54 = (void *)(sVar18 * sVar21 * uVar51 + (long)pvVar39);
                      uVar14 = 0;
                      do {
                        if (0 < (int)uVar13) {
                          uVar37 = 0;
                          pvVar52 = pvVar55;
                          do {
                            if (0 < (int)uVar12) {
                              uVar46 = 0;
                              do {
                                fVar1 = *(float *)((long)pvVar54 + uVar46 * 4);
                                fVar60 = *(float *)((long)pvVar52 + uVar46 * 4);
                                if (fVar1 <= fVar60) {
                                  fVar1 = fVar60;
                                }
                                *(float *)((long)pvVar52 + uVar46 * 4) = fVar1;
                                uVar46 = uVar46 + 1;
                              } while (uVar57 != uVar46);
                            }
                            pvVar54 = (void *)((long)pvVar54 + lVar56 * 4);
                            uVar37 = uVar37 + 1;
                            pvVar52 = (void *)((long)pvVar52 +
                                              (long)local_b8.w *
                                              CONCAT44(local_b8.elemsize._4_4_,
                                                       (int)local_b8.elemsize));
                          } while (uVar37 != uVar35);
                        }
                        uVar14 = uVar14 + 1;
                      } while (uVar14 != uVar15);
                    }
                    uVar51 = uVar51 + 1;
                    pvVar55 = (void *)((long)pvVar55 +
                                      CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize) *
                                      local_b8.cstep);
                  } while (uVar51 != uVar41);
                }
                auVar67 = _DAT_00544250;
                auVar79 = _DAT_00544240;
                auVar273 = _DAT_0053f020;
                uVar14 = top_blob->c * (int)top_blob->cstep;
                if (0 < (int)uVar14) {
                  pvVar39 = top_blob->data;
                  lVar56 = (ulong)uVar14 - 1;
                  auVar134._8_4_ = (int)lVar56;
                  auVar134._0_8_ = lVar56;
                  auVar134._12_4_ = (int)((ulong)lVar56 >> 0x20);
                  uVar51 = 0;
                  auVar134 = auVar134 ^ _DAT_0053f020;
                  do {
                    auVar235._8_4_ = (int)uVar51;
                    auVar235._0_8_ = uVar51;
                    auVar235._12_4_ = (int)(uVar51 >> 0x20);
                    auVar264 = (auVar235 | auVar67) ^ auVar273;
                    iVar11 = auVar134._4_4_;
                    if ((bool)(~(auVar264._4_4_ == iVar11 && auVar134._0_4_ < auVar264._0_4_ ||
                                iVar11 < auVar264._4_4_) & 1)) {
                      *(undefined4 *)((long)pvVar39 + uVar51 * 4) = 0xff7fffff;
                    }
                    if ((auVar264._12_4_ != auVar134._12_4_ || auVar264._8_4_ <= auVar134._8_4_) &&
                        auVar264._12_4_ <= auVar134._12_4_) {
                      *(undefined4 *)((long)pvVar39 + uVar51 * 4 + 4) = 0xff7fffff;
                    }
                    auVar264 = (auVar235 | auVar79) ^ auVar273;
                    iVar10 = auVar264._4_4_;
                    if (iVar10 <= iVar11 && (iVar10 != iVar11 || auVar264._0_4_ <= auVar134._0_4_))
                    {
                      *(undefined4 *)((long)pvVar39 + uVar51 * 4 + 8) = 0xff7fffff;
                      *(undefined4 *)((long)pvVar39 + uVar51 * 4 + 0xc) = 0xff7fffff;
                    }
                    uVar51 = uVar51 + 4;
                  } while ((uVar14 + 3 & 0xfffffffc) != uVar51);
                }
                if (0 < (int)uVar33) {
                  pvVar39 = top_blob->data;
                  iVar11 = top_blob->w;
                  sVar18 = top_blob->elemsize;
                  uVar51 = 0;
                  pvVar55 = local_b8.data;
                  do {
                    if (0 < (int)uVar13) {
                      uVar37 = 0;
                      pvVar54 = pvVar39;
                      pvVar52 = pvVar55;
                      do {
                        if (0 < (int)uVar12) {
                          uVar46 = 0;
                          do {
                            fVar1 = *(float *)((long)pvVar52 + uVar46 * 4);
                            fVar60 = *(float *)((long)pvVar54 + uVar46 * 4);
                            if (fVar1 <= fVar60) {
                              fVar1 = fVar60;
                            }
                            *(float *)((long)pvVar54 + uVar46 * 4) = fVar1;
                            uVar46 = uVar46 + 1;
                          } while (uVar57 != uVar46);
                        }
                        uVar37 = uVar37 + 1;
                        pvVar52 = (void *)((long)pvVar52 +
                                          (long)local_b8.w *
                                          CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize));
                        pvVar54 = (void *)((long)pvVar54 + (long)iVar11 * sVar18);
                      } while (uVar37 != uVar35);
                    }
                    uVar51 = uVar51 + 1;
                    pvVar55 = (void *)((long)pvVar55 +
                                      local_b8.cstep *
                                      CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize));
                  } while (uVar51 != uVar41);
                }
                unaff_R15D = 0;
              }
              piVar7 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
              if (piVar7 != (int *)0x0) {
                LOCK();
                *piVar7 = *piVar7 + -1;
                UNLOCK();
                if (*piVar7 == 0) {
                  if (local_b8.allocator == (Allocator *)0x0) goto LAB_003586f3;
                  (**(code **)(*(long *)local_b8.allocator + 0x18))();
                }
              }
              goto LAB_00358700;
            }
            if (((bVar47 & 1) == 0 && bVar9 == 0) && bVar25 == 0) {
              if (iVar11 == 0) {
                Mat::create(top_blob,uVar13,uVar33,(size_t)pMVar42,opt->blob_allocator);
              }
              else {
                Mat::create(top_blob,1,uVar13,1,uVar33,(size_t)pMVar42,opt->blob_allocator);
              }
              auVar67 = _DAT_00544250;
              auVar79 = _DAT_00544240;
              auVar273 = _DAT_0053f020;
              if ((int)uVar33 < 1) goto LAB_003519f4;
              sVar18 = bottom_blob->elemsize;
              pvVar39 = top_blob->data;
              if (iVar11 == 0) {
                sVar21 = (size_t)top_blob->w;
              }
              else {
                sVar21 = top_blob->cstep;
              }
              pvVar55 = bottom_blob->data;
              sVar22 = bottom_blob->cstep;
              lVar30 = sVar21 * top_blob->elemsize;
              lVar20 = uVar35 - 1;
              auVar139._8_4_ = (int)lVar20;
              auVar139._0_8_ = lVar20;
              auVar139._12_4_ = (int)((ulong)lVar20 >> 0x20);
              lVar20 = (long)pvVar39 + 0xc;
              uVar51 = 0;
              auVar139 = auVar139 ^ _DAT_0053f020;
              do {
                if (0 < (int)uVar13) {
                  lVar45 = 0;
                  auVar256 = auVar67;
                  auVar267 = auVar79;
                  do {
                    auVar264 = auVar256 ^ auVar273;
                    iVar11 = auVar139._4_4_;
                    if ((bool)(~(auVar264._4_4_ == iVar11 && auVar139._0_4_ < auVar264._0_4_ ||
                                iVar11 < auVar264._4_4_) & 1)) {
                      *(undefined4 *)(lVar20 + -0xc + lVar45) = 0xff7fffff;
                    }
                    if ((auVar264._12_4_ != auVar139._12_4_ || auVar264._8_4_ <= auVar139._8_4_) &&
                        auVar264._12_4_ <= auVar139._12_4_) {
                      *(undefined4 *)(lVar20 + -8 + lVar45) = 0xff7fffff;
                    }
                    auVar264 = auVar267 ^ auVar273;
                    iVar10 = auVar264._4_4_;
                    if (iVar10 <= iVar11 && (iVar10 != iVar11 || auVar264._0_4_ <= auVar139._0_4_))
                    {
                      *(undefined4 *)(lVar20 + -4 + lVar45) = 0xff7fffff;
                      *(undefined4 *)(lVar20 + lVar45) = 0xff7fffff;
                    }
                    lVar266 = auVar256._8_8_;
                    auVar256._0_8_ = auVar256._0_8_ + 4;
                    auVar256._8_8_ = lVar266 + 4;
                    lVar266 = auVar267._8_8_;
                    auVar267._0_8_ = auVar267._0_8_ + 4;
                    auVar267._8_8_ = lVar266 + 4;
                    lVar45 = lVar45 + 0x10;
                  } while ((ulong)(uVar13 + 3 >> 2) << 4 != lVar45);
                }
                if (0 < (int)uVar15) {
                  pvVar54 = (void *)(sVar18 * sVar22 * uVar51 + (long)pvVar55);
                  lVar45 = lVar30 * uVar51;
                  uVar14 = 0;
                  do {
                    if (0 < (int)uVar13) {
                      uVar37 = 0;
                      do {
                        if (0 < (int)uVar12) {
                          auVar257 = ZEXT416(*(uint *)((long)pvVar39 + uVar37 * 4 + lVar45));
                          uVar46 = 0;
                          do {
                            fVar60 = *(float *)((long)pvVar54 + uVar46 * 4);
                            if (auVar257._0_4_ <= fVar60) {
                              auVar257._0_4_ = fVar60;
                            }
                            *(int *)((long)pvVar39 + uVar37 * 4 + lVar45) = auVar257._0_4_;
                            uVar46 = uVar46 + 1;
                          } while (uVar57 != uVar46);
                        }
                        pvVar54 = (void *)((long)pvVar54 + lVar56 * 4);
                        uVar37 = uVar37 + 1;
                      } while (uVar37 != uVar35);
                    }
                    uVar14 = uVar14 + 1;
                  } while (uVar14 != uVar15);
                }
                uVar51 = uVar51 + 1;
                lVar20 = lVar20 + lVar30;
                pMVar44 = (Mat *)0x0;
                unaff_R15D = 0;
              } while (uVar51 != uVar41);
              goto LAB_00358727;
            }
            if (((bVar27 & 1) == 0 && bVar8 == 0) && bVar32 == 0) {
              if (iVar11 == 0) {
                Mat::create(top_blob,uVar12,uVar15,(size_t)pMVar42,opt->blob_allocator);
              }
              else {
                Mat::create(top_blob,uVar12,1,uVar15,1,(size_t)pMVar42,opt->blob_allocator);
              }
              local_b8.cstep = 0;
              local_b8.data = (void *)0x0;
              local_b8.refcount._0_4_ = 0;
              local_b8.refcount._4_4_ = 0;
              local_b8.elemsize._0_4_ = 0;
              local_b8.elemsize._4_4_ = 0;
              local_b8.elempack = 0;
              local_b8.allocator = (Allocator *)0x0;
              local_b8.dims = 0;
              local_b8.w = 0;
              local_b8.h = 0;
              local_b8.d = 0;
              local_b8.c = 0;
              Mat::create(&local_b8,uVar12,uVar15,uVar33,(size_t)pMVar42,opt->workspace_allocator);
              auVar67 = _DAT_00544250;
              auVar79 = _DAT_00544240;
              auVar273 = _DAT_0053f020;
              unaff_R15D = -100;
              if ((local_b8.data != (void *)0x0) && (local_b8.cstep * (long)local_b8.c != 0)) {
                uVar14 = (int)local_b8.cstep * local_b8.c;
                if (0 < (int)uVar14) {
                  lVar20 = (ulong)uVar14 - 1;
                  auVar142._8_4_ = (int)lVar20;
                  auVar142._0_8_ = lVar20;
                  auVar142._12_4_ = (int)((ulong)lVar20 >> 0x20);
                  uVar35 = 0;
                  auVar142 = auVar142 ^ _DAT_0053f020;
                  do {
                    auVar240._8_4_ = (int)uVar35;
                    auVar240._0_8_ = uVar35;
                    auVar240._12_4_ = (int)(uVar35 >> 0x20);
                    auVar264 = (auVar240 | auVar67) ^ auVar273;
                    iVar11 = auVar142._4_4_;
                    if ((bool)(~(auVar264._4_4_ == iVar11 && auVar142._0_4_ < auVar264._0_4_ ||
                                iVar11 < auVar264._4_4_) & 1)) {
                      *(undefined4 *)((long)local_b8.data + uVar35 * 4) = 0xff7fffff;
                    }
                    if ((auVar264._12_4_ != auVar142._12_4_ || auVar264._8_4_ <= auVar142._8_4_) &&
                        auVar264._12_4_ <= auVar142._12_4_) {
                      *(undefined4 *)((long)local_b8.data + uVar35 * 4 + 4) = 0xff7fffff;
                    }
                    auVar264 = (auVar240 | auVar79) ^ auVar273;
                    iVar10 = auVar264._4_4_;
                    if (iVar10 <= iVar11 && (iVar10 != iVar11 || auVar264._0_4_ <= auVar142._0_4_))
                    {
                      *(undefined4 *)((long)local_b8.data + uVar35 * 4 + 8) = 0xff7fffff;
                      *(undefined4 *)((long)local_b8.data + uVar35 * 4 + 0xc) = 0xff7fffff;
                    }
                    uVar35 = uVar35 + 4;
                  } while ((uVar14 + 3 & 0xfffffffc) != uVar35);
                }
                if (0 < (int)uVar33) {
                  pvVar39 = bottom_blob->data;
                  sVar18 = bottom_blob->elemsize;
                  sVar21 = bottom_blob->cstep;
                  uVar35 = 0;
                  pvVar55 = local_b8.data;
                  do {
                    if (0 < (int)uVar15) {
                      pvVar52 = (void *)(sVar18 * sVar21 * uVar35 + (long)pvVar39);
                      uVar37 = 0;
                      pvVar54 = pvVar55;
                      do {
                        if (0 < (int)uVar13) {
                          uVar14 = 0;
                          do {
                            if (0 < (int)uVar12) {
                              uVar46 = 0;
                              do {
                                fVar1 = *(float *)((long)pvVar52 + uVar46 * 4);
                                fVar60 = *(float *)((long)pvVar54 + uVar46 * 4);
                                if (fVar1 <= fVar60) {
                                  fVar1 = fVar60;
                                }
                                *(float *)((long)pvVar54 + uVar46 * 4) = fVar1;
                                uVar46 = uVar46 + 1;
                              } while (uVar57 != uVar46);
                            }
                            pvVar52 = (void *)((long)pvVar52 + lVar56 * 4);
                            uVar14 = uVar14 + 1;
                          } while (uVar14 != uVar13);
                        }
                        uVar37 = uVar37 + 1;
                        pvVar54 = (void *)((long)pvVar54 +
                                          (long)local_b8.w *
                                          CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize));
                      } while (uVar37 != uVar51);
                    }
                    uVar35 = uVar35 + 1;
                    pvVar55 = (void *)((long)pvVar55 +
                                      CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize) *
                                      local_b8.cstep);
                  } while (uVar35 != uVar41);
                }
                auVar67 = _DAT_00544250;
                auVar79 = _DAT_00544240;
                auVar273 = _DAT_0053f020;
                uVar14 = top_blob->c * (int)top_blob->cstep;
                if (0 < (int)uVar14) {
                  pvVar39 = top_blob->data;
                  lVar56 = (ulong)uVar14 - 1;
                  auVar143._8_4_ = (int)lVar56;
                  auVar143._0_8_ = lVar56;
                  auVar143._12_4_ = (int)((ulong)lVar56 >> 0x20);
                  uVar35 = 0;
                  auVar143 = auVar143 ^ _DAT_0053f020;
                  do {
                    auVar241._8_4_ = (int)uVar35;
                    auVar241._0_8_ = uVar35;
                    auVar241._12_4_ = (int)(uVar35 >> 0x20);
                    auVar264 = (auVar241 | auVar67) ^ auVar273;
                    iVar11 = auVar143._4_4_;
                    if ((bool)(~(auVar264._4_4_ == iVar11 && auVar143._0_4_ < auVar264._0_4_ ||
                                iVar11 < auVar264._4_4_) & 1)) {
                      *(undefined4 *)((long)pvVar39 + uVar35 * 4) = 0xff7fffff;
                    }
                    if ((auVar264._12_4_ != auVar143._12_4_ || auVar264._8_4_ <= auVar143._8_4_) &&
                        auVar264._12_4_ <= auVar143._12_4_) {
                      *(undefined4 *)((long)pvVar39 + uVar35 * 4 + 4) = 0xff7fffff;
                    }
                    auVar264 = (auVar241 | auVar79) ^ auVar273;
                    iVar10 = auVar264._4_4_;
                    if (iVar10 <= iVar11 && (iVar10 != iVar11 || auVar264._0_4_ <= auVar143._0_4_))
                    {
                      *(undefined4 *)((long)pvVar39 + uVar35 * 4 + 8) = 0xff7fffff;
                      *(undefined4 *)((long)pvVar39 + uVar35 * 4 + 0xc) = 0xff7fffff;
                    }
                    uVar35 = uVar35 + 4;
                  } while ((uVar14 + 3 & 0xfffffffc) != uVar35);
                }
                if (0 < (int)uVar33) {
                  pvVar39 = top_blob->data;
                  iVar11 = top_blob->w;
                  sVar18 = top_blob->elemsize;
                  uVar35 = 0;
                  pvVar55 = local_b8.data;
                  do {
                    if (0 < (int)uVar15) {
                      uVar37 = 0;
                      pvVar54 = pvVar39;
                      pvVar52 = pvVar55;
                      do {
                        if (0 < (int)uVar12) {
                          uVar46 = 0;
                          do {
                            fVar1 = *(float *)((long)pvVar52 + uVar46 * 4);
                            fVar60 = *(float *)((long)pvVar54 + uVar46 * 4);
                            if (fVar1 <= fVar60) {
                              fVar1 = fVar60;
                            }
                            *(float *)((long)pvVar54 + uVar46 * 4) = fVar1;
                            uVar46 = uVar46 + 1;
                          } while (uVar57 != uVar46);
                        }
                        uVar37 = uVar37 + 1;
                        pvVar52 = (void *)((long)pvVar52 +
                                          (long)local_b8.w *
                                          CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize));
                        pvVar54 = (void *)((long)pvVar54 + (long)iVar11 * sVar18);
                      } while (uVar37 != uVar51);
                    }
                    uVar35 = uVar35 + 1;
                    pvVar55 = (void *)((long)pvVar55 +
                                      local_b8.cstep *
                                      CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize));
                  } while (uVar35 != uVar41);
                }
                unaff_R15D = 0;
              }
              piVar7 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
              if (piVar7 != (int *)0x0) {
                LOCK();
                *piVar7 = *piVar7 + -1;
                UNLOCK();
                if (*piVar7 == 0) {
                  if (local_b8.allocator == (Allocator *)0x0) goto LAB_003586f3;
                  (**(code **)(*(long *)local_b8.allocator + 0x18))();
                }
              }
              goto LAB_00358700;
            }
            if (((bVar27 & 1) != 0 || bVar9 != 0) || bVar25 != 0) {
              if (((bVar47 & 1) == 0 && bVar8 == 0) && bVar25 == 0) {
                if (iVar11 == 0) {
                  Mat::create(top_blob,uVar13,uVar15,uVar33,(size_t)pMVar42,opt->blob_allocator);
                }
                else {
                  Mat::create(top_blob,1,uVar13,uVar15,uVar33,(size_t)pMVar42,opt->blob_allocator);
                }
                if ((int)uVar33 < 1) goto LAB_003519f4;
                pvVar39 = bottom_blob->data;
                sVar18 = bottom_blob->elemsize;
                sVar21 = top_blob->elemsize;
                sVar22 = top_blob->cstep;
                pvVar55 = top_blob->data;
                sVar5 = bottom_blob->cstep;
                uVar35 = 0;
                unaff_R15D = 0;
                do {
                  if (0 < (int)(uVar13 * uVar15)) {
                    uVar51 = 0;
                    pvVar54 = pvVar39;
                    do {
                      auVar186 = ZEXT816(0xff7fffff);
                      if (0 < (int)uVar12) {
                        uVar37 = 0;
                        auVar186 = ZEXT816(0xff7fffff);
                        do {
                          fVar60 = *(float *)((long)pvVar54 + uVar37 * 4);
                          if (auVar186._0_4_ <= fVar60) {
                            auVar186._0_4_ = fVar60;
                          }
                          uVar37 = uVar37 + 1;
                        } while (uVar57 != uVar37);
                      }
                      *(int *)((long)pvVar55 + uVar51 * 4 + sVar21 * sVar22 * uVar35) =
                           auVar186._0_4_;
                      uVar51 = uVar51 + 1;
                      pvVar54 = (void *)((long)pvVar54 + lVar56 * 4);
                    } while (uVar51 != uVar13 * uVar15);
                  }
                  uVar35 = uVar35 + 1;
                  pvVar39 = (void *)((long)pvVar39 + sVar18 * sVar5);
                  pMVar44 = (Mat *)0x0;
                } while (uVar35 != uVar41);
              }
              else if ((bVar8 == 0 && (bVar43 & 1) == 0) && bVar32 == 0) {
                if (iVar11 == 0) {
                  Mat::create(top_blob,uVar12,uVar13,uVar15,(size_t)pMVar42,opt->blob_allocator);
                }
                else {
                  Mat::create(top_blob,uVar12,uVar13,uVar15,1,(size_t)pMVar42,opt->blob_allocator);
                }
                auVar67 = _DAT_00544250;
                auVar79 = _DAT_00544240;
                auVar273 = _DAT_0053f020;
                uVar14 = top_blob->c * (int)top_blob->cstep;
                if (0 < (int)uVar14) {
                  pvVar39 = top_blob->data;
                  lVar20 = (ulong)uVar14 - 1;
                  auVar152._8_4_ = (int)lVar20;
                  auVar152._0_8_ = lVar20;
                  auVar152._12_4_ = (int)((ulong)lVar20 >> 0x20);
                  uVar37 = 0;
                  auVar152 = auVar152 ^ _DAT_0053f020;
                  do {
                    auVar246._8_4_ = (int)uVar37;
                    auVar246._0_8_ = uVar37;
                    auVar246._12_4_ = (int)(uVar37 >> 0x20);
                    auVar264 = (auVar246 | auVar67) ^ auVar273;
                    iVar10 = auVar152._4_4_;
                    if ((bool)(~(auVar264._4_4_ == iVar10 && auVar152._0_4_ < auVar264._0_4_ ||
                                iVar10 < auVar264._4_4_) & 1)) {
                      *(undefined4 *)((long)pvVar39 + uVar37 * 4) = 0xff7fffff;
                    }
                    if ((auVar264._12_4_ != auVar152._12_4_ || auVar264._8_4_ <= auVar152._8_4_) &&
                        auVar264._12_4_ <= auVar152._12_4_) {
                      *(undefined4 *)((long)pvVar39 + uVar37 * 4 + 4) = 0xff7fffff;
                    }
                    auVar264 = (auVar246 | auVar79) ^ auVar273;
                    iVar265 = auVar264._4_4_;
                    if (iVar265 <= iVar10 && (iVar265 != iVar10 || auVar264._0_4_ <= auVar152._0_4_)
                       ) {
                      *(undefined4 *)((long)pvVar39 + uVar37 * 4 + 8) = 0xff7fffff;
                      *(undefined4 *)((long)pvVar39 + uVar37 * 4 + 0xc) = 0xff7fffff;
                    }
                    uVar37 = uVar37 + 4;
                  } while ((uVar14 + 3 & 0xfffffffc) != uVar37);
                }
                if ((int)uVar33 < 1) goto LAB_003519f4;
                pvVar39 = bottom_blob->data;
                sVar18 = bottom_blob->elemsize;
                sVar21 = bottom_blob->cstep;
                uVar37 = 0;
                do {
                  if (0 < (int)uVar15) {
                    iVar10 = top_blob->w;
                    if (iVar11 == 0) {
                      sVar22 = top_blob->cstep;
                    }
                    else {
                      sVar22 = (long)top_blob->h * (long)iVar10;
                    }
                    pvVar54 = (void *)(sVar18 * sVar21 * uVar37 + (long)pvVar39);
                    pvVar55 = top_blob->data;
                    sVar5 = top_blob->elemsize;
                    uVar46 = 0;
                    do {
                      if (0 < (int)uVar13) {
                        uVar40 = 0;
                        pvVar52 = pvVar55;
                        do {
                          if (0 < (int)uVar12) {
                            uVar24 = 0;
                            do {
                              fVar1 = *(float *)((long)pvVar54 + uVar24 * 4);
                              fVar60 = *(float *)((long)pvVar52 + uVar24 * 4);
                              if (fVar1 <= fVar60) {
                                fVar1 = fVar60;
                              }
                              *(float *)((long)pvVar52 + uVar24 * 4) = fVar1;
                              uVar24 = uVar24 + 1;
                            } while (uVar57 != uVar24);
                          }
                          pvVar54 = (void *)((long)pvVar54 + lVar56 * 4);
                          uVar40 = uVar40 + 1;
                          pvVar52 = (void *)((long)pvVar52 + (long)iVar10 * sVar5);
                        } while (uVar40 != uVar35);
                      }
                      uVar46 = uVar46 + 1;
                      pvVar55 = (void *)((long)pvVar55 + sVar22 * sVar5);
                    } while (uVar46 != uVar51);
                  }
                  uVar37 = uVar37 + 1;
                  pMVar44 = (Mat *)0x0;
                  unaff_R15D = 0;
                } while (uVar37 != uVar41);
              }
              else if (((bVar27 & 1) == 0 && bVar8 == 0) && bVar25 == 0) {
                if (iVar11 == 0) {
                  Mat::create(top_blob,uVar12,uVar15,uVar33,(size_t)pMVar42,opt->blob_allocator);
                }
                else {
                  Mat::create(top_blob,uVar12,1,uVar15,uVar33,(size_t)pMVar42,opt->blob_allocator);
                }
                auVar67 = _DAT_00544250;
                auVar79 = _DAT_00544240;
                auVar273 = _DAT_0053f020;
                if ((int)uVar33 < 1) goto LAB_003519f4;
                pvVar39 = bottom_blob->data;
                sVar18 = bottom_blob->elemsize;
                sVar21 = bottom_blob->cstep;
                iVar11 = top_blob->w;
                pvVar55 = top_blob->data;
                uVar35 = top_blob->elemsize;
                lVar56 = (long)top_blob->h * (long)iVar11;
                uVar37 = 0;
                iVar10 = (int)((uVar35 * lVar56 + 0xf & 0xfffffffffffffff0) / uVar35);
                if (top_blob->dims == 4) {
                  iVar10 = (int)lVar56;
                }
                uVar14 = iVar10 * top_blob->d;
                lVar56 = (ulong)uVar14 - 1;
                auVar155._8_4_ = (int)lVar56;
                auVar155._0_8_ = lVar56;
                auVar155._12_4_ = (int)((ulong)lVar56 >> 0x20);
                lVar56 = (long)pvVar55 + 0xc;
                lVar20 = top_blob->cstep * uVar35;
                auVar155 = auVar155 ^ _DAT_0053f020;
                do {
                  if (0 < (int)uVar14) {
                    uVar46 = 0;
                    do {
                      auVar249._8_4_ = (int)uVar46;
                      auVar249._0_8_ = uVar46;
                      auVar249._12_4_ = (int)(uVar46 >> 0x20);
                      auVar264 = (auVar249 | auVar67) ^ auVar273;
                      iVar10 = auVar155._4_4_;
                      if ((bool)(~(iVar10 < auVar264._4_4_ ||
                                  auVar155._0_4_ < auVar264._0_4_ && auVar264._4_4_ == iVar10) & 1))
                      {
                        *(undefined4 *)(lVar56 + -0xc + uVar46 * 4) = 0xff7fffff;
                      }
                      if (auVar264._12_4_ <= auVar155._12_4_ &&
                          (auVar264._8_4_ <= auVar155._8_4_ || auVar264._12_4_ != auVar155._12_4_))
                      {
                        *(undefined4 *)(lVar56 + -8 + uVar46 * 4) = 0xff7fffff;
                      }
                      auVar264 = (auVar249 | auVar79) ^ auVar273;
                      iVar265 = auVar264._4_4_;
                      if (iVar265 <= iVar10 &&
                          (iVar265 != iVar10 || auVar264._0_4_ <= auVar155._0_4_)) {
                        *(undefined4 *)(lVar56 + -4 + uVar46 * 4) = 0xff7fffff;
                        *(undefined4 *)(lVar56 + uVar46 * 4) = 0xff7fffff;
                      }
                      uVar46 = uVar46 + 4;
                    } while ((uVar14 + 3 & 0xfffffffc) != uVar46);
                  }
                  if (0 < (int)uVar15) {
                    pvVar52 = (void *)(sVar18 * sVar21 * uVar37 + (long)pvVar39);
                    uVar46 = 0;
                    pvVar54 = pvVar55;
                    do {
                      if (0 < (int)uVar13) {
                        uVar33 = 0;
                        do {
                          if (0 < (int)uVar12) {
                            uVar40 = 0;
                            do {
                              fVar1 = *(float *)((long)pvVar52 + uVar40 * 4);
                              fVar60 = *(float *)((long)pvVar54 + uVar40 * 4);
                              if (fVar1 <= fVar60) {
                                fVar1 = fVar60;
                              }
                              *(float *)((long)pvVar54 + uVar40 * 4) = fVar1;
                              uVar40 = uVar40 + 1;
                            } while (uVar57 != uVar40);
                          }
                          pvVar52 = (void *)((long)pvVar52 + (long)(int)uVar12 * 4);
                          uVar33 = uVar33 + 1;
                        } while (uVar33 != uVar13);
                      }
                      uVar46 = uVar46 + 1;
                      pvVar54 = (void *)((long)pvVar54 + uVar35 * (long)iVar11);
                    } while (uVar46 != uVar51);
                  }
                  uVar37 = uVar37 + 1;
                  lVar56 = lVar56 + lVar20;
                  pvVar55 = (void *)((long)pvVar55 + lVar20);
                  pMVar44 = (Mat *)0x0;
                  unaff_R15D = 0;
                } while (uVar37 != uVar41);
              }
              else {
                pMVar44 = (Mat *)CONCAT71((uint7)(uint3)((uint)iVar10 >> 8),1);
                if (bVar25 == 0 && (bVar9 == 0 && (bVar43 & 1) == 0)) {
                  if (iVar11 == 0) {
                    Mat::create(top_blob,uVar12,uVar13,uVar33,(size_t)pMVar42,opt->blob_allocator);
                  }
                  else {
                    Mat::create(top_blob,uVar12,uVar13,1,uVar33,(size_t)pMVar42,opt->blob_allocator)
                    ;
                  }
                  auVar67 = _DAT_00544250;
                  auVar79 = _DAT_00544240;
                  auVar273 = _DAT_0053f020;
                  if ((int)uVar33 < 1) goto LAB_003519f4;
                  pvVar39 = bottom_blob->data;
                  sVar18 = bottom_blob->elemsize;
                  sVar21 = bottom_blob->cstep;
                  iVar11 = top_blob->w;
                  pvVar55 = top_blob->data;
                  uVar51 = top_blob->elemsize;
                  lVar56 = (long)top_blob->h * (long)iVar11;
                  uVar37 = 0;
                  iVar10 = (int)((uVar51 * lVar56 + 0xf & 0xfffffffffffffff0) / uVar51);
                  if (top_blob->dims == 4) {
                    iVar10 = (int)lVar56;
                  }
                  uVar14 = iVar10 * top_blob->d;
                  lVar56 = (ulong)uVar14 - 1;
                  auVar158._8_4_ = (int)lVar56;
                  auVar158._0_8_ = lVar56;
                  auVar158._12_4_ = (int)((ulong)lVar56 >> 0x20);
                  lVar56 = (long)pvVar55 + 0xc;
                  lVar20 = top_blob->cstep * uVar51;
                  auVar158 = auVar158 ^ _DAT_0053f020;
                  do {
                    if (0 < (int)uVar14) {
                      uVar46 = 0;
                      do {
                        auVar252._8_4_ = (int)uVar46;
                        auVar252._0_8_ = uVar46;
                        auVar252._12_4_ = (int)(uVar46 >> 0x20);
                        auVar264 = (auVar252 | auVar67) ^ auVar273;
                        iVar10 = auVar158._4_4_;
                        if ((bool)(~(iVar10 < auVar264._4_4_ ||
                                    auVar158._0_4_ < auVar264._0_4_ && auVar264._4_4_ == iVar10) & 1
                                  )) {
                          *(undefined4 *)(lVar56 + -0xc + uVar46 * 4) = 0xff7fffff;
                        }
                        if (auVar264._12_4_ <= auVar158._12_4_ &&
                            (auVar264._8_4_ <= auVar158._8_4_ || auVar264._12_4_ != auVar158._12_4_)
                           ) {
                          *(undefined4 *)(lVar56 + -8 + uVar46 * 4) = 0xff7fffff;
                        }
                        auVar264 = (auVar252 | auVar79) ^ auVar273;
                        iVar265 = auVar264._4_4_;
                        if (iVar265 <= iVar10 &&
                            (iVar265 != iVar10 || auVar264._0_4_ <= auVar158._0_4_)) {
                          *(undefined4 *)(lVar56 + -4 + uVar46 * 4) = 0xff7fffff;
                          *(undefined4 *)(lVar56 + uVar46 * 4) = 0xff7fffff;
                        }
                        uVar46 = uVar46 + 4;
                      } while ((uVar14 + 3 & 0xfffffffc) != uVar46);
                    }
                    if (0 < (int)uVar15) {
                      pvVar54 = (void *)(sVar18 * sVar21 * uVar37 + (long)pvVar39);
                      uVar33 = 0;
                      do {
                        if (0 < (int)uVar13) {
                          uVar46 = 0;
                          pvVar52 = pvVar55;
                          do {
                            if (0 < (int)uVar12) {
                              uVar40 = 0;
                              do {
                                fVar1 = *(float *)((long)pvVar54 + uVar40 * 4);
                                fVar60 = *(float *)((long)pvVar52 + uVar40 * 4);
                                if (fVar1 <= fVar60) {
                                  fVar1 = fVar60;
                                }
                                *(float *)((long)pvVar52 + uVar40 * 4) = fVar1;
                                uVar40 = uVar40 + 1;
                              } while (uVar57 != uVar40);
                            }
                            pvVar54 = (void *)((long)pvVar54 + (long)(int)uVar12 * 4);
                            uVar46 = uVar46 + 1;
                            pvVar52 = (void *)((long)pvVar52 + uVar51 * (long)iVar11);
                          } while (uVar46 != uVar35);
                        }
                        uVar33 = uVar33 + 1;
                      } while (uVar33 != uVar15);
                    }
                    uVar37 = uVar37 + 1;
                    lVar56 = lVar56 + lVar20;
                    pvVar55 = (void *)((long)pvVar55 + lVar20);
                    pMVar44 = (Mat *)0x0;
                    unaff_R15D = 0;
                  } while (uVar37 != uVar41);
                }
              }
              goto LAB_00358727;
            }
            if (iVar11 == 0) {
              Mat::create(top_blob,uVar12,uVar33,(size_t)pMVar42,opt->blob_allocator);
            }
            else {
              Mat::create(top_blob,uVar12,1,1,uVar33,(size_t)pMVar42,opt->blob_allocator);
            }
            auVar67 = _DAT_00544250;
            auVar79 = _DAT_00544240;
            auVar273 = _DAT_0053f020;
            if (0 < (int)uVar33) {
              sVar18 = bottom_blob->elemsize;
              pvVar39 = top_blob->data;
              if (iVar11 == 0) {
                sVar21 = (size_t)top_blob->w;
              }
              else {
                sVar21 = top_blob->cstep;
              }
              pvVar55 = bottom_blob->data;
              sVar22 = bottom_blob->cstep;
              lVar20 = uVar57 - 1;
              auVar148._8_4_ = (int)lVar20;
              auVar148._0_8_ = lVar20;
              auVar148._12_4_ = (int)((ulong)lVar20 >> 0x20);
              lVar30 = sVar21 * top_blob->elemsize;
              lVar20 = (long)pvVar39 + 0xc;
              uVar35 = 0;
              auVar148 = auVar148 ^ _DAT_0053f020;
              do {
                if (0 < (int)uVar12) {
                  lVar45 = 0;
                  auVar261 = auVar67;
                  auVar270 = auVar79;
                  do {
                    auVar264 = auVar261 ^ auVar273;
                    iVar11 = auVar148._4_4_;
                    if ((bool)(~(auVar264._4_4_ == iVar11 && auVar148._0_4_ < auVar264._0_4_ ||
                                iVar11 < auVar264._4_4_) & 1)) {
                      *(undefined4 *)(lVar20 + -0xc + lVar45) = 0xff7fffff;
                    }
                    if ((auVar264._12_4_ != auVar148._12_4_ || auVar264._8_4_ <= auVar148._8_4_) &&
                        auVar264._12_4_ <= auVar148._12_4_) {
                      *(undefined4 *)(lVar20 + -8 + lVar45) = 0xff7fffff;
                    }
                    auVar264 = auVar270 ^ auVar273;
                    iVar10 = auVar264._4_4_;
                    if (iVar10 <= iVar11 && (iVar10 != iVar11 || auVar264._0_4_ <= auVar148._0_4_))
                    {
                      *(undefined4 *)(lVar20 + -4 + lVar45) = 0xff7fffff;
                      *(undefined4 *)(lVar20 + lVar45) = 0xff7fffff;
                    }
                    lVar266 = auVar261._8_8_;
                    auVar261._0_8_ = auVar261._0_8_ + 4;
                    auVar261._8_8_ = lVar266 + 4;
                    lVar266 = auVar270._8_8_;
                    auVar270._0_8_ = auVar270._0_8_ + 4;
                    auVar270._8_8_ = lVar266 + 4;
                    lVar45 = lVar45 + 0x10;
                  } while ((ulong)(uVar12 + 3 >> 2) << 4 != lVar45);
                }
                if (0 < (int)uVar15) {
                  pvVar54 = (void *)(sVar18 * sVar22 * uVar35 + (long)pvVar55);
                  uVar14 = 0;
                  do {
                    if (0 < (int)uVar13) {
                      uVar33 = 0;
                      do {
                        if (0 < (int)uVar12) {
                          uVar51 = 0;
                          do {
                            fVar1 = *(float *)((long)pvVar54 + uVar51 * 4);
                            fVar60 = *(float *)((long)pvVar39 + uVar51 * 4);
                            if (fVar1 <= fVar60) {
                              fVar1 = fVar60;
                            }
                            *(float *)((long)pvVar39 + uVar51 * 4) = fVar1;
                            uVar51 = uVar51 + 1;
                          } while (uVar57 != uVar51);
                        }
                        pvVar54 = (void *)((long)pvVar54 + lVar56 * 4);
                        uVar33 = uVar33 + 1;
                      } while (uVar33 != uVar13);
                    }
                    uVar14 = uVar14 + 1;
                  } while (uVar14 != uVar15);
                }
                uVar35 = uVar35 + 1;
                lVar20 = lVar20 + lVar30;
                pvVar39 = (void *)((long)pvVar39 + lVar30);
                pMVar44 = (Mat *)0x0;
                unaff_R15D = 0;
              } while (uVar35 != uVar41);
              goto LAB_00358727;
            }
            goto LAB_003519f4;
          }
          if (iVar11 == 0) {
            Mat::create(top_blob,uVar13,(size_t)pMVar42,opt->blob_allocator);
          }
          else {
            Mat::create(top_blob,1,uVar13,1,1,(size_t)pMVar42,opt->blob_allocator);
          }
          local_b8.cstep = 0;
          local_b8.data = (void *)0x0;
          local_b8.refcount._0_4_ = 0;
          local_b8.refcount._4_4_ = 0;
          local_b8.elemsize._0_4_ = 0;
          local_b8.elemsize._4_4_ = 0;
          local_b8.elempack = 0;
          local_b8.allocator = (Allocator *)0x0;
          local_b8.dims = 0;
          local_b8.w = 0;
          local_b8.h = 0;
          local_b8.d = 0;
          local_b8.c = 0;
          Mat::create(&local_b8,1,uVar13,uVar33,(size_t)pMVar42,opt->workspace_allocator);
          auVar67 = _DAT_00544250;
          auVar79 = _DAT_00544240;
          auVar273 = _DAT_0053f020;
          unaff_R15D = -100;
          if ((local_b8.data != (void *)0x0) && (local_b8.cstep * (long)local_b8.c != 0)) {
            uVar14 = (int)local_b8.cstep * local_b8.c;
            if (0 < (int)uVar14) {
              lVar20 = (ulong)uVar14 - 1;
              auVar105._8_4_ = (int)lVar20;
              auVar105._0_8_ = lVar20;
              auVar105._12_4_ = (int)((ulong)lVar20 >> 0x20);
              uVar51 = 0;
              auVar105 = auVar105 ^ _DAT_0053f020;
              do {
                auVar210._8_4_ = (int)uVar51;
                auVar210._0_8_ = uVar51;
                auVar210._12_4_ = (int)(uVar51 >> 0x20);
                auVar264 = (auVar210 | auVar67) ^ auVar273;
                iVar11 = auVar105._4_4_;
                if ((bool)(~(auVar264._4_4_ == iVar11 && auVar105._0_4_ < auVar264._0_4_ ||
                            iVar11 < auVar264._4_4_) & 1)) {
                  *(undefined4 *)((long)local_b8.data + uVar51 * 4) = 0xff7fffff;
                }
                if ((auVar264._12_4_ != auVar105._12_4_ || auVar264._8_4_ <= auVar105._8_4_) &&
                    auVar264._12_4_ <= auVar105._12_4_) {
                  *(undefined4 *)((long)local_b8.data + uVar51 * 4 + 4) = 0xff7fffff;
                }
                auVar264 = (auVar210 | auVar79) ^ auVar273;
                iVar10 = auVar264._4_4_;
                if (iVar10 <= iVar11 && (iVar10 != iVar11 || auVar264._0_4_ <= auVar105._0_4_)) {
                  *(undefined4 *)((long)local_b8.data + uVar51 * 4 + 8) = 0xff7fffff;
                  *(undefined4 *)((long)local_b8.data + uVar51 * 4 + 0xc) = 0xff7fffff;
                }
                uVar51 = uVar51 + 4;
              } while ((uVar14 + 3 & 0xfffffffc) != uVar51);
            }
            if (0 < (int)uVar33) {
              pvVar39 = bottom_blob->data;
              sVar18 = bottom_blob->elemsize;
              sVar21 = bottom_blob->cstep;
              uVar51 = 0;
              do {
                if (0 < (int)uVar15) {
                  lVar20 = CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize) * local_b8.cstep
                           * uVar51;
                  pvVar55 = (void *)(sVar18 * sVar21 * uVar51 + (long)pvVar39);
                  uVar14 = 0;
                  do {
                    if (0 < (int)uVar13) {
                      uVar37 = 0;
                      do {
                        if (0 < (int)uVar12) {
                          auVar106 = ZEXT416(*(uint *)((long)local_b8.data + uVar37 * 4 + lVar20));
                          uVar46 = 0;
                          do {
                            fVar60 = *(float *)((long)pvVar55 + uVar46 * 4);
                            if (auVar106._0_4_ <= fVar60) {
                              auVar106._0_4_ = fVar60;
                            }
                            *(int *)((long)local_b8.data + uVar37 * 4 + lVar20) = auVar106._0_4_;
                            uVar46 = uVar46 + 1;
                          } while (uVar57 != uVar46);
                        }
                        pvVar55 = (void *)((long)pvVar55 + lVar56 * 4);
                        uVar37 = uVar37 + 1;
                      } while (uVar37 != uVar35);
                    }
                    uVar14 = uVar14 + 1;
                  } while (uVar14 != uVar15);
                }
                uVar51 = uVar51 + 1;
              } while (uVar51 != uVar41);
            }
            auVar67 = _DAT_00544250;
            auVar79 = _DAT_00544240;
            auVar273 = _DAT_0053f020;
            uVar12 = top_blob->c * (int)top_blob->cstep;
            if (0 < (int)uVar12) {
              pvVar39 = top_blob->data;
              lVar56 = (ulong)uVar12 - 1;
              auVar107._8_4_ = (int)lVar56;
              auVar107._0_8_ = lVar56;
              auVar107._12_4_ = (int)((ulong)lVar56 >> 0x20);
              uVar51 = 0;
              auVar107 = auVar107 ^ _DAT_0053f020;
              do {
                auVar211._8_4_ = (int)uVar51;
                auVar211._0_8_ = uVar51;
                auVar211._12_4_ = (int)(uVar51 >> 0x20);
                auVar264 = (auVar211 | auVar67) ^ auVar273;
                iVar11 = auVar107._4_4_;
                if ((bool)(~(auVar264._4_4_ == iVar11 && auVar107._0_4_ < auVar264._0_4_ ||
                            iVar11 < auVar264._4_4_) & 1)) {
                  *(undefined4 *)((long)pvVar39 + uVar51 * 4) = 0xff7fffff;
                }
                if ((auVar264._12_4_ != auVar107._12_4_ || auVar264._8_4_ <= auVar107._8_4_) &&
                    auVar264._12_4_ <= auVar107._12_4_) {
                  *(undefined4 *)((long)pvVar39 + uVar51 * 4 + 4) = 0xff7fffff;
                }
                auVar264 = (auVar211 | auVar79) ^ auVar273;
                iVar10 = auVar264._4_4_;
                if (iVar10 <= iVar11 && (iVar10 != iVar11 || auVar264._0_4_ <= auVar107._0_4_)) {
                  *(undefined4 *)((long)pvVar39 + uVar51 * 4 + 8) = 0xff7fffff;
                  *(undefined4 *)((long)pvVar39 + uVar51 * 4 + 0xc) = 0xff7fffff;
                }
                uVar51 = uVar51 + 4;
              } while ((uVar12 + 3 & 0xfffffffc) != uVar51);
            }
            if (0 < (int)uVar33) {
              pvVar39 = top_blob->data;
              uVar51 = 0;
              pvVar55 = local_b8.data;
              do {
                if (0 < (int)uVar13) {
                  uVar57 = 0;
                  do {
                    fVar1 = *(float *)((long)pvVar55 + uVar57 * 4);
                    fVar60 = *(float *)((long)pvVar39 + uVar57 * 4);
                    if (fVar1 <= fVar60) {
                      fVar1 = fVar60;
                    }
                    *(float *)((long)pvVar39 + uVar57 * 4) = fVar1;
                    uVar57 = uVar57 + 1;
                  } while (uVar35 != uVar57);
                }
                uVar51 = uVar51 + 1;
                pvVar55 = (void *)((long)pvVar55 +
                                  local_b8.cstep *
                                  CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize));
              } while (uVar51 != uVar41);
            }
            unaff_R15D = 0;
          }
          piVar7 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 == 0) {
              if (local_b8.allocator == (Allocator *)0x0) goto LAB_003586f3;
              (**(code **)(*(long *)local_b8.allocator + 0x18))();
            }
          }
          goto LAB_00358700;
        }
      }
LAB_00358731:
      unaff_R15D = 0;
    }
    break;
  case 5:
    fVar161 = this->coeff;
    iVar11 = this->keepdims;
    pMVar42 = (Mat *)bottom_blob->elemsize;
    if (uVar12 == 2) {
      uVar13 = bottom_blob->w;
      uVar35 = (ulong)uVar13;
      uVar15 = bottom_blob->h;
      pAVar36 = (Allocator *)(ulong)uVar15;
      auVar63._8_4_ = 0xffffffff;
      auVar63._0_8_ = 0xffffffffffffffff;
      auVar63._12_4_ = 0xffffffff;
      auVar64._0_8_ = SUB168(auVar63 ^ auVar273,0) << 0x3f;
      auVar64._8_8_ = SUB168(auVar63 ^ auVar273,8) << 0x3f;
      iVar10 = movmskpd(iVar10,auVar64);
      if (iVar10 == 0) {
        if (iVar11 == 0) {
          Mat::create(top_blob,1,(size_t)pMVar42,opt->blob_allocator);
        }
        else {
          Mat::create(top_blob,1,1,(size_t)pMVar42,opt->blob_allocator);
        }
        pAVar50 = opt->workspace_allocator;
        local_b8.cstep = 0;
        local_b8.data = (void *)0x0;
        local_b8.refcount._0_4_ = 0;
        local_b8.refcount._4_4_ = 0;
        local_b8.elemsize._0_4_ = 0;
        local_b8.elemsize._4_4_ = 0;
        local_b8.elempack = 0;
        local_b8.allocator = (Allocator *)0x0;
        local_b8.dims = 0;
        local_b8.w = 0;
        local_b8.h = 0;
        local_b8.d = 0;
        local_b8.c = 0;
        Mat::create(&local_b8,uVar15,(size_t)pMVar42,pAVar50);
        unaff_R15D = -100;
        if ((local_b8.data != (void *)0x0) &&
           (pAVar50 = (Allocator *)((long)local_b8.c * local_b8.cstep), pAVar50 != (Allocator *)0x0)
           ) {
          if ((int)uVar15 < 1) {
            fVar60 = 3.4028235e+38;
          }
          else {
            pvVar39 = bottom_blob->data;
            iVar10 = bottom_blob->w;
            sVar18 = bottom_blob->elemsize;
            pAVar50 = (Allocator *)0x0;
            do {
              auVar163 = ZEXT816(0x7f7fffff);
              if (0 < (int)uVar13) {
                uVar51 = 0;
                auVar163 = ZEXT816(0x7f7fffff);
                do {
                  fVar60 = *(float *)((long)pvVar39 + uVar51 * 4);
                  if (fVar60 <= auVar163._0_4_) {
                    auVar163._0_4_ = fVar60;
                  }
                  uVar51 = uVar51 + 1;
                } while (uVar35 != uVar51);
              }
              *(int *)((long)local_b8.data + (long)pAVar50 * 4) = auVar163._0_4_;
              pAVar50 = pAVar50 + 1;
              pvVar39 = (void *)((long)pvVar39 + (long)iVar10 * sVar18);
            } while (pAVar50 != pAVar36);
            fVar60 = 3.4028235e+38;
            pAVar50 = (Allocator *)0x0;
            do {
              fVar1 = *(float *)((long)local_b8.data + (long)pAVar50 * 4);
              if (fVar1 <= fVar60) {
                fVar60 = fVar1;
              }
              pAVar50 = pAVar50 + 1;
            } while (pAVar36 != pAVar50);
          }
          *(float *)top_blob->data = fVar60;
          unaff_R15D = 0;
        }
        uVar14 = (uint)pAVar50;
        piVar7 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            if (local_b8.allocator == (Allocator *)0x0) {
              if (local_b8.data != (void *)0x0) {
                free(local_b8.data);
              }
            }
            else {
              (**(code **)(*(long *)local_b8.allocator + 0x18))();
            }
          }
        }
        uVar41 = uVar41 & 0xffffffff;
        local_b8.cstep = 0;
        local_b8.data = (void *)0x0;
        local_b8.refcount._0_4_ = 0;
        local_b8.refcount._4_4_ = 0;
        local_b8.elemsize._0_4_ = 0;
        local_b8.elemsize._4_4_ = 0;
        local_b8.elempack = 0;
        local_b8.dims = 0;
        local_b8.w = 0;
        local_b8.h = 0;
        local_b8.d = 0;
        local_b8.c = 0;
        bVar59 = false;
        pMVar44 = (Mat *)((ulong)pMVar44 & 0xffffffff);
      }
      else if (((bVar43 | (byte)iVar10 >> 1) & 1) == 0) {
        pAVar50 = opt->blob_allocator;
        if (iVar11 == 0) {
          Mat::create(top_blob,uVar15,(size_t)pMVar42,pAVar50);
          uVar14 = (uint)pAVar50;
        }
        else {
          pMVar16 = pMVar42;
          Mat::create(top_blob,1,uVar15,(size_t)pMVar42,pAVar50);
          uVar14 = (uint)pMVar16;
        }
        if (0 < (int)uVar15) {
          iVar10 = bottom_blob->w;
          sVar18 = bottom_blob->elemsize;
          pvVar39 = bottom_blob->data;
          pvVar55 = top_blob->data;
          pAVar50 = (Allocator *)0x0;
          do {
            auVar166 = ZEXT816(0x7f7fffff);
            if (0 < (int)uVar13) {
              uVar51 = 0;
              auVar166 = ZEXT816(0x7f7fffff);
              do {
                fVar60 = *(float *)((long)pvVar39 + uVar51 * 4);
                if (fVar60 <= auVar166._0_4_) {
                  auVar166._0_4_ = fVar60;
                }
                uVar51 = uVar51 + 1;
              } while (uVar35 != uVar51);
            }
            *(int *)((long)pvVar55 + (long)pAVar50 * 4) = auVar166._0_4_;
            pAVar50 = pAVar50 + 1;
            pvVar39 = (void *)((long)pvVar39 + (long)iVar10 * sVar18);
          } while (pAVar50 != pAVar36);
          goto LAB_0034cff6;
        }
        bVar59 = false;
        unaff_R15D = 0;
        pMVar44 = (Mat *)((ulong)pMVar44 & 0xffffffff);
        uVar41 = uVar41 & 0xffffffff;
      }
      else {
        bVar25 = bVar31 | (byte)iVar10;
        uVar14 = (uint)CONCAT11(uVar6,bVar25);
        if ((bVar25 & 1) == 0) {
          if (iVar11 == 0) {
            Mat::create(top_blob,uVar13,(size_t)pMVar42,opt->blob_allocator);
          }
          else {
            Mat::create(top_blob,uVar13,1,(size_t)pMVar42,opt->blob_allocator);
          }
          auVar264 = _DAT_00544250;
          auVar67 = _DAT_00544240;
          auVar79 = _DAT_0053f020;
          uVar14 = top_blob->c * (int)top_blob->cstep;
          pvVar39 = (void *)(ulong)uVar14;
          pvVar55 = top_blob->data;
          if (0 < (int)uVar14) {
            pvVar39 = (void *)(ulong)(uVar14 + 3 & 0xfffffffc);
            lVar56 = (ulong)uVar14 - 1;
            auVar73._8_4_ = (int)lVar56;
            auVar73._0_8_ = lVar56;
            auVar73._12_4_ = (int)((ulong)lVar56 >> 0x20);
            pvVar54 = (void *)0x0;
            auVar73 = auVar73 ^ _DAT_0053f020;
            do {
              auVar190._8_4_ = (int)pvVar54;
              auVar190._0_8_ = pvVar54;
              auVar190._12_4_ = (int)((ulong)pvVar54 >> 0x20);
              auVar255 = (auVar190 | auVar264) ^ auVar79;
              iVar10 = auVar73._4_4_;
              if ((bool)(~(iVar10 < auVar255._4_4_ ||
                          auVar73._0_4_ < auVar255._0_4_ && auVar255._4_4_ == iVar10) & 1)) {
                *(undefined4 *)((long)pvVar55 + (long)pvVar54 * 4) = 0x7f7fffff;
              }
              if (auVar255._12_4_ <= auVar73._12_4_ &&
                  (auVar255._8_4_ <= auVar73._8_4_ || auVar255._12_4_ != auVar73._12_4_)) {
                *(undefined4 *)((long)pvVar55 + (long)pvVar54 * 4 + 4) = 0x7f7fffff;
              }
              auVar255 = (auVar190 | auVar67) ^ auVar79;
              iVar265 = auVar255._4_4_;
              if (iVar265 <= iVar10 && (iVar265 != iVar10 || auVar255._0_4_ <= auVar73._0_4_)) {
                *(undefined4 *)((long)pvVar55 + (long)pvVar54 * 4 + 8) = 0x7f7fffff;
                *(undefined4 *)((long)pvVar55 + (long)pvVar54 * 4 + 0xc) = 0x7f7fffff;
              }
              pvVar54 = (void *)((long)pvVar54 + 4);
            } while (pvVar39 != pvVar54);
          }
          if (0 < (int)uVar15) {
            pvVar39 = bottom_blob->data;
            iVar10 = bottom_blob->w;
            sVar18 = bottom_blob->elemsize;
            pAVar50 = (Allocator *)0x0;
            do {
              if (0 < (int)uVar13) {
                uVar51 = 0;
                do {
                  fVar1 = *(float *)((long)pvVar39 + uVar51 * 4);
                  fVar60 = *(float *)((long)pvVar55 + uVar51 * 4);
                  if (fVar60 <= fVar1) {
                    fVar1 = fVar60;
                  }
                  *(float *)((long)pvVar55 + uVar51 * 4) = fVar1;
                  uVar51 = uVar51 + 1;
                } while (uVar35 != uVar51);
              }
              pAVar50 = pAVar50 + 1;
              pvVar39 = (void *)((long)pvVar39 + (long)iVar10 * sVar18);
            } while (pAVar50 != pAVar36);
          }
LAB_0034cff6:
          uVar14 = (uint)pvVar39;
          uVar41 = uVar41 & 0xffffffff;
          bVar59 = false;
          unaff_R15D = 0;
          pMVar44 = (Mat *)((ulong)pMVar44 & 0xffffffff);
        }
        else {
          bVar59 = true;
        }
      }
      if (!bVar59) break;
    }
    else if (uVar12 == 1) {
      iVar11 = bottom_blob->w;
      pMVar44 = (Mat *)0x1;
      Mat::create(top_blob,1,(size_t)pMVar42,opt->blob_allocator);
      if ((long)iVar11 < 1) {
        fVar60 = 3.4028235e+38;
      }
      else {
        fVar60 = 3.4028235e+38;
        lVar56 = 0;
        do {
          fVar1 = *(float *)((long)bottom_blob->data + lVar56 * 4);
          if (fVar1 <= fVar60) {
            fVar60 = fVar1;
          }
          lVar56 = lVar56 + 1;
        } while (iVar11 != lVar56);
      }
      goto LAB_0034bc6f;
    }
    bVar25 = (byte)uVar41;
    if (uVar12 == 3) {
      uVar14 = bottom_blob->w;
      lVar56 = (long)(int)uVar14;
      uVar13 = bottom_blob->h;
      uVar35 = (ulong)uVar13;
      uVar15 = bottom_blob->c;
      pMVar17 = (Mat *)(ulong)uVar15;
      uVar33 = uVar13 * uVar14;
      auVar74._8_4_ = 0xffffffff;
      auVar74._0_8_ = 0xffffffffffffffff;
      auVar74._12_4_ = 0xffffffff;
      auVar75._0_8_ = SUB168(auVar74 ^ auVar273,0) << 0x3f;
      auVar75._8_8_ = SUB168(auVar74 ^ auVar273,8) << 0x3f;
      iVar10 = movmskpd(uVar15,auVar75);
      pMVar16 = (Mat *)(uVar41 & 0xffffffff ^ 1);
      cVar26 = (char)pMVar16;
      if ((iVar10 != 0) || (cVar26 != '\0')) {
        if (iVar10 != 0 || bVar25 != 0) {
          uVar41 = (ulong)uVar14;
          bVar8 = (byte)iVar10 >> 1 | bVar43;
          if ((bVar8 & 1) == 0 && cVar26 == '\0') {
            if (iVar11 == 0) {
              Mat::create(top_blob,uVar13,(size_t)pMVar42,opt->blob_allocator);
            }
            else {
              Mat::create(top_blob,1,uVar13,1,(size_t)pMVar42,opt->blob_allocator);
            }
            local_b8.cstep = 0;
            local_b8.data = (Allocator *)0x0;
            local_b8.refcount._0_4_ = 0;
            local_b8.refcount._4_4_ = 0;
            local_b8.elemsize._0_4_ = 0;
            local_b8.elemsize._4_4_ = 0;
            local_b8.elempack = 0;
            local_b8.allocator = (Allocator *)0x0;
            local_b8.dims = 0;
            local_b8.w = 0;
            local_b8.h = 0;
            local_b8.d = 0;
            local_b8.c = 0;
            pMVar16 = pMVar17;
            Mat::create(&local_b8,1,uVar13,uVar15,(size_t)pMVar42,opt->workspace_allocator);
            auVar264 = _DAT_00544250;
            auVar67 = _DAT_00544240;
            auVar79 = _DAT_0053f020;
            unaff_R15D = -100;
            if (((Allocator *)local_b8.data != (Allocator *)0x0) &&
               (pMVar16 = (Mat *)local_b8.cstep, local_b8.cstep * (long)local_b8.c != 0)) {
              uVar33 = (int)local_b8.cstep * local_b8.c;
              if (0 < (int)uVar33) {
                lVar20 = (ulong)uVar33 - 1;
                auVar82._8_4_ = (int)lVar20;
                auVar82._0_8_ = lVar20;
                auVar82._12_4_ = (int)((ulong)lVar20 >> 0x20);
                uVar51 = 0;
                auVar82 = auVar82 ^ _DAT_0053f020;
                do {
                  auVar194._8_4_ = (int)uVar51;
                  auVar194._0_8_ = uVar51;
                  auVar194._12_4_ = (int)(uVar51 >> 0x20);
                  auVar255 = (auVar194 | auVar264) ^ auVar79;
                  iVar10 = auVar82._4_4_;
                  if ((bool)(~(iVar10 < auVar255._4_4_ ||
                              auVar82._0_4_ < auVar255._0_4_ && auVar255._4_4_ == iVar10) & 1)) {
                    *(undefined4 *)((long)local_b8.data + uVar51 * 4) = 0x7f7fffff;
                  }
                  if (auVar255._12_4_ <= auVar82._12_4_ &&
                      (auVar255._8_4_ <= auVar82._8_4_ || auVar255._12_4_ != auVar82._12_4_)) {
                    *(undefined4 *)((long)local_b8.data + uVar51 * 4 + 4) = 0x7f7fffff;
                  }
                  auVar255 = (auVar194 | auVar67) ^ auVar79;
                  iVar265 = auVar255._4_4_;
                  if (iVar265 <= iVar10 && (iVar265 != iVar10 || auVar255._0_4_ <= auVar82._0_4_)) {
                    *(undefined4 *)((long)local_b8.data + uVar51 * 4 + 8) = 0x7f7fffff;
                    *(undefined4 *)((long)local_b8.data + uVar51 * 4 + 0xc) = 0x7f7fffff;
                  }
                  uVar51 = uVar51 + 4;
                } while ((uVar33 + 3 & 0xfffffffc) != uVar51);
              }
              if (0 < (int)uVar15) {
                pvVar39 = bottom_blob->data;
                sVar18 = bottom_blob->elemsize;
                sVar21 = bottom_blob->cstep;
                pMVar29 = (Mat *)0x0;
                do {
                  if (0 < (int)uVar13) {
                    uVar51 = 0;
                    pvVar55 = pvVar39;
                    do {
                      auVar175 = ZEXT816(0x7f7fffff);
                      if (0 < (int)uVar14) {
                        uVar57 = 0;
                        auVar175 = ZEXT816(0x7f7fffff);
                        do {
                          fVar60 = *(float *)((long)pvVar55 + uVar57 * 4);
                          if (fVar60 <= auVar175._0_4_) {
                            auVar175._0_4_ = fVar60;
                          }
                          uVar57 = uVar57 + 1;
                        } while (uVar41 != uVar57);
                      }
                      *(int *)((long)local_b8.data +
                              uVar51 * 4 +
                              CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize) *
                              local_b8.cstep * (long)pMVar29) = auVar175._0_4_;
                      uVar51 = uVar51 + 1;
                      pvVar55 = (void *)((long)pvVar55 + lVar56 * 4);
                    } while (uVar51 != uVar35);
                  }
                  pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                  pvVar39 = (void *)((long)pvVar39 + sVar18 * sVar21);
                } while (pMVar29 != pMVar17);
              }
              auVar264 = _DAT_00544250;
              auVar67 = _DAT_00544240;
              auVar79 = _DAT_0053f020;
              uVar14 = top_blob->c * (int)top_blob->cstep;
              if (0 < (int)uVar14) {
                pvVar39 = top_blob->data;
                lVar56 = (ulong)uVar14 - 1;
                auVar83._8_4_ = (int)lVar56;
                auVar83._0_8_ = lVar56;
                auVar83._12_4_ = (int)((ulong)lVar56 >> 0x20);
                uVar41 = 0;
                auVar83 = auVar83 ^ _DAT_0053f020;
                do {
                  auVar195._8_4_ = (int)uVar41;
                  auVar195._0_8_ = uVar41;
                  auVar195._12_4_ = (int)(uVar41 >> 0x20);
                  auVar255 = (auVar195 | auVar264) ^ auVar79;
                  iVar10 = auVar83._4_4_;
                  if ((bool)(~(iVar10 < auVar255._4_4_ ||
                              auVar83._0_4_ < auVar255._0_4_ && auVar255._4_4_ == iVar10) & 1)) {
                    *(undefined4 *)((long)pvVar39 + uVar41 * 4) = 0x7f7fffff;
                  }
                  if (auVar255._12_4_ <= auVar83._12_4_ &&
                      (auVar255._8_4_ <= auVar83._8_4_ || auVar255._12_4_ != auVar83._12_4_)) {
                    *(undefined4 *)((long)pvVar39 + uVar41 * 4 + 4) = 0x7f7fffff;
                  }
                  auVar255 = (auVar195 | auVar67) ^ auVar79;
                  iVar265 = auVar255._4_4_;
                  if (iVar265 <= iVar10 && (iVar265 != iVar10 || auVar255._0_4_ <= auVar83._0_4_)) {
                    *(undefined4 *)((long)pvVar39 + uVar41 * 4 + 8) = 0x7f7fffff;
                    *(undefined4 *)((long)pvVar39 + uVar41 * 4 + 0xc) = 0x7f7fffff;
                  }
                  uVar41 = uVar41 + 4;
                } while ((uVar14 + 3 & 0xfffffffc) != uVar41);
              }
              if (0 < (int)uVar15) {
                pMVar16 = (Mat *)(local_b8.cstep *
                                 CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize));
                pvVar39 = top_blob->data;
                pMVar29 = (Mat *)0x0;
                pAVar36 = (Allocator *)local_b8.data;
                do {
                  if (0 < (int)uVar13) {
                    uVar41 = 0;
                    do {
                      fVar60 = *(float *)((long)pvVar39 + uVar41 * 4);
                      fVar1 = *(float *)(pAVar36 + uVar41 * 4);
                      if (fVar60 <= *(float *)(pAVar36 + uVar41 * 4)) {
                        fVar1 = fVar60;
                      }
                      *(float *)((long)pvVar39 + uVar41 * 4) = fVar1;
                      uVar41 = uVar41 + 1;
                    } while (uVar35 != uVar41);
                  }
                  pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                  pAVar36 = pAVar36 + (long)pMVar16;
                } while (pMVar29 != pMVar17);
              }
              unaff_R15D = 0;
            }
            piVar7 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
            if (piVar7 != (int *)0x0) {
              LOCK();
              *piVar7 = *piVar7 + -1;
              UNLOCK();
              if (*piVar7 == 0) {
                if (local_b8.allocator == (Allocator *)0x0) {
LAB_00350c89:
                  if ((Allocator *)local_b8.data != (Allocator *)0x0) {
                    free(local_b8.data);
                  }
                }
                else {
                  (**(code **)(*(long *)local_b8.allocator + 0x18))();
                }
              }
            }
          }
          else {
            bVar9 = (byte)iVar10 | bVar31;
            if ((bVar9 & 1) != 0 || cVar26 != '\0') {
              if ((bVar8 & 1) == 0 && bVar25 == 0) {
                if (iVar11 == 0) {
                  pMVar16 = pMVar42;
                  Mat::create(top_blob,uVar13,uVar15,(size_t)pMVar42,opt->blob_allocator);
                }
                else {
                  pMVar16 = pMVar17;
                  Mat::create(top_blob,1,uVar13,uVar15,(size_t)pMVar42,opt->blob_allocator);
                }
                if ((int)uVar15 < 1) {
                  bVar59 = false;
                  unaff_R15D = 0;
                }
                else {
                  sVar18 = bottom_blob->elemsize;
                  if (iVar11 == 0) {
                    sVar21 = (size_t)top_blob->w;
                  }
                  else {
                    sVar21 = top_blob->cstep;
                  }
                  pvVar39 = bottom_blob->data;
                  sVar22 = top_blob->elemsize;
                  sVar5 = bottom_blob->cstep;
                  pvVar55 = top_blob->data;
                  pMVar29 = (Mat *)0x0;
                  unaff_R15D = 0;
                  do {
                    if (0 < (int)uVar13) {
                      uVar51 = 0;
                      pvVar54 = pvVar39;
                      do {
                        auVar181 = ZEXT816(0x7f7fffff);
                        if (0 < (int)uVar14) {
                          uVar57 = 0;
                          auVar181 = ZEXT816(0x7f7fffff);
                          do {
                            fVar60 = *(float *)((long)pvVar54 + uVar57 * 4);
                            if (fVar60 <= auVar181._0_4_) {
                              auVar181._0_4_ = fVar60;
                            }
                            uVar57 = uVar57 + 1;
                          } while (uVar41 != uVar57);
                        }
                        *(int *)((long)pvVar55 + uVar51 * 4 + sVar21 * sVar22 * (long)pMVar29) =
                             auVar181._0_4_;
                        uVar51 = uVar51 + 1;
                        pvVar54 = (void *)((long)pvVar54 + lVar56 * 4);
                      } while (uVar51 != uVar35);
                    }
                    pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                    pvVar39 = (void *)((long)pvVar39 + sVar18 * sVar5);
                    bVar59 = false;
                    pMVar16 = top_blob;
                  } while (pMVar29 != pMVar17);
                }
              }
              else if (((bVar43 | bVar31) & 1) == 0 && cVar26 == '\0') {
                if (iVar11 == 0) {
                  pMVar16 = pMVar42;
                  Mat::create(top_blob,uVar14,uVar13,(size_t)pMVar42,opt->blob_allocator);
                }
                else {
                  pMVar16 = (Mat *)0x1;
                  Mat::create(top_blob,uVar14,uVar13,1,(size_t)pMVar42,opt->blob_allocator);
                }
                auVar264 = _DAT_00544250;
                auVar67 = _DAT_00544240;
                auVar79 = _DAT_0053f020;
                uVar14 = top_blob->c * (int)top_blob->cstep;
                if (0 < (int)uVar14) {
                  pMVar16 = (Mat *)top_blob->data;
                  lVar56 = (ulong)uVar14 - 1;
                  auVar120._8_4_ = (int)lVar56;
                  auVar120._0_8_ = lVar56;
                  auVar120._12_4_ = (int)((ulong)lVar56 >> 0x20);
                  uVar41 = 0;
                  auVar120 = auVar120 ^ _DAT_0053f020;
                  do {
                    auVar223._8_4_ = (int)uVar41;
                    auVar223._0_8_ = uVar41;
                    auVar223._12_4_ = (int)(uVar41 >> 0x20);
                    auVar255 = (auVar223 | auVar264) ^ auVar79;
                    iVar10 = auVar120._4_4_;
                    if ((bool)(~(iVar10 < auVar255._4_4_ ||
                                auVar120._0_4_ < auVar255._0_4_ && auVar255._4_4_ == iVar10) & 1)) {
                      *(undefined4 *)((long)&pMVar16->data + uVar41 * 4) = 0x7f7fffff;
                    }
                    if (auVar255._12_4_ <= auVar120._12_4_ &&
                        (auVar255._8_4_ <= auVar120._8_4_ || auVar255._12_4_ != auVar120._12_4_)) {
                      *(undefined4 *)((long)&pMVar16->data + uVar41 * 4 + 4) = 0x7f7fffff;
                    }
                    auVar255 = (auVar223 | auVar67) ^ auVar79;
                    iVar265 = auVar255._4_4_;
                    if (iVar265 <= iVar10 && (iVar265 != iVar10 || auVar255._0_4_ <= auVar120._0_4_)
                       ) {
                      *(undefined4 *)((long)&pMVar16->refcount + uVar41 * 4) = 0x7f7fffff;
                      *(undefined4 *)((long)&pMVar16->refcount + uVar41 * 4 + 4) = 0x7f7fffff;
                    }
                    uVar41 = uVar41 + 4;
                  } while ((uVar14 + 3 & 0xfffffffc) != uVar41);
                }
                if ((int)uVar15 < 1) {
LAB_00354d46:
                  bVar59 = false;
                  unaff_R15D = 0;
                }
                else {
                  sVar18 = bottom_blob->elemsize;
                  sVar21 = bottom_blob->cstep;
                  pMVar16 = (Mat *)bottom_blob->data;
                  pvVar39 = top_blob->data;
                  pMVar29 = (Mat *)0x0;
                  unaff_R15D = 0;
                  do {
                    if (0 < (int)uVar33) {
                      uVar41 = 0;
                      do {
                        fVar1 = *(float *)((long)&pMVar16->data + uVar41 * 4);
                        fVar60 = *(float *)((long)pvVar39 + uVar41 * 4);
                        if (fVar60 <= fVar1) {
                          fVar1 = fVar60;
                        }
                        *(float *)((long)pvVar39 + uVar41 * 4) = fVar1;
                        uVar41 = uVar41 + 1;
                      } while (uVar33 != uVar41);
                    }
                    pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                    pMVar16 = (Mat *)((long)&pMVar16->data + sVar18 * sVar21);
                    bVar59 = false;
                  } while (pMVar29 != pMVar17);
                }
              }
              else {
                bVar59 = true;
                if ((bVar9 & 1) == 0 && bVar25 == 0) {
                  if (iVar11 == 0) {
                    Mat::create(top_blob,uVar14,uVar15,(size_t)pMVar42,opt->blob_allocator);
                  }
                  else {
                    Mat::create(top_blob,uVar14,1,uVar15,(size_t)pMVar42,opt->blob_allocator);
                  }
                  auVar264 = _DAT_00544250;
                  auVar67 = _DAT_00544240;
                  auVar79 = _DAT_0053f020;
                  sVar18 = top_blob->cstep;
                  uVar33 = top_blob->c * (int)sVar18;
                  pMVar16 = (Mat *)(ulong)uVar33;
                  if (0 < (int)uVar33) {
                    pvVar39 = top_blob->data;
                    pMVar16 = (Mat *)(ulong)(uVar33 + 3 & 0xfffffffc);
                    lVar56 = (ulong)uVar33 - 1;
                    auVar123._8_4_ = (int)lVar56;
                    auVar123._0_8_ = lVar56;
                    auVar123._12_4_ = (int)((ulong)lVar56 >> 0x20);
                    pMVar29 = (Mat *)0x0;
                    auVar123 = auVar123 ^ _DAT_0053f020;
                    do {
                      auVar226._8_4_ = (int)pMVar29;
                      auVar226._0_8_ = pMVar29;
                      auVar226._12_4_ = (int)((ulong)pMVar29 >> 0x20);
                      auVar255 = (auVar226 | auVar264) ^ auVar79;
                      iVar10 = auVar123._4_4_;
                      if ((bool)(~(iVar10 < auVar255._4_4_ ||
                                  auVar123._0_4_ < auVar255._0_4_ && auVar255._4_4_ == iVar10) & 1))
                      {
                        *(undefined4 *)((long)pvVar39 + (long)pMVar29 * 4) = 0x7f7fffff;
                      }
                      if (auVar255._12_4_ <= auVar123._12_4_ &&
                          (auVar255._8_4_ <= auVar123._8_4_ || auVar255._12_4_ != auVar123._12_4_))
                      {
                        *(undefined4 *)((long)pvVar39 + (long)pMVar29 * 4 + 4) = 0x7f7fffff;
                      }
                      auVar255 = (auVar226 | auVar67) ^ auVar79;
                      iVar265 = auVar255._4_4_;
                      if (iVar265 <= iVar10 &&
                          (iVar265 != iVar10 || auVar255._0_4_ <= auVar123._0_4_)) {
                        *(undefined4 *)((long)pvVar39 + (long)pMVar29 * 4 + 8) = 0x7f7fffff;
                        *(undefined4 *)((long)pvVar39 + (long)pMVar29 * 4 + 0xc) = 0x7f7fffff;
                      }
                      pMVar29 = (Mat *)((long)&pMVar29->data + 4);
                    } while (pMVar16 != pMVar29);
                  }
                  if ((int)uVar15 < 1) goto LAB_00354d46;
                  pAVar36 = (Allocator *)bottom_blob->data;
                  sVar21 = bottom_blob->elemsize;
                  pvVar39 = top_blob->data;
                  if (iVar11 == 0) {
                    sVar18 = (long)top_blob->w;
                  }
                  sVar22 = top_blob->elemsize;
                  sVar5 = bottom_blob->cstep;
                  pMVar16 = (Mat *)((long)(int)uVar14 * 4);
                  pMVar29 = (Mat *)0x0;
                  unaff_R15D = 0;
                  do {
                    if (0 < (int)uVar13) {
                      uVar15 = 0;
                      pAVar50 = pAVar36;
                      do {
                        if (0 < (int)uVar14) {
                          uVar35 = 0;
                          do {
                            fVar60 = *(float *)((long)pvVar39 + uVar35 * 4);
                            fVar1 = *(float *)(pAVar50 + uVar35 * 4);
                            if (fVar60 <= *(float *)(pAVar50 + uVar35 * 4)) {
                              fVar1 = fVar60;
                            }
                            *(float *)((long)pvVar39 + uVar35 * 4) = fVar1;
                            uVar35 = uVar35 + 1;
                          } while (uVar41 != uVar35);
                        }
                        uVar15 = uVar15 + 1;
                        pAVar50 = pAVar50 + (long)pMVar16;
                      } while (uVar15 != uVar13);
                    }
                    pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                    pAVar36 = pAVar36 + sVar21 * sVar5;
                    pvVar39 = (void *)((long)pvVar39 + sVar18 * sVar22);
                    bVar59 = false;
                  } while (pMVar29 != pMVar17);
                }
              }
              goto LAB_00350cc9;
            }
            if (iVar11 == 0) {
              Mat::create(top_blob,uVar14,(size_t)pMVar42,opt->blob_allocator);
            }
            else {
              Mat::create(top_blob,uVar14,1,1,(size_t)pMVar42,opt->blob_allocator);
            }
            local_b8.cstep = 0;
            local_b8.data = (Allocator *)0x0;
            local_b8.refcount._0_4_ = 0;
            local_b8.refcount._4_4_ = 0;
            local_b8.elemsize._0_4_ = 0;
            local_b8.elemsize._4_4_ = 0;
            local_b8.elempack = 0;
            local_b8.allocator = (Allocator *)0x0;
            local_b8.dims = 0;
            local_b8.w = 0;
            local_b8.h = 0;
            local_b8.d = 0;
            local_b8.c = 0;
            pMVar16 = pMVar17;
            Mat::create(&local_b8,uVar14,1,uVar15,(size_t)pMVar42,opt->workspace_allocator);
            auVar264 = _DAT_00544250;
            auVar67 = _DAT_00544240;
            auVar79 = _DAT_0053f020;
            unaff_R15D = -100;
            if (((Allocator *)local_b8.data != (Allocator *)0x0) &&
               (pMVar16 = (Mat *)local_b8.cstep, local_b8.cstep * (long)local_b8.c != 0)) {
              uVar33 = (int)local_b8.cstep * local_b8.c;
              if (0 < (int)uVar33) {
                lVar20 = (ulong)uVar33 - 1;
                auVar88._8_4_ = (int)lVar20;
                auVar88._0_8_ = lVar20;
                auVar88._12_4_ = (int)((ulong)lVar20 >> 0x20);
                uVar35 = 0;
                auVar88 = auVar88 ^ _DAT_0053f020;
                do {
                  auVar200._8_4_ = (int)uVar35;
                  auVar200._0_8_ = uVar35;
                  auVar200._12_4_ = (int)(uVar35 >> 0x20);
                  auVar255 = (auVar200 | auVar264) ^ auVar79;
                  iVar10 = auVar88._4_4_;
                  if ((bool)(~(iVar10 < auVar255._4_4_ ||
                              auVar88._0_4_ < auVar255._0_4_ && auVar255._4_4_ == iVar10) & 1)) {
                    *(undefined4 *)((long)local_b8.data + uVar35 * 4) = 0x7f7fffff;
                  }
                  if (auVar255._12_4_ <= auVar88._12_4_ &&
                      (auVar255._8_4_ <= auVar88._8_4_ || auVar255._12_4_ != auVar88._12_4_)) {
                    *(undefined4 *)((long)local_b8.data + uVar35 * 4 + 4) = 0x7f7fffff;
                  }
                  auVar255 = (auVar200 | auVar67) ^ auVar79;
                  iVar265 = auVar255._4_4_;
                  if (iVar265 <= iVar10 && (iVar265 != iVar10 || auVar255._0_4_ <= auVar88._0_4_)) {
                    *(undefined4 *)((long)local_b8.data + uVar35 * 4 + 8) = 0x7f7fffff;
                    *(undefined4 *)((long)local_b8.data + uVar35 * 4 + 0xc) = 0x7f7fffff;
                  }
                  uVar35 = uVar35 + 4;
                } while ((uVar33 + 3 & 0xfffffffc) != uVar35);
              }
              if (0 < (int)uVar15) {
                pvVar39 = bottom_blob->data;
                sVar18 = bottom_blob->elemsize;
                sVar21 = bottom_blob->cstep;
                pMVar29 = (Mat *)0x0;
                pAVar36 = (Allocator *)local_b8.data;
                do {
                  if (0 < (int)uVar13) {
                    uVar33 = 0;
                    pvVar55 = pvVar39;
                    do {
                      if (0 < (int)uVar14) {
                        uVar35 = 0;
                        do {
                          fVar60 = *(float *)((long)pvVar55 + uVar35 * 4);
                          if (*(float *)(pAVar36 + uVar35 * 4) <= fVar60) {
                            fVar60 = *(float *)(pAVar36 + uVar35 * 4);
                          }
                          *(float *)(pAVar36 + uVar35 * 4) = fVar60;
                          uVar35 = uVar35 + 1;
                        } while (uVar41 != uVar35);
                      }
                      uVar33 = uVar33 + 1;
                      pvVar55 = (void *)((long)pvVar55 + lVar56 * 4);
                    } while (uVar33 != uVar13);
                  }
                  pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                  pvVar39 = (void *)((long)pvVar39 + sVar18 * sVar21);
                  pAVar36 = pAVar36 + CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize) *
                                      local_b8.cstep;
                } while (pMVar29 != pMVar17);
              }
              auVar264 = _DAT_00544250;
              auVar67 = _DAT_00544240;
              auVar79 = _DAT_0053f020;
              uVar13 = top_blob->c * (int)top_blob->cstep;
              if (0 < (int)uVar13) {
                pvVar39 = top_blob->data;
                lVar56 = (ulong)uVar13 - 1;
                auVar89._8_4_ = (int)lVar56;
                auVar89._0_8_ = lVar56;
                auVar89._12_4_ = (int)((ulong)lVar56 >> 0x20);
                uVar35 = 0;
                auVar89 = auVar89 ^ _DAT_0053f020;
                do {
                  auVar201._8_4_ = (int)uVar35;
                  auVar201._0_8_ = uVar35;
                  auVar201._12_4_ = (int)(uVar35 >> 0x20);
                  auVar255 = (auVar201 | auVar264) ^ auVar79;
                  iVar10 = auVar89._4_4_;
                  if ((bool)(~(iVar10 < auVar255._4_4_ ||
                              auVar89._0_4_ < auVar255._0_4_ && auVar255._4_4_ == iVar10) & 1)) {
                    *(undefined4 *)((long)pvVar39 + uVar35 * 4) = 0x7f7fffff;
                  }
                  if (auVar255._12_4_ <= auVar89._12_4_ &&
                      (auVar255._8_4_ <= auVar89._8_4_ || auVar255._12_4_ != auVar89._12_4_)) {
                    *(undefined4 *)((long)pvVar39 + uVar35 * 4 + 4) = 0x7f7fffff;
                  }
                  auVar255 = (auVar201 | auVar67) ^ auVar79;
                  iVar265 = auVar255._4_4_;
                  if (iVar265 <= iVar10 && (iVar265 != iVar10 || auVar255._0_4_ <= auVar89._0_4_)) {
                    *(undefined4 *)((long)pvVar39 + uVar35 * 4 + 8) = 0x7f7fffff;
                    *(undefined4 *)((long)pvVar39 + uVar35 * 4 + 0xc) = 0x7f7fffff;
                  }
                  uVar35 = uVar35 + 4;
                } while ((uVar13 + 3 & 0xfffffffc) != uVar35);
              }
              if (0 < (int)uVar15) {
                pMVar16 = (Mat *)(local_b8.cstep *
                                 CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize));
                pvVar39 = top_blob->data;
                pMVar29 = (Mat *)0x0;
                pAVar36 = (Allocator *)local_b8.data;
                do {
                  if (0 < (int)uVar14) {
                    uVar35 = 0;
                    do {
                      fVar60 = *(float *)((long)pvVar39 + uVar35 * 4);
                      fVar1 = *(float *)(pAVar36 + uVar35 * 4);
                      if (fVar60 <= *(float *)(pAVar36 + uVar35 * 4)) {
                        fVar1 = fVar60;
                      }
                      *(float *)((long)pvVar39 + uVar35 * 4) = fVar1;
                      uVar35 = uVar35 + 1;
                    } while (uVar41 != uVar35);
                  }
                  pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                  pAVar36 = pAVar36 + (long)pMVar16;
                } while (pMVar29 != pMVar17);
              }
              unaff_R15D = 0;
            }
            piVar7 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
            if (piVar7 != (int *)0x0) {
              LOCK();
              *piVar7 = *piVar7 + -1;
              UNLOCK();
              if (*piVar7 == 0) {
                if (local_b8.allocator == (Allocator *)0x0) goto LAB_00350c89;
                (**(code **)(*(long *)local_b8.allocator + 0x18))();
              }
            }
          }
          goto LAB_00350ca2;
        }
        pMVar16 = (Mat *)opt->blob_allocator;
        if (iVar11 == 0) {
          Mat::create(top_blob,uVar15,(size_t)pMVar42,(Allocator *)pMVar16);
        }
        else {
          pMVar29 = pMVar17;
          Mat::create(top_blob,1,1,uVar15,(size_t)pMVar42,(Allocator *)pMVar16);
          pMVar16 = pMVar29;
        }
        if ((int)uVar15 < 1) {
          bVar59 = false;
          unaff_R15D = 0;
        }
        else {
          pAVar36 = (Allocator *)bottom_blob->data;
          pvVar39 = top_blob->data;
          sVar18 = top_blob->elemsize;
          sVar21 = top_blob->cstep;
          pMVar16 = (Mat *)(bottom_blob->elemsize * bottom_blob->cstep);
          pMVar29 = (Mat *)0x0;
          do {
            auVar171 = ZEXT816(0x7f7fffff);
            if (0 < (int)uVar33) {
              uVar41 = 0;
              auVar171 = ZEXT816(0x7f7fffff);
              do {
                if (*(float *)(pAVar36 + uVar41 * 4) <= auVar171._0_4_) {
                  auVar171._0_4_ = *(float *)(pAVar36 + uVar41 * 4);
                }
                uVar41 = uVar41 + 1;
              } while (uVar33 != uVar41);
            }
            lVar56 = sVar18 * sVar21 * (long)pMVar29;
            if (iVar11 == 0) {
              lVar56 = (long)pMVar29 * 4;
            }
            *(int *)((long)pvVar39 + lVar56) = auVar171._0_4_;
            pMVar29 = (Mat *)((long)&pMVar29->data + 1);
            pAVar36 = pAVar36 + (long)pMVar16;
          } while (pMVar29 != pMVar17);
          bVar59 = false;
          unaff_R15D = 0;
        }
      }
      else {
        if (iVar11 == 0) {
          Mat::create(top_blob,1,(size_t)pMVar42,opt->blob_allocator);
        }
        else {
          Mat::create(top_blob,1,1,1,(size_t)pMVar42,opt->blob_allocator);
        }
        pMVar16 = (Mat *)opt->workspace_allocator;
        local_b8.cstep = 0;
        local_b8.data = (void *)0x0;
        local_b8.refcount._0_4_ = 0;
        local_b8.refcount._4_4_ = 0;
        local_b8.elemsize._0_4_ = 0;
        local_b8.elemsize._4_4_ = 0;
        local_b8.elempack = 0;
        local_b8.allocator = (Allocator *)0x0;
        local_b8.dims = 0;
        local_b8.w = 0;
        local_b8.h = 0;
        local_b8.d = 0;
        local_b8.c = 0;
        Mat::create(&local_b8,uVar15,(size_t)pMVar42,(Allocator *)pMVar16);
        unaff_R15D = -100;
        if ((local_b8.data != (void *)0x0) &&
           (pMVar16 = (Mat *)((long)local_b8.c * local_b8.cstep), pMVar16 != (Mat *)0x0)) {
          if ((int)uVar15 < 1) {
            fVar60 = 3.4028235e+38;
          }
          else {
            sVar18 = bottom_blob->elemsize;
            sVar21 = bottom_blob->cstep;
            pvVar39 = bottom_blob->data;
            pMVar16 = (Mat *)0x0;
            do {
              auVar170 = ZEXT816(0x7f7fffff);
              if (0 < (int)uVar33) {
                uVar41 = 0;
                auVar170 = ZEXT816(0x7f7fffff);
                do {
                  fVar60 = *(float *)((long)pvVar39 + uVar41 * 4);
                  if (fVar60 <= auVar170._0_4_) {
                    auVar170._0_4_ = fVar60;
                  }
                  uVar41 = uVar41 + 1;
                } while (uVar33 != uVar41);
              }
              *(int *)((long)local_b8.data + (long)pMVar16 * 4) = auVar170._0_4_;
              pMVar16 = (Mat *)((long)&pMVar16->data + 1);
              pvVar39 = (void *)((long)pvVar39 + sVar18 * sVar21);
            } while (pMVar16 != pMVar17);
            fVar60 = 3.4028235e+38;
            pMVar16 = (Mat *)0x0;
            do {
              fVar1 = *(float *)((long)local_b8.data + (long)pMVar16 * 4);
              if (fVar1 <= fVar60) {
                fVar60 = fVar1;
              }
              pMVar16 = (Mat *)((long)&pMVar16->data + 1);
            } while (pMVar17 != pMVar16);
          }
          *(float *)top_blob->data = fVar60;
          unaff_R15D = 0;
        }
        piVar7 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            if (local_b8.allocator == (Allocator *)0x0) {
              if (local_b8.data != (void *)0x0) {
                free(local_b8.data);
              }
            }
            else {
              (**(code **)(*(long *)local_b8.allocator + 0x18))();
            }
          }
        }
LAB_00350ca2:
        local_b8.cstep = 0;
        local_b8.data = (void *)0x0;
        local_b8.refcount._0_4_ = 0;
        local_b8.refcount._4_4_ = 0;
        local_b8.elemsize._0_4_ = 0;
        local_b8.elemsize._4_4_ = 0;
        local_b8.elempack = 0;
        local_b8.dims = 0;
        local_b8.w = 0;
        local_b8.h = 0;
        local_b8.d = 0;
        local_b8.c = 0;
        bVar59 = false;
      }
LAB_00350cc9:
      uVar14 = (uint)pMVar16;
      pMVar44 = (Mat *)((ulong)pMVar44 & 0xffffffff);
      if (!bVar59) break;
    }
    if (uVar12 != 4) goto LAB_00358731;
    uVar12 = bottom_blob->w;
    lVar56 = (long)(int)uVar12;
    uVar13 = bottom_blob->h;
    uVar35 = (ulong)uVar13;
    uVar15 = bottom_blob->d;
    uVar51 = (ulong)uVar15;
    uVar33 = bottom_blob->c;
    uVar41 = (ulong)uVar33;
    uVar53 = uVar13 * uVar12;
    uVar34 = uVar53 * uVar15;
    auVar97._8_4_ = 0xffffffff;
    auVar97._0_8_ = 0xffffffffffffffff;
    auVar97._12_4_ = 0xffffffff;
    auVar98._0_8_ = SUB168(auVar97 ^ auVar273,0) << 0x3f;
    auVar98._8_8_ = SUB168(auVar97 ^ auVar273,8) << 0x3f;
    iVar10 = movmskpd(uVar14,auVar98);
    bVar59 = iVar10 == 0;
    bVar8 = (byte)pMVar44;
    bVar9 = bVar8 ^ 1;
    bVar32 = bVar25 ^ 1;
    if ((bVar59 && bVar9 == 0) && (bVar32 == 0)) {
      if (iVar11 == 0) {
        Mat::create(top_blob,1,(size_t)pMVar42,opt->blob_allocator);
      }
      else {
        Mat::create(top_blob,1,1,1,1,(size_t)pMVar42,opt->blob_allocator);
      }
      local_b8.cstep = 0;
      local_b8.data = (void *)0x0;
      local_b8.refcount._0_4_ = 0;
      local_b8.refcount._4_4_ = 0;
      local_b8.elemsize._0_4_ = 0;
      local_b8.elemsize._4_4_ = 0;
      local_b8.elempack = 0;
      local_b8.allocator = (Allocator *)0x0;
      local_b8.dims = 0;
      local_b8.w = 0;
      local_b8.h = 0;
      local_b8.d = 0;
      local_b8.c = 0;
      Mat::create(&local_b8,uVar33,(size_t)pMVar42,opt->workspace_allocator);
      unaff_R15D = -100;
      if ((local_b8.data != (void *)0x0) && ((long)local_b8.c * local_b8.cstep != 0)) {
        if ((int)uVar33 < 1) {
          fVar60 = 3.4028235e+38;
        }
        else {
          sVar18 = bottom_blob->elemsize;
          sVar21 = bottom_blob->cstep;
          pvVar39 = bottom_blob->data;
          uVar35 = 0;
          do {
            fVar60 = 3.4028235e+38;
            if (0 < (int)uVar34) {
              uVar51 = 0;
              fVar60 = 3.4028235e+38;
              do {
                fVar1 = *(float *)((long)pvVar39 + uVar51 * 4);
                if (fVar1 <= fVar60) {
                  fVar60 = fVar1;
                }
                uVar51 = uVar51 + 1;
              } while (uVar34 != uVar51);
            }
            *(float *)((long)local_b8.data + uVar35 * 4) = fVar60;
            uVar35 = uVar35 + 1;
            pvVar39 = (void *)((long)pvVar39 + sVar18 * sVar21);
          } while (uVar35 != uVar41);
          fVar60 = 3.4028235e+38;
          uVar35 = 0;
          do {
            fVar1 = *(float *)((long)local_b8.data + uVar35 * 4);
            if (fVar1 <= fVar60) {
              fVar60 = fVar1;
            }
            uVar35 = uVar35 + 1;
          } while (uVar41 != uVar35);
        }
        *(float *)top_blob->data = fVar60;
        unaff_R15D = 0;
      }
      piVar7 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + -1;
        UNLOCK();
        if (*piVar7 == 0) {
          if (local_b8.allocator == (Allocator *)0x0) goto LAB_003586f3;
          (**(code **)(*(long *)local_b8.allocator + 0x18))();
        }
      }
      goto LAB_00358700;
    }
    if ((bVar59 && bVar9 == 0) && bVar25 == 0) {
      if (iVar11 == 0) {
        Mat::create(top_blob,uVar33,(size_t)pMVar42,opt->blob_allocator);
      }
      else {
        Mat::create(top_blob,1,1,1,uVar33,(size_t)pMVar42,opt->blob_allocator);
      }
      if (0 < (int)uVar33) {
        pvVar39 = bottom_blob->data;
        sVar18 = bottom_blob->elemsize;
        pvVar55 = top_blob->data;
        sVar21 = top_blob->elemsize;
        sVar22 = top_blob->cstep;
        sVar5 = bottom_blob->cstep;
        uVar35 = 0;
        do {
          fVar60 = 3.4028235e+38;
          if (0 < (int)uVar34) {
            uVar51 = 0;
            fVar60 = 3.4028235e+38;
            do {
              fVar1 = *(float *)((long)pvVar39 + uVar51 * 4);
              if (fVar1 <= fVar60) {
                fVar60 = fVar1;
              }
              uVar51 = uVar51 + 1;
            } while (uVar34 != uVar51);
          }
          lVar56 = sVar21 * sVar22 * uVar35;
          if (iVar11 == 0) {
            lVar56 = uVar35 * 4;
          }
          *(float *)((long)pvVar55 + lVar56) = fVar60;
          uVar35 = uVar35 + 1;
          pvVar39 = (void *)((long)pvVar39 + sVar18 * sVar5);
        } while (uVar35 != uVar41);
      }
      goto LAB_003519f4;
    }
    if ((bVar59 && bVar8 == 0) && bVar32 == 0) {
      if (iVar11 == 0) {
        Mat::create(top_blob,uVar15,(size_t)pMVar42,opt->blob_allocator);
      }
      else {
        Mat::create(top_blob,1,1,uVar15,1,(size_t)pMVar42,opt->blob_allocator);
      }
      local_b8.cstep = 0;
      local_b8.data = (void *)0x0;
      local_b8.refcount._0_4_ = 0;
      local_b8.refcount._4_4_ = 0;
      local_b8.elemsize._0_4_ = 0;
      local_b8.elemsize._4_4_ = 0;
      local_b8.elempack = 0;
      local_b8.allocator = (Allocator *)0x0;
      local_b8.dims = 0;
      local_b8.w = 0;
      local_b8.h = 0;
      local_b8.d = 0;
      local_b8.c = 0;
      Mat::create(&local_b8,1,uVar15,uVar33,(size_t)pMVar42,opt->workspace_allocator);
      auVar67 = _DAT_00544250;
      auVar79 = _DAT_00544240;
      auVar273 = _DAT_0053f020;
      unaff_R15D = -100;
      if ((local_b8.data != (void *)0x0) && (local_b8.cstep * (long)local_b8.c != 0)) {
        uVar12 = (int)local_b8.cstep * local_b8.c;
        if (0 < (int)uVar12) {
          lVar56 = (ulong)uVar12 - 1;
          auVar99._8_4_ = (int)lVar56;
          auVar99._0_8_ = lVar56;
          auVar99._12_4_ = (int)((ulong)lVar56 >> 0x20);
          uVar35 = 0;
          auVar99 = auVar99 ^ _DAT_0053f020;
          do {
            auVar206._8_4_ = (int)uVar35;
            auVar206._0_8_ = uVar35;
            auVar206._12_4_ = (int)(uVar35 >> 0x20);
            auVar264 = (auVar206 | auVar67) ^ auVar273;
            iVar11 = auVar99._4_4_;
            if ((bool)(~(auVar264._4_4_ == iVar11 && auVar99._0_4_ < auVar264._0_4_ ||
                        iVar11 < auVar264._4_4_) & 1)) {
              *(undefined4 *)((long)local_b8.data + uVar35 * 4) = 0x7f7fffff;
            }
            if ((auVar264._12_4_ != auVar99._12_4_ || auVar264._8_4_ <= auVar99._8_4_) &&
                auVar264._12_4_ <= auVar99._12_4_) {
              *(undefined4 *)((long)local_b8.data + uVar35 * 4 + 4) = 0x7f7fffff;
            }
            auVar264 = (auVar206 | auVar79) ^ auVar273;
            iVar10 = auVar264._4_4_;
            if (iVar10 <= iVar11 && (iVar10 != iVar11 || auVar264._0_4_ <= auVar99._0_4_)) {
              *(undefined4 *)((long)local_b8.data + uVar35 * 4 + 8) = 0x7f7fffff;
              *(undefined4 *)((long)local_b8.data + uVar35 * 4 + 0xc) = 0x7f7fffff;
            }
            uVar35 = uVar35 + 4;
          } while ((uVar12 + 3 & 0xfffffffc) != uVar35);
        }
        if (0 < (int)uVar33) {
          pvVar39 = bottom_blob->data;
          sVar18 = bottom_blob->elemsize;
          sVar21 = bottom_blob->cstep;
          uVar35 = 0;
          do {
            if (0 < (int)uVar15) {
              uVar57 = 0;
              pvVar55 = pvVar39;
              do {
                auVar178 = ZEXT816(0x7f7fffff);
                if (0 < (int)uVar53) {
                  uVar37 = 0;
                  auVar178 = ZEXT816(0x7f7fffff);
                  do {
                    fVar60 = *(float *)((long)pvVar55 + uVar37 * 4);
                    if (fVar60 <= auVar178._0_4_) {
                      auVar178._0_4_ = fVar60;
                    }
                    uVar37 = uVar37 + 1;
                  } while (uVar53 != uVar37);
                }
                *(int *)((long)local_b8.data +
                        uVar57 * 4 +
                        CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize) * local_b8.cstep *
                        uVar35) = auVar178._0_4_;
                uVar57 = uVar57 + 1;
                pvVar55 = (void *)((long)pvVar55 + (long)(int)uVar53 * 4);
              } while (uVar57 != uVar51);
            }
            uVar35 = uVar35 + 1;
            pvVar39 = (void *)((long)pvVar39 + sVar18 * sVar21);
          } while (uVar35 != uVar41);
        }
        auVar67 = _DAT_00544250;
        auVar79 = _DAT_00544240;
        auVar273 = _DAT_0053f020;
        uVar12 = top_blob->c * (int)top_blob->cstep;
        if (0 < (int)uVar12) {
          pvVar39 = top_blob->data;
          lVar56 = (ulong)uVar12 - 1;
          auVar100._8_4_ = (int)lVar56;
          auVar100._0_8_ = lVar56;
          auVar100._12_4_ = (int)((ulong)lVar56 >> 0x20);
          uVar35 = 0;
          auVar100 = auVar100 ^ _DAT_0053f020;
          do {
            auVar207._8_4_ = (int)uVar35;
            auVar207._0_8_ = uVar35;
            auVar207._12_4_ = (int)(uVar35 >> 0x20);
            auVar264 = (auVar207 | auVar67) ^ auVar273;
            iVar11 = auVar100._4_4_;
            if ((bool)(~(auVar264._4_4_ == iVar11 && auVar100._0_4_ < auVar264._0_4_ ||
                        iVar11 < auVar264._4_4_) & 1)) {
              *(undefined4 *)((long)pvVar39 + uVar35 * 4) = 0x7f7fffff;
            }
            if ((auVar264._12_4_ != auVar100._12_4_ || auVar264._8_4_ <= auVar100._8_4_) &&
                auVar264._12_4_ <= auVar100._12_4_) {
              *(undefined4 *)((long)pvVar39 + uVar35 * 4 + 4) = 0x7f7fffff;
            }
            auVar264 = (auVar207 | auVar79) ^ auVar273;
            iVar10 = auVar264._4_4_;
            if (iVar10 <= iVar11 && (iVar10 != iVar11 || auVar264._0_4_ <= auVar100._0_4_)) {
              *(undefined4 *)((long)pvVar39 + uVar35 * 4 + 8) = 0x7f7fffff;
              *(undefined4 *)((long)pvVar39 + uVar35 * 4 + 0xc) = 0x7f7fffff;
            }
            uVar35 = uVar35 + 4;
          } while ((uVar12 + 3 & 0xfffffffc) != uVar35);
        }
        if (0 < (int)uVar33) {
          pvVar39 = top_blob->data;
          uVar35 = 0;
          pvVar55 = local_b8.data;
          do {
            if (0 < (int)uVar15) {
              uVar57 = 0;
              do {
                fVar1 = *(float *)((long)pvVar55 + uVar57 * 4);
                fVar60 = *(float *)((long)pvVar39 + uVar57 * 4);
                if (fVar60 <= fVar1) {
                  fVar1 = fVar60;
                }
                *(float *)((long)pvVar39 + uVar57 * 4) = fVar1;
                uVar57 = uVar57 + 1;
              } while (uVar51 != uVar57);
            }
            uVar35 = uVar35 + 1;
            pvVar55 = (void *)((long)pvVar55 +
                              local_b8.cstep *
                              CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize));
          } while (uVar35 != uVar41);
        }
        unaff_R15D = 0;
      }
      piVar7 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + -1;
        UNLOCK();
        if (*piVar7 == 0) {
          if (local_b8.allocator == (Allocator *)0x0) {
LAB_003586f3:
            if (local_b8.data != (void *)0x0) {
              free(local_b8.data);
            }
          }
          else {
            (**(code **)(*(long *)local_b8.allocator + 0x18))();
          }
        }
      }
LAB_00358700:
      local_b8.cstep = 0;
      local_b8.data = (void *)0x0;
      local_b8.refcount._0_4_ = 0;
      local_b8.refcount._4_4_ = 0;
      local_b8.elemsize._0_4_ = 0;
      local_b8.elemsize._4_4_ = 0;
      local_b8.elempack = 0;
      local_b8.dims = 0;
      local_b8.w = 0;
      local_b8.h = 0;
      local_b8.d = 0;
      local_b8.c = 0;
      pMVar44 = (Mat *)0x0;
    }
    else {
      uVar57 = (ulong)uVar12;
      bVar47 = (byte)iVar10 >> 1 | bVar43;
      if (((bVar47 & 1) == 0 && bVar9 == 0) && bVar32 == 0) {
        if (iVar11 == 0) {
          Mat::create(top_blob,uVar13,(size_t)pMVar42,opt->blob_allocator);
        }
        else {
          Mat::create(top_blob,1,uVar13,1,1,(size_t)pMVar42,opt->blob_allocator);
        }
        local_b8.cstep = 0;
        local_b8.data = (void *)0x0;
        local_b8.refcount._0_4_ = 0;
        local_b8.refcount._4_4_ = 0;
        local_b8.elemsize._0_4_ = 0;
        local_b8.elemsize._4_4_ = 0;
        local_b8.elempack = 0;
        local_b8.allocator = (Allocator *)0x0;
        local_b8.dims = 0;
        local_b8.w = 0;
        local_b8.h = 0;
        local_b8.d = 0;
        local_b8.c = 0;
        Mat::create(&local_b8,1,uVar13,uVar33,(size_t)pMVar42,opt->workspace_allocator);
        auVar67 = _DAT_00544250;
        auVar79 = _DAT_00544240;
        auVar273 = _DAT_0053f020;
        unaff_R15D = -100;
        if ((local_b8.data != (void *)0x0) && (local_b8.cstep * (long)local_b8.c != 0)) {
          uVar14 = (int)local_b8.cstep * local_b8.c;
          if (0 < (int)uVar14) {
            lVar20 = (ulong)uVar14 - 1;
            auVar108._8_4_ = (int)lVar20;
            auVar108._0_8_ = lVar20;
            auVar108._12_4_ = (int)((ulong)lVar20 >> 0x20);
            uVar51 = 0;
            auVar108 = auVar108 ^ _DAT_0053f020;
            do {
              auVar212._8_4_ = (int)uVar51;
              auVar212._0_8_ = uVar51;
              auVar212._12_4_ = (int)(uVar51 >> 0x20);
              auVar264 = (auVar212 | auVar67) ^ auVar273;
              iVar11 = auVar108._4_4_;
              if ((bool)(~(auVar264._4_4_ == iVar11 && auVar108._0_4_ < auVar264._0_4_ ||
                          iVar11 < auVar264._4_4_) & 1)) {
                *(undefined4 *)((long)local_b8.data + uVar51 * 4) = 0x7f7fffff;
              }
              if ((auVar264._12_4_ != auVar108._12_4_ || auVar264._8_4_ <= auVar108._8_4_) &&
                  auVar264._12_4_ <= auVar108._12_4_) {
                *(undefined4 *)((long)local_b8.data + uVar51 * 4 + 4) = 0x7f7fffff;
              }
              auVar264 = (auVar212 | auVar79) ^ auVar273;
              iVar10 = auVar264._4_4_;
              if (iVar10 <= iVar11 && (iVar10 != iVar11 || auVar264._0_4_ <= auVar108._0_4_)) {
                *(undefined4 *)((long)local_b8.data + uVar51 * 4 + 8) = 0x7f7fffff;
                *(undefined4 *)((long)local_b8.data + uVar51 * 4 + 0xc) = 0x7f7fffff;
              }
              uVar51 = uVar51 + 4;
            } while ((uVar14 + 3 & 0xfffffffc) != uVar51);
          }
          if (0 < (int)uVar33) {
            pvVar39 = bottom_blob->data;
            sVar18 = bottom_blob->elemsize;
            sVar21 = bottom_blob->cstep;
            uVar51 = 0;
            do {
              if (0 < (int)uVar15) {
                lVar20 = CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize) * local_b8.cstep *
                         uVar51;
                pvVar55 = (void *)(sVar18 * sVar21 * uVar51 + (long)pvVar39);
                uVar14 = 0;
                do {
                  if (0 < (int)uVar13) {
                    uVar37 = 0;
                    do {
                      if (0 < (int)uVar12) {
                        auVar109 = ZEXT416(*(uint *)((long)local_b8.data + uVar37 * 4 + lVar20));
                        uVar46 = 0;
                        do {
                          fVar60 = *(float *)((long)pvVar55 + uVar46 * 4);
                          if (fVar60 <= auVar109._0_4_) {
                            auVar109._0_4_ = fVar60;
                          }
                          *(int *)((long)local_b8.data + uVar37 * 4 + lVar20) = auVar109._0_4_;
                          uVar46 = uVar46 + 1;
                        } while (uVar57 != uVar46);
                      }
                      pvVar55 = (void *)((long)pvVar55 + lVar56 * 4);
                      uVar37 = uVar37 + 1;
                    } while (uVar37 != uVar35);
                  }
                  uVar14 = uVar14 + 1;
                } while (uVar14 != uVar15);
              }
              uVar51 = uVar51 + 1;
            } while (uVar51 != uVar41);
          }
          auVar67 = _DAT_00544250;
          auVar79 = _DAT_00544240;
          auVar273 = _DAT_0053f020;
          uVar12 = top_blob->c * (int)top_blob->cstep;
          if (0 < (int)uVar12) {
            pvVar39 = top_blob->data;
            lVar56 = (ulong)uVar12 - 1;
            auVar110._8_4_ = (int)lVar56;
            auVar110._0_8_ = lVar56;
            auVar110._12_4_ = (int)((ulong)lVar56 >> 0x20);
            uVar51 = 0;
            auVar110 = auVar110 ^ _DAT_0053f020;
            do {
              auVar213._8_4_ = (int)uVar51;
              auVar213._0_8_ = uVar51;
              auVar213._12_4_ = (int)(uVar51 >> 0x20);
              auVar264 = (auVar213 | auVar67) ^ auVar273;
              iVar11 = auVar110._4_4_;
              if ((bool)(~(auVar264._4_4_ == iVar11 && auVar110._0_4_ < auVar264._0_4_ ||
                          iVar11 < auVar264._4_4_) & 1)) {
                *(undefined4 *)((long)pvVar39 + uVar51 * 4) = 0x7f7fffff;
              }
              if ((auVar264._12_4_ != auVar110._12_4_ || auVar264._8_4_ <= auVar110._8_4_) &&
                  auVar264._12_4_ <= auVar110._12_4_) {
                *(undefined4 *)((long)pvVar39 + uVar51 * 4 + 4) = 0x7f7fffff;
              }
              auVar264 = (auVar213 | auVar79) ^ auVar273;
              iVar10 = auVar264._4_4_;
              if (iVar10 <= iVar11 && (iVar10 != iVar11 || auVar264._0_4_ <= auVar110._0_4_)) {
                *(undefined4 *)((long)pvVar39 + uVar51 * 4 + 8) = 0x7f7fffff;
                *(undefined4 *)((long)pvVar39 + uVar51 * 4 + 0xc) = 0x7f7fffff;
              }
              uVar51 = uVar51 + 4;
            } while ((uVar12 + 3 & 0xfffffffc) != uVar51);
          }
          if (0 < (int)uVar33) {
            pvVar39 = top_blob->data;
            uVar51 = 0;
            pvVar55 = local_b8.data;
            do {
              if (0 < (int)uVar13) {
                uVar57 = 0;
                do {
                  fVar1 = *(float *)((long)pvVar55 + uVar57 * 4);
                  fVar60 = *(float *)((long)pvVar39 + uVar57 * 4);
                  if (fVar60 <= fVar1) {
                    fVar1 = fVar60;
                  }
                  *(float *)((long)pvVar39 + uVar57 * 4) = fVar1;
                  uVar57 = uVar57 + 1;
                } while (uVar35 != uVar57);
              }
              uVar51 = uVar51 + 1;
              pvVar55 = (void *)((long)pvVar55 +
                                local_b8.cstep *
                                CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize));
            } while (uVar51 != uVar41);
          }
          unaff_R15D = 0;
        }
        piVar7 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            if (local_b8.allocator == (Allocator *)0x0) goto LAB_003586f3;
            (**(code **)(*(long *)local_b8.allocator + 0x18))();
          }
        }
        goto LAB_00358700;
      }
      bVar27 = (byte)iVar10 | bVar31;
      if (((bVar27 & 1) == 0 && bVar9 == 0) && bVar32 == 0) {
        if (iVar11 == 0) {
          Mat::create(top_blob,uVar12,(size_t)pMVar42,opt->blob_allocator);
        }
        else {
          Mat::create(top_blob,uVar12,1,1,1,(size_t)pMVar42,opt->blob_allocator);
        }
        local_b8.cstep = 0;
        local_b8.data = (void *)0x0;
        local_b8.refcount._0_4_ = 0;
        local_b8.refcount._4_4_ = 0;
        local_b8.elemsize._0_4_ = 0;
        local_b8.elemsize._4_4_ = 0;
        local_b8.elempack = 0;
        local_b8.allocator = (Allocator *)0x0;
        local_b8.dims = 0;
        local_b8.w = 0;
        local_b8.h = 0;
        local_b8.d = 0;
        local_b8.c = 0;
        Mat::create(&local_b8,uVar12,1,uVar33,(size_t)pMVar42,opt->workspace_allocator);
        auVar67 = _DAT_00544250;
        auVar79 = _DAT_00544240;
        auVar273 = _DAT_0053f020;
        unaff_R15D = -100;
        if ((local_b8.data != (void *)0x0) && (local_b8.cstep * (long)local_b8.c != 0)) {
          uVar14 = (int)local_b8.cstep * local_b8.c;
          if (0 < (int)uVar14) {
            lVar20 = (ulong)uVar14 - 1;
            auVar115._8_4_ = (int)lVar20;
            auVar115._0_8_ = lVar20;
            auVar115._12_4_ = (int)((ulong)lVar20 >> 0x20);
            uVar35 = 0;
            auVar115 = auVar115 ^ _DAT_0053f020;
            do {
              auVar218._8_4_ = (int)uVar35;
              auVar218._0_8_ = uVar35;
              auVar218._12_4_ = (int)(uVar35 >> 0x20);
              auVar264 = (auVar218 | auVar67) ^ auVar273;
              iVar11 = auVar115._4_4_;
              if ((bool)(~(auVar264._4_4_ == iVar11 && auVar115._0_4_ < auVar264._0_4_ ||
                          iVar11 < auVar264._4_4_) & 1)) {
                *(undefined4 *)((long)local_b8.data + uVar35 * 4) = 0x7f7fffff;
              }
              if ((auVar264._12_4_ != auVar115._12_4_ || auVar264._8_4_ <= auVar115._8_4_) &&
                  auVar264._12_4_ <= auVar115._12_4_) {
                *(undefined4 *)((long)local_b8.data + uVar35 * 4 + 4) = 0x7f7fffff;
              }
              auVar264 = (auVar218 | auVar79) ^ auVar273;
              iVar10 = auVar264._4_4_;
              if (iVar10 <= iVar11 && (iVar10 != iVar11 || auVar264._0_4_ <= auVar115._0_4_)) {
                *(undefined4 *)((long)local_b8.data + uVar35 * 4 + 8) = 0x7f7fffff;
                *(undefined4 *)((long)local_b8.data + uVar35 * 4 + 0xc) = 0x7f7fffff;
              }
              uVar35 = uVar35 + 4;
            } while ((uVar14 + 3 & 0xfffffffc) != uVar35);
          }
          if (0 < (int)uVar33) {
            pvVar39 = bottom_blob->data;
            sVar18 = bottom_blob->elemsize;
            sVar21 = bottom_blob->cstep;
            uVar35 = 0;
            pvVar55 = local_b8.data;
            do {
              if (0 < (int)uVar15) {
                pvVar54 = (void *)(sVar18 * sVar21 * uVar35 + (long)pvVar39);
                uVar14 = 0;
                do {
                  if (0 < (int)uVar13) {
                    uVar34 = 0;
                    do {
                      if (0 < (int)uVar12) {
                        uVar51 = 0;
                        do {
                          fVar1 = *(float *)((long)pvVar54 + uVar51 * 4);
                          fVar60 = *(float *)((long)pvVar55 + uVar51 * 4);
                          if (fVar60 <= fVar1) {
                            fVar1 = fVar60;
                          }
                          *(float *)((long)pvVar55 + uVar51 * 4) = fVar1;
                          uVar51 = uVar51 + 1;
                        } while (uVar57 != uVar51);
                      }
                      pvVar54 = (void *)((long)pvVar54 + lVar56 * 4);
                      uVar34 = uVar34 + 1;
                    } while (uVar34 != uVar13);
                  }
                  uVar14 = uVar14 + 1;
                } while (uVar14 != uVar15);
              }
              uVar35 = uVar35 + 1;
              pvVar55 = (void *)((long)pvVar55 +
                                CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize) *
                                local_b8.cstep);
            } while (uVar35 != uVar41);
          }
          auVar67 = _DAT_00544250;
          auVar79 = _DAT_00544240;
          auVar273 = _DAT_0053f020;
          uVar14 = top_blob->c * (int)top_blob->cstep;
          if (0 < (int)uVar14) {
            pvVar39 = top_blob->data;
            lVar56 = (ulong)uVar14 - 1;
            auVar116._8_4_ = (int)lVar56;
            auVar116._0_8_ = lVar56;
            auVar116._12_4_ = (int)((ulong)lVar56 >> 0x20);
            uVar35 = 0;
            auVar116 = auVar116 ^ _DAT_0053f020;
            do {
              auVar219._8_4_ = (int)uVar35;
              auVar219._0_8_ = uVar35;
              auVar219._12_4_ = (int)(uVar35 >> 0x20);
              auVar264 = (auVar219 | auVar67) ^ auVar273;
              iVar11 = auVar116._4_4_;
              if ((bool)(~(auVar264._4_4_ == iVar11 && auVar116._0_4_ < auVar264._0_4_ ||
                          iVar11 < auVar264._4_4_) & 1)) {
                *(undefined4 *)((long)pvVar39 + uVar35 * 4) = 0x7f7fffff;
              }
              if ((auVar264._12_4_ != auVar116._12_4_ || auVar264._8_4_ <= auVar116._8_4_) &&
                  auVar264._12_4_ <= auVar116._12_4_) {
                *(undefined4 *)((long)pvVar39 + uVar35 * 4 + 4) = 0x7f7fffff;
              }
              auVar264 = (auVar219 | auVar79) ^ auVar273;
              iVar10 = auVar264._4_4_;
              if (iVar10 <= iVar11 && (iVar10 != iVar11 || auVar264._0_4_ <= auVar116._0_4_)) {
                *(undefined4 *)((long)pvVar39 + uVar35 * 4 + 8) = 0x7f7fffff;
                *(undefined4 *)((long)pvVar39 + uVar35 * 4 + 0xc) = 0x7f7fffff;
              }
              uVar35 = uVar35 + 4;
            } while ((uVar14 + 3 & 0xfffffffc) != uVar35);
          }
          if (0 < (int)uVar33) {
            pvVar39 = top_blob->data;
            uVar35 = 0;
            pvVar55 = local_b8.data;
            do {
              if (0 < (int)uVar12) {
                uVar51 = 0;
                do {
                  fVar1 = *(float *)((long)pvVar55 + uVar51 * 4);
                  fVar60 = *(float *)((long)pvVar39 + uVar51 * 4);
                  if (fVar60 <= fVar1) {
                    fVar1 = fVar60;
                  }
                  *(float *)((long)pvVar39 + uVar51 * 4) = fVar1;
                  uVar51 = uVar51 + 1;
                } while (uVar57 != uVar51);
              }
              uVar35 = uVar35 + 1;
              pvVar55 = (void *)((long)pvVar55 +
                                local_b8.cstep *
                                CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize));
            } while (uVar35 != uVar41);
          }
          unaff_R15D = 0;
        }
        piVar7 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            if (local_b8.allocator == (Allocator *)0x0) goto LAB_003586f3;
            (**(code **)(*(long *)local_b8.allocator + 0x18))();
          }
        }
        goto LAB_00358700;
      }
      if ((bVar59 && bVar8 == 0) && bVar25 == 0) {
        if (iVar11 == 0) {
          Mat::create(top_blob,uVar15,uVar33,(size_t)pMVar42,opt->blob_allocator);
        }
        else {
          Mat::create(top_blob,1,1,uVar15,uVar33,(size_t)pMVar42,opt->blob_allocator);
        }
        if ((int)uVar33 < 1) goto LAB_003519f4;
        sVar18 = bottom_blob->elemsize;
        if (iVar11 == 0) {
          sVar21 = (size_t)top_blob->w;
        }
        else {
          sVar21 = top_blob->cstep;
        }
        pvVar39 = bottom_blob->data;
        sVar22 = top_blob->elemsize;
        sVar5 = bottom_blob->cstep;
        pvVar55 = top_blob->data;
        uVar35 = 0;
        do {
          if (0 < (int)uVar15) {
            uVar57 = 0;
            pvVar54 = pvVar39;
            do {
              auVar184 = ZEXT816(0x7f7fffff);
              if (0 < (int)uVar53) {
                uVar37 = 0;
                auVar184 = ZEXT816(0x7f7fffff);
                do {
                  fVar60 = *(float *)((long)pvVar54 + uVar37 * 4);
                  if (fVar60 <= auVar184._0_4_) {
                    auVar184._0_4_ = fVar60;
                  }
                  uVar37 = uVar37 + 1;
                } while (uVar53 != uVar37);
              }
              *(int *)((long)pvVar55 + uVar57 * 4 + sVar21 * sVar22 * uVar35) = auVar184._0_4_;
              uVar57 = uVar57 + 1;
              pvVar54 = (void *)((long)pvVar54 + (long)(int)uVar53 * 4);
            } while (uVar57 != uVar51);
          }
          uVar35 = uVar35 + 1;
          pvVar39 = (void *)((long)pvVar39 + sVar18 * sVar5);
          pMVar44 = (Mat *)0x0;
          unaff_R15D = 0;
        } while (uVar35 != uVar41);
        goto LAB_00358727;
      }
      if (((bVar47 & 1) == 0 && bVar8 == 0) && bVar32 == 0) {
        if (iVar11 == 0) {
          Mat::create(top_blob,uVar13,uVar15,(size_t)pMVar42,opt->blob_allocator);
        }
        else {
          Mat::create(top_blob,1,uVar13,uVar15,1,(size_t)pMVar42,opt->blob_allocator);
        }
        local_b8.cstep = 0;
        local_b8.data = (void *)0x0;
        local_b8.refcount._0_4_ = 0;
        local_b8.refcount._4_4_ = 0;
        local_b8.elemsize._0_4_ = 0;
        local_b8.elemsize._4_4_ = 0;
        local_b8.elempack = 0;
        local_b8.allocator = (Allocator *)0x0;
        local_b8.dims = 0;
        local_b8.w = 0;
        local_b8.h = 0;
        local_b8.d = 0;
        local_b8.c = 0;
        Mat::create(&local_b8,uVar13,uVar15,uVar33,(size_t)pMVar42,opt->workspace_allocator);
        auVar67 = _DAT_00544250;
        auVar79 = _DAT_00544240;
        auVar273 = _DAT_0053f020;
        unaff_R15D = -100;
        if ((local_b8.data != (void *)0x0) && (local_b8.cstep * (long)local_b8.c != 0)) {
          uVar14 = (int)local_b8.cstep * local_b8.c;
          if (0 < (int)uVar14) {
            lVar20 = (ulong)uVar14 - 1;
            auVar128._8_4_ = (int)lVar20;
            auVar128._0_8_ = lVar20;
            auVar128._12_4_ = (int)((ulong)lVar20 >> 0x20);
            uVar37 = 0;
            auVar128 = auVar128 ^ _DAT_0053f020;
            do {
              auVar230._8_4_ = (int)uVar37;
              auVar230._0_8_ = uVar37;
              auVar230._12_4_ = (int)(uVar37 >> 0x20);
              auVar264 = (auVar230 | auVar67) ^ auVar273;
              iVar10 = auVar128._4_4_;
              if ((bool)(~(auVar264._4_4_ == iVar10 && auVar128._0_4_ < auVar264._0_4_ ||
                          iVar10 < auVar264._4_4_) & 1)) {
                *(undefined4 *)((long)local_b8.data + uVar37 * 4) = 0x7f7fffff;
              }
              if ((auVar264._12_4_ != auVar128._12_4_ || auVar264._8_4_ <= auVar128._8_4_) &&
                  auVar264._12_4_ <= auVar128._12_4_) {
                *(undefined4 *)((long)local_b8.data + uVar37 * 4 + 4) = 0x7f7fffff;
              }
              auVar264 = (auVar230 | auVar79) ^ auVar273;
              iVar265 = auVar264._4_4_;
              if (iVar265 <= iVar10 && (iVar265 != iVar10 || auVar264._0_4_ <= auVar128._0_4_)) {
                *(undefined4 *)((long)local_b8.data + uVar37 * 4 + 8) = 0x7f7fffff;
                *(undefined4 *)((long)local_b8.data + uVar37 * 4 + 0xc) = 0x7f7fffff;
              }
              uVar37 = uVar37 + 4;
            } while ((uVar14 + 3 & 0xfffffffc) != uVar37);
          }
          if (0 < (int)uVar33) {
            pvVar39 = bottom_blob->data;
            sVar18 = bottom_blob->elemsize;
            sVar21 = bottom_blob->cstep;
            uVar37 = 0;
            do {
              if (0 < (int)uVar15) {
                pvVar55 = (void *)(sVar18 * sVar21 * uVar37 + (long)pvVar39);
                uVar46 = 0;
                do {
                  if (0 < (int)uVar13) {
                    lVar20 = (long)local_b8.w *
                             CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize) * uVar46 +
                             CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize) *
                             local_b8.cstep * uVar37;
                    uVar40 = 0;
                    do {
                      if (0 < (int)uVar12) {
                        auVar129 = ZEXT416(*(uint *)((long)local_b8.data + uVar40 * 4 + lVar20));
                        uVar24 = 0;
                        do {
                          fVar60 = *(float *)((long)pvVar55 + uVar24 * 4);
                          if (fVar60 <= auVar129._0_4_) {
                            auVar129._0_4_ = fVar60;
                          }
                          *(int *)((long)local_b8.data + uVar40 * 4 + lVar20) = auVar129._0_4_;
                          uVar24 = uVar24 + 1;
                        } while (uVar57 != uVar24);
                      }
                      pvVar55 = (void *)((long)pvVar55 + lVar56 * 4);
                      uVar40 = uVar40 + 1;
                    } while (uVar40 != uVar35);
                  }
                  uVar46 = uVar46 + 1;
                } while (uVar46 != uVar51);
              }
              uVar37 = uVar37 + 1;
            } while (uVar37 != uVar41);
          }
          auVar67 = _DAT_00544250;
          auVar79 = _DAT_00544240;
          auVar273 = _DAT_0053f020;
          uVar12 = top_blob->c * (int)top_blob->cstep;
          if (0 < (int)uVar12) {
            pvVar39 = top_blob->data;
            lVar56 = (ulong)uVar12 - 1;
            auVar130._8_4_ = (int)lVar56;
            auVar130._0_8_ = lVar56;
            auVar130._12_4_ = (int)((ulong)lVar56 >> 0x20);
            uVar57 = 0;
            auVar130 = auVar130 ^ _DAT_0053f020;
            do {
              auVar231._8_4_ = (int)uVar57;
              auVar231._0_8_ = uVar57;
              auVar231._12_4_ = (int)(uVar57 >> 0x20);
              auVar264 = (auVar231 | auVar67) ^ auVar273;
              iVar10 = auVar130._4_4_;
              if ((bool)(~(auVar264._4_4_ == iVar10 && auVar130._0_4_ < auVar264._0_4_ ||
                          iVar10 < auVar264._4_4_) & 1)) {
                *(undefined4 *)((long)pvVar39 + uVar57 * 4) = 0x7f7fffff;
              }
              if ((auVar264._12_4_ != auVar130._12_4_ || auVar264._8_4_ <= auVar130._8_4_) &&
                  auVar264._12_4_ <= auVar130._12_4_) {
                *(undefined4 *)((long)pvVar39 + uVar57 * 4 + 4) = 0x7f7fffff;
              }
              auVar264 = (auVar231 | auVar79) ^ auVar273;
              iVar265 = auVar264._4_4_;
              if (iVar265 <= iVar10 && (iVar265 != iVar10 || auVar264._0_4_ <= auVar130._0_4_)) {
                *(undefined4 *)((long)pvVar39 + uVar57 * 4 + 8) = 0x7f7fffff;
                *(undefined4 *)((long)pvVar39 + uVar57 * 4 + 0xc) = 0x7f7fffff;
              }
              uVar57 = uVar57 + 4;
            } while ((uVar12 + 3 & 0xfffffffc) != uVar57);
          }
          if (0 < (int)uVar33) {
            uVar57 = 0;
            pvVar39 = local_b8.data;
            do {
              if (0 < (int)uVar15) {
                iVar10 = 1;
                if (iVar11 != 0) {
                  iVar10 = top_blob->h;
                }
                iVar265 = top_blob->w;
                sVar18 = top_blob->elemsize;
                pvVar55 = top_blob->data;
                uVar37 = 0;
                pvVar54 = pvVar39;
                do {
                  if (0 < (int)uVar13) {
                    uVar46 = 0;
                    do {
                      fVar1 = *(float *)((long)pvVar54 + uVar46 * 4);
                      fVar60 = *(float *)((long)pvVar55 + uVar46 * 4);
                      if (fVar60 <= fVar1) {
                        fVar1 = fVar60;
                      }
                      *(float *)((long)pvVar55 + uVar46 * 4) = fVar1;
                      uVar46 = uVar46 + 1;
                    } while (uVar35 != uVar46);
                  }
                  uVar37 = uVar37 + 1;
                  pvVar54 = (void *)((long)pvVar54 +
                                    (long)local_b8.w *
                                    CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize));
                  pvVar55 = (void *)((long)pvVar55 + (long)iVar10 * sVar18 * (long)iVar265);
                } while (uVar37 != uVar51);
              }
              uVar57 = uVar57 + 1;
              pvVar39 = (void *)((long)pvVar39 +
                                local_b8.cstep *
                                CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize));
            } while (uVar57 != uVar41);
          }
          unaff_R15D = 0;
        }
        piVar7 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            if (local_b8.allocator == (Allocator *)0x0) goto LAB_003586f3;
            (**(code **)(*(long *)local_b8.allocator + 0x18))();
          }
        }
        goto LAB_00358700;
      }
      bVar43 = bVar43 | bVar31;
      if ((bVar9 == 0 && (bVar43 & 1) == 0) && bVar32 == 0) {
        if (iVar11 == 0) {
          Mat::create(top_blob,uVar12,uVar13,(size_t)pMVar42,opt->blob_allocator);
        }
        else {
          Mat::create(top_blob,uVar12,uVar13,1,1,(size_t)pMVar42,opt->blob_allocator);
        }
        local_b8.cstep = 0;
        local_b8.data = (void *)0x0;
        local_b8.refcount._0_4_ = 0;
        local_b8.refcount._4_4_ = 0;
        local_b8.elemsize._0_4_ = 0;
        local_b8.elemsize._4_4_ = 0;
        local_b8.elempack = 0;
        local_b8.allocator = (Allocator *)0x0;
        local_b8.dims = 0;
        local_b8.w = 0;
        local_b8.h = 0;
        local_b8.d = 0;
        local_b8.c = 0;
        Mat::create(&local_b8,uVar12,uVar13,uVar33,(size_t)pMVar42,opt->workspace_allocator);
        auVar67 = _DAT_00544250;
        auVar79 = _DAT_00544240;
        auVar273 = _DAT_0053f020;
        unaff_R15D = -100;
        if ((local_b8.data != (void *)0x0) && (local_b8.cstep * (long)local_b8.c != 0)) {
          uVar14 = (int)local_b8.cstep * local_b8.c;
          if (0 < (int)uVar14) {
            lVar20 = (ulong)uVar14 - 1;
            auVar135._8_4_ = (int)lVar20;
            auVar135._0_8_ = lVar20;
            auVar135._12_4_ = (int)((ulong)lVar20 >> 0x20);
            uVar51 = 0;
            auVar135 = auVar135 ^ _DAT_0053f020;
            do {
              auVar236._8_4_ = (int)uVar51;
              auVar236._0_8_ = uVar51;
              auVar236._12_4_ = (int)(uVar51 >> 0x20);
              auVar264 = (auVar236 | auVar67) ^ auVar273;
              iVar11 = auVar135._4_4_;
              if ((bool)(~(auVar264._4_4_ == iVar11 && auVar135._0_4_ < auVar264._0_4_ ||
                          iVar11 < auVar264._4_4_) & 1)) {
                *(undefined4 *)((long)local_b8.data + uVar51 * 4) = 0x7f7fffff;
              }
              if ((auVar264._12_4_ != auVar135._12_4_ || auVar264._8_4_ <= auVar135._8_4_) &&
                  auVar264._12_4_ <= auVar135._12_4_) {
                *(undefined4 *)((long)local_b8.data + uVar51 * 4 + 4) = 0x7f7fffff;
              }
              auVar264 = (auVar236 | auVar79) ^ auVar273;
              iVar10 = auVar264._4_4_;
              if (iVar10 <= iVar11 && (iVar10 != iVar11 || auVar264._0_4_ <= auVar135._0_4_)) {
                *(undefined4 *)((long)local_b8.data + uVar51 * 4 + 8) = 0x7f7fffff;
                *(undefined4 *)((long)local_b8.data + uVar51 * 4 + 0xc) = 0x7f7fffff;
              }
              uVar51 = uVar51 + 4;
            } while ((uVar14 + 3 & 0xfffffffc) != uVar51);
          }
          if (0 < (int)uVar33) {
            pvVar39 = bottom_blob->data;
            sVar18 = bottom_blob->elemsize;
            sVar21 = bottom_blob->cstep;
            uVar51 = 0;
            pvVar55 = local_b8.data;
            do {
              if (0 < (int)uVar15) {
                pvVar54 = (void *)(sVar18 * sVar21 * uVar51 + (long)pvVar39);
                uVar14 = 0;
                do {
                  if (0 < (int)uVar13) {
                    uVar37 = 0;
                    pvVar52 = pvVar55;
                    do {
                      if (0 < (int)uVar12) {
                        uVar46 = 0;
                        do {
                          fVar1 = *(float *)((long)pvVar54 + uVar46 * 4);
                          fVar60 = *(float *)((long)pvVar52 + uVar46 * 4);
                          if (fVar60 <= fVar1) {
                            fVar1 = fVar60;
                          }
                          *(float *)((long)pvVar52 + uVar46 * 4) = fVar1;
                          uVar46 = uVar46 + 1;
                        } while (uVar57 != uVar46);
                      }
                      pvVar54 = (void *)((long)pvVar54 + lVar56 * 4);
                      uVar37 = uVar37 + 1;
                      pvVar52 = (void *)((long)pvVar52 +
                                        (long)local_b8.w *
                                        CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize));
                    } while (uVar37 != uVar35);
                  }
                  uVar14 = uVar14 + 1;
                } while (uVar14 != uVar15);
              }
              uVar51 = uVar51 + 1;
              pvVar55 = (void *)((long)pvVar55 +
                                CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize) *
                                local_b8.cstep);
            } while (uVar51 != uVar41);
          }
          auVar67 = _DAT_00544250;
          auVar79 = _DAT_00544240;
          auVar273 = _DAT_0053f020;
          uVar14 = top_blob->c * (int)top_blob->cstep;
          if (0 < (int)uVar14) {
            pvVar39 = top_blob->data;
            lVar56 = (ulong)uVar14 - 1;
            auVar136._8_4_ = (int)lVar56;
            auVar136._0_8_ = lVar56;
            auVar136._12_4_ = (int)((ulong)lVar56 >> 0x20);
            uVar51 = 0;
            auVar136 = auVar136 ^ _DAT_0053f020;
            do {
              auVar237._8_4_ = (int)uVar51;
              auVar237._0_8_ = uVar51;
              auVar237._12_4_ = (int)(uVar51 >> 0x20);
              auVar264 = (auVar237 | auVar67) ^ auVar273;
              iVar11 = auVar136._4_4_;
              if ((bool)(~(auVar264._4_4_ == iVar11 && auVar136._0_4_ < auVar264._0_4_ ||
                          iVar11 < auVar264._4_4_) & 1)) {
                *(undefined4 *)((long)pvVar39 + uVar51 * 4) = 0x7f7fffff;
              }
              if ((auVar264._12_4_ != auVar136._12_4_ || auVar264._8_4_ <= auVar136._8_4_) &&
                  auVar264._12_4_ <= auVar136._12_4_) {
                *(undefined4 *)((long)pvVar39 + uVar51 * 4 + 4) = 0x7f7fffff;
              }
              auVar264 = (auVar237 | auVar79) ^ auVar273;
              iVar10 = auVar264._4_4_;
              if (iVar10 <= iVar11 && (iVar10 != iVar11 || auVar264._0_4_ <= auVar136._0_4_)) {
                *(undefined4 *)((long)pvVar39 + uVar51 * 4 + 8) = 0x7f7fffff;
                *(undefined4 *)((long)pvVar39 + uVar51 * 4 + 0xc) = 0x7f7fffff;
              }
              uVar51 = uVar51 + 4;
            } while ((uVar14 + 3 & 0xfffffffc) != uVar51);
          }
          if (0 < (int)uVar33) {
            pvVar39 = top_blob->data;
            iVar11 = top_blob->w;
            sVar18 = top_blob->elemsize;
            uVar51 = 0;
            pvVar55 = local_b8.data;
            do {
              if (0 < (int)uVar13) {
                uVar37 = 0;
                pvVar54 = pvVar39;
                pvVar52 = pvVar55;
                do {
                  if (0 < (int)uVar12) {
                    uVar46 = 0;
                    do {
                      fVar1 = *(float *)((long)pvVar52 + uVar46 * 4);
                      fVar60 = *(float *)((long)pvVar54 + uVar46 * 4);
                      if (fVar60 <= fVar1) {
                        fVar1 = fVar60;
                      }
                      *(float *)((long)pvVar54 + uVar46 * 4) = fVar1;
                      uVar46 = uVar46 + 1;
                    } while (uVar57 != uVar46);
                  }
                  uVar37 = uVar37 + 1;
                  pvVar52 = (void *)((long)pvVar52 +
                                    (long)local_b8.w *
                                    CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize));
                  pvVar54 = (void *)((long)pvVar54 + (long)iVar11 * sVar18);
                } while (uVar37 != uVar35);
              }
              uVar51 = uVar51 + 1;
              pvVar55 = (void *)((long)pvVar55 +
                                local_b8.cstep *
                                CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize));
            } while (uVar51 != uVar41);
          }
          unaff_R15D = 0;
        }
        piVar7 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            if (local_b8.allocator == (Allocator *)0x0) goto LAB_003586f3;
            (**(code **)(*(long *)local_b8.allocator + 0x18))();
          }
        }
        goto LAB_00358700;
      }
      if (((bVar47 & 1) == 0 && bVar9 == 0) && bVar25 == 0) {
        if (iVar11 == 0) {
          Mat::create(top_blob,uVar13,uVar33,(size_t)pMVar42,opt->blob_allocator);
        }
        else {
          Mat::create(top_blob,1,uVar13,1,uVar33,(size_t)pMVar42,opt->blob_allocator);
        }
        auVar67 = _DAT_00544250;
        auVar79 = _DAT_00544240;
        auVar273 = _DAT_0053f020;
        if ((int)uVar33 < 1) goto LAB_003519f4;
        sVar18 = bottom_blob->elemsize;
        pvVar39 = top_blob->data;
        if (iVar11 == 0) {
          sVar21 = (size_t)top_blob->w;
        }
        else {
          sVar21 = top_blob->cstep;
        }
        pvVar55 = bottom_blob->data;
        sVar22 = bottom_blob->cstep;
        lVar30 = sVar21 * top_blob->elemsize;
        lVar20 = uVar35 - 1;
        auVar140._8_4_ = (int)lVar20;
        auVar140._0_8_ = lVar20;
        auVar140._12_4_ = (int)((ulong)lVar20 >> 0x20);
        lVar20 = (long)pvVar39 + 0xc;
        uVar51 = 0;
        auVar140 = auVar140 ^ _DAT_0053f020;
        do {
          if (0 < (int)uVar13) {
            lVar45 = 0;
            auVar258 = auVar67;
            auVar268 = auVar79;
            do {
              auVar264 = auVar258 ^ auVar273;
              iVar11 = auVar140._4_4_;
              if ((bool)(~(auVar264._4_4_ == iVar11 && auVar140._0_4_ < auVar264._0_4_ ||
                          iVar11 < auVar264._4_4_) & 1)) {
                *(undefined4 *)(lVar20 + -0xc + lVar45) = 0x7f7fffff;
              }
              if ((auVar264._12_4_ != auVar140._12_4_ || auVar264._8_4_ <= auVar140._8_4_) &&
                  auVar264._12_4_ <= auVar140._12_4_) {
                *(undefined4 *)(lVar20 + -8 + lVar45) = 0x7f7fffff;
              }
              auVar264 = auVar268 ^ auVar273;
              iVar10 = auVar264._4_4_;
              if (iVar10 <= iVar11 && (iVar10 != iVar11 || auVar264._0_4_ <= auVar140._0_4_)) {
                *(undefined4 *)(lVar20 + -4 + lVar45) = 0x7f7fffff;
                *(undefined4 *)(lVar20 + lVar45) = 0x7f7fffff;
              }
              lVar266 = auVar258._8_8_;
              auVar258._0_8_ = auVar258._0_8_ + 4;
              auVar258._8_8_ = lVar266 + 4;
              lVar266 = auVar268._8_8_;
              auVar268._0_8_ = auVar268._0_8_ + 4;
              auVar268._8_8_ = lVar266 + 4;
              lVar45 = lVar45 + 0x10;
            } while ((ulong)(uVar13 + 3 >> 2) << 4 != lVar45);
          }
          if (0 < (int)uVar15) {
            pvVar54 = (void *)(sVar18 * sVar22 * uVar51 + (long)pvVar55);
            lVar45 = lVar30 * uVar51;
            uVar14 = 0;
            do {
              if (0 < (int)uVar13) {
                uVar37 = 0;
                do {
                  if (0 < (int)uVar12) {
                    auVar259 = ZEXT416(*(uint *)((long)pvVar39 + uVar37 * 4 + lVar45));
                    uVar46 = 0;
                    do {
                      fVar60 = *(float *)((long)pvVar54 + uVar46 * 4);
                      if (fVar60 <= auVar259._0_4_) {
                        auVar259._0_4_ = fVar60;
                      }
                      *(int *)((long)pvVar39 + uVar37 * 4 + lVar45) = auVar259._0_4_;
                      uVar46 = uVar46 + 1;
                    } while (uVar57 != uVar46);
                  }
                  pvVar54 = (void *)((long)pvVar54 + lVar56 * 4);
                  uVar37 = uVar37 + 1;
                } while (uVar37 != uVar35);
              }
              uVar14 = uVar14 + 1;
            } while (uVar14 != uVar15);
          }
          uVar51 = uVar51 + 1;
          lVar20 = lVar20 + lVar30;
          pMVar44 = (Mat *)0x0;
          unaff_R15D = 0;
        } while (uVar51 != uVar41);
      }
      else {
        if (((bVar27 & 1) == 0 && bVar8 == 0) && bVar32 == 0) {
          if (iVar11 == 0) {
            Mat::create(top_blob,uVar12,uVar15,(size_t)pMVar42,opt->blob_allocator);
          }
          else {
            Mat::create(top_blob,uVar12,1,uVar15,1,(size_t)pMVar42,opt->blob_allocator);
          }
          local_b8.cstep = 0;
          local_b8.data = (void *)0x0;
          local_b8.refcount._0_4_ = 0;
          local_b8.refcount._4_4_ = 0;
          local_b8.elemsize._0_4_ = 0;
          local_b8.elemsize._4_4_ = 0;
          local_b8.elempack = 0;
          local_b8.allocator = (Allocator *)0x0;
          local_b8.dims = 0;
          local_b8.w = 0;
          local_b8.h = 0;
          local_b8.d = 0;
          local_b8.c = 0;
          Mat::create(&local_b8,uVar12,uVar15,uVar33,(size_t)pMVar42,opt->workspace_allocator);
          auVar67 = _DAT_00544250;
          auVar79 = _DAT_00544240;
          auVar273 = _DAT_0053f020;
          unaff_R15D = -100;
          if ((local_b8.data != (void *)0x0) && (local_b8.cstep * (long)local_b8.c != 0)) {
            uVar14 = (int)local_b8.cstep * local_b8.c;
            if (0 < (int)uVar14) {
              lVar20 = (ulong)uVar14 - 1;
              auVar144._8_4_ = (int)lVar20;
              auVar144._0_8_ = lVar20;
              auVar144._12_4_ = (int)((ulong)lVar20 >> 0x20);
              uVar35 = 0;
              auVar144 = auVar144 ^ _DAT_0053f020;
              do {
                auVar242._8_4_ = (int)uVar35;
                auVar242._0_8_ = uVar35;
                auVar242._12_4_ = (int)(uVar35 >> 0x20);
                auVar264 = (auVar242 | auVar67) ^ auVar273;
                iVar11 = auVar144._4_4_;
                if ((bool)(~(auVar264._4_4_ == iVar11 && auVar144._0_4_ < auVar264._0_4_ ||
                            iVar11 < auVar264._4_4_) & 1)) {
                  *(undefined4 *)((long)local_b8.data + uVar35 * 4) = 0x7f7fffff;
                }
                if ((auVar264._12_4_ != auVar144._12_4_ || auVar264._8_4_ <= auVar144._8_4_) &&
                    auVar264._12_4_ <= auVar144._12_4_) {
                  *(undefined4 *)((long)local_b8.data + uVar35 * 4 + 4) = 0x7f7fffff;
                }
                auVar264 = (auVar242 | auVar79) ^ auVar273;
                iVar10 = auVar264._4_4_;
                if (iVar10 <= iVar11 && (iVar10 != iVar11 || auVar264._0_4_ <= auVar144._0_4_)) {
                  *(undefined4 *)((long)local_b8.data + uVar35 * 4 + 8) = 0x7f7fffff;
                  *(undefined4 *)((long)local_b8.data + uVar35 * 4 + 0xc) = 0x7f7fffff;
                }
                uVar35 = uVar35 + 4;
              } while ((uVar14 + 3 & 0xfffffffc) != uVar35);
            }
            if (0 < (int)uVar33) {
              pvVar39 = bottom_blob->data;
              sVar18 = bottom_blob->elemsize;
              sVar21 = bottom_blob->cstep;
              uVar35 = 0;
              pvVar55 = local_b8.data;
              do {
                if (0 < (int)uVar15) {
                  pvVar52 = (void *)(sVar18 * sVar21 * uVar35 + (long)pvVar39);
                  uVar37 = 0;
                  pvVar54 = pvVar55;
                  do {
                    if (0 < (int)uVar13) {
                      uVar14 = 0;
                      do {
                        if (0 < (int)uVar12) {
                          uVar46 = 0;
                          do {
                            fVar1 = *(float *)((long)pvVar52 + uVar46 * 4);
                            fVar60 = *(float *)((long)pvVar54 + uVar46 * 4);
                            if (fVar60 <= fVar1) {
                              fVar1 = fVar60;
                            }
                            *(float *)((long)pvVar54 + uVar46 * 4) = fVar1;
                            uVar46 = uVar46 + 1;
                          } while (uVar57 != uVar46);
                        }
                        pvVar52 = (void *)((long)pvVar52 + lVar56 * 4);
                        uVar14 = uVar14 + 1;
                      } while (uVar14 != uVar13);
                    }
                    uVar37 = uVar37 + 1;
                    pvVar54 = (void *)((long)pvVar54 +
                                      (long)local_b8.w *
                                      CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize));
                  } while (uVar37 != uVar51);
                }
                uVar35 = uVar35 + 1;
                pvVar55 = (void *)((long)pvVar55 +
                                  CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize) *
                                  local_b8.cstep);
              } while (uVar35 != uVar41);
            }
            auVar67 = _DAT_00544250;
            auVar79 = _DAT_00544240;
            auVar273 = _DAT_0053f020;
            uVar14 = top_blob->c * (int)top_blob->cstep;
            if (0 < (int)uVar14) {
              pvVar39 = top_blob->data;
              lVar56 = (ulong)uVar14 - 1;
              auVar145._8_4_ = (int)lVar56;
              auVar145._0_8_ = lVar56;
              auVar145._12_4_ = (int)((ulong)lVar56 >> 0x20);
              uVar35 = 0;
              auVar145 = auVar145 ^ _DAT_0053f020;
              do {
                auVar243._8_4_ = (int)uVar35;
                auVar243._0_8_ = uVar35;
                auVar243._12_4_ = (int)(uVar35 >> 0x20);
                auVar264 = (auVar243 | auVar67) ^ auVar273;
                iVar11 = auVar145._4_4_;
                if ((bool)(~(auVar264._4_4_ == iVar11 && auVar145._0_4_ < auVar264._0_4_ ||
                            iVar11 < auVar264._4_4_) & 1)) {
                  *(undefined4 *)((long)pvVar39 + uVar35 * 4) = 0x7f7fffff;
                }
                if ((auVar264._12_4_ != auVar145._12_4_ || auVar264._8_4_ <= auVar145._8_4_) &&
                    auVar264._12_4_ <= auVar145._12_4_) {
                  *(undefined4 *)((long)pvVar39 + uVar35 * 4 + 4) = 0x7f7fffff;
                }
                auVar264 = (auVar243 | auVar79) ^ auVar273;
                iVar10 = auVar264._4_4_;
                if (iVar10 <= iVar11 && (iVar10 != iVar11 || auVar264._0_4_ <= auVar145._0_4_)) {
                  *(undefined4 *)((long)pvVar39 + uVar35 * 4 + 8) = 0x7f7fffff;
                  *(undefined4 *)((long)pvVar39 + uVar35 * 4 + 0xc) = 0x7f7fffff;
                }
                uVar35 = uVar35 + 4;
              } while ((uVar14 + 3 & 0xfffffffc) != uVar35);
            }
            if (0 < (int)uVar33) {
              pvVar39 = top_blob->data;
              iVar11 = top_blob->w;
              sVar18 = top_blob->elemsize;
              uVar35 = 0;
              pvVar55 = local_b8.data;
              do {
                if (0 < (int)uVar15) {
                  uVar37 = 0;
                  pvVar54 = pvVar39;
                  pvVar52 = pvVar55;
                  do {
                    if (0 < (int)uVar12) {
                      uVar46 = 0;
                      do {
                        fVar1 = *(float *)((long)pvVar52 + uVar46 * 4);
                        fVar60 = *(float *)((long)pvVar54 + uVar46 * 4);
                        if (fVar60 <= fVar1) {
                          fVar1 = fVar60;
                        }
                        *(float *)((long)pvVar54 + uVar46 * 4) = fVar1;
                        uVar46 = uVar46 + 1;
                      } while (uVar57 != uVar46);
                    }
                    uVar37 = uVar37 + 1;
                    pvVar52 = (void *)((long)pvVar52 +
                                      (long)local_b8.w *
                                      CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize));
                    pvVar54 = (void *)((long)pvVar54 + (long)iVar11 * sVar18);
                  } while (uVar37 != uVar51);
                }
                uVar35 = uVar35 + 1;
                pvVar55 = (void *)((long)pvVar55 +
                                  local_b8.cstep *
                                  CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize));
              } while (uVar35 != uVar41);
            }
            unaff_R15D = 0;
          }
          piVar7 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 == 0) {
              if (local_b8.allocator == (Allocator *)0x0) goto LAB_003586f3;
              (**(code **)(*(long *)local_b8.allocator + 0x18))();
            }
          }
          goto LAB_00358700;
        }
        if (((bVar27 & 1) == 0 && bVar9 == 0) && bVar25 == 0) {
          if (iVar11 == 0) {
            Mat::create(top_blob,uVar12,uVar33,(size_t)pMVar42,opt->blob_allocator);
          }
          else {
            Mat::create(top_blob,uVar12,1,1,uVar33,(size_t)pMVar42,opt->blob_allocator);
          }
          auVar67 = _DAT_00544250;
          auVar79 = _DAT_00544240;
          auVar273 = _DAT_0053f020;
          if ((int)uVar33 < 1) {
LAB_003519f4:
            pMVar44 = (Mat *)0x0;
            unaff_R15D = 0;
          }
          else {
            sVar18 = bottom_blob->elemsize;
            pvVar39 = top_blob->data;
            if (iVar11 == 0) {
              sVar21 = (size_t)top_blob->w;
            }
            else {
              sVar21 = top_blob->cstep;
            }
            pvVar55 = bottom_blob->data;
            sVar22 = bottom_blob->cstep;
            lVar20 = uVar57 - 1;
            auVar149._8_4_ = (int)lVar20;
            auVar149._0_8_ = lVar20;
            auVar149._12_4_ = (int)((ulong)lVar20 >> 0x20);
            lVar30 = sVar21 * top_blob->elemsize;
            lVar20 = (long)pvVar39 + 0xc;
            uVar35 = 0;
            auVar149 = auVar149 ^ _DAT_0053f020;
            do {
              if (0 < (int)uVar12) {
                lVar45 = 0;
                auVar262 = auVar67;
                auVar271 = auVar79;
                do {
                  auVar264 = auVar262 ^ auVar273;
                  iVar11 = auVar149._4_4_;
                  if ((bool)(~(auVar264._4_4_ == iVar11 && auVar149._0_4_ < auVar264._0_4_ ||
                              iVar11 < auVar264._4_4_) & 1)) {
                    *(undefined4 *)(lVar20 + -0xc + lVar45) = 0x7f7fffff;
                  }
                  if ((auVar264._12_4_ != auVar149._12_4_ || auVar264._8_4_ <= auVar149._8_4_) &&
                      auVar264._12_4_ <= auVar149._12_4_) {
                    *(undefined4 *)(lVar20 + -8 + lVar45) = 0x7f7fffff;
                  }
                  auVar264 = auVar271 ^ auVar273;
                  iVar10 = auVar264._4_4_;
                  if (iVar10 <= iVar11 && (iVar10 != iVar11 || auVar264._0_4_ <= auVar149._0_4_)) {
                    *(undefined4 *)(lVar20 + -4 + lVar45) = 0x7f7fffff;
                    *(undefined4 *)(lVar20 + lVar45) = 0x7f7fffff;
                  }
                  lVar266 = auVar262._8_8_;
                  auVar262._0_8_ = auVar262._0_8_ + 4;
                  auVar262._8_8_ = lVar266 + 4;
                  lVar266 = auVar271._8_8_;
                  auVar271._0_8_ = auVar271._0_8_ + 4;
                  auVar271._8_8_ = lVar266 + 4;
                  lVar45 = lVar45 + 0x10;
                } while ((ulong)(uVar12 + 3 >> 2) << 4 != lVar45);
              }
              if (0 < (int)uVar15) {
                pvVar54 = (void *)(sVar18 * sVar22 * uVar35 + (long)pvVar55);
                uVar14 = 0;
                do {
                  if (0 < (int)uVar13) {
                    uVar33 = 0;
                    do {
                      if (0 < (int)uVar12) {
                        uVar51 = 0;
                        do {
                          fVar1 = *(float *)((long)pvVar54 + uVar51 * 4);
                          fVar60 = *(float *)((long)pvVar39 + uVar51 * 4);
                          if (fVar60 <= fVar1) {
                            fVar1 = fVar60;
                          }
                          *(float *)((long)pvVar39 + uVar51 * 4) = fVar1;
                          uVar51 = uVar51 + 1;
                        } while (uVar57 != uVar51);
                      }
                      pvVar54 = (void *)((long)pvVar54 + lVar56 * 4);
                      uVar33 = uVar33 + 1;
                    } while (uVar33 != uVar13);
                  }
                  uVar14 = uVar14 + 1;
                } while (uVar14 != uVar15);
              }
              uVar35 = uVar35 + 1;
              lVar20 = lVar20 + lVar30;
              pvVar39 = (void *)((long)pvVar39 + lVar30);
              pMVar44 = (Mat *)0x0;
              unaff_R15D = 0;
            } while (uVar35 != uVar41);
          }
        }
        else if (((bVar47 & 1) == 0 && bVar8 == 0) && bVar25 == 0) {
          if (iVar11 == 0) {
            Mat::create(top_blob,uVar13,uVar15,uVar33,(size_t)pMVar42,opt->blob_allocator);
          }
          else {
            Mat::create(top_blob,1,uVar13,uVar15,uVar33,(size_t)pMVar42,opt->blob_allocator);
          }
          if ((int)uVar33 < 1) goto LAB_003519f4;
          pvVar39 = bottom_blob->data;
          sVar18 = bottom_blob->elemsize;
          sVar21 = top_blob->elemsize;
          sVar22 = top_blob->cstep;
          pvVar55 = top_blob->data;
          sVar5 = bottom_blob->cstep;
          uVar35 = 0;
          unaff_R15D = 0;
          do {
            if (0 < (int)(uVar13 * uVar15)) {
              uVar51 = 0;
              pvVar54 = pvVar39;
              do {
                auVar187 = ZEXT816(0x7f7fffff);
                if (0 < (int)uVar12) {
                  uVar37 = 0;
                  auVar187 = ZEXT816(0x7f7fffff);
                  do {
                    fVar60 = *(float *)((long)pvVar54 + uVar37 * 4);
                    if (fVar60 <= auVar187._0_4_) {
                      auVar187._0_4_ = fVar60;
                    }
                    uVar37 = uVar37 + 1;
                  } while (uVar57 != uVar37);
                }
                *(int *)((long)pvVar55 + uVar51 * 4 + sVar21 * sVar22 * uVar35) = auVar187._0_4_;
                uVar51 = uVar51 + 1;
                pvVar54 = (void *)((long)pvVar54 + lVar56 * 4);
              } while (uVar51 != uVar13 * uVar15);
            }
            uVar35 = uVar35 + 1;
            pvVar39 = (void *)((long)pvVar39 + sVar18 * sVar5);
            pMVar44 = (Mat *)0x0;
          } while (uVar35 != uVar41);
        }
        else if ((bVar8 == 0 && (bVar43 & 1) == 0) && bVar32 == 0) {
          if (iVar11 == 0) {
            Mat::create(top_blob,uVar12,uVar13,uVar15,(size_t)pMVar42,opt->blob_allocator);
          }
          else {
            Mat::create(top_blob,uVar12,uVar13,uVar15,1,(size_t)pMVar42,opt->blob_allocator);
          }
          auVar67 = _DAT_00544250;
          auVar79 = _DAT_00544240;
          auVar273 = _DAT_0053f020;
          uVar14 = top_blob->c * (int)top_blob->cstep;
          if (0 < (int)uVar14) {
            pvVar39 = top_blob->data;
            lVar20 = (ulong)uVar14 - 1;
            auVar153._8_4_ = (int)lVar20;
            auVar153._0_8_ = lVar20;
            auVar153._12_4_ = (int)((ulong)lVar20 >> 0x20);
            uVar37 = 0;
            auVar153 = auVar153 ^ _DAT_0053f020;
            do {
              auVar247._8_4_ = (int)uVar37;
              auVar247._0_8_ = uVar37;
              auVar247._12_4_ = (int)(uVar37 >> 0x20);
              auVar264 = (auVar247 | auVar67) ^ auVar273;
              iVar10 = auVar153._4_4_;
              if ((bool)(~(auVar264._4_4_ == iVar10 && auVar153._0_4_ < auVar264._0_4_ ||
                          iVar10 < auVar264._4_4_) & 1)) {
                *(undefined4 *)((long)pvVar39 + uVar37 * 4) = 0x7f7fffff;
              }
              if ((auVar264._12_4_ != auVar153._12_4_ || auVar264._8_4_ <= auVar153._8_4_) &&
                  auVar264._12_4_ <= auVar153._12_4_) {
                *(undefined4 *)((long)pvVar39 + uVar37 * 4 + 4) = 0x7f7fffff;
              }
              auVar264 = (auVar247 | auVar79) ^ auVar273;
              iVar265 = auVar264._4_4_;
              if (iVar265 <= iVar10 && (iVar265 != iVar10 || auVar264._0_4_ <= auVar153._0_4_)) {
                *(undefined4 *)((long)pvVar39 + uVar37 * 4 + 8) = 0x7f7fffff;
                *(undefined4 *)((long)pvVar39 + uVar37 * 4 + 0xc) = 0x7f7fffff;
              }
              uVar37 = uVar37 + 4;
            } while ((uVar14 + 3 & 0xfffffffc) != uVar37);
          }
          if ((int)uVar33 < 1) goto LAB_003519f4;
          pvVar39 = bottom_blob->data;
          sVar18 = bottom_blob->elemsize;
          sVar21 = bottom_blob->cstep;
          uVar37 = 0;
          do {
            if (0 < (int)uVar15) {
              iVar10 = top_blob->w;
              if (iVar11 == 0) {
                sVar22 = top_blob->cstep;
              }
              else {
                sVar22 = (long)top_blob->h * (long)iVar10;
              }
              pvVar54 = (void *)(sVar18 * sVar21 * uVar37 + (long)pvVar39);
              pvVar55 = top_blob->data;
              sVar5 = top_blob->elemsize;
              uVar46 = 0;
              do {
                if (0 < (int)uVar13) {
                  uVar40 = 0;
                  pvVar52 = pvVar55;
                  do {
                    if (0 < (int)uVar12) {
                      uVar24 = 0;
                      do {
                        fVar1 = *(float *)((long)pvVar54 + uVar24 * 4);
                        fVar60 = *(float *)((long)pvVar52 + uVar24 * 4);
                        if (fVar60 <= fVar1) {
                          fVar1 = fVar60;
                        }
                        *(float *)((long)pvVar52 + uVar24 * 4) = fVar1;
                        uVar24 = uVar24 + 1;
                      } while (uVar57 != uVar24);
                    }
                    pvVar54 = (void *)((long)pvVar54 + lVar56 * 4);
                    uVar40 = uVar40 + 1;
                    pvVar52 = (void *)((long)pvVar52 + (long)iVar10 * sVar5);
                  } while (uVar40 != uVar35);
                }
                uVar46 = uVar46 + 1;
                pvVar55 = (void *)((long)pvVar55 + sVar22 * sVar5);
              } while (uVar46 != uVar51);
            }
            uVar37 = uVar37 + 1;
            pMVar44 = (Mat *)0x0;
            unaff_R15D = 0;
          } while (uVar37 != uVar41);
        }
        else if (((bVar27 & 1) == 0 && bVar8 == 0) && bVar25 == 0) {
          if (iVar11 == 0) {
            Mat::create(top_blob,uVar12,uVar15,uVar33,(size_t)pMVar42,opt->blob_allocator);
          }
          else {
            Mat::create(top_blob,uVar12,1,uVar15,uVar33,(size_t)pMVar42,opt->blob_allocator);
          }
          auVar67 = _DAT_00544250;
          auVar79 = _DAT_00544240;
          auVar273 = _DAT_0053f020;
          if ((int)uVar33 < 1) goto LAB_003519f4;
          pvVar39 = bottom_blob->data;
          sVar18 = bottom_blob->elemsize;
          sVar21 = bottom_blob->cstep;
          iVar11 = top_blob->w;
          pvVar55 = top_blob->data;
          uVar35 = top_blob->elemsize;
          lVar56 = (long)top_blob->h * (long)iVar11;
          uVar37 = 0;
          iVar10 = (int)((uVar35 * lVar56 + 0xf & 0xfffffffffffffff0) / uVar35);
          if (top_blob->dims == 4) {
            iVar10 = (int)lVar56;
          }
          uVar14 = iVar10 * top_blob->d;
          lVar56 = (ulong)uVar14 - 1;
          auVar156._8_4_ = (int)lVar56;
          auVar156._0_8_ = lVar56;
          auVar156._12_4_ = (int)((ulong)lVar56 >> 0x20);
          lVar56 = (long)pvVar55 + 0xc;
          lVar20 = top_blob->cstep * uVar35;
          auVar156 = auVar156 ^ _DAT_0053f020;
          do {
            if (0 < (int)uVar14) {
              uVar46 = 0;
              do {
                auVar250._8_4_ = (int)uVar46;
                auVar250._0_8_ = uVar46;
                auVar250._12_4_ = (int)(uVar46 >> 0x20);
                auVar264 = (auVar250 | auVar67) ^ auVar273;
                iVar10 = auVar156._4_4_;
                if ((bool)(~(iVar10 < auVar264._4_4_ ||
                            auVar156._0_4_ < auVar264._0_4_ && auVar264._4_4_ == iVar10) & 1)) {
                  *(undefined4 *)(lVar56 + -0xc + uVar46 * 4) = 0x7f7fffff;
                }
                if (auVar264._12_4_ <= auVar156._12_4_ &&
                    (auVar264._8_4_ <= auVar156._8_4_ || auVar264._12_4_ != auVar156._12_4_)) {
                  *(undefined4 *)(lVar56 + -8 + uVar46 * 4) = 0x7f7fffff;
                }
                auVar264 = (auVar250 | auVar79) ^ auVar273;
                iVar265 = auVar264._4_4_;
                if (iVar265 <= iVar10 && (iVar265 != iVar10 || auVar264._0_4_ <= auVar156._0_4_)) {
                  *(undefined4 *)(lVar56 + -4 + uVar46 * 4) = 0x7f7fffff;
                  *(undefined4 *)(lVar56 + uVar46 * 4) = 0x7f7fffff;
                }
                uVar46 = uVar46 + 4;
              } while ((uVar14 + 3 & 0xfffffffc) != uVar46);
            }
            if (0 < (int)uVar15) {
              pvVar52 = (void *)(sVar18 * sVar21 * uVar37 + (long)pvVar39);
              uVar46 = 0;
              pvVar54 = pvVar55;
              do {
                if (0 < (int)uVar13) {
                  uVar33 = 0;
                  do {
                    if (0 < (int)uVar12) {
                      uVar40 = 0;
                      do {
                        fVar1 = *(float *)((long)pvVar52 + uVar40 * 4);
                        fVar60 = *(float *)((long)pvVar54 + uVar40 * 4);
                        if (fVar60 <= fVar1) {
                          fVar1 = fVar60;
                        }
                        *(float *)((long)pvVar54 + uVar40 * 4) = fVar1;
                        uVar40 = uVar40 + 1;
                      } while (uVar57 != uVar40);
                    }
                    pvVar52 = (void *)((long)pvVar52 + (long)(int)uVar12 * 4);
                    uVar33 = uVar33 + 1;
                  } while (uVar33 != uVar13);
                }
                uVar46 = uVar46 + 1;
                pvVar54 = (void *)((long)pvVar54 + uVar35 * (long)iVar11);
              } while (uVar46 != uVar51);
            }
            uVar37 = uVar37 + 1;
            lVar56 = lVar56 + lVar20;
            pvVar55 = (void *)((long)pvVar55 + lVar20);
            pMVar44 = (Mat *)0x0;
            unaff_R15D = 0;
          } while (uVar37 != uVar41);
        }
        else {
          pMVar44 = (Mat *)CONCAT71((uint7)(uint3)((uint)iVar10 >> 8),1);
          if (bVar25 == 0 && (bVar9 == 0 && (bVar43 & 1) == 0)) {
            if (iVar11 == 0) {
              Mat::create(top_blob,uVar12,uVar13,uVar33,(size_t)pMVar42,opt->blob_allocator);
            }
            else {
              Mat::create(top_blob,uVar12,uVar13,1,uVar33,(size_t)pMVar42,opt->blob_allocator);
            }
            auVar67 = _DAT_00544250;
            auVar79 = _DAT_00544240;
            auVar273 = _DAT_0053f020;
            if ((int)uVar33 < 1) goto LAB_003519f4;
            pvVar39 = bottom_blob->data;
            sVar18 = bottom_blob->elemsize;
            sVar21 = bottom_blob->cstep;
            iVar11 = top_blob->w;
            pvVar55 = top_blob->data;
            uVar51 = top_blob->elemsize;
            lVar56 = (long)top_blob->h * (long)iVar11;
            uVar37 = 0;
            iVar10 = (int)((uVar51 * lVar56 + 0xf & 0xfffffffffffffff0) / uVar51);
            if (top_blob->dims == 4) {
              iVar10 = (int)lVar56;
            }
            uVar14 = iVar10 * top_blob->d;
            lVar56 = (ulong)uVar14 - 1;
            auVar159._8_4_ = (int)lVar56;
            auVar159._0_8_ = lVar56;
            auVar159._12_4_ = (int)((ulong)lVar56 >> 0x20);
            lVar56 = (long)pvVar55 + 0xc;
            lVar20 = top_blob->cstep * uVar51;
            auVar159 = auVar159 ^ _DAT_0053f020;
            do {
              if (0 < (int)uVar14) {
                uVar46 = 0;
                do {
                  auVar253._8_4_ = (int)uVar46;
                  auVar253._0_8_ = uVar46;
                  auVar253._12_4_ = (int)(uVar46 >> 0x20);
                  auVar264 = (auVar253 | auVar67) ^ auVar273;
                  iVar10 = auVar159._4_4_;
                  if ((bool)(~(iVar10 < auVar264._4_4_ ||
                              auVar159._0_4_ < auVar264._0_4_ && auVar264._4_4_ == iVar10) & 1)) {
                    *(undefined4 *)(lVar56 + -0xc + uVar46 * 4) = 0x7f7fffff;
                  }
                  if (auVar264._12_4_ <= auVar159._12_4_ &&
                      (auVar264._8_4_ <= auVar159._8_4_ || auVar264._12_4_ != auVar159._12_4_)) {
                    *(undefined4 *)(lVar56 + -8 + uVar46 * 4) = 0x7f7fffff;
                  }
                  auVar264 = (auVar253 | auVar79) ^ auVar273;
                  iVar265 = auVar264._4_4_;
                  if (iVar265 <= iVar10 && (iVar265 != iVar10 || auVar264._0_4_ <= auVar159._0_4_))
                  {
                    *(undefined4 *)(lVar56 + -4 + uVar46 * 4) = 0x7f7fffff;
                    *(undefined4 *)(lVar56 + uVar46 * 4) = 0x7f7fffff;
                  }
                  uVar46 = uVar46 + 4;
                } while ((uVar14 + 3 & 0xfffffffc) != uVar46);
              }
              if (0 < (int)uVar15) {
                pvVar54 = (void *)(sVar18 * sVar21 * uVar37 + (long)pvVar39);
                uVar33 = 0;
                do {
                  if (0 < (int)uVar13) {
                    uVar46 = 0;
                    pvVar52 = pvVar55;
                    do {
                      if (0 < (int)uVar12) {
                        uVar40 = 0;
                        do {
                          fVar1 = *(float *)((long)pvVar54 + uVar40 * 4);
                          fVar60 = *(float *)((long)pvVar52 + uVar40 * 4);
                          if (fVar60 <= fVar1) {
                            fVar1 = fVar60;
                          }
                          *(float *)((long)pvVar52 + uVar40 * 4) = fVar1;
                          uVar40 = uVar40 + 1;
                        } while (uVar57 != uVar40);
                      }
                      pvVar54 = (void *)((long)pvVar54 + (long)(int)uVar12 * 4);
                      uVar46 = uVar46 + 1;
                      pvVar52 = (void *)((long)pvVar52 + uVar51 * (long)iVar11);
                    } while (uVar46 != uVar35);
                  }
                  uVar33 = uVar33 + 1;
                } while (uVar33 != uVar15);
              }
              uVar37 = uVar37 + 1;
              lVar56 = lVar56 + lVar20;
              pvVar55 = (void *)((long)pvVar55 + lVar20);
              pMVar44 = (Mat *)0x0;
              unaff_R15D = 0;
            } while (uVar37 != uVar41);
          }
        }
      }
    }
LAB_00358727:
    if ((char)pMVar44 != '\0') goto LAB_00358731;
    break;
  case 6:
    fVar161 = this->coeff;
    iVar11 = this->keepdims;
    pMVar42 = (Mat *)bottom_blob->elemsize;
    if (uVar12 == 2) {
      uVar13 = bottom_blob->w;
      uVar35 = (ulong)uVar13;
      uVar15 = bottom_blob->h;
      pAVar36 = (Allocator *)(ulong)uVar15;
      auVar65._8_4_ = 0xffffffff;
      auVar65._0_8_ = 0xffffffffffffffff;
      auVar65._12_4_ = 0xffffffff;
      auVar66._0_8_ = SUB168(auVar65 ^ auVar273,0) << 0x3f;
      auVar66._8_8_ = SUB168(auVar65 ^ auVar273,8) << 0x3f;
      iVar10 = movmskpd(iVar10,auVar66);
      if (iVar10 == 0) {
        if (iVar11 == 0) {
          Mat::create(top_blob,1,(size_t)pMVar42,opt->blob_allocator);
        }
        else {
          Mat::create(top_blob,1,1,(size_t)pMVar42,opt->blob_allocator);
        }
        pAVar50 = opt->workspace_allocator;
        local_b8.cstep = 0;
        local_b8.data = (void *)0x0;
        local_b8.refcount._0_4_ = 0;
        local_b8.refcount._4_4_ = 0;
        local_b8.elemsize._0_4_ = 0;
        local_b8.elemsize._4_4_ = 0;
        local_b8.elempack = 0;
        local_b8.allocator = (Allocator *)0x0;
        local_b8.dims = 0;
        local_b8.w = 0;
        local_b8.h = 0;
        local_b8.d = 0;
        local_b8.c = 0;
        Mat::create(&local_b8,uVar15,(size_t)pMVar42,pAVar50);
        unaff_R15D = -100;
        if ((local_b8.data != (void *)0x0) &&
           (pAVar50 = (Allocator *)((long)local_b8.c * local_b8.cstep), pAVar50 != (Allocator *)0x0)
           ) {
          if ((int)uVar15 < 1) {
            fVar60 = 1.0;
          }
          else {
            pvVar39 = bottom_blob->data;
            iVar10 = bottom_blob->w;
            sVar18 = bottom_blob->elemsize;
            pAVar50 = (Allocator *)0x0;
            do {
              auVar164 = ZEXT816(0x3f800000);
              if (0 < (int)uVar13) {
                uVar51 = 0;
                auVar164 = ZEXT816(0x3f800000);
                do {
                  auVar164._0_4_ = auVar164._0_4_ * *(float *)((long)pvVar39 + uVar51 * 4);
                  uVar51 = uVar51 + 1;
                } while (uVar35 != uVar51);
              }
              *(int *)((long)local_b8.data + (long)pAVar50 * 4) = auVar164._0_4_;
              pAVar50 = pAVar50 + 1;
              pvVar39 = (void *)((long)pvVar39 + (long)iVar10 * sVar18);
            } while (pAVar50 != pAVar36);
            fVar60 = 1.0;
            pAVar50 = (Allocator *)0x0;
            do {
              fVar60 = fVar60 * *(float *)((long)local_b8.data + (long)pAVar50 * 4);
              pAVar50 = pAVar50 + 1;
            } while (pAVar36 != pAVar50);
          }
          *(float *)top_blob->data = fVar60;
          unaff_R15D = 0;
        }
        uVar14 = (uint)pAVar50;
        piVar7 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            if (local_b8.allocator == (Allocator *)0x0) {
              if (local_b8.data != (void *)0x0) {
                free(local_b8.data);
              }
            }
            else {
              (**(code **)(*(long *)local_b8.allocator + 0x18))();
            }
          }
        }
        uVar41 = uVar41 & 0xffffffff;
        local_b8.cstep = 0;
        local_b8.data = (void *)0x0;
        local_b8.refcount._0_4_ = 0;
        local_b8.refcount._4_4_ = 0;
        local_b8.elemsize._0_4_ = 0;
        local_b8.elemsize._4_4_ = 0;
        local_b8.elempack = 0;
        local_b8.dims = 0;
        local_b8.w = 0;
        local_b8.h = 0;
        local_b8.d = 0;
        local_b8.c = 0;
        bVar59 = false;
        pMVar44 = (Mat *)((ulong)pMVar44 & 0xffffffff);
      }
      else if (((bVar43 | (byte)iVar10 >> 1) & 1) == 0) {
        pAVar50 = opt->blob_allocator;
        if (iVar11 == 0) {
          Mat::create(top_blob,uVar15,(size_t)pMVar42,pAVar50);
          uVar14 = (uint)pAVar50;
        }
        else {
          pMVar16 = pMVar42;
          Mat::create(top_blob,1,uVar15,(size_t)pMVar42,pAVar50);
          uVar14 = (uint)pMVar16;
        }
        if (0 < (int)uVar15) {
          iVar10 = bottom_blob->w;
          sVar18 = bottom_blob->elemsize;
          pvVar39 = bottom_blob->data;
          pvVar55 = top_blob->data;
          pAVar50 = (Allocator *)0x0;
          do {
            auVar167 = ZEXT816(0x3f800000);
            if (0 < (int)uVar13) {
              uVar51 = 0;
              auVar167 = ZEXT816(0x3f800000);
              do {
                auVar167._0_4_ = auVar167._0_4_ * *(float *)((long)pvVar39 + uVar51 * 4);
                uVar51 = uVar51 + 1;
              } while (uVar35 != uVar51);
            }
            *(int *)((long)pvVar55 + (long)pAVar50 * 4) = auVar167._0_4_;
            pAVar50 = pAVar50 + 1;
            pvVar39 = (void *)((long)pvVar39 + (long)iVar10 * sVar18);
          } while (pAVar50 != pAVar36);
          goto LAB_0034d54a;
        }
        bVar59 = false;
        unaff_R15D = 0;
        pMVar44 = (Mat *)((ulong)pMVar44 & 0xffffffff);
        uVar41 = uVar41 & 0xffffffff;
      }
      else {
        bVar25 = bVar31 | (byte)iVar10;
        uVar14 = (uint)CONCAT11(uVar6,bVar25);
        if ((bVar25 & 1) == 0) {
          if (iVar11 == 0) {
            Mat::create(top_blob,uVar13,(size_t)pMVar42,opt->blob_allocator);
          }
          else {
            Mat::create(top_blob,uVar13,1,(size_t)pMVar42,opt->blob_allocator);
          }
          auVar264 = _DAT_00544250;
          auVar67 = _DAT_00544240;
          auVar79 = _DAT_0053f020;
          uVar14 = top_blob->c * (int)top_blob->cstep;
          pvVar39 = (void *)(ulong)uVar14;
          pvVar55 = top_blob->data;
          if (0 < (int)uVar14) {
            pvVar39 = (void *)(ulong)(uVar14 + 3 & 0xfffffffc);
            lVar56 = (ulong)uVar14 - 1;
            auVar76._8_4_ = (int)lVar56;
            auVar76._0_8_ = lVar56;
            auVar76._12_4_ = (int)((ulong)lVar56 >> 0x20);
            pvVar54 = (void *)0x0;
            auVar76 = auVar76 ^ _DAT_0053f020;
            do {
              auVar191._8_4_ = (int)pvVar54;
              auVar191._0_8_ = pvVar54;
              auVar191._12_4_ = (int)((ulong)pvVar54 >> 0x20);
              auVar255 = (auVar191 | auVar264) ^ auVar79;
              iVar10 = auVar76._4_4_;
              if ((bool)(~(iVar10 < auVar255._4_4_ ||
                          auVar76._0_4_ < auVar255._0_4_ && auVar255._4_4_ == iVar10) & 1)) {
                *(undefined4 *)((long)pvVar55 + (long)pvVar54 * 4) = 0x3f800000;
              }
              if (auVar255._12_4_ <= auVar76._12_4_ &&
                  (auVar255._8_4_ <= auVar76._8_4_ || auVar255._12_4_ != auVar76._12_4_)) {
                *(undefined4 *)((long)pvVar55 + (long)pvVar54 * 4 + 4) = 0x3f800000;
              }
              auVar255 = (auVar191 | auVar67) ^ auVar79;
              iVar265 = auVar255._4_4_;
              if (iVar265 <= iVar10 && (iVar265 != iVar10 || auVar255._0_4_ <= auVar76._0_4_)) {
                *(undefined4 *)((long)pvVar55 + (long)pvVar54 * 4 + 8) = 0x3f800000;
                *(undefined4 *)((long)pvVar55 + (long)pvVar54 * 4 + 0xc) = 0x3f800000;
              }
              pvVar54 = (void *)((long)pvVar54 + 4);
            } while (pvVar39 != pvVar54);
          }
          if (0 < (int)uVar15) {
            pvVar39 = bottom_blob->data;
            iVar10 = bottom_blob->w;
            sVar18 = bottom_blob->elemsize;
            pAVar50 = (Allocator *)0x0;
            do {
              if (0 < (int)uVar13) {
                uVar51 = 0;
                do {
                  *(float *)((long)pvVar55 + uVar51 * 4) =
                       *(float *)((long)pvVar39 + uVar51 * 4) *
                       *(float *)((long)pvVar55 + uVar51 * 4);
                  uVar51 = uVar51 + 1;
                } while (uVar35 != uVar51);
              }
              pAVar50 = pAVar50 + 1;
              pvVar39 = (void *)((long)pvVar39 + (long)iVar10 * sVar18);
            } while (pAVar50 != pAVar36);
          }
LAB_0034d54a:
          uVar14 = (uint)pvVar39;
          uVar41 = uVar41 & 0xffffffff;
          bVar59 = false;
          unaff_R15D = 0;
          pMVar44 = (Mat *)((ulong)pMVar44 & 0xffffffff);
        }
        else {
          bVar59 = true;
        }
      }
      if (!bVar59) break;
    }
    else if (uVar12 == 1) {
      iVar11 = bottom_blob->w;
      pMVar44 = (Mat *)0x1;
      Mat::create(top_blob,1,(size_t)pMVar42,opt->blob_allocator);
      if ((long)iVar11 < 1) {
        fVar60 = 1.0;
      }
      else {
        fVar60 = 1.0;
        lVar56 = 0;
        do {
          fVar60 = fVar60 * *(float *)((long)bottom_blob->data + lVar56 * 4);
          lVar56 = lVar56 + 1;
        } while (iVar11 != lVar56);
      }
      goto LAB_0034bc6f;
    }
    bVar25 = (byte)uVar41;
    if (uVar12 == 3) {
      uVar14 = bottom_blob->w;
      lVar56 = (long)(int)uVar14;
      uVar13 = bottom_blob->h;
      uVar35 = (ulong)uVar13;
      uVar15 = bottom_blob->c;
      pMVar17 = (Mat *)(ulong)uVar15;
      uVar33 = uVar13 * uVar14;
      auVar77._8_4_ = 0xffffffff;
      auVar77._0_8_ = 0xffffffffffffffff;
      auVar77._12_4_ = 0xffffffff;
      auVar78._0_8_ = SUB168(auVar77 ^ auVar273,0) << 0x3f;
      auVar78._8_8_ = SUB168(auVar77 ^ auVar273,8) << 0x3f;
      iVar10 = movmskpd(uVar15,auVar78);
      pMVar16 = (Mat *)(uVar41 & 0xffffffff ^ 1);
      cVar26 = (char)pMVar16;
      if ((iVar10 != 0) || (cVar26 != '\0')) {
        if (iVar10 != 0 || bVar25 != 0) {
          uVar41 = (ulong)uVar14;
          bVar8 = (byte)iVar10 >> 1 | bVar43;
          if ((bVar8 & 1) == 0 && cVar26 == '\0') {
            if (iVar11 == 0) {
              Mat::create(top_blob,uVar13,(size_t)pMVar42,opt->blob_allocator);
            }
            else {
              Mat::create(top_blob,1,uVar13,1,(size_t)pMVar42,opt->blob_allocator);
            }
            local_b8.cstep = 0;
            local_b8.data = (Allocator *)0x0;
            local_b8.refcount._0_4_ = 0;
            local_b8.refcount._4_4_ = 0;
            local_b8.elemsize._0_4_ = 0;
            local_b8.elemsize._4_4_ = 0;
            local_b8.elempack = 0;
            local_b8.allocator = (Allocator *)0x0;
            local_b8.dims = 0;
            local_b8.w = 0;
            local_b8.h = 0;
            local_b8.d = 0;
            local_b8.c = 0;
            pMVar16 = pMVar17;
            Mat::create(&local_b8,1,uVar13,uVar15,(size_t)pMVar42,opt->workspace_allocator);
            auVar264 = _DAT_00544250;
            auVar67 = _DAT_00544240;
            auVar79 = _DAT_0053f020;
            unaff_R15D = -100;
            if (((Allocator *)local_b8.data != (Allocator *)0x0) &&
               (pMVar16 = (Mat *)local_b8.cstep, local_b8.cstep * (long)local_b8.c != 0)) {
              uVar33 = (int)local_b8.cstep * local_b8.c;
              if (0 < (int)uVar33) {
                lVar20 = (ulong)uVar33 - 1;
                auVar84._8_4_ = (int)lVar20;
                auVar84._0_8_ = lVar20;
                auVar84._12_4_ = (int)((ulong)lVar20 >> 0x20);
                uVar51 = 0;
                auVar84 = auVar84 ^ _DAT_0053f020;
                do {
                  auVar196._8_4_ = (int)uVar51;
                  auVar196._0_8_ = uVar51;
                  auVar196._12_4_ = (int)(uVar51 >> 0x20);
                  auVar255 = (auVar196 | auVar264) ^ auVar79;
                  iVar10 = auVar84._4_4_;
                  if ((bool)(~(iVar10 < auVar255._4_4_ ||
                              auVar84._0_4_ < auVar255._0_4_ && auVar255._4_4_ == iVar10) & 1)) {
                    *(undefined4 *)((long)local_b8.data + uVar51 * 4) = 0x3f800000;
                  }
                  if (auVar255._12_4_ <= auVar84._12_4_ &&
                      (auVar255._8_4_ <= auVar84._8_4_ || auVar255._12_4_ != auVar84._12_4_)) {
                    *(undefined4 *)((long)local_b8.data + uVar51 * 4 + 4) = 0x3f800000;
                  }
                  auVar255 = (auVar196 | auVar67) ^ auVar79;
                  iVar265 = auVar255._4_4_;
                  if (iVar265 <= iVar10 && (iVar265 != iVar10 || auVar255._0_4_ <= auVar84._0_4_)) {
                    *(undefined4 *)((long)local_b8.data + uVar51 * 4 + 8) = 0x3f800000;
                    *(undefined4 *)((long)local_b8.data + uVar51 * 4 + 0xc) = 0x3f800000;
                  }
                  uVar51 = uVar51 + 4;
                } while ((uVar33 + 3 & 0xfffffffc) != uVar51);
              }
              if (0 < (int)uVar15) {
                pvVar39 = bottom_blob->data;
                sVar18 = bottom_blob->elemsize;
                sVar21 = bottom_blob->cstep;
                pMVar29 = (Mat *)0x0;
                do {
                  if (0 < (int)uVar13) {
                    uVar51 = 0;
                    pvVar55 = pvVar39;
                    do {
                      auVar176 = ZEXT816(0x3f800000);
                      if (0 < (int)uVar14) {
                        uVar57 = 0;
                        auVar176 = ZEXT816(0x3f800000);
                        do {
                          auVar176._0_4_ = auVar176._0_4_ * *(float *)((long)pvVar55 + uVar57 * 4);
                          uVar57 = uVar57 + 1;
                        } while (uVar41 != uVar57);
                      }
                      *(int *)((long)local_b8.data +
                              uVar51 * 4 +
                              CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize) *
                              local_b8.cstep * (long)pMVar29) = auVar176._0_4_;
                      uVar51 = uVar51 + 1;
                      pvVar55 = (void *)((long)pvVar55 + lVar56 * 4);
                    } while (uVar51 != uVar35);
                  }
                  pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                  pvVar39 = (void *)((long)pvVar39 + sVar18 * sVar21);
                } while (pMVar29 != pMVar17);
              }
              auVar264 = _DAT_00544250;
              auVar67 = _DAT_00544240;
              auVar79 = _DAT_0053f020;
              uVar14 = top_blob->c * (int)top_blob->cstep;
              if (0 < (int)uVar14) {
                pvVar39 = top_blob->data;
                lVar56 = (ulong)uVar14 - 1;
                auVar85._8_4_ = (int)lVar56;
                auVar85._0_8_ = lVar56;
                auVar85._12_4_ = (int)((ulong)lVar56 >> 0x20);
                uVar41 = 0;
                auVar85 = auVar85 ^ _DAT_0053f020;
                do {
                  auVar197._8_4_ = (int)uVar41;
                  auVar197._0_8_ = uVar41;
                  auVar197._12_4_ = (int)(uVar41 >> 0x20);
                  auVar255 = (auVar197 | auVar264) ^ auVar79;
                  iVar10 = auVar85._4_4_;
                  if ((bool)(~(iVar10 < auVar255._4_4_ ||
                              auVar85._0_4_ < auVar255._0_4_ && auVar255._4_4_ == iVar10) & 1)) {
                    *(undefined4 *)((long)pvVar39 + uVar41 * 4) = 0x3f800000;
                  }
                  if (auVar255._12_4_ <= auVar85._12_4_ &&
                      (auVar255._8_4_ <= auVar85._8_4_ || auVar255._12_4_ != auVar85._12_4_)) {
                    *(undefined4 *)((long)pvVar39 + uVar41 * 4 + 4) = 0x3f800000;
                  }
                  auVar255 = (auVar197 | auVar67) ^ auVar79;
                  iVar265 = auVar255._4_4_;
                  if (iVar265 <= iVar10 && (iVar265 != iVar10 || auVar255._0_4_ <= auVar85._0_4_)) {
                    *(undefined4 *)((long)pvVar39 + uVar41 * 4 + 8) = 0x3f800000;
                    *(undefined4 *)((long)pvVar39 + uVar41 * 4 + 0xc) = 0x3f800000;
                  }
                  uVar41 = uVar41 + 4;
                } while ((uVar14 + 3 & 0xfffffffc) != uVar41);
              }
              if (0 < (int)uVar15) {
                pMVar16 = (Mat *)(local_b8.cstep *
                                 CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize));
                pvVar39 = top_blob->data;
                pMVar29 = (Mat *)0x0;
                pAVar36 = (Allocator *)local_b8.data;
                do {
                  if (0 < (int)uVar13) {
                    uVar41 = 0;
                    do {
                      *(float *)((long)pvVar39 + uVar41 * 4) =
                           *(float *)(pAVar36 + uVar41 * 4) * *(float *)((long)pvVar39 + uVar41 * 4)
                      ;
                      uVar41 = uVar41 + 1;
                    } while (uVar35 != uVar41);
                  }
                  pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                  pAVar36 = pAVar36 + (long)pMVar16;
                } while (pMVar29 != pMVar17);
              }
              unaff_R15D = 0;
            }
            piVar7 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
            if (piVar7 != (int *)0x0) {
              LOCK();
              *piVar7 = *piVar7 + -1;
              UNLOCK();
              if (*piVar7 == 0) {
                if (local_b8.allocator == (Allocator *)0x0) {
LAB_00351579:
                  if ((Allocator *)local_b8.data != (Allocator *)0x0) {
                    free(local_b8.data);
                  }
                }
                else {
                  (**(code **)(*(long *)local_b8.allocator + 0x18))();
                }
              }
            }
          }
          else {
            bVar9 = (byte)iVar10 | bVar31;
            if ((bVar9 & 1) != 0 || cVar26 != '\0') {
              if ((bVar8 & 1) == 0 && bVar25 == 0) {
                if (iVar11 == 0) {
                  pMVar16 = pMVar42;
                  Mat::create(top_blob,uVar13,uVar15,(size_t)pMVar42,opt->blob_allocator);
                }
                else {
                  pMVar16 = pMVar17;
                  Mat::create(top_blob,1,uVar13,uVar15,(size_t)pMVar42,opt->blob_allocator);
                }
                if ((int)uVar15 < 1) {
                  bVar59 = false;
                  unaff_R15D = 0;
                }
                else {
                  sVar18 = bottom_blob->elemsize;
                  if (iVar11 == 0) {
                    sVar21 = (size_t)top_blob->w;
                  }
                  else {
                    sVar21 = top_blob->cstep;
                  }
                  pvVar39 = bottom_blob->data;
                  sVar22 = top_blob->elemsize;
                  sVar5 = bottom_blob->cstep;
                  pvVar55 = top_blob->data;
                  pMVar29 = (Mat *)0x0;
                  unaff_R15D = 0;
                  do {
                    if (0 < (int)uVar13) {
                      uVar51 = 0;
                      pvVar54 = pvVar39;
                      do {
                        auVar182 = ZEXT816(0x3f800000);
                        if (0 < (int)uVar14) {
                          uVar57 = 0;
                          auVar182 = ZEXT816(0x3f800000);
                          do {
                            auVar182._0_4_ = auVar182._0_4_ * *(float *)((long)pvVar54 + uVar57 * 4)
                            ;
                            uVar57 = uVar57 + 1;
                          } while (uVar41 != uVar57);
                        }
                        *(int *)((long)pvVar55 + uVar51 * 4 + sVar21 * sVar22 * (long)pMVar29) =
                             auVar182._0_4_;
                        uVar51 = uVar51 + 1;
                        pvVar54 = (void *)((long)pvVar54 + lVar56 * 4);
                      } while (uVar51 != uVar35);
                    }
                    pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                    pvVar39 = (void *)((long)pvVar39 + sVar18 * sVar5);
                    bVar59 = false;
                    pMVar16 = top_blob;
                  } while (pMVar29 != pMVar17);
                }
              }
              else if (((bVar43 | bVar31) & 1) == 0 && cVar26 == '\0') {
                if (iVar11 == 0) {
                  pMVar16 = pMVar42;
                  Mat::create(top_blob,uVar14,uVar13,(size_t)pMVar42,opt->blob_allocator);
                }
                else {
                  pMVar16 = (Mat *)0x1;
                  Mat::create(top_blob,uVar14,uVar13,1,(size_t)pMVar42,opt->blob_allocator);
                }
                auVar264 = _DAT_00544250;
                auVar67 = _DAT_00544240;
                auVar79 = _DAT_0053f020;
                uVar14 = top_blob->c * (int)top_blob->cstep;
                if (0 < (int)uVar14) {
                  pMVar16 = (Mat *)top_blob->data;
                  lVar56 = (ulong)uVar14 - 1;
                  auVar121._8_4_ = (int)lVar56;
                  auVar121._0_8_ = lVar56;
                  auVar121._12_4_ = (int)((ulong)lVar56 >> 0x20);
                  uVar41 = 0;
                  auVar121 = auVar121 ^ _DAT_0053f020;
                  do {
                    auVar224._8_4_ = (int)uVar41;
                    auVar224._0_8_ = uVar41;
                    auVar224._12_4_ = (int)(uVar41 >> 0x20);
                    auVar255 = (auVar224 | auVar264) ^ auVar79;
                    iVar10 = auVar121._4_4_;
                    if ((bool)(~(iVar10 < auVar255._4_4_ ||
                                auVar121._0_4_ < auVar255._0_4_ && auVar255._4_4_ == iVar10) & 1)) {
                      *(undefined4 *)((long)&pMVar16->data + uVar41 * 4) = 0x3f800000;
                    }
                    if (auVar255._12_4_ <= auVar121._12_4_ &&
                        (auVar255._8_4_ <= auVar121._8_4_ || auVar255._12_4_ != auVar121._12_4_)) {
                      *(undefined4 *)((long)&pMVar16->data + uVar41 * 4 + 4) = 0x3f800000;
                    }
                    auVar255 = (auVar224 | auVar67) ^ auVar79;
                    iVar265 = auVar255._4_4_;
                    if (iVar265 <= iVar10 && (iVar265 != iVar10 || auVar255._0_4_ <= auVar121._0_4_)
                       ) {
                      *(undefined4 *)((long)&pMVar16->refcount + uVar41 * 4) = 0x3f800000;
                      *(undefined4 *)((long)&pMVar16->refcount + uVar41 * 4 + 4) = 0x3f800000;
                    }
                    uVar41 = uVar41 + 4;
                  } while ((uVar14 + 3 & 0xfffffffc) != uVar41);
                }
                if ((int)uVar15 < 1) {
LAB_00354f15:
                  bVar59 = false;
                  unaff_R15D = 0;
                }
                else {
                  sVar18 = bottom_blob->elemsize;
                  sVar21 = bottom_blob->cstep;
                  pMVar16 = (Mat *)bottom_blob->data;
                  pvVar39 = top_blob->data;
                  pMVar29 = (Mat *)0x0;
                  unaff_R15D = 0;
                  do {
                    if (0 < (int)uVar33) {
                      uVar41 = 0;
                      do {
                        *(float *)((long)pvVar39 + uVar41 * 4) =
                             *(float *)((long)&pMVar16->data + uVar41 * 4) *
                             *(float *)((long)pvVar39 + uVar41 * 4);
                        uVar41 = uVar41 + 1;
                      } while (uVar33 != uVar41);
                    }
                    pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                    pMVar16 = (Mat *)((long)&pMVar16->data + sVar18 * sVar21);
                    bVar59 = false;
                  } while (pMVar29 != pMVar17);
                }
              }
              else {
                bVar59 = true;
                if ((bVar9 & 1) == 0 && bVar25 == 0) {
                  if (iVar11 == 0) {
                    Mat::create(top_blob,uVar14,uVar15,(size_t)pMVar42,opt->blob_allocator);
                  }
                  else {
                    Mat::create(top_blob,uVar14,1,uVar15,(size_t)pMVar42,opt->blob_allocator);
                  }
                  auVar264 = _DAT_00544250;
                  auVar67 = _DAT_00544240;
                  auVar79 = _DAT_0053f020;
                  sVar18 = top_blob->cstep;
                  uVar33 = top_blob->c * (int)sVar18;
                  pMVar16 = (Mat *)(ulong)uVar33;
                  if (0 < (int)uVar33) {
                    pvVar39 = top_blob->data;
                    pMVar16 = (Mat *)(ulong)(uVar33 + 3 & 0xfffffffc);
                    lVar56 = (ulong)uVar33 - 1;
                    auVar124._8_4_ = (int)lVar56;
                    auVar124._0_8_ = lVar56;
                    auVar124._12_4_ = (int)((ulong)lVar56 >> 0x20);
                    pMVar29 = (Mat *)0x0;
                    auVar124 = auVar124 ^ _DAT_0053f020;
                    do {
                      auVar227._8_4_ = (int)pMVar29;
                      auVar227._0_8_ = pMVar29;
                      auVar227._12_4_ = (int)((ulong)pMVar29 >> 0x20);
                      auVar255 = (auVar227 | auVar264) ^ auVar79;
                      iVar10 = auVar124._4_4_;
                      if ((bool)(~(iVar10 < auVar255._4_4_ ||
                                  auVar124._0_4_ < auVar255._0_4_ && auVar255._4_4_ == iVar10) & 1))
                      {
                        *(undefined4 *)((long)pvVar39 + (long)pMVar29 * 4) = 0x3f800000;
                      }
                      if (auVar255._12_4_ <= auVar124._12_4_ &&
                          (auVar255._8_4_ <= auVar124._8_4_ || auVar255._12_4_ != auVar124._12_4_))
                      {
                        *(undefined4 *)((long)pvVar39 + (long)pMVar29 * 4 + 4) = 0x3f800000;
                      }
                      auVar255 = (auVar227 | auVar67) ^ auVar79;
                      iVar265 = auVar255._4_4_;
                      if (iVar265 <= iVar10 &&
                          (iVar265 != iVar10 || auVar255._0_4_ <= auVar124._0_4_)) {
                        *(undefined4 *)((long)pvVar39 + (long)pMVar29 * 4 + 8) = 0x3f800000;
                        *(undefined4 *)((long)pvVar39 + (long)pMVar29 * 4 + 0xc) = 0x3f800000;
                      }
                      pMVar29 = (Mat *)((long)&pMVar29->data + 4);
                    } while (pMVar16 != pMVar29);
                  }
                  if ((int)uVar15 < 1) goto LAB_00354f15;
                  pAVar36 = (Allocator *)bottom_blob->data;
                  sVar21 = bottom_blob->elemsize;
                  pvVar39 = top_blob->data;
                  if (iVar11 == 0) {
                    sVar18 = (long)top_blob->w;
                  }
                  sVar22 = top_blob->elemsize;
                  sVar5 = bottom_blob->cstep;
                  pMVar16 = (Mat *)((long)(int)uVar14 * 4);
                  pMVar29 = (Mat *)0x0;
                  unaff_R15D = 0;
                  do {
                    if (0 < (int)uVar13) {
                      uVar15 = 0;
                      pAVar50 = pAVar36;
                      do {
                        if (0 < (int)uVar14) {
                          uVar35 = 0;
                          do {
                            *(float *)((long)pvVar39 + uVar35 * 4) =
                                 *(float *)(pAVar50 + uVar35 * 4) *
                                 *(float *)((long)pvVar39 + uVar35 * 4);
                            uVar35 = uVar35 + 1;
                          } while (uVar41 != uVar35);
                        }
                        uVar15 = uVar15 + 1;
                        pAVar50 = pAVar50 + (long)pMVar16;
                      } while (uVar15 != uVar13);
                    }
                    pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                    pAVar36 = pAVar36 + sVar21 * sVar5;
                    pvVar39 = (void *)((long)pvVar39 + sVar18 * sVar22);
                    bVar59 = false;
                  } while (pMVar29 != pMVar17);
                }
              }
              goto LAB_003515b9;
            }
            if (iVar11 == 0) {
              Mat::create(top_blob,uVar14,(size_t)pMVar42,opt->blob_allocator);
            }
            else {
              Mat::create(top_blob,uVar14,1,1,(size_t)pMVar42,opt->blob_allocator);
            }
            local_b8.cstep = 0;
            local_b8.data = (Allocator *)0x0;
            local_b8.refcount._0_4_ = 0;
            local_b8.refcount._4_4_ = 0;
            local_b8.elemsize._0_4_ = 0;
            local_b8.elemsize._4_4_ = 0;
            local_b8.elempack = 0;
            local_b8.allocator = (Allocator *)0x0;
            local_b8.dims = 0;
            local_b8.w = 0;
            local_b8.h = 0;
            local_b8.d = 0;
            local_b8.c = 0;
            pMVar16 = pMVar17;
            Mat::create(&local_b8,uVar14,1,uVar15,(size_t)pMVar42,opt->workspace_allocator);
            auVar264 = _DAT_00544250;
            auVar67 = _DAT_00544240;
            auVar79 = _DAT_0053f020;
            unaff_R15D = -100;
            if (((Allocator *)local_b8.data != (Allocator *)0x0) &&
               (pMVar16 = (Mat *)local_b8.cstep, local_b8.cstep * (long)local_b8.c != 0)) {
              uVar33 = (int)local_b8.cstep * local_b8.c;
              if (0 < (int)uVar33) {
                lVar20 = (ulong)uVar33 - 1;
                auVar90._8_4_ = (int)lVar20;
                auVar90._0_8_ = lVar20;
                auVar90._12_4_ = (int)((ulong)lVar20 >> 0x20);
                uVar35 = 0;
                auVar90 = auVar90 ^ _DAT_0053f020;
                do {
                  auVar202._8_4_ = (int)uVar35;
                  auVar202._0_8_ = uVar35;
                  auVar202._12_4_ = (int)(uVar35 >> 0x20);
                  auVar255 = (auVar202 | auVar264) ^ auVar79;
                  iVar10 = auVar90._4_4_;
                  if ((bool)(~(iVar10 < auVar255._4_4_ ||
                              auVar90._0_4_ < auVar255._0_4_ && auVar255._4_4_ == iVar10) & 1)) {
                    *(undefined4 *)((long)local_b8.data + uVar35 * 4) = 0x3f800000;
                  }
                  if (auVar255._12_4_ <= auVar90._12_4_ &&
                      (auVar255._8_4_ <= auVar90._8_4_ || auVar255._12_4_ != auVar90._12_4_)) {
                    *(undefined4 *)((long)local_b8.data + uVar35 * 4 + 4) = 0x3f800000;
                  }
                  auVar255 = (auVar202 | auVar67) ^ auVar79;
                  iVar265 = auVar255._4_4_;
                  if (iVar265 <= iVar10 && (iVar265 != iVar10 || auVar255._0_4_ <= auVar90._0_4_)) {
                    *(undefined4 *)((long)local_b8.data + uVar35 * 4 + 8) = 0x3f800000;
                    *(undefined4 *)((long)local_b8.data + uVar35 * 4 + 0xc) = 0x3f800000;
                  }
                  uVar35 = uVar35 + 4;
                } while ((uVar33 + 3 & 0xfffffffc) != uVar35);
              }
              if (0 < (int)uVar15) {
                pvVar39 = bottom_blob->data;
                sVar18 = bottom_blob->elemsize;
                sVar21 = bottom_blob->cstep;
                pMVar29 = (Mat *)0x0;
                pAVar36 = (Allocator *)local_b8.data;
                do {
                  if (0 < (int)uVar13) {
                    uVar33 = 0;
                    pvVar55 = pvVar39;
                    do {
                      if (0 < (int)uVar14) {
                        uVar35 = 0;
                        do {
                          *(float *)(pAVar36 + uVar35 * 4) =
                               *(float *)((long)pvVar55 + uVar35 * 4) *
                               *(float *)(pAVar36 + uVar35 * 4);
                          uVar35 = uVar35 + 1;
                        } while (uVar41 != uVar35);
                      }
                      uVar33 = uVar33 + 1;
                      pvVar55 = (void *)((long)pvVar55 + lVar56 * 4);
                    } while (uVar33 != uVar13);
                  }
                  pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                  pvVar39 = (void *)((long)pvVar39 + sVar18 * sVar21);
                  pAVar36 = pAVar36 + CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize) *
                                      local_b8.cstep;
                } while (pMVar29 != pMVar17);
              }
              auVar264 = _DAT_00544250;
              auVar67 = _DAT_00544240;
              auVar79 = _DAT_0053f020;
              uVar13 = top_blob->c * (int)top_blob->cstep;
              if (0 < (int)uVar13) {
                pvVar39 = top_blob->data;
                lVar56 = (ulong)uVar13 - 1;
                auVar91._8_4_ = (int)lVar56;
                auVar91._0_8_ = lVar56;
                auVar91._12_4_ = (int)((ulong)lVar56 >> 0x20);
                uVar35 = 0;
                auVar91 = auVar91 ^ _DAT_0053f020;
                do {
                  auVar203._8_4_ = (int)uVar35;
                  auVar203._0_8_ = uVar35;
                  auVar203._12_4_ = (int)(uVar35 >> 0x20);
                  auVar255 = (auVar203 | auVar264) ^ auVar79;
                  iVar10 = auVar91._4_4_;
                  if ((bool)(~(iVar10 < auVar255._4_4_ ||
                              auVar91._0_4_ < auVar255._0_4_ && auVar255._4_4_ == iVar10) & 1)) {
                    *(undefined4 *)((long)pvVar39 + uVar35 * 4) = 0x3f800000;
                  }
                  if (auVar255._12_4_ <= auVar91._12_4_ &&
                      (auVar255._8_4_ <= auVar91._8_4_ || auVar255._12_4_ != auVar91._12_4_)) {
                    *(undefined4 *)((long)pvVar39 + uVar35 * 4 + 4) = 0x3f800000;
                  }
                  auVar255 = (auVar203 | auVar67) ^ auVar79;
                  iVar265 = auVar255._4_4_;
                  if (iVar265 <= iVar10 && (iVar265 != iVar10 || auVar255._0_4_ <= auVar91._0_4_)) {
                    *(undefined4 *)((long)pvVar39 + uVar35 * 4 + 8) = 0x3f800000;
                    *(undefined4 *)((long)pvVar39 + uVar35 * 4 + 0xc) = 0x3f800000;
                  }
                  uVar35 = uVar35 + 4;
                } while ((uVar13 + 3 & 0xfffffffc) != uVar35);
              }
              if (0 < (int)uVar15) {
                pMVar16 = (Mat *)(local_b8.cstep *
                                 CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize));
                pvVar39 = top_blob->data;
                pMVar29 = (Mat *)0x0;
                pAVar36 = (Allocator *)local_b8.data;
                do {
                  if (0 < (int)uVar14) {
                    uVar35 = 0;
                    do {
                      *(float *)((long)pvVar39 + uVar35 * 4) =
                           *(float *)(pAVar36 + uVar35 * 4) * *(float *)((long)pvVar39 + uVar35 * 4)
                      ;
                      uVar35 = uVar35 + 1;
                    } while (uVar41 != uVar35);
                  }
                  pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                  pAVar36 = pAVar36 + (long)pMVar16;
                } while (pMVar29 != pMVar17);
              }
              unaff_R15D = 0;
            }
            piVar7 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
            if (piVar7 != (int *)0x0) {
              LOCK();
              *piVar7 = *piVar7 + -1;
              UNLOCK();
              if (*piVar7 == 0) {
                if (local_b8.allocator == (Allocator *)0x0) goto LAB_00351579;
                (**(code **)(*(long *)local_b8.allocator + 0x18))();
              }
            }
          }
          goto LAB_00351592;
        }
        pMVar16 = (Mat *)opt->blob_allocator;
        if (iVar11 == 0) {
          Mat::create(top_blob,uVar15,(size_t)pMVar42,(Allocator *)pMVar16);
        }
        else {
          pMVar29 = pMVar17;
          Mat::create(top_blob,1,1,uVar15,(size_t)pMVar42,(Allocator *)pMVar16);
          pMVar16 = pMVar29;
        }
        if ((int)uVar15 < 1) {
          bVar59 = false;
          unaff_R15D = 0;
        }
        else {
          pAVar36 = (Allocator *)bottom_blob->data;
          pvVar39 = top_blob->data;
          sVar18 = top_blob->elemsize;
          sVar21 = top_blob->cstep;
          pMVar16 = (Mat *)(bottom_blob->elemsize * bottom_blob->cstep);
          pMVar29 = (Mat *)0x0;
          do {
            auVar173 = ZEXT816(0x3f800000);
            if (0 < (int)uVar33) {
              uVar41 = 0;
              auVar173 = ZEXT816(0x3f800000);
              do {
                auVar173._0_4_ = auVar173._0_4_ * *(float *)(pAVar36 + uVar41 * 4);
                uVar41 = uVar41 + 1;
              } while (uVar33 != uVar41);
            }
            lVar56 = sVar18 * sVar21 * (long)pMVar29;
            if (iVar11 == 0) {
              lVar56 = (long)pMVar29 * 4;
            }
            *(int *)((long)pvVar39 + lVar56) = auVar173._0_4_;
            pMVar29 = (Mat *)((long)&pMVar29->data + 1);
            pAVar36 = pAVar36 + (long)pMVar16;
          } while (pMVar29 != pMVar17);
          bVar59 = false;
          unaff_R15D = 0;
        }
      }
      else {
        if (iVar11 == 0) {
          Mat::create(top_blob,1,(size_t)pMVar42,opt->blob_allocator);
        }
        else {
          Mat::create(top_blob,1,1,1,(size_t)pMVar42,opt->blob_allocator);
        }
        pMVar16 = (Mat *)opt->workspace_allocator;
        local_b8.cstep = 0;
        local_b8.data = (void *)0x0;
        local_b8.refcount._0_4_ = 0;
        local_b8.refcount._4_4_ = 0;
        local_b8.elemsize._0_4_ = 0;
        local_b8.elemsize._4_4_ = 0;
        local_b8.elempack = 0;
        local_b8.allocator = (Allocator *)0x0;
        local_b8.dims = 0;
        local_b8.w = 0;
        local_b8.h = 0;
        local_b8.d = 0;
        local_b8.c = 0;
        Mat::create(&local_b8,uVar15,(size_t)pMVar42,(Allocator *)pMVar16);
        unaff_R15D = -100;
        if ((local_b8.data != (void *)0x0) &&
           (pMVar16 = (Mat *)((long)local_b8.c * local_b8.cstep), pMVar16 != (Mat *)0x0)) {
          if ((int)uVar15 < 1) {
            fVar60 = 1.0;
          }
          else {
            sVar18 = bottom_blob->elemsize;
            sVar21 = bottom_blob->cstep;
            pvVar39 = bottom_blob->data;
            pMVar16 = (Mat *)0x0;
            do {
              auVar172 = ZEXT816(0x3f800000);
              if (0 < (int)uVar33) {
                uVar41 = 0;
                auVar172 = ZEXT816(0x3f800000);
                do {
                  auVar172._0_4_ = auVar172._0_4_ * *(float *)((long)pvVar39 + uVar41 * 4);
                  uVar41 = uVar41 + 1;
                } while (uVar33 != uVar41);
              }
              *(int *)((long)local_b8.data + (long)pMVar16 * 4) = auVar172._0_4_;
              pMVar16 = (Mat *)((long)&pMVar16->data + 1);
              pvVar39 = (void *)((long)pvVar39 + sVar18 * sVar21);
            } while (pMVar16 != pMVar17);
            fVar60 = 1.0;
            pMVar16 = (Mat *)0x0;
            do {
              fVar60 = fVar60 * *(float *)((long)local_b8.data + (long)pMVar16 * 4);
              pMVar16 = (Mat *)((long)&pMVar16->data + 1);
            } while (pMVar17 != pMVar16);
          }
          *(float *)top_blob->data = fVar60;
          unaff_R15D = 0;
        }
        piVar7 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            if (local_b8.allocator == (Allocator *)0x0) {
              if (local_b8.data != (void *)0x0) {
                free(local_b8.data);
              }
            }
            else {
              (**(code **)(*(long *)local_b8.allocator + 0x18))();
            }
          }
        }
LAB_00351592:
        local_b8.cstep = 0;
        local_b8.data = (void *)0x0;
        local_b8.refcount._0_4_ = 0;
        local_b8.refcount._4_4_ = 0;
        local_b8.elemsize._0_4_ = 0;
        local_b8.elemsize._4_4_ = 0;
        local_b8.elempack = 0;
        local_b8.dims = 0;
        local_b8.w = 0;
        local_b8.h = 0;
        local_b8.d = 0;
        local_b8.c = 0;
        bVar59 = false;
      }
LAB_003515b9:
      uVar14 = (uint)pMVar16;
      pMVar44 = (Mat *)((ulong)pMVar44 & 0xffffffff);
      if (!bVar59) break;
    }
    if (uVar12 != 4) goto LAB_00358731;
    uVar12 = bottom_blob->w;
    lVar56 = (long)(int)uVar12;
    uVar13 = bottom_blob->h;
    uVar35 = (ulong)uVar13;
    uVar15 = bottom_blob->d;
    uVar51 = (ulong)uVar15;
    uVar33 = bottom_blob->c;
    uVar41 = (ulong)uVar33;
    uVar53 = uVar13 * uVar12;
    uVar34 = uVar53 * uVar15;
    auVar101._8_4_ = 0xffffffff;
    auVar101._0_8_ = 0xffffffffffffffff;
    auVar101._12_4_ = 0xffffffff;
    auVar102._0_8_ = SUB168(auVar101 ^ auVar273,0) << 0x3f;
    auVar102._8_8_ = SUB168(auVar101 ^ auVar273,8) << 0x3f;
    iVar10 = movmskpd(uVar14,auVar102);
    bVar59 = iVar10 == 0;
    bVar8 = (byte)pMVar44;
    bVar9 = bVar8 ^ 1;
    bVar32 = bVar25 ^ 1;
    if ((bVar59 && bVar9 == 0) && (bVar32 == 0)) {
      if (iVar11 == 0) {
        Mat::create(top_blob,1,(size_t)pMVar42,opt->blob_allocator);
      }
      else {
        Mat::create(top_blob,1,1,1,1,(size_t)pMVar42,opt->blob_allocator);
      }
      local_b8.cstep = 0;
      local_b8.data = (void *)0x0;
      local_b8.refcount._0_4_ = 0;
      local_b8.refcount._4_4_ = 0;
      local_b8.elemsize._0_4_ = 0;
      local_b8.elemsize._4_4_ = 0;
      local_b8.elempack = 0;
      local_b8.allocator = (Allocator *)0x0;
      local_b8.dims = 0;
      local_b8.w = 0;
      local_b8.h = 0;
      local_b8.d = 0;
      local_b8.c = 0;
      Mat::create(&local_b8,uVar33,(size_t)pMVar42,opt->workspace_allocator);
      unaff_R15D = -100;
      if ((local_b8.data != (void *)0x0) && ((long)local_b8.c * local_b8.cstep != 0)) {
        if ((int)uVar33 < 1) {
          fVar60 = 1.0;
        }
        else {
          sVar18 = bottom_blob->elemsize;
          sVar21 = bottom_blob->cstep;
          pvVar39 = bottom_blob->data;
          uVar35 = 0;
          do {
            fVar60 = 1.0;
            if (0 < (int)uVar34) {
              uVar51 = 0;
              fVar60 = 1.0;
              do {
                fVar60 = fVar60 * *(float *)((long)pvVar39 + uVar51 * 4);
                uVar51 = uVar51 + 1;
              } while (uVar34 != uVar51);
            }
            *(float *)((long)local_b8.data + uVar35 * 4) = fVar60;
            uVar35 = uVar35 + 1;
            pvVar39 = (void *)((long)pvVar39 + sVar18 * sVar21);
          } while (uVar35 != uVar41);
          fVar60 = 1.0;
          uVar35 = 0;
          do {
            fVar60 = fVar60 * *(float *)((long)local_b8.data + uVar35 * 4);
            uVar35 = uVar35 + 1;
          } while (uVar41 != uVar35);
        }
        *(float *)top_blob->data = fVar60;
        unaff_R15D = 0;
      }
      piVar7 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + -1;
        UNLOCK();
        if (*piVar7 == 0) {
          if (local_b8.allocator == (Allocator *)0x0) goto LAB_003586f3;
          (**(code **)(*(long *)local_b8.allocator + 0x18))();
        }
      }
      goto LAB_00358700;
    }
    if ((bVar59 && bVar9 == 0) && bVar25 == 0) {
      if (iVar11 == 0) {
        Mat::create(top_blob,uVar33,(size_t)pMVar42,opt->blob_allocator);
      }
      else {
        Mat::create(top_blob,1,1,1,uVar33,(size_t)pMVar42,opt->blob_allocator);
      }
      if (0 < (int)uVar33) {
        pvVar39 = bottom_blob->data;
        sVar18 = bottom_blob->elemsize;
        pvVar55 = top_blob->data;
        sVar21 = top_blob->elemsize;
        sVar22 = top_blob->cstep;
        sVar5 = bottom_blob->cstep;
        uVar35 = 0;
        do {
          fVar60 = 1.0;
          if (0 < (int)uVar34) {
            uVar51 = 0;
            fVar60 = 1.0;
            do {
              fVar60 = fVar60 * *(float *)((long)pvVar39 + uVar51 * 4);
              uVar51 = uVar51 + 1;
            } while (uVar34 != uVar51);
          }
          lVar56 = sVar21 * sVar22 * uVar35;
          if (iVar11 == 0) {
            lVar56 = uVar35 * 4;
          }
          *(float *)((long)pvVar55 + lVar56) = fVar60;
          uVar35 = uVar35 + 1;
          pvVar39 = (void *)((long)pvVar39 + sVar18 * sVar5);
        } while (uVar35 != uVar41);
      }
      goto LAB_003519f4;
    }
    if ((bVar59 && bVar8 == 0) && bVar32 == 0) {
      if (iVar11 == 0) {
        Mat::create(top_blob,uVar15,(size_t)pMVar42,opt->blob_allocator);
      }
      else {
        Mat::create(top_blob,1,1,uVar15,1,(size_t)pMVar42,opt->blob_allocator);
      }
      local_b8.cstep = 0;
      local_b8.data = (void *)0x0;
      local_b8.refcount._0_4_ = 0;
      local_b8.refcount._4_4_ = 0;
      local_b8.elemsize._0_4_ = 0;
      local_b8.elemsize._4_4_ = 0;
      local_b8.elempack = 0;
      local_b8.allocator = (Allocator *)0x0;
      local_b8.dims = 0;
      local_b8.w = 0;
      local_b8.h = 0;
      local_b8.d = 0;
      local_b8.c = 0;
      Mat::create(&local_b8,1,uVar15,uVar33,(size_t)pMVar42,opt->workspace_allocator);
      auVar67 = _DAT_00544250;
      auVar79 = _DAT_00544240;
      auVar273 = _DAT_0053f020;
      unaff_R15D = -100;
      if ((local_b8.data != (void *)0x0) && (local_b8.cstep * (long)local_b8.c != 0)) {
        uVar12 = (int)local_b8.cstep * local_b8.c;
        if (0 < (int)uVar12) {
          lVar56 = (ulong)uVar12 - 1;
          auVar103._8_4_ = (int)lVar56;
          auVar103._0_8_ = lVar56;
          auVar103._12_4_ = (int)((ulong)lVar56 >> 0x20);
          uVar35 = 0;
          auVar103 = auVar103 ^ _DAT_0053f020;
          do {
            auVar208._8_4_ = (int)uVar35;
            auVar208._0_8_ = uVar35;
            auVar208._12_4_ = (int)(uVar35 >> 0x20);
            auVar264 = (auVar208 | auVar67) ^ auVar273;
            iVar11 = auVar103._4_4_;
            if ((bool)(~(auVar264._4_4_ == iVar11 && auVar103._0_4_ < auVar264._0_4_ ||
                        iVar11 < auVar264._4_4_) & 1)) {
              *(undefined4 *)((long)local_b8.data + uVar35 * 4) = 0x3f800000;
            }
            if ((auVar264._12_4_ != auVar103._12_4_ || auVar264._8_4_ <= auVar103._8_4_) &&
                auVar264._12_4_ <= auVar103._12_4_) {
              *(undefined4 *)((long)local_b8.data + uVar35 * 4 + 4) = 0x3f800000;
            }
            auVar264 = (auVar208 | auVar79) ^ auVar273;
            iVar10 = auVar264._4_4_;
            if (iVar10 <= iVar11 && (iVar10 != iVar11 || auVar264._0_4_ <= auVar103._0_4_)) {
              *(undefined4 *)((long)local_b8.data + uVar35 * 4 + 8) = 0x3f800000;
              *(undefined4 *)((long)local_b8.data + uVar35 * 4 + 0xc) = 0x3f800000;
            }
            uVar35 = uVar35 + 4;
          } while ((uVar12 + 3 & 0xfffffffc) != uVar35);
        }
        if (0 < (int)uVar33) {
          pvVar39 = bottom_blob->data;
          sVar18 = bottom_blob->elemsize;
          sVar21 = bottom_blob->cstep;
          uVar35 = 0;
          do {
            if (0 < (int)uVar15) {
              uVar57 = 0;
              pvVar55 = pvVar39;
              do {
                auVar179 = ZEXT816(0x3f800000);
                if (0 < (int)uVar53) {
                  uVar37 = 0;
                  auVar179 = ZEXT816(0x3f800000);
                  do {
                    auVar179._0_4_ = auVar179._0_4_ * *(float *)((long)pvVar55 + uVar37 * 4);
                    uVar37 = uVar37 + 1;
                  } while (uVar53 != uVar37);
                }
                *(int *)((long)local_b8.data +
                        uVar57 * 4 +
                        CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize) * local_b8.cstep *
                        uVar35) = auVar179._0_4_;
                uVar57 = uVar57 + 1;
                pvVar55 = (void *)((long)pvVar55 + (long)(int)uVar53 * 4);
              } while (uVar57 != uVar51);
            }
            uVar35 = uVar35 + 1;
            pvVar39 = (void *)((long)pvVar39 + sVar18 * sVar21);
          } while (uVar35 != uVar41);
        }
        auVar67 = _DAT_00544250;
        auVar79 = _DAT_00544240;
        auVar273 = _DAT_0053f020;
        uVar12 = top_blob->c * (int)top_blob->cstep;
        if (0 < (int)uVar12) {
          pvVar39 = top_blob->data;
          lVar56 = (ulong)uVar12 - 1;
          auVar104._8_4_ = (int)lVar56;
          auVar104._0_8_ = lVar56;
          auVar104._12_4_ = (int)((ulong)lVar56 >> 0x20);
          uVar35 = 0;
          auVar104 = auVar104 ^ _DAT_0053f020;
          do {
            auVar209._8_4_ = (int)uVar35;
            auVar209._0_8_ = uVar35;
            auVar209._12_4_ = (int)(uVar35 >> 0x20);
            auVar264 = (auVar209 | auVar67) ^ auVar273;
            iVar11 = auVar104._4_4_;
            if ((bool)(~(auVar264._4_4_ == iVar11 && auVar104._0_4_ < auVar264._0_4_ ||
                        iVar11 < auVar264._4_4_) & 1)) {
              *(undefined4 *)((long)pvVar39 + uVar35 * 4) = 0x3f800000;
            }
            if ((auVar264._12_4_ != auVar104._12_4_ || auVar264._8_4_ <= auVar104._8_4_) &&
                auVar264._12_4_ <= auVar104._12_4_) {
              *(undefined4 *)((long)pvVar39 + uVar35 * 4 + 4) = 0x3f800000;
            }
            auVar264 = (auVar209 | auVar79) ^ auVar273;
            iVar10 = auVar264._4_4_;
            if (iVar10 <= iVar11 && (iVar10 != iVar11 || auVar264._0_4_ <= auVar104._0_4_)) {
              *(undefined4 *)((long)pvVar39 + uVar35 * 4 + 8) = 0x3f800000;
              *(undefined4 *)((long)pvVar39 + uVar35 * 4 + 0xc) = 0x3f800000;
            }
            uVar35 = uVar35 + 4;
          } while ((uVar12 + 3 & 0xfffffffc) != uVar35);
        }
        if (0 < (int)uVar33) {
          pvVar39 = top_blob->data;
          uVar35 = 0;
          pvVar55 = local_b8.data;
          do {
            if (0 < (int)uVar15) {
              uVar57 = 0;
              do {
                *(float *)((long)pvVar39 + uVar57 * 4) =
                     *(float *)((long)pvVar55 + uVar57 * 4) * *(float *)((long)pvVar39 + uVar57 * 4)
                ;
                uVar57 = uVar57 + 1;
              } while (uVar51 != uVar57);
            }
            uVar35 = uVar35 + 1;
            pvVar55 = (void *)((long)pvVar55 +
                              local_b8.cstep *
                              CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize));
          } while (uVar35 != uVar41);
        }
        unaff_R15D = 0;
      }
      piVar7 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
      if (piVar7 == (int *)0x0) goto LAB_00358700;
      LOCK();
      *piVar7 = *piVar7 + -1;
      UNLOCK();
      if (*piVar7 != 0) goto LAB_00358700;
      if (local_b8.allocator != (Allocator *)0x0) {
        (**(code **)(*(long *)local_b8.allocator + 0x18))();
        goto LAB_00358700;
      }
      goto LAB_003586f3;
    }
    uVar57 = (ulong)uVar12;
    bVar47 = (byte)iVar10 >> 1 | bVar43;
    if (((bVar47 & 1) != 0 || bVar9 != 0) || bVar32 != 0) {
      bVar27 = (byte)iVar10 | bVar31;
      if (((bVar27 & 1) == 0 && bVar9 == 0) && bVar32 == 0) {
        if (iVar11 == 0) {
          Mat::create(top_blob,uVar12,(size_t)pMVar42,opt->blob_allocator);
        }
        else {
          Mat::create(top_blob,uVar12,1,1,1,(size_t)pMVar42,opt->blob_allocator);
        }
        local_b8.cstep = 0;
        local_b8.data = (void *)0x0;
        local_b8.refcount._0_4_ = 0;
        local_b8.refcount._4_4_ = 0;
        local_b8.elemsize._0_4_ = 0;
        local_b8.elemsize._4_4_ = 0;
        local_b8.elempack = 0;
        local_b8.allocator = (Allocator *)0x0;
        local_b8.dims = 0;
        local_b8.w = 0;
        local_b8.h = 0;
        local_b8.d = 0;
        local_b8.c = 0;
        Mat::create(&local_b8,uVar12,1,uVar33,(size_t)pMVar42,opt->workspace_allocator);
        auVar67 = _DAT_00544250;
        auVar79 = _DAT_00544240;
        auVar273 = _DAT_0053f020;
        unaff_R15D = -100;
        if ((local_b8.data != (void *)0x0) && (local_b8.cstep * (long)local_b8.c != 0)) {
          uVar14 = (int)local_b8.cstep * local_b8.c;
          if (0 < (int)uVar14) {
            lVar20 = (ulong)uVar14 - 1;
            auVar117._8_4_ = (int)lVar20;
            auVar117._0_8_ = lVar20;
            auVar117._12_4_ = (int)((ulong)lVar20 >> 0x20);
            uVar35 = 0;
            auVar117 = auVar117 ^ _DAT_0053f020;
            do {
              auVar220._8_4_ = (int)uVar35;
              auVar220._0_8_ = uVar35;
              auVar220._12_4_ = (int)(uVar35 >> 0x20);
              auVar264 = (auVar220 | auVar67) ^ auVar273;
              iVar11 = auVar117._4_4_;
              if ((bool)(~(auVar264._4_4_ == iVar11 && auVar117._0_4_ < auVar264._0_4_ ||
                          iVar11 < auVar264._4_4_) & 1)) {
                *(undefined4 *)((long)local_b8.data + uVar35 * 4) = 0x3f800000;
              }
              if ((auVar264._12_4_ != auVar117._12_4_ || auVar264._8_4_ <= auVar117._8_4_) &&
                  auVar264._12_4_ <= auVar117._12_4_) {
                *(undefined4 *)((long)local_b8.data + uVar35 * 4 + 4) = 0x3f800000;
              }
              auVar264 = (auVar220 | auVar79) ^ auVar273;
              iVar10 = auVar264._4_4_;
              if (iVar10 <= iVar11 && (iVar10 != iVar11 || auVar264._0_4_ <= auVar117._0_4_)) {
                *(undefined4 *)((long)local_b8.data + uVar35 * 4 + 8) = 0x3f800000;
                *(undefined4 *)((long)local_b8.data + uVar35 * 4 + 0xc) = 0x3f800000;
              }
              uVar35 = uVar35 + 4;
            } while ((uVar14 + 3 & 0xfffffffc) != uVar35);
          }
          if (0 < (int)uVar33) {
            pvVar39 = bottom_blob->data;
            sVar18 = bottom_blob->elemsize;
            sVar21 = bottom_blob->cstep;
            uVar35 = 0;
            pvVar55 = local_b8.data;
            do {
              if (0 < (int)uVar15) {
                pvVar54 = (void *)(sVar18 * sVar21 * uVar35 + (long)pvVar39);
                uVar14 = 0;
                do {
                  if (0 < (int)uVar13) {
                    uVar34 = 0;
                    do {
                      if (0 < (int)uVar12) {
                        uVar51 = 0;
                        do {
                          *(float *)((long)pvVar55 + uVar51 * 4) =
                               *(float *)((long)pvVar54 + uVar51 * 4) *
                               *(float *)((long)pvVar55 + uVar51 * 4);
                          uVar51 = uVar51 + 1;
                        } while (uVar57 != uVar51);
                      }
                      pvVar54 = (void *)((long)pvVar54 + lVar56 * 4);
                      uVar34 = uVar34 + 1;
                    } while (uVar34 != uVar13);
                  }
                  uVar14 = uVar14 + 1;
                } while (uVar14 != uVar15);
              }
              uVar35 = uVar35 + 1;
              pvVar55 = (void *)((long)pvVar55 +
                                CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize) *
                                local_b8.cstep);
            } while (uVar35 != uVar41);
          }
          auVar67 = _DAT_00544250;
          auVar79 = _DAT_00544240;
          auVar273 = _DAT_0053f020;
          uVar14 = top_blob->c * (int)top_blob->cstep;
          if (0 < (int)uVar14) {
            pvVar39 = top_blob->data;
            lVar56 = (ulong)uVar14 - 1;
            auVar118._8_4_ = (int)lVar56;
            auVar118._0_8_ = lVar56;
            auVar118._12_4_ = (int)((ulong)lVar56 >> 0x20);
            uVar35 = 0;
            auVar118 = auVar118 ^ _DAT_0053f020;
            do {
              auVar221._8_4_ = (int)uVar35;
              auVar221._0_8_ = uVar35;
              auVar221._12_4_ = (int)(uVar35 >> 0x20);
              auVar264 = (auVar221 | auVar67) ^ auVar273;
              iVar11 = auVar118._4_4_;
              if ((bool)(~(auVar264._4_4_ == iVar11 && auVar118._0_4_ < auVar264._0_4_ ||
                          iVar11 < auVar264._4_4_) & 1)) {
                *(undefined4 *)((long)pvVar39 + uVar35 * 4) = 0x3f800000;
              }
              if ((auVar264._12_4_ != auVar118._12_4_ || auVar264._8_4_ <= auVar118._8_4_) &&
                  auVar264._12_4_ <= auVar118._12_4_) {
                *(undefined4 *)((long)pvVar39 + uVar35 * 4 + 4) = 0x3f800000;
              }
              auVar264 = (auVar221 | auVar79) ^ auVar273;
              iVar10 = auVar264._4_4_;
              if (iVar10 <= iVar11 && (iVar10 != iVar11 || auVar264._0_4_ <= auVar118._0_4_)) {
                *(undefined4 *)((long)pvVar39 + uVar35 * 4 + 8) = 0x3f800000;
                *(undefined4 *)((long)pvVar39 + uVar35 * 4 + 0xc) = 0x3f800000;
              }
              uVar35 = uVar35 + 4;
            } while ((uVar14 + 3 & 0xfffffffc) != uVar35);
          }
          if (0 < (int)uVar33) {
            pvVar39 = top_blob->data;
            uVar35 = 0;
            pvVar55 = local_b8.data;
            do {
              if (0 < (int)uVar12) {
                uVar51 = 0;
                do {
                  *(float *)((long)pvVar39 + uVar51 * 4) =
                       *(float *)((long)pvVar55 + uVar51 * 4) *
                       *(float *)((long)pvVar39 + uVar51 * 4);
                  uVar51 = uVar51 + 1;
                } while (uVar57 != uVar51);
              }
              uVar35 = uVar35 + 1;
              pvVar55 = (void *)((long)pvVar55 +
                                local_b8.cstep *
                                CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize));
            } while (uVar35 != uVar41);
          }
          unaff_R15D = 0;
        }
        piVar7 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            if (local_b8.allocator == (Allocator *)0x0) goto LAB_003586f3;
            (**(code **)(*(long *)local_b8.allocator + 0x18))();
          }
        }
        goto LAB_00358700;
      }
      if ((bVar59 && bVar8 == 0) && bVar25 == 0) {
        if (iVar11 == 0) {
          Mat::create(top_blob,uVar15,uVar33,(size_t)pMVar42,opt->blob_allocator);
        }
        else {
          Mat::create(top_blob,1,1,uVar15,uVar33,(size_t)pMVar42,opt->blob_allocator);
        }
        if ((int)uVar33 < 1) goto LAB_003519f4;
        sVar18 = bottom_blob->elemsize;
        if (iVar11 == 0) {
          sVar21 = (size_t)top_blob->w;
        }
        else {
          sVar21 = top_blob->cstep;
        }
        pvVar39 = bottom_blob->data;
        sVar22 = top_blob->elemsize;
        sVar5 = bottom_blob->cstep;
        pvVar55 = top_blob->data;
        uVar35 = 0;
        do {
          if (0 < (int)uVar15) {
            uVar57 = 0;
            pvVar54 = pvVar39;
            do {
              auVar185 = ZEXT816(0x3f800000);
              if (0 < (int)uVar53) {
                uVar37 = 0;
                auVar185 = ZEXT816(0x3f800000);
                do {
                  auVar185._0_4_ = auVar185._0_4_ * *(float *)((long)pvVar54 + uVar37 * 4);
                  uVar37 = uVar37 + 1;
                } while (uVar53 != uVar37);
              }
              *(int *)((long)pvVar55 + uVar57 * 4 + sVar21 * sVar22 * uVar35) = auVar185._0_4_;
              uVar57 = uVar57 + 1;
              pvVar54 = (void *)((long)pvVar54 + (long)(int)uVar53 * 4);
            } while (uVar57 != uVar51);
          }
          uVar35 = uVar35 + 1;
          pvVar39 = (void *)((long)pvVar39 + sVar18 * sVar5);
          pMVar44 = (Mat *)0x0;
          unaff_R15D = 0;
        } while (uVar35 != uVar41);
        goto LAB_00358727;
      }
      if (((bVar47 & 1) == 0 && bVar8 == 0) && bVar32 == 0) {
        if (iVar11 == 0) {
          Mat::create(top_blob,uVar13,uVar15,(size_t)pMVar42,opt->blob_allocator);
        }
        else {
          Mat::create(top_blob,1,uVar13,uVar15,1,(size_t)pMVar42,opt->blob_allocator);
        }
        local_b8.cstep = 0;
        local_b8.data = (void *)0x0;
        local_b8.refcount._0_4_ = 0;
        local_b8.refcount._4_4_ = 0;
        local_b8.elemsize._0_4_ = 0;
        local_b8.elemsize._4_4_ = 0;
        local_b8.elempack = 0;
        local_b8.allocator = (Allocator *)0x0;
        local_b8.dims = 0;
        local_b8.w = 0;
        local_b8.h = 0;
        local_b8.d = 0;
        local_b8.c = 0;
        Mat::create(&local_b8,uVar13,uVar15,uVar33,(size_t)pMVar42,opt->workspace_allocator);
        auVar67 = _DAT_00544250;
        auVar79 = _DAT_00544240;
        auVar273 = _DAT_0053f020;
        unaff_R15D = -100;
        if ((local_b8.data != (void *)0x0) && (local_b8.cstep * (long)local_b8.c != 0)) {
          uVar14 = (int)local_b8.cstep * local_b8.c;
          if (0 < (int)uVar14) {
            lVar20 = (ulong)uVar14 - 1;
            auVar131._8_4_ = (int)lVar20;
            auVar131._0_8_ = lVar20;
            auVar131._12_4_ = (int)((ulong)lVar20 >> 0x20);
            uVar37 = 0;
            auVar131 = auVar131 ^ _DAT_0053f020;
            do {
              auVar232._8_4_ = (int)uVar37;
              auVar232._0_8_ = uVar37;
              auVar232._12_4_ = (int)(uVar37 >> 0x20);
              auVar264 = (auVar232 | auVar67) ^ auVar273;
              iVar10 = auVar131._4_4_;
              if ((bool)(~(auVar264._4_4_ == iVar10 && auVar131._0_4_ < auVar264._0_4_ ||
                          iVar10 < auVar264._4_4_) & 1)) {
                *(undefined4 *)((long)local_b8.data + uVar37 * 4) = 0x3f800000;
              }
              if ((auVar264._12_4_ != auVar131._12_4_ || auVar264._8_4_ <= auVar131._8_4_) &&
                  auVar264._12_4_ <= auVar131._12_4_) {
                *(undefined4 *)((long)local_b8.data + uVar37 * 4 + 4) = 0x3f800000;
              }
              auVar264 = (auVar232 | auVar79) ^ auVar273;
              iVar265 = auVar264._4_4_;
              if (iVar265 <= iVar10 && (iVar265 != iVar10 || auVar264._0_4_ <= auVar131._0_4_)) {
                *(undefined4 *)((long)local_b8.data + uVar37 * 4 + 8) = 0x3f800000;
                *(undefined4 *)((long)local_b8.data + uVar37 * 4 + 0xc) = 0x3f800000;
              }
              uVar37 = uVar37 + 4;
            } while ((uVar14 + 3 & 0xfffffffc) != uVar37);
          }
          if (0 < (int)uVar33) {
            pvVar39 = bottom_blob->data;
            sVar18 = bottom_blob->elemsize;
            sVar21 = bottom_blob->cstep;
            uVar37 = 0;
            do {
              if (0 < (int)uVar15) {
                pvVar55 = (void *)(sVar18 * sVar21 * uVar37 + (long)pvVar39);
                uVar46 = 0;
                do {
                  if (0 < (int)uVar13) {
                    lVar20 = (long)local_b8.w *
                             CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize) * uVar46 +
                             CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize) *
                             local_b8.cstep * uVar37;
                    uVar40 = 0;
                    do {
                      if (0 < (int)uVar12) {
                        fVar60 = *(float *)((long)local_b8.data + uVar40 * 4 + lVar20);
                        uVar24 = 0;
                        do {
                          fVar60 = fVar60 * *(float *)((long)pvVar55 + uVar24 * 4);
                          *(float *)((long)local_b8.data + uVar40 * 4 + lVar20) = fVar60;
                          uVar24 = uVar24 + 1;
                        } while (uVar57 != uVar24);
                      }
                      pvVar55 = (void *)((long)pvVar55 + lVar56 * 4);
                      uVar40 = uVar40 + 1;
                    } while (uVar40 != uVar35);
                  }
                  uVar46 = uVar46 + 1;
                } while (uVar46 != uVar51);
              }
              uVar37 = uVar37 + 1;
            } while (uVar37 != uVar41);
          }
          auVar67 = _DAT_00544250;
          auVar79 = _DAT_00544240;
          auVar273 = _DAT_0053f020;
          uVar12 = top_blob->c * (int)top_blob->cstep;
          if (0 < (int)uVar12) {
            pvVar39 = top_blob->data;
            lVar56 = (ulong)uVar12 - 1;
            auVar132._8_4_ = (int)lVar56;
            auVar132._0_8_ = lVar56;
            auVar132._12_4_ = (int)((ulong)lVar56 >> 0x20);
            uVar57 = 0;
            auVar132 = auVar132 ^ _DAT_0053f020;
            do {
              auVar233._8_4_ = (int)uVar57;
              auVar233._0_8_ = uVar57;
              auVar233._12_4_ = (int)(uVar57 >> 0x20);
              auVar264 = (auVar233 | auVar67) ^ auVar273;
              iVar10 = auVar132._4_4_;
              if ((bool)(~(auVar264._4_4_ == iVar10 && auVar132._0_4_ < auVar264._0_4_ ||
                          iVar10 < auVar264._4_4_) & 1)) {
                *(undefined4 *)((long)pvVar39 + uVar57 * 4) = 0x3f800000;
              }
              if ((auVar264._12_4_ != auVar132._12_4_ || auVar264._8_4_ <= auVar132._8_4_) &&
                  auVar264._12_4_ <= auVar132._12_4_) {
                *(undefined4 *)((long)pvVar39 + uVar57 * 4 + 4) = 0x3f800000;
              }
              auVar264 = (auVar233 | auVar79) ^ auVar273;
              iVar265 = auVar264._4_4_;
              if (iVar265 <= iVar10 && (iVar265 != iVar10 || auVar264._0_4_ <= auVar132._0_4_)) {
                *(undefined4 *)((long)pvVar39 + uVar57 * 4 + 8) = 0x3f800000;
                *(undefined4 *)((long)pvVar39 + uVar57 * 4 + 0xc) = 0x3f800000;
              }
              uVar57 = uVar57 + 4;
            } while ((uVar12 + 3 & 0xfffffffc) != uVar57);
          }
          if (0 < (int)uVar33) {
            uVar57 = 0;
            pvVar39 = local_b8.data;
            do {
              if (0 < (int)uVar15) {
                iVar10 = 1;
                if (iVar11 != 0) {
                  iVar10 = top_blob->h;
                }
                iVar265 = top_blob->w;
                sVar18 = top_blob->elemsize;
                pvVar55 = top_blob->data;
                uVar37 = 0;
                pvVar54 = pvVar39;
                do {
                  if (0 < (int)uVar13) {
                    uVar46 = 0;
                    do {
                      *(float *)((long)pvVar55 + uVar46 * 4) =
                           *(float *)((long)pvVar54 + uVar46 * 4) *
                           *(float *)((long)pvVar55 + uVar46 * 4);
                      uVar46 = uVar46 + 1;
                    } while (uVar35 != uVar46);
                  }
                  uVar37 = uVar37 + 1;
                  pvVar54 = (void *)((long)pvVar54 +
                                    (long)local_b8.w *
                                    CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize));
                  pvVar55 = (void *)((long)pvVar55 + (long)iVar10 * sVar18 * (long)iVar265);
                } while (uVar37 != uVar51);
              }
              uVar57 = uVar57 + 1;
              pvVar39 = (void *)((long)pvVar39 +
                                local_b8.cstep *
                                CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize));
            } while (uVar57 != uVar41);
          }
          unaff_R15D = 0;
        }
        piVar7 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            if (local_b8.allocator == (Allocator *)0x0) goto LAB_003586f3;
            (**(code **)(*(long *)local_b8.allocator + 0x18))();
          }
        }
        goto LAB_00358700;
      }
      bVar43 = bVar43 | bVar31;
      if ((bVar9 == 0 && (bVar43 & 1) == 0) && bVar32 == 0) {
        if (iVar11 == 0) {
          Mat::create(top_blob,uVar12,uVar13,(size_t)pMVar42,opt->blob_allocator);
        }
        else {
          Mat::create(top_blob,uVar12,uVar13,1,1,(size_t)pMVar42,opt->blob_allocator);
        }
        local_b8.cstep = 0;
        local_b8.data = (void *)0x0;
        local_b8.refcount._0_4_ = 0;
        local_b8.refcount._4_4_ = 0;
        local_b8.elemsize._0_4_ = 0;
        local_b8.elemsize._4_4_ = 0;
        local_b8.elempack = 0;
        local_b8.allocator = (Allocator *)0x0;
        local_b8.dims = 0;
        local_b8.w = 0;
        local_b8.h = 0;
        local_b8.d = 0;
        local_b8.c = 0;
        Mat::create(&local_b8,uVar12,uVar13,uVar33,(size_t)pMVar42,opt->workspace_allocator);
        auVar67 = _DAT_00544250;
        auVar79 = _DAT_00544240;
        auVar273 = _DAT_0053f020;
        unaff_R15D = -100;
        if ((local_b8.data != (void *)0x0) && (local_b8.cstep * (long)local_b8.c != 0)) {
          uVar14 = (int)local_b8.cstep * local_b8.c;
          if (0 < (int)uVar14) {
            lVar20 = (ulong)uVar14 - 1;
            auVar137._8_4_ = (int)lVar20;
            auVar137._0_8_ = lVar20;
            auVar137._12_4_ = (int)((ulong)lVar20 >> 0x20);
            uVar51 = 0;
            auVar137 = auVar137 ^ _DAT_0053f020;
            do {
              auVar238._8_4_ = (int)uVar51;
              auVar238._0_8_ = uVar51;
              auVar238._12_4_ = (int)(uVar51 >> 0x20);
              auVar264 = (auVar238 | auVar67) ^ auVar273;
              iVar11 = auVar137._4_4_;
              if ((bool)(~(auVar264._4_4_ == iVar11 && auVar137._0_4_ < auVar264._0_4_ ||
                          iVar11 < auVar264._4_4_) & 1)) {
                *(undefined4 *)((long)local_b8.data + uVar51 * 4) = 0x3f800000;
              }
              if ((auVar264._12_4_ != auVar137._12_4_ || auVar264._8_4_ <= auVar137._8_4_) &&
                  auVar264._12_4_ <= auVar137._12_4_) {
                *(undefined4 *)((long)local_b8.data + uVar51 * 4 + 4) = 0x3f800000;
              }
              auVar264 = (auVar238 | auVar79) ^ auVar273;
              iVar10 = auVar264._4_4_;
              if (iVar10 <= iVar11 && (iVar10 != iVar11 || auVar264._0_4_ <= auVar137._0_4_)) {
                *(undefined4 *)((long)local_b8.data + uVar51 * 4 + 8) = 0x3f800000;
                *(undefined4 *)((long)local_b8.data + uVar51 * 4 + 0xc) = 0x3f800000;
              }
              uVar51 = uVar51 + 4;
            } while ((uVar14 + 3 & 0xfffffffc) != uVar51);
          }
          if (0 < (int)uVar33) {
            pvVar39 = bottom_blob->data;
            sVar18 = bottom_blob->elemsize;
            sVar21 = bottom_blob->cstep;
            uVar51 = 0;
            pvVar55 = local_b8.data;
            do {
              if (0 < (int)uVar15) {
                pvVar54 = (void *)(sVar18 * sVar21 * uVar51 + (long)pvVar39);
                uVar14 = 0;
                do {
                  if (0 < (int)uVar13) {
                    uVar37 = 0;
                    pvVar52 = pvVar55;
                    do {
                      if (0 < (int)uVar12) {
                        uVar46 = 0;
                        do {
                          *(float *)((long)pvVar52 + uVar46 * 4) =
                               *(float *)((long)pvVar54 + uVar46 * 4) *
                               *(float *)((long)pvVar52 + uVar46 * 4);
                          uVar46 = uVar46 + 1;
                        } while (uVar57 != uVar46);
                      }
                      pvVar54 = (void *)((long)pvVar54 + lVar56 * 4);
                      uVar37 = uVar37 + 1;
                      pvVar52 = (void *)((long)pvVar52 +
                                        (long)local_b8.w *
                                        CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize));
                    } while (uVar37 != uVar35);
                  }
                  uVar14 = uVar14 + 1;
                } while (uVar14 != uVar15);
              }
              uVar51 = uVar51 + 1;
              pvVar55 = (void *)((long)pvVar55 +
                                CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize) *
                                local_b8.cstep);
            } while (uVar51 != uVar41);
          }
          auVar67 = _DAT_00544250;
          auVar79 = _DAT_00544240;
          auVar273 = _DAT_0053f020;
          uVar14 = top_blob->c * (int)top_blob->cstep;
          if (0 < (int)uVar14) {
            pvVar39 = top_blob->data;
            lVar56 = (ulong)uVar14 - 1;
            auVar138._8_4_ = (int)lVar56;
            auVar138._0_8_ = lVar56;
            auVar138._12_4_ = (int)((ulong)lVar56 >> 0x20);
            uVar51 = 0;
            auVar138 = auVar138 ^ _DAT_0053f020;
            do {
              auVar239._8_4_ = (int)uVar51;
              auVar239._0_8_ = uVar51;
              auVar239._12_4_ = (int)(uVar51 >> 0x20);
              auVar264 = (auVar239 | auVar67) ^ auVar273;
              iVar11 = auVar138._4_4_;
              if ((bool)(~(auVar264._4_4_ == iVar11 && auVar138._0_4_ < auVar264._0_4_ ||
                          iVar11 < auVar264._4_4_) & 1)) {
                *(undefined4 *)((long)pvVar39 + uVar51 * 4) = 0x3f800000;
              }
              if ((auVar264._12_4_ != auVar138._12_4_ || auVar264._8_4_ <= auVar138._8_4_) &&
                  auVar264._12_4_ <= auVar138._12_4_) {
                *(undefined4 *)((long)pvVar39 + uVar51 * 4 + 4) = 0x3f800000;
              }
              auVar264 = (auVar239 | auVar79) ^ auVar273;
              iVar10 = auVar264._4_4_;
              if (iVar10 <= iVar11 && (iVar10 != iVar11 || auVar264._0_4_ <= auVar138._0_4_)) {
                *(undefined4 *)((long)pvVar39 + uVar51 * 4 + 8) = 0x3f800000;
                *(undefined4 *)((long)pvVar39 + uVar51 * 4 + 0xc) = 0x3f800000;
              }
              uVar51 = uVar51 + 4;
            } while ((uVar14 + 3 & 0xfffffffc) != uVar51);
          }
          if (0 < (int)uVar33) {
            pvVar39 = top_blob->data;
            iVar11 = top_blob->w;
            sVar18 = top_blob->elemsize;
            uVar51 = 0;
            pvVar55 = local_b8.data;
            do {
              if (0 < (int)uVar13) {
                uVar37 = 0;
                pvVar54 = pvVar39;
                pvVar52 = pvVar55;
                do {
                  if (0 < (int)uVar12) {
                    uVar46 = 0;
                    do {
                      *(float *)((long)pvVar54 + uVar46 * 4) =
                           *(float *)((long)pvVar52 + uVar46 * 4) *
                           *(float *)((long)pvVar54 + uVar46 * 4);
                      uVar46 = uVar46 + 1;
                    } while (uVar57 != uVar46);
                  }
                  uVar37 = uVar37 + 1;
                  pvVar52 = (void *)((long)pvVar52 +
                                    (long)local_b8.w *
                                    CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize));
                  pvVar54 = (void *)((long)pvVar54 + (long)iVar11 * sVar18);
                } while (uVar37 != uVar35);
              }
              uVar51 = uVar51 + 1;
              pvVar55 = (void *)((long)pvVar55 +
                                local_b8.cstep *
                                CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize));
            } while (uVar51 != uVar41);
          }
          unaff_R15D = 0;
        }
        piVar7 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            if (local_b8.allocator == (Allocator *)0x0) goto LAB_003586f3;
            (**(code **)(*(long *)local_b8.allocator + 0x18))();
          }
        }
        goto LAB_00358700;
      }
      if (((bVar47 & 1) == 0 && bVar9 == 0) && bVar25 == 0) {
        if (iVar11 == 0) {
          Mat::create(top_blob,uVar13,uVar33,(size_t)pMVar42,opt->blob_allocator);
        }
        else {
          Mat::create(top_blob,1,uVar13,1,uVar33,(size_t)pMVar42,opt->blob_allocator);
        }
        auVar67 = _DAT_00544250;
        auVar79 = _DAT_00544240;
        auVar273 = _DAT_0053f020;
        if ((int)uVar33 < 1) goto LAB_003519f4;
        sVar18 = bottom_blob->elemsize;
        pvVar39 = top_blob->data;
        if (iVar11 == 0) {
          sVar21 = (size_t)top_blob->w;
        }
        else {
          sVar21 = top_blob->cstep;
        }
        pvVar55 = bottom_blob->data;
        sVar22 = bottom_blob->cstep;
        lVar30 = sVar21 * top_blob->elemsize;
        lVar20 = uVar35 - 1;
        auVar141._8_4_ = (int)lVar20;
        auVar141._0_8_ = lVar20;
        auVar141._12_4_ = (int)((ulong)lVar20 >> 0x20);
        lVar20 = (long)pvVar39 + 0xc;
        uVar51 = 0;
        auVar141 = auVar141 ^ _DAT_0053f020;
        do {
          if (0 < (int)uVar13) {
            lVar45 = 0;
            auVar260 = auVar67;
            auVar269 = auVar79;
            do {
              auVar264 = auVar260 ^ auVar273;
              iVar11 = auVar141._4_4_;
              if ((bool)(~(auVar264._4_4_ == iVar11 && auVar141._0_4_ < auVar264._0_4_ ||
                          iVar11 < auVar264._4_4_) & 1)) {
                *(undefined4 *)(lVar20 + -0xc + lVar45) = 0x3f800000;
              }
              if ((auVar264._12_4_ != auVar141._12_4_ || auVar264._8_4_ <= auVar141._8_4_) &&
                  auVar264._12_4_ <= auVar141._12_4_) {
                *(undefined4 *)(lVar20 + -8 + lVar45) = 0x3f800000;
              }
              auVar264 = auVar269 ^ auVar273;
              iVar10 = auVar264._4_4_;
              if (iVar10 <= iVar11 && (iVar10 != iVar11 || auVar264._0_4_ <= auVar141._0_4_)) {
                *(undefined4 *)(lVar20 + -4 + lVar45) = 0x3f800000;
                *(undefined4 *)(lVar20 + lVar45) = 0x3f800000;
              }
              lVar266 = auVar260._8_8_;
              auVar260._0_8_ = auVar260._0_8_ + 4;
              auVar260._8_8_ = lVar266 + 4;
              lVar266 = auVar269._8_8_;
              auVar269._0_8_ = auVar269._0_8_ + 4;
              auVar269._8_8_ = lVar266 + 4;
              lVar45 = lVar45 + 0x10;
            } while ((ulong)(uVar13 + 3 >> 2) << 4 != lVar45);
          }
          if (0 < (int)uVar15) {
            pvVar54 = (void *)(sVar18 * sVar22 * uVar51 + (long)pvVar55);
            lVar45 = lVar30 * uVar51;
            uVar14 = 0;
            do {
              if (0 < (int)uVar13) {
                uVar37 = 0;
                do {
                  if (0 < (int)uVar12) {
                    fVar60 = *(float *)((long)pvVar39 + uVar37 * 4 + lVar45);
                    uVar46 = 0;
                    do {
                      fVar60 = fVar60 * *(float *)((long)pvVar54 + uVar46 * 4);
                      *(float *)((long)pvVar39 + uVar37 * 4 + lVar45) = fVar60;
                      uVar46 = uVar46 + 1;
                    } while (uVar57 != uVar46);
                  }
                  pvVar54 = (void *)((long)pvVar54 + lVar56 * 4);
                  uVar37 = uVar37 + 1;
                } while (uVar37 != uVar35);
              }
              uVar14 = uVar14 + 1;
            } while (uVar14 != uVar15);
          }
          uVar51 = uVar51 + 1;
          lVar20 = lVar20 + lVar30;
          pMVar44 = (Mat *)0x0;
          unaff_R15D = 0;
        } while (uVar51 != uVar41);
        goto LAB_00358727;
      }
      if (((bVar27 & 1) == 0 && bVar8 == 0) && bVar32 == 0) {
        if (iVar11 == 0) {
          Mat::create(top_blob,uVar12,uVar15,(size_t)pMVar42,opt->blob_allocator);
        }
        else {
          Mat::create(top_blob,uVar12,1,uVar15,1,(size_t)pMVar42,opt->blob_allocator);
        }
        local_b8.cstep = 0;
        local_b8.data = (void *)0x0;
        local_b8.refcount._0_4_ = 0;
        local_b8.refcount._4_4_ = 0;
        local_b8.elemsize._0_4_ = 0;
        local_b8.elemsize._4_4_ = 0;
        local_b8.elempack = 0;
        local_b8.allocator = (Allocator *)0x0;
        local_b8.dims = 0;
        local_b8.w = 0;
        local_b8.h = 0;
        local_b8.d = 0;
        local_b8.c = 0;
        Mat::create(&local_b8,uVar12,uVar15,uVar33,(size_t)pMVar42,opt->workspace_allocator);
        auVar67 = _DAT_00544250;
        auVar79 = _DAT_00544240;
        auVar273 = _DAT_0053f020;
        unaff_R15D = -100;
        if ((local_b8.data != (void *)0x0) && (local_b8.cstep * (long)local_b8.c != 0)) {
          uVar14 = (int)local_b8.cstep * local_b8.c;
          if (0 < (int)uVar14) {
            lVar20 = (ulong)uVar14 - 1;
            auVar146._8_4_ = (int)lVar20;
            auVar146._0_8_ = lVar20;
            auVar146._12_4_ = (int)((ulong)lVar20 >> 0x20);
            uVar35 = 0;
            auVar146 = auVar146 ^ _DAT_0053f020;
            do {
              auVar244._8_4_ = (int)uVar35;
              auVar244._0_8_ = uVar35;
              auVar244._12_4_ = (int)(uVar35 >> 0x20);
              auVar264 = (auVar244 | auVar67) ^ auVar273;
              iVar11 = auVar146._4_4_;
              if ((bool)(~(auVar264._4_4_ == iVar11 && auVar146._0_4_ < auVar264._0_4_ ||
                          iVar11 < auVar264._4_4_) & 1)) {
                *(undefined4 *)((long)local_b8.data + uVar35 * 4) = 0x3f800000;
              }
              if ((auVar264._12_4_ != auVar146._12_4_ || auVar264._8_4_ <= auVar146._8_4_) &&
                  auVar264._12_4_ <= auVar146._12_4_) {
                *(undefined4 *)((long)local_b8.data + uVar35 * 4 + 4) = 0x3f800000;
              }
              auVar264 = (auVar244 | auVar79) ^ auVar273;
              iVar10 = auVar264._4_4_;
              if (iVar10 <= iVar11 && (iVar10 != iVar11 || auVar264._0_4_ <= auVar146._0_4_)) {
                *(undefined4 *)((long)local_b8.data + uVar35 * 4 + 8) = 0x3f800000;
                *(undefined4 *)((long)local_b8.data + uVar35 * 4 + 0xc) = 0x3f800000;
              }
              uVar35 = uVar35 + 4;
            } while ((uVar14 + 3 & 0xfffffffc) != uVar35);
          }
          if (0 < (int)uVar33) {
            pvVar39 = bottom_blob->data;
            sVar18 = bottom_blob->elemsize;
            sVar21 = bottom_blob->cstep;
            uVar35 = 0;
            pvVar55 = local_b8.data;
            do {
              if (0 < (int)uVar15) {
                pvVar52 = (void *)(sVar18 * sVar21 * uVar35 + (long)pvVar39);
                uVar37 = 0;
                pvVar54 = pvVar55;
                do {
                  if (0 < (int)uVar13) {
                    uVar14 = 0;
                    do {
                      if (0 < (int)uVar12) {
                        uVar46 = 0;
                        do {
                          *(float *)((long)pvVar54 + uVar46 * 4) =
                               *(float *)((long)pvVar52 + uVar46 * 4) *
                               *(float *)((long)pvVar54 + uVar46 * 4);
                          uVar46 = uVar46 + 1;
                        } while (uVar57 != uVar46);
                      }
                      pvVar52 = (void *)((long)pvVar52 + lVar56 * 4);
                      uVar14 = uVar14 + 1;
                    } while (uVar14 != uVar13);
                  }
                  uVar37 = uVar37 + 1;
                  pvVar54 = (void *)((long)pvVar54 +
                                    (long)local_b8.w *
                                    CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize));
                } while (uVar37 != uVar51);
              }
              uVar35 = uVar35 + 1;
              pvVar55 = (void *)((long)pvVar55 +
                                CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize) *
                                local_b8.cstep);
            } while (uVar35 != uVar41);
          }
          auVar67 = _DAT_00544250;
          auVar79 = _DAT_00544240;
          auVar273 = _DAT_0053f020;
          uVar14 = top_blob->c * (int)top_blob->cstep;
          if (0 < (int)uVar14) {
            pvVar39 = top_blob->data;
            lVar56 = (ulong)uVar14 - 1;
            auVar147._8_4_ = (int)lVar56;
            auVar147._0_8_ = lVar56;
            auVar147._12_4_ = (int)((ulong)lVar56 >> 0x20);
            uVar35 = 0;
            auVar147 = auVar147 ^ _DAT_0053f020;
            do {
              auVar245._8_4_ = (int)uVar35;
              auVar245._0_8_ = uVar35;
              auVar245._12_4_ = (int)(uVar35 >> 0x20);
              auVar264 = (auVar245 | auVar67) ^ auVar273;
              iVar11 = auVar147._4_4_;
              if ((bool)(~(auVar264._4_4_ == iVar11 && auVar147._0_4_ < auVar264._0_4_ ||
                          iVar11 < auVar264._4_4_) & 1)) {
                *(undefined4 *)((long)pvVar39 + uVar35 * 4) = 0x3f800000;
              }
              if ((auVar264._12_4_ != auVar147._12_4_ || auVar264._8_4_ <= auVar147._8_4_) &&
                  auVar264._12_4_ <= auVar147._12_4_) {
                *(undefined4 *)((long)pvVar39 + uVar35 * 4 + 4) = 0x3f800000;
              }
              auVar264 = (auVar245 | auVar79) ^ auVar273;
              iVar10 = auVar264._4_4_;
              if (iVar10 <= iVar11 && (iVar10 != iVar11 || auVar264._0_4_ <= auVar147._0_4_)) {
                *(undefined4 *)((long)pvVar39 + uVar35 * 4 + 8) = 0x3f800000;
                *(undefined4 *)((long)pvVar39 + uVar35 * 4 + 0xc) = 0x3f800000;
              }
              uVar35 = uVar35 + 4;
            } while ((uVar14 + 3 & 0xfffffffc) != uVar35);
          }
          if (0 < (int)uVar33) {
            pvVar39 = top_blob->data;
            iVar11 = top_blob->w;
            sVar18 = top_blob->elemsize;
            uVar35 = 0;
            pvVar55 = local_b8.data;
            do {
              if (0 < (int)uVar15) {
                uVar37 = 0;
                pvVar54 = pvVar39;
                pvVar52 = pvVar55;
                do {
                  if (0 < (int)uVar12) {
                    uVar46 = 0;
                    do {
                      *(float *)((long)pvVar54 + uVar46 * 4) =
                           *(float *)((long)pvVar52 + uVar46 * 4) *
                           *(float *)((long)pvVar54 + uVar46 * 4);
                      uVar46 = uVar46 + 1;
                    } while (uVar57 != uVar46);
                  }
                  uVar37 = uVar37 + 1;
                  pvVar52 = (void *)((long)pvVar52 +
                                    (long)local_b8.w *
                                    CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize));
                  pvVar54 = (void *)((long)pvVar54 + (long)iVar11 * sVar18);
                } while (uVar37 != uVar51);
              }
              uVar35 = uVar35 + 1;
              pvVar55 = (void *)((long)pvVar55 +
                                local_b8.cstep *
                                CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize));
            } while (uVar35 != uVar41);
          }
          unaff_R15D = 0;
        }
        piVar7 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            if (local_b8.allocator == (Allocator *)0x0) goto LAB_003586f3;
            (**(code **)(*(long *)local_b8.allocator + 0x18))();
          }
        }
        goto LAB_00358700;
      }
      if (((bVar27 & 1) != 0 || bVar9 != 0) || bVar25 != 0) {
        if (((bVar47 & 1) == 0 && bVar8 == 0) && bVar25 == 0) {
          if (iVar11 == 0) {
            Mat::create(top_blob,uVar13,uVar15,uVar33,(size_t)pMVar42,opt->blob_allocator);
          }
          else {
            Mat::create(top_blob,1,uVar13,uVar15,uVar33,(size_t)pMVar42,opt->blob_allocator);
          }
          if ((int)uVar33 < 1) goto LAB_003519f4;
          pvVar39 = bottom_blob->data;
          sVar18 = bottom_blob->elemsize;
          sVar21 = top_blob->elemsize;
          sVar22 = top_blob->cstep;
          pvVar55 = top_blob->data;
          sVar5 = bottom_blob->cstep;
          uVar35 = 0;
          unaff_R15D = 0;
          do {
            if (0 < (int)(uVar13 * uVar15)) {
              uVar51 = 0;
              pvVar54 = pvVar39;
              do {
                auVar188 = ZEXT816(0x3f800000);
                if (0 < (int)uVar12) {
                  uVar37 = 0;
                  auVar188 = ZEXT816(0x3f800000);
                  do {
                    auVar188._0_4_ = auVar188._0_4_ * *(float *)((long)pvVar54 + uVar37 * 4);
                    uVar37 = uVar37 + 1;
                  } while (uVar57 != uVar37);
                }
                *(int *)((long)pvVar55 + uVar51 * 4 + sVar21 * sVar22 * uVar35) = auVar188._0_4_;
                uVar51 = uVar51 + 1;
                pvVar54 = (void *)((long)pvVar54 + lVar56 * 4);
              } while (uVar51 != uVar13 * uVar15);
            }
            uVar35 = uVar35 + 1;
            pvVar39 = (void *)((long)pvVar39 + sVar18 * sVar5);
            pMVar44 = (Mat *)0x0;
          } while (uVar35 != uVar41);
        }
        else if ((bVar8 == 0 && (bVar43 & 1) == 0) && bVar32 == 0) {
          if (iVar11 == 0) {
            Mat::create(top_blob,uVar12,uVar13,uVar15,(size_t)pMVar42,opt->blob_allocator);
          }
          else {
            Mat::create(top_blob,uVar12,uVar13,uVar15,1,(size_t)pMVar42,opt->blob_allocator);
          }
          auVar67 = _DAT_00544250;
          auVar79 = _DAT_00544240;
          auVar273 = _DAT_0053f020;
          uVar14 = top_blob->c * (int)top_blob->cstep;
          if (0 < (int)uVar14) {
            pvVar39 = top_blob->data;
            lVar20 = (ulong)uVar14 - 1;
            auVar154._8_4_ = (int)lVar20;
            auVar154._0_8_ = lVar20;
            auVar154._12_4_ = (int)((ulong)lVar20 >> 0x20);
            uVar37 = 0;
            auVar154 = auVar154 ^ _DAT_0053f020;
            do {
              auVar248._8_4_ = (int)uVar37;
              auVar248._0_8_ = uVar37;
              auVar248._12_4_ = (int)(uVar37 >> 0x20);
              auVar264 = (auVar248 | auVar67) ^ auVar273;
              iVar10 = auVar154._4_4_;
              if ((bool)(~(auVar264._4_4_ == iVar10 && auVar154._0_4_ < auVar264._0_4_ ||
                          iVar10 < auVar264._4_4_) & 1)) {
                *(undefined4 *)((long)pvVar39 + uVar37 * 4) = 0x3f800000;
              }
              if ((auVar264._12_4_ != auVar154._12_4_ || auVar264._8_4_ <= auVar154._8_4_) &&
                  auVar264._12_4_ <= auVar154._12_4_) {
                *(undefined4 *)((long)pvVar39 + uVar37 * 4 + 4) = 0x3f800000;
              }
              auVar264 = (auVar248 | auVar79) ^ auVar273;
              iVar265 = auVar264._4_4_;
              if (iVar265 <= iVar10 && (iVar265 != iVar10 || auVar264._0_4_ <= auVar154._0_4_)) {
                *(undefined4 *)((long)pvVar39 + uVar37 * 4 + 8) = 0x3f800000;
                *(undefined4 *)((long)pvVar39 + uVar37 * 4 + 0xc) = 0x3f800000;
              }
              uVar37 = uVar37 + 4;
            } while ((uVar14 + 3 & 0xfffffffc) != uVar37);
          }
          if ((int)uVar33 < 1) goto LAB_003519f4;
          pvVar39 = bottom_blob->data;
          sVar18 = bottom_blob->elemsize;
          sVar21 = bottom_blob->cstep;
          uVar37 = 0;
          do {
            if (0 < (int)uVar15) {
              iVar10 = top_blob->w;
              if (iVar11 == 0) {
                sVar22 = top_blob->cstep;
              }
              else {
                sVar22 = (long)top_blob->h * (long)iVar10;
              }
              pvVar54 = (void *)(sVar18 * sVar21 * uVar37 + (long)pvVar39);
              pvVar55 = top_blob->data;
              sVar5 = top_blob->elemsize;
              uVar46 = 0;
              do {
                if (0 < (int)uVar13) {
                  uVar40 = 0;
                  pvVar52 = pvVar55;
                  do {
                    if (0 < (int)uVar12) {
                      uVar24 = 0;
                      do {
                        *(float *)((long)pvVar52 + uVar24 * 4) =
                             *(float *)((long)pvVar54 + uVar24 * 4) *
                             *(float *)((long)pvVar52 + uVar24 * 4);
                        uVar24 = uVar24 + 1;
                      } while (uVar57 != uVar24);
                    }
                    pvVar54 = (void *)((long)pvVar54 + lVar56 * 4);
                    uVar40 = uVar40 + 1;
                    pvVar52 = (void *)((long)pvVar52 + (long)iVar10 * sVar5);
                  } while (uVar40 != uVar35);
                }
                uVar46 = uVar46 + 1;
                pvVar55 = (void *)((long)pvVar55 + sVar22 * sVar5);
              } while (uVar46 != uVar51);
            }
            uVar37 = uVar37 + 1;
            pMVar44 = (Mat *)0x0;
            unaff_R15D = 0;
          } while (uVar37 != uVar41);
        }
        else if (((bVar27 & 1) == 0 && bVar8 == 0) && bVar25 == 0) {
          if (iVar11 == 0) {
            Mat::create(top_blob,uVar12,uVar15,uVar33,(size_t)pMVar42,opt->blob_allocator);
          }
          else {
            Mat::create(top_blob,uVar12,1,uVar15,uVar33,(size_t)pMVar42,opt->blob_allocator);
          }
          auVar67 = _DAT_00544250;
          auVar79 = _DAT_00544240;
          auVar273 = _DAT_0053f020;
          if ((int)uVar33 < 1) goto LAB_003519f4;
          pvVar39 = bottom_blob->data;
          sVar18 = bottom_blob->elemsize;
          sVar21 = bottom_blob->cstep;
          iVar11 = top_blob->w;
          pvVar55 = top_blob->data;
          uVar35 = top_blob->elemsize;
          lVar56 = (long)top_blob->h * (long)iVar11;
          uVar37 = 0;
          iVar10 = (int)((uVar35 * lVar56 + 0xf & 0xfffffffffffffff0) / uVar35);
          if (top_blob->dims == 4) {
            iVar10 = (int)lVar56;
          }
          uVar14 = iVar10 * top_blob->d;
          lVar56 = (ulong)uVar14 - 1;
          auVar157._8_4_ = (int)lVar56;
          auVar157._0_8_ = lVar56;
          auVar157._12_4_ = (int)((ulong)lVar56 >> 0x20);
          lVar56 = (long)pvVar55 + 0xc;
          lVar20 = top_blob->cstep * uVar35;
          auVar157 = auVar157 ^ _DAT_0053f020;
          do {
            if (0 < (int)uVar14) {
              uVar46 = 0;
              do {
                auVar251._8_4_ = (int)uVar46;
                auVar251._0_8_ = uVar46;
                auVar251._12_4_ = (int)(uVar46 >> 0x20);
                auVar264 = (auVar251 | auVar67) ^ auVar273;
                iVar10 = auVar157._4_4_;
                if ((bool)(~(iVar10 < auVar264._4_4_ ||
                            auVar157._0_4_ < auVar264._0_4_ && auVar264._4_4_ == iVar10) & 1)) {
                  *(undefined4 *)(lVar56 + -0xc + uVar46 * 4) = 0x3f800000;
                }
                if (auVar264._12_4_ <= auVar157._12_4_ &&
                    (auVar264._8_4_ <= auVar157._8_4_ || auVar264._12_4_ != auVar157._12_4_)) {
                  *(undefined4 *)(lVar56 + -8 + uVar46 * 4) = 0x3f800000;
                }
                auVar264 = (auVar251 | auVar79) ^ auVar273;
                iVar265 = auVar264._4_4_;
                if (iVar265 <= iVar10 && (iVar265 != iVar10 || auVar264._0_4_ <= auVar157._0_4_)) {
                  *(undefined4 *)(lVar56 + -4 + uVar46 * 4) = 0x3f800000;
                  *(undefined4 *)(lVar56 + uVar46 * 4) = 0x3f800000;
                }
                uVar46 = uVar46 + 4;
              } while ((uVar14 + 3 & 0xfffffffc) != uVar46);
            }
            if (0 < (int)uVar15) {
              pvVar52 = (void *)(sVar18 * sVar21 * uVar37 + (long)pvVar39);
              uVar46 = 0;
              pvVar54 = pvVar55;
              do {
                if (0 < (int)uVar13) {
                  uVar33 = 0;
                  do {
                    if (0 < (int)uVar12) {
                      uVar40 = 0;
                      do {
                        *(float *)((long)pvVar54 + uVar40 * 4) =
                             *(float *)((long)pvVar52 + uVar40 * 4) *
                             *(float *)((long)pvVar54 + uVar40 * 4);
                        uVar40 = uVar40 + 1;
                      } while (uVar57 != uVar40);
                    }
                    pvVar52 = (void *)((long)pvVar52 + (long)(int)uVar12 * 4);
                    uVar33 = uVar33 + 1;
                  } while (uVar33 != uVar13);
                }
                uVar46 = uVar46 + 1;
                pvVar54 = (void *)((long)pvVar54 + uVar35 * (long)iVar11);
              } while (uVar46 != uVar51);
            }
            uVar37 = uVar37 + 1;
            lVar56 = lVar56 + lVar20;
            pvVar55 = (void *)((long)pvVar55 + lVar20);
            pMVar44 = (Mat *)0x0;
            unaff_R15D = 0;
          } while (uVar37 != uVar41);
        }
        else {
          pMVar44 = (Mat *)CONCAT71((uint7)(uint3)((uint)iVar10 >> 8),1);
          if (bVar25 == 0 && (bVar9 == 0 && (bVar43 & 1) == 0)) {
            if (iVar11 == 0) {
              Mat::create(top_blob,uVar12,uVar13,uVar33,(size_t)pMVar42,opt->blob_allocator);
            }
            else {
              Mat::create(top_blob,uVar12,uVar13,1,uVar33,(size_t)pMVar42,opt->blob_allocator);
            }
            auVar67 = _DAT_00544250;
            auVar79 = _DAT_00544240;
            auVar273 = _DAT_0053f020;
            if ((int)uVar33 < 1) goto LAB_003519f4;
            pvVar39 = bottom_blob->data;
            sVar18 = bottom_blob->elemsize;
            sVar21 = bottom_blob->cstep;
            iVar11 = top_blob->w;
            pvVar55 = top_blob->data;
            uVar51 = top_blob->elemsize;
            lVar56 = (long)top_blob->h * (long)iVar11;
            uVar37 = 0;
            iVar10 = (int)((uVar51 * lVar56 + 0xf & 0xfffffffffffffff0) / uVar51);
            if (top_blob->dims == 4) {
              iVar10 = (int)lVar56;
            }
            uVar14 = iVar10 * top_blob->d;
            lVar56 = (ulong)uVar14 - 1;
            auVar160._8_4_ = (int)lVar56;
            auVar160._0_8_ = lVar56;
            auVar160._12_4_ = (int)((ulong)lVar56 >> 0x20);
            lVar56 = (long)pvVar55 + 0xc;
            lVar20 = top_blob->cstep * uVar51;
            auVar160 = auVar160 ^ _DAT_0053f020;
            do {
              if (0 < (int)uVar14) {
                uVar46 = 0;
                do {
                  auVar254._8_4_ = (int)uVar46;
                  auVar254._0_8_ = uVar46;
                  auVar254._12_4_ = (int)(uVar46 >> 0x20);
                  auVar264 = (auVar254 | auVar67) ^ auVar273;
                  iVar10 = auVar160._4_4_;
                  if ((bool)(~(iVar10 < auVar264._4_4_ ||
                              auVar160._0_4_ < auVar264._0_4_ && auVar264._4_4_ == iVar10) & 1)) {
                    *(undefined4 *)(lVar56 + -0xc + uVar46 * 4) = 0x3f800000;
                  }
                  if (auVar264._12_4_ <= auVar160._12_4_ &&
                      (auVar264._8_4_ <= auVar160._8_4_ || auVar264._12_4_ != auVar160._12_4_)) {
                    *(undefined4 *)(lVar56 + -8 + uVar46 * 4) = 0x3f800000;
                  }
                  auVar264 = (auVar254 | auVar79) ^ auVar273;
                  iVar265 = auVar264._4_4_;
                  if (iVar265 <= iVar10 && (iVar265 != iVar10 || auVar264._0_4_ <= auVar160._0_4_))
                  {
                    *(undefined4 *)(lVar56 + -4 + uVar46 * 4) = 0x3f800000;
                    *(undefined4 *)(lVar56 + uVar46 * 4) = 0x3f800000;
                  }
                  uVar46 = uVar46 + 4;
                } while ((uVar14 + 3 & 0xfffffffc) != uVar46);
              }
              if (0 < (int)uVar15) {
                pvVar54 = (void *)(sVar18 * sVar21 * uVar37 + (long)pvVar39);
                uVar33 = 0;
                do {
                  if (0 < (int)uVar13) {
                    uVar46 = 0;
                    pvVar52 = pvVar55;
                    do {
                      if (0 < (int)uVar12) {
                        uVar40 = 0;
                        do {
                          *(float *)((long)pvVar52 + uVar40 * 4) =
                               *(float *)((long)pvVar54 + uVar40 * 4) *
                               *(float *)((long)pvVar52 + uVar40 * 4);
                          uVar40 = uVar40 + 1;
                        } while (uVar57 != uVar40);
                      }
                      pvVar54 = (void *)((long)pvVar54 + (long)(int)uVar12 * 4);
                      uVar46 = uVar46 + 1;
                      pvVar52 = (void *)((long)pvVar52 + uVar51 * (long)iVar11);
                    } while (uVar46 != uVar35);
                  }
                  uVar33 = uVar33 + 1;
                } while (uVar33 != uVar15);
              }
              uVar37 = uVar37 + 1;
              lVar56 = lVar56 + lVar20;
              pvVar55 = (void *)((long)pvVar55 + lVar20);
              pMVar44 = (Mat *)0x0;
              unaff_R15D = 0;
            } while (uVar37 != uVar41);
          }
        }
        goto LAB_00358727;
      }
      if (iVar11 == 0) {
        Mat::create(top_blob,uVar12,uVar33,(size_t)pMVar42,opt->blob_allocator);
      }
      else {
        Mat::create(top_blob,uVar12,1,1,uVar33,(size_t)pMVar42,opt->blob_allocator);
      }
      auVar67 = _DAT_00544250;
      auVar79 = _DAT_00544240;
      auVar273 = _DAT_0053f020;
      if (0 < (int)uVar33) {
        sVar18 = bottom_blob->elemsize;
        pvVar39 = top_blob->data;
        if (iVar11 == 0) {
          sVar21 = (size_t)top_blob->w;
        }
        else {
          sVar21 = top_blob->cstep;
        }
        pvVar55 = bottom_blob->data;
        sVar22 = bottom_blob->cstep;
        lVar20 = uVar57 - 1;
        auVar151._8_4_ = (int)lVar20;
        auVar151._0_8_ = lVar20;
        auVar151._12_4_ = (int)((ulong)lVar20 >> 0x20);
        lVar30 = sVar21 * top_blob->elemsize;
        lVar20 = (long)pvVar39 + 0xc;
        uVar35 = 0;
        auVar151 = auVar151 ^ _DAT_0053f020;
        do {
          if (0 < (int)uVar12) {
            lVar45 = 0;
            auVar263 = auVar67;
            auVar272 = auVar79;
            do {
              auVar264 = auVar263 ^ auVar273;
              iVar11 = auVar151._4_4_;
              if ((bool)(~(auVar264._4_4_ == iVar11 && auVar151._0_4_ < auVar264._0_4_ ||
                          iVar11 < auVar264._4_4_) & 1)) {
                *(undefined4 *)(lVar20 + -0xc + lVar45) = 0x3f800000;
              }
              if ((auVar264._12_4_ != auVar151._12_4_ || auVar264._8_4_ <= auVar151._8_4_) &&
                  auVar264._12_4_ <= auVar151._12_4_) {
                *(undefined4 *)(lVar20 + -8 + lVar45) = 0x3f800000;
              }
              auVar264 = auVar272 ^ auVar273;
              iVar10 = auVar264._4_4_;
              if (iVar10 <= iVar11 && (iVar10 != iVar11 || auVar264._0_4_ <= auVar151._0_4_)) {
                *(undefined4 *)(lVar20 + -4 + lVar45) = 0x3f800000;
                *(undefined4 *)(lVar20 + lVar45) = 0x3f800000;
              }
              lVar266 = auVar263._8_8_;
              auVar263._0_8_ = auVar263._0_8_ + 4;
              auVar263._8_8_ = lVar266 + 4;
              lVar266 = auVar272._8_8_;
              auVar272._0_8_ = auVar272._0_8_ + 4;
              auVar272._8_8_ = lVar266 + 4;
              lVar45 = lVar45 + 0x10;
            } while ((ulong)(uVar12 + 3 >> 2) << 4 != lVar45);
          }
          if (0 < (int)uVar15) {
            pvVar54 = (void *)(sVar18 * sVar22 * uVar35 + (long)pvVar55);
            uVar14 = 0;
            do {
              if (0 < (int)uVar13) {
                uVar33 = 0;
                do {
                  if (0 < (int)uVar12) {
                    uVar51 = 0;
                    do {
                      *(float *)((long)pvVar39 + uVar51 * 4) =
                           *(float *)((long)pvVar54 + uVar51 * 4) *
                           *(float *)((long)pvVar39 + uVar51 * 4);
                      uVar51 = uVar51 + 1;
                    } while (uVar57 != uVar51);
                  }
                  pvVar54 = (void *)((long)pvVar54 + lVar56 * 4);
                  uVar33 = uVar33 + 1;
                } while (uVar33 != uVar13);
              }
              uVar14 = uVar14 + 1;
            } while (uVar14 != uVar15);
          }
          uVar35 = uVar35 + 1;
          lVar20 = lVar20 + lVar30;
          pvVar39 = (void *)((long)pvVar39 + lVar30);
          pMVar44 = (Mat *)0x0;
          unaff_R15D = 0;
        } while (uVar35 != uVar41);
        goto LAB_00358727;
      }
      goto LAB_003519f4;
    }
    if (iVar11 == 0) {
      Mat::create(top_blob,uVar13,(size_t)pMVar42,opt->blob_allocator);
    }
    else {
      Mat::create(top_blob,1,uVar13,1,1,(size_t)pMVar42,opt->blob_allocator);
    }
    local_b8.cstep = 0;
    local_b8.data = (void *)0x0;
    local_b8.refcount._0_4_ = 0;
    local_b8.refcount._4_4_ = 0;
    local_b8.elemsize._0_4_ = 0;
    local_b8.elemsize._4_4_ = 0;
    local_b8.elempack = 0;
    local_b8.allocator = (Allocator *)0x0;
    local_b8.dims = 0;
    local_b8.w = 0;
    local_b8.h = 0;
    local_b8.d = 0;
    local_b8.c = 0;
    Mat::create(&local_b8,1,uVar13,uVar33,(size_t)pMVar42,opt->workspace_allocator);
    auVar67 = _DAT_00544250;
    auVar79 = _DAT_00544240;
    auVar273 = _DAT_0053f020;
    unaff_R15D = -100;
    if ((local_b8.data != (void *)0x0) && (local_b8.cstep * (long)local_b8.c != 0)) {
      uVar14 = (int)local_b8.cstep * local_b8.c;
      if (0 < (int)uVar14) {
        lVar20 = (ulong)uVar14 - 1;
        auVar111._8_4_ = (int)lVar20;
        auVar111._0_8_ = lVar20;
        auVar111._12_4_ = (int)((ulong)lVar20 >> 0x20);
        uVar51 = 0;
        auVar111 = auVar111 ^ _DAT_0053f020;
        do {
          auVar214._8_4_ = (int)uVar51;
          auVar214._0_8_ = uVar51;
          auVar214._12_4_ = (int)(uVar51 >> 0x20);
          auVar264 = (auVar214 | auVar67) ^ auVar273;
          iVar11 = auVar111._4_4_;
          if ((bool)(~(auVar264._4_4_ == iVar11 && auVar111._0_4_ < auVar264._0_4_ ||
                      iVar11 < auVar264._4_4_) & 1)) {
            *(undefined4 *)((long)local_b8.data + uVar51 * 4) = 0x3f800000;
          }
          if ((auVar264._12_4_ != auVar111._12_4_ || auVar264._8_4_ <= auVar111._8_4_) &&
              auVar264._12_4_ <= auVar111._12_4_) {
            *(undefined4 *)((long)local_b8.data + uVar51 * 4 + 4) = 0x3f800000;
          }
          auVar264 = (auVar214 | auVar79) ^ auVar273;
          iVar10 = auVar264._4_4_;
          if (iVar10 <= iVar11 && (iVar10 != iVar11 || auVar264._0_4_ <= auVar111._0_4_)) {
            *(undefined4 *)((long)local_b8.data + uVar51 * 4 + 8) = 0x3f800000;
            *(undefined4 *)((long)local_b8.data + uVar51 * 4 + 0xc) = 0x3f800000;
          }
          uVar51 = uVar51 + 4;
        } while ((uVar14 + 3 & 0xfffffffc) != uVar51);
      }
      if (0 < (int)uVar33) {
        pvVar39 = bottom_blob->data;
        sVar18 = bottom_blob->elemsize;
        sVar21 = bottom_blob->cstep;
        uVar51 = 0;
        do {
          if (0 < (int)uVar15) {
            lVar20 = CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize) * local_b8.cstep *
                     uVar51;
            pvVar55 = (void *)(sVar18 * sVar21 * uVar51 + (long)pvVar39);
            uVar14 = 0;
            do {
              if (0 < (int)uVar13) {
                uVar37 = 0;
                do {
                  if (0 < (int)uVar12) {
                    fVar60 = *(float *)((long)local_b8.data + uVar37 * 4 + lVar20);
                    uVar46 = 0;
                    do {
                      fVar60 = fVar60 * *(float *)((long)pvVar55 + uVar46 * 4);
                      *(float *)((long)local_b8.data + uVar37 * 4 + lVar20) = fVar60;
                      uVar46 = uVar46 + 1;
                    } while (uVar57 != uVar46);
                  }
                  pvVar55 = (void *)((long)pvVar55 + lVar56 * 4);
                  uVar37 = uVar37 + 1;
                } while (uVar37 != uVar35);
              }
              uVar14 = uVar14 + 1;
            } while (uVar14 != uVar15);
          }
          uVar51 = uVar51 + 1;
        } while (uVar51 != uVar41);
      }
      auVar67 = _DAT_00544250;
      auVar79 = _DAT_00544240;
      auVar273 = _DAT_0053f020;
      uVar12 = top_blob->c * (int)top_blob->cstep;
      if (0 < (int)uVar12) {
        pvVar39 = top_blob->data;
        lVar56 = (ulong)uVar12 - 1;
        auVar112._8_4_ = (int)lVar56;
        auVar112._0_8_ = lVar56;
        auVar112._12_4_ = (int)((ulong)lVar56 >> 0x20);
        uVar51 = 0;
        auVar112 = auVar112 ^ _DAT_0053f020;
        do {
          auVar215._8_4_ = (int)uVar51;
          auVar215._0_8_ = uVar51;
          auVar215._12_4_ = (int)(uVar51 >> 0x20);
          auVar264 = (auVar215 | auVar67) ^ auVar273;
          iVar11 = auVar112._4_4_;
          if ((bool)(~(auVar264._4_4_ == iVar11 && auVar112._0_4_ < auVar264._0_4_ ||
                      iVar11 < auVar264._4_4_) & 1)) {
            *(undefined4 *)((long)pvVar39 + uVar51 * 4) = 0x3f800000;
          }
          if ((auVar264._12_4_ != auVar112._12_4_ || auVar264._8_4_ <= auVar112._8_4_) &&
              auVar264._12_4_ <= auVar112._12_4_) {
            *(undefined4 *)((long)pvVar39 + uVar51 * 4 + 4) = 0x3f800000;
          }
          auVar264 = (auVar215 | auVar79) ^ auVar273;
          iVar10 = auVar264._4_4_;
          if (iVar10 <= iVar11 && (iVar10 != iVar11 || auVar264._0_4_ <= auVar112._0_4_)) {
            *(undefined4 *)((long)pvVar39 + uVar51 * 4 + 8) = 0x3f800000;
            *(undefined4 *)((long)pvVar39 + uVar51 * 4 + 0xc) = 0x3f800000;
          }
          uVar51 = uVar51 + 4;
        } while ((uVar12 + 3 & 0xfffffffc) != uVar51);
      }
      if (0 < (int)uVar33) {
        pvVar39 = top_blob->data;
        uVar51 = 0;
        pvVar55 = local_b8.data;
        do {
          if (0 < (int)uVar13) {
            uVar57 = 0;
            do {
              *(float *)((long)pvVar39 + uVar57 * 4) =
                   *(float *)((long)pvVar55 + uVar57 * 4) * *(float *)((long)pvVar39 + uVar57 * 4);
              uVar57 = uVar57 + 1;
            } while (uVar35 != uVar57);
          }
          uVar51 = uVar51 + 1;
          pvVar55 = (void *)((long)pvVar55 +
                            local_b8.cstep *
                            CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize));
        } while (uVar51 != uVar41);
      }
      unaff_R15D = 0;
    }
    piVar7 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + -1;
      UNLOCK();
      if (*piVar7 == 0) {
        if (local_b8.allocator == (Allocator *)0x0) goto LAB_003586f3;
        (**(code **)(*(long *)local_b8.allocator + 0x18))();
      }
    }
    goto LAB_00358700;
  case 7:
    uVar6 = (undefined1)this->keepdims;
    auVar277._0_8_ = lVar56 << 0x3f;
    auVar277._8_8_ = lVar20 << 0x3f;
    uVar28 = movmskpd(0x548410,auVar277);
    bVar31 = (byte)uVar28;
    fVar161 = 1.0;
LAB_0034b6eb:
    iVar11 = reduction<ncnn::reduction_op_asum<float>,ncnn::reduction_op_add<float>,ncnn::post_process_identity<float>>
                       (bottom_blob,top_blob,fVar161,(bool)(bVar31 >> 1),(bool)(bVar31 & 1),bVar59,
                        reduce_c,(bool)uVar6,in_XMM1_Da,(int)opt,in_stack_fffffffffffffeb8);
    return iVar11;
  case 8:
    auVar279._0_8_ = lVar56 << 0x3f;
    auVar279._8_8_ = lVar20 << 0x3f;
    uVar28 = movmskpd(0x548410,auVar279);
    iVar11 = reduction_op<ncnn::reduction_op_sumsq<float>,ncnn::reduction_op_add<float>>
                       (bottom_blob,top_blob,fVar161,(bool)((byte)uVar28 >> 1),
                        (bool)((byte)uVar28 & 1),bVar59,reduce_c,this->keepdims,opt);
    if (iVar11 != 0) {
      return -100;
    }
    iVar11 = top_blob->dims;
    if (iVar11 == 2) {
      uVar12 = top_blob->h * top_blob->w;
      if (0 < (int)uVar12) {
        pvVar39 = top_blob->data;
        uVar41 = 0;
        do {
          *(float *)((long)pvVar39 + uVar41 * 4) = SQRT(*(float *)((long)pvVar39 + uVar41 * 4));
          uVar41 = uVar41 + 1;
        } while (uVar12 != uVar41);
        return 0;
      }
      return 0;
    }
    if (iVar11 == 1) {
      iVar11 = top_blob->w;
      if (0 < (long)iVar11) {
        pvVar39 = top_blob->data;
        lVar56 = 0;
        do {
          *(float *)((long)pvVar39 + lVar56 * 4) = SQRT(*(float *)((long)pvVar39 + lVar56 * 4));
          lVar56 = lVar56 + 1;
        } while (iVar11 != lVar56);
        return 0;
      }
      return 0;
    }
    if (1 < iVar11 - 3U) {
      return 0;
    }
    uVar12 = top_blob->c;
    uVar14 = top_blob->h * top_blob->w * top_blob->d;
    if ((ulong)uVar12 != 1) {
      if (0 < (int)uVar12) {
        pvVar39 = top_blob->data;
        sVar18 = top_blob->elemsize;
        sVar21 = top_blob->cstep;
        uVar41 = 0;
        do {
          if (0 < (int)uVar14) {
            uVar35 = 0;
            do {
              *(float *)((long)pvVar39 + uVar35 * 4) = SQRT(*(float *)((long)pvVar39 + uVar35 * 4));
              uVar35 = uVar35 + 1;
            } while (uVar14 != uVar35);
          }
          uVar41 = uVar41 + 1;
          pvVar39 = (void *)((long)pvVar39 + sVar18 * sVar21);
        } while (uVar41 != uVar12);
        return 0;
      }
      return 0;
    }
    if (0 < (int)uVar14) {
      pvVar39 = top_blob->data;
      uVar41 = 0;
      do {
        *(float *)((long)pvVar39 + uVar41 * 4) = SQRT(*(float *)((long)pvVar39 + uVar41 * 4));
        uVar41 = uVar41 + 1;
      } while (uVar14 != uVar41);
      return 0;
    }
    return 0;
  case 9:
    auVar275._0_8_ = lVar56 << 0x3f;
    auVar275._8_8_ = lVar20 << 0x3f;
    uVar28 = movmskpd(0x548410,auVar275);
    pMVar44 = top_blob;
    in_R11D = reduction_op<ncnn::reduction_op_add<float>,ncnn::reduction_op_add<float>>
                        (bottom_blob,top_blob,fVar161,(bool)((byte)uVar28 >> 1),
                         (bool)((byte)uVar28 & 1),bVar59,reduce_c,this->keepdims,opt);
    fVar161 = extraout_XMM0_Da;
    goto joined_r0x00352c51;
  case 10:
    iVar11 = this->keepdims;
    sVar18 = bottom_blob->elemsize;
    if (uVar12 == 2) {
      uVar14 = bottom_blob->w;
      uVar51 = (ulong)uVar14;
      uVar13 = bottom_blob->h;
      uVar35 = (ulong)uVar13;
      auVar67._8_4_ = 0xffffffff;
      auVar67._0_8_ = 0xffffffffffffffff;
      auVar67._12_4_ = 0xffffffff;
      auVar79._0_8_ = SUB168(auVar67 ^ auVar273,0) << 0x3f;
      auVar79._8_8_ = SUB168(auVar67 ^ auVar273,8) << 0x3f;
      iVar10 = movmskpd(iVar11,auVar79);
      if (iVar10 == 0) {
        if (iVar11 == 0) {
          Mat::create(top_blob,1,sVar18,opt->blob_allocator);
        }
        else {
          Mat::create(top_blob,1,1,sVar18,opt->blob_allocator);
        }
        local_b8.cstep = 0;
        local_b8.data = (void *)0x0;
        local_b8.refcount._0_4_ = 0;
        local_b8.refcount._4_4_ = 0;
        local_b8.elemsize._0_4_ = 0;
        local_b8.elemsize._4_4_ = 0;
        local_b8.elempack = 0;
        local_b8.allocator = (Allocator *)0x0;
        local_b8.dims = 0;
        local_b8.w = 0;
        local_b8.h = 0;
        local_b8.d = 0;
        local_b8.c = 0;
        Mat::create(&local_b8,uVar13,sVar18,opt->workspace_allocator);
        pvVar39 = local_b8.data;
        in_R11D = -100;
        if ((local_b8.data != (void *)0x0) && ((long)local_b8.c * local_b8.cstep != 0)) {
          if ((int)uVar13 < 1) {
            fVar161 = 0.0;
          }
          else {
            pvVar55 = bottom_blob->data;
            iVar10 = bottom_blob->w;
            sVar21 = bottom_blob->elemsize;
            uVar57 = 0;
            do {
              fVar161 = 0.0;
              if (0 < (int)uVar14) {
                uVar37 = 0;
                do {
                  fVar60 = expf(*(float *)((long)pvVar55 + uVar37 * 4));
                  fVar161 = fVar161 + fVar60;
                  uVar37 = uVar37 + 1;
                } while (uVar51 != uVar37);
              }
              *(float *)((long)pvVar39 + uVar57 * 4) = fVar161;
              uVar57 = uVar57 + 1;
              pvVar55 = (void *)((long)pvVar55 + (long)iVar10 * sVar21);
            } while (uVar57 != uVar35);
            fVar161 = 0.0;
            uVar51 = 0;
            do {
              fVar161 = fVar161 + *(float *)((long)pvVar39 + uVar51 * 4);
              uVar51 = uVar51 + 1;
            } while (uVar35 != uVar51);
          }
          *(float *)top_blob->data = fVar161;
          in_R11D = 0;
        }
        piVar7 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            if (local_b8.allocator == (Allocator *)0x0) {
              if (local_b8.data != (void *)0x0) {
                free(local_b8.data);
              }
            }
            else {
              (**(code **)(*(long *)local_b8.allocator + 0x18))();
            }
          }
        }
        uVar41 = uVar41 & 0xffffffff;
        local_b8.cstep = 0;
        auVar79 = ZEXT816(0);
        local_b8.data = (void *)0x0;
        local_b8.refcount._0_4_ = 0;
        local_b8.refcount._4_4_ = 0;
        local_b8.elemsize._0_4_ = 0;
        local_b8.elemsize._4_4_ = 0;
        local_b8.elempack = 0;
        local_b8.h = 0;
        local_b8.d = 0;
        local_b8.c = 0;
        bVar59 = false;
        pMVar44 = (Mat *)((ulong)pMVar44 & 0xffffffff);
        local_b8.dims = local_b8.refcount._4_4_;
        local_b8.w = (int)local_b8.elemsize;
      }
      else if (((bVar43 | (byte)iVar10 >> 1) & 1) == 0) {
        if (iVar11 == 0) {
          Mat::create(top_blob,uVar13,sVar18,opt->blob_allocator);
          auVar79 = extraout_XMM0_01;
        }
        else {
          Mat::create(top_blob,1,uVar13,sVar18,opt->blob_allocator);
          auVar79 = extraout_XMM0;
        }
        if (0 < (int)uVar13) {
          pvVar39 = bottom_blob->data;
          iVar10 = bottom_blob->w;
          sVar21 = bottom_blob->elemsize;
          pvVar55 = top_blob->data;
          uVar57 = 0;
          do {
            auVar79 = ZEXT816(0);
            if (0 < (int)uVar14) {
              uVar37 = 0;
              do {
                fVar161 = expf(*(float *)((long)pvVar39 + uVar37 * 4));
                auVar79 = ZEXT416((uint)(auVar79._0_4_ + fVar161));
                uVar37 = uVar37 + 1;
              } while (uVar51 != uVar37);
            }
            *(int *)((long)pvVar55 + uVar57 * 4) = auVar79._0_4_;
            uVar57 = uVar57 + 1;
            pvVar39 = (void *)((long)pvVar39 + (long)iVar10 * sVar21);
          } while (uVar57 != uVar35);
          goto LAB_0034d9eb;
        }
        bVar59 = false;
        in_R11D = 0;
        uVar41 = uVar41 & 0xffffffff;
        pMVar44 = (Mat *)((ulong)pMVar44 & 0xffffffff);
      }
      else if (((bVar31 | (byte)iVar10) & 1) == 0) {
        if (iVar11 == 0) {
          Mat::create(top_blob,uVar14,sVar18,opt->blob_allocator);
          auVar79 = extraout_XMM0_02;
        }
        else {
          Mat::create(top_blob,uVar14,1,sVar18,opt->blob_allocator);
          auVar79 = extraout_XMM0_00;
        }
        uVar15 = top_blob->c * (int)top_blob->cstep;
        pvVar39 = top_blob->data;
        if (0 < (int)uVar15) {
          memset(pvVar39,0,(ulong)uVar15 << 2);
          auVar79 = extraout_XMM0_03;
        }
        if (0 < (int)uVar13) {
          pvVar55 = bottom_blob->data;
          iVar10 = bottom_blob->w;
          sVar21 = bottom_blob->elemsize;
          uVar57 = 0;
          do {
            if (0 < (int)uVar14) {
              uVar37 = 0;
              do {
                fVar161 = expf(*(float *)((long)pvVar55 + uVar37 * 4));
                auVar79._0_4_ = fVar161 + *(float *)((long)pvVar39 + uVar37 * 4);
                auVar79._4_12_ = extraout_var;
                *(float *)((long)pvVar39 + uVar37 * 4) = auVar79._0_4_;
                uVar37 = uVar37 + 1;
              } while (uVar51 != uVar37);
            }
            uVar57 = uVar57 + 1;
            pvVar55 = (void *)((long)pvVar55 + (long)iVar10 * sVar21);
          } while (uVar57 != uVar35);
        }
LAB_0034d9eb:
        in_R11D = 0;
        bVar59 = false;
        uVar41 = uVar41 & 0xffffffff;
        pMVar44 = (Mat *)((ulong)pMVar44 & 0xffffffff);
      }
      else {
        bVar59 = true;
      }
      fVar161 = auVar79._0_4_;
      if (bVar59) goto LAB_0034d9fb;
    }
    else {
      if (uVar12 == 1) {
        iVar11 = bottom_blob->w;
        pMVar44 = (Mat *)0x1;
        Mat::create(top_blob,1,sVar18,opt->blob_allocator);
        if ((long)iVar11 < 1) {
          fVar161 = 0.0;
        }
        else {
          pvVar39 = bottom_blob->data;
          fVar161 = 0.0;
          lVar56 = 0;
          do {
            fVar60 = expf(*(float *)((long)pvVar39 + lVar56 * 4));
            fVar161 = fVar161 + fVar60;
            lVar56 = lVar56 + 1;
          } while (iVar11 != lVar56);
        }
        *(float *)top_blob->data = fVar161;
      }
      else {
LAB_0034d9fb:
        bVar25 = (byte)uVar41;
        if (uVar12 == 3) {
          uVar14 = bottom_blob->w;
          lVar56 = (long)(int)uVar14;
          uVar13 = bottom_blob->h;
          uVar41 = (ulong)uVar13;
          uVar15 = bottom_blob->c;
          pvVar39 = (void *)(ulong)uVar15;
          uVar33 = uVar13 * uVar14;
          auVar255._8_4_ = 0xffffffff;
          auVar255._0_8_ = 0xffffffffffffffff;
          auVar255._12_4_ = 0xffffffff;
          auVar264._0_8_ = SUB168(auVar255 ^ auVar273,0) << 0x3f;
          auVar264._8_8_ = SUB168(auVar255 ^ auVar273,8) << 0x3f;
          iVar10 = movmskpd(uVar14,auVar264);
          bVar8 = bVar25 ^ 1;
          if ((iVar10 == 0) && (bVar8 == 0)) {
            if (iVar11 == 0) {
              Mat::create(top_blob,1,sVar18,opt->blob_allocator);
            }
            else {
              Mat::create(top_blob,1,1,1,sVar18,opt->blob_allocator);
            }
            local_b8.cstep = 0;
            local_b8.data = (void *)0x0;
            local_b8.refcount._0_4_ = 0;
            local_b8.refcount._4_4_ = 0;
            local_b8.elemsize._0_4_ = 0;
            local_b8.elemsize._4_4_ = 0;
            local_b8.elempack = 0;
            local_b8.allocator = (Allocator *)0x0;
            local_b8.dims = 0;
            local_b8.w = 0;
            local_b8.h = 0;
            local_b8.d = 0;
            local_b8.c = 0;
            Mat::create(&local_b8,uVar15,sVar18,opt->workspace_allocator);
            pvVar55 = local_b8.data;
            in_R11D = -100;
            if ((local_b8.data != (void *)0x0) && ((long)local_b8.c * local_b8.cstep != 0)) {
              if ((int)uVar15 < 1) {
                fVar161 = 0.0;
              }
              else {
                pvVar54 = bottom_blob->data;
                sVar21 = bottom_blob->elemsize;
                sVar22 = bottom_blob->cstep;
                pvVar52 = (void *)0x0;
                do {
                  if ((int)uVar33 < 1) {
                    fVar161 = 0.0;
                  }
                  else {
                    fVar161 = 0.0;
                    uVar41 = 0;
                    do {
                      fVar60 = expf(*(float *)((long)pvVar54 + uVar41 * 4));
                      fVar161 = fVar161 + fVar60;
                      uVar41 = uVar41 + 1;
                    } while (uVar33 != uVar41);
                  }
                  *(float *)((long)pvVar55 + (long)pvVar52 * 4) = fVar161;
                  pvVar52 = (void *)((long)pvVar52 + 1);
                  pvVar54 = (void *)((long)pvVar54 + sVar21 * sVar22);
                } while (pvVar52 != pvVar39);
                fVar161 = 0.0;
                pvVar54 = (void *)0x0;
                do {
                  fVar161 = fVar161 + *(float *)((long)pvVar55 + (long)pvVar54 * 4);
                  pvVar54 = (void *)((long)pvVar54 + 1);
                } while (pvVar39 != pvVar54);
              }
              *(float *)top_blob->data = fVar161;
              in_R11D = 0;
            }
            piVar7 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
            if (piVar7 != (int *)0x0) {
              LOCK();
              *piVar7 = *piVar7 + -1;
              UNLOCK();
              if (*piVar7 == 0) {
                if (local_b8.allocator == (Allocator *)0x0) goto LAB_0034fb8e;
                (**(code **)(*(long *)local_b8.allocator + 0x18))();
              }
            }
            goto LAB_0034fba1;
          }
          if (iVar10 == 0 && bVar25 == 0) {
            if (iVar11 == 0) {
              Mat::create(top_blob,uVar15,sVar18,opt->blob_allocator);
              auVar264 = extraout_XMM0_06;
            }
            else {
              Mat::create(top_blob,1,1,uVar15,sVar18,opt->blob_allocator);
              auVar264 = extraout_XMM0_05;
            }
            if (0 < (int)uVar15) {
              pvVar55 = bottom_blob->data;
              sVar21 = bottom_blob->elemsize;
              pvVar54 = top_blob->data;
              sVar22 = top_blob->elemsize;
              sVar5 = top_blob->cstep;
              sVar4 = bottom_blob->cstep;
              pvVar52 = (void *)0x0;
              do {
                if ((int)uVar33 < 1) {
                  auVar264 = ZEXT816(0);
                }
                else {
                  auVar264 = ZEXT816(0);
                  uVar41 = 0;
                  do {
                    fVar161 = expf(*(float *)((long)pvVar55 + uVar41 * 4));
                    auVar264 = ZEXT416((uint)(auVar264._0_4_ + fVar161));
                    uVar41 = uVar41 + 1;
                  } while (uVar33 != uVar41);
                }
                lVar56 = sVar22 * sVar5 * (long)pvVar52;
                if (iVar11 == 0) {
                  lVar56 = (long)pvVar52 * 4;
                }
                *(int *)((long)pvVar54 + lVar56) = auVar264._0_4_;
                pvVar52 = (void *)((long)pvVar52 + 1);
                pvVar55 = (void *)((long)pvVar55 + sVar21 * sVar4);
              } while (pvVar52 != pvVar39);
            }
            goto LAB_0034dd83;
          }
          uVar35 = (ulong)uVar14;
          bVar9 = (byte)iVar10 >> 1 | bVar43;
          if ((bVar9 & 1) == 0 && bVar8 == 0) {
            if (iVar11 == 0) {
              Mat::create(top_blob,uVar13,sVar18,opt->blob_allocator);
            }
            else {
              Mat::create(top_blob,1,uVar13,1,sVar18,opt->blob_allocator);
            }
            local_b8.cstep = 0;
            local_b8.data = (void *)0x0;
            local_b8.refcount._0_4_ = 0;
            local_b8.refcount._4_4_ = 0;
            local_b8.elemsize._0_4_ = 0;
            local_b8.elemsize._4_4_ = 0;
            local_b8.elempack = 0;
            local_b8.allocator = (Allocator *)0x0;
            local_b8.dims = 0;
            local_b8.w = 0;
            local_b8.h = 0;
            local_b8.d = 0;
            local_b8.c = 0;
            Mat::create(&local_b8,1,uVar13,uVar15,sVar18,opt->workspace_allocator);
            pvVar55 = local_b8.data;
            in_R11D = -100;
            if ((local_b8.data != (void *)0x0) && (local_b8.cstep * (long)local_b8.c != 0)) {
              local_38 = (void *)local_b8.cstep;
              uVar33 = (int)local_b8.cstep * local_b8.c;
              if (0 < (int)uVar33) {
                memset(local_b8.data,0,(ulong)uVar33 << 2);
              }
              local_58 = pvVar55;
              if (0 < (int)uVar15) {
                local_68 = bottom_blob->data;
                local_60 = (void *)(bottom_blob->elemsize * bottom_blob->cstep);
                local_50 = (void *)(CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize) *
                                   (long)local_38);
                local_f0 = (void *)0x0;
                do {
                  pvVar55 = local_58;
                  if (0 < (int)uVar13) {
                    lVar20 = (long)local_50 * (long)local_f0;
                    uVar51 = 0;
                    pvVar54 = local_68;
                    do {
                      if ((int)uVar14 < 1) {
                        fVar161 = 0.0;
                      }
                      else {
                        fVar161 = 0.0;
                        uVar57 = 0;
                        do {
                          fVar60 = expf(*(float *)((long)pvVar54 + uVar57 * 4));
                          fVar161 = fVar161 + fVar60;
                          uVar57 = uVar57 + 1;
                        } while (uVar35 != uVar57);
                      }
                      *(float *)((long)pvVar55 + uVar51 * 4 + lVar20) = fVar161;
                      uVar51 = uVar51 + 1;
                      pvVar54 = (void *)((long)pvVar54 + lVar56 * 4);
                    } while (uVar51 != uVar41);
                  }
                  local_f0 = (void *)((long)local_f0 + 1);
                  local_68 = (void *)((long)local_68 + (long)local_60);
                } while (local_f0 != pvVar39);
              }
              uVar14 = top_blob->c * (int)top_blob->cstep;
              if (0 < (int)uVar14) {
                memset(top_blob->data,0,(ulong)uVar14 << 2);
              }
              if (0 < (int)uVar15) {
                pvVar55 = top_blob->data;
                pvVar52 = (void *)0x0;
                pvVar54 = local_58;
                do {
                  if (0 < (int)uVar13) {
                    uVar35 = 0;
                    do {
                      *(float *)((long)pvVar55 + uVar35 * 4) =
                           *(float *)((long)pvVar54 + uVar35 * 4) +
                           *(float *)((long)pvVar55 + uVar35 * 4);
                      uVar35 = uVar35 + 1;
                    } while (uVar41 != uVar35);
                  }
                  pvVar52 = (void *)((long)pvVar52 + 1);
                  pvVar54 = (void *)((long)pvVar54 +
                                    (long)local_38 *
                                    CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize));
                } while (pvVar52 != pvVar39);
              }
              in_R11D = 0;
            }
            piVar7 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
            if (piVar7 != (int *)0x0) {
              LOCK();
              *piVar7 = *piVar7 + -1;
              UNLOCK();
              if (*piVar7 == 0) {
                if (local_b8.allocator == (Allocator *)0x0) {
LAB_0034fb8e:
                  if (local_b8.data != (void *)0x0) {
                    free(local_b8.data);
                  }
                }
                else {
                  (**(code **)(*(long *)local_b8.allocator + 0x18))();
                }
              }
            }
LAB_0034fba1:
            local_b8.cstep = 0;
            auVar264 = ZEXT816(0);
            local_b8.data = (void *)0x0;
            local_b8.refcount._0_4_ = 0;
            local_b8.refcount._4_4_ = 0;
            local_b8.elemsize._0_4_ = 0;
            local_b8.elemsize._4_4_ = 0;
            local_b8.elempack = 0;
            local_b8.h = 0;
            local_b8.d = 0;
            local_b8.c = 0;
            bVar59 = false;
            local_b8.dims = local_b8.refcount._4_4_;
            local_b8.w = (int)local_b8.elemsize;
          }
          else {
            bVar32 = (byte)iVar10 | bVar31;
            if ((bVar32 & 1) == 0 && bVar8 == 0) {
              if (iVar11 == 0) {
                Mat::create(top_blob,uVar14,sVar18,opt->blob_allocator);
              }
              else {
                Mat::create(top_blob,uVar14,1,1,sVar18,opt->blob_allocator);
              }
              local_b8.cstep = 0;
              local_b8.data = (void *)0x0;
              local_b8.refcount._0_4_ = 0;
              local_b8.refcount._4_4_ = 0;
              local_b8.elemsize._0_4_ = 0;
              local_b8.elemsize._4_4_ = 0;
              local_b8.elempack = 0;
              local_b8.allocator = (Allocator *)0x0;
              local_b8.dims = 0;
              local_b8.w = 0;
              local_b8.h = 0;
              local_b8.d = 0;
              local_b8.c = 0;
              Mat::create(&local_b8,uVar14,1,uVar15,sVar18,opt->workspace_allocator);
              pvVar55 = local_b8.data;
              in_R11D = -100;
              if ((local_b8.data != (void *)0x0) && (local_b8.cstep * (long)local_b8.c != 0)) {
                local_50 = (void *)local_b8.cstep;
                uVar33 = (int)local_b8.cstep * local_b8.c;
                if (0 < (int)uVar33) {
                  memset(local_b8.data,0,(ulong)uVar33 << 2);
                }
                local_58 = pvVar55;
                if (0 < (int)uVar15) {
                  local_f0 = bottom_blob->data;
                  local_68 = (void *)(bottom_blob->elemsize * bottom_blob->cstep);
                  local_60 = (void *)(CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize) *
                                     (long)local_50);
                  pvVar54 = (void *)0x0;
                  do {
                    if (0 < (int)uVar13) {
                      uVar33 = 0;
                      pvVar52 = local_f0;
                      do {
                        if (0 < (int)uVar14) {
                          uVar41 = 0;
                          do {
                            fVar161 = expf(*(float *)((long)pvVar52 + uVar41 * 4));
                            *(float *)((long)pvVar55 + uVar41 * 4) =
                                 fVar161 + *(float *)((long)pvVar55 + uVar41 * 4);
                            uVar41 = uVar41 + 1;
                          } while (uVar35 != uVar41);
                        }
                        uVar33 = uVar33 + 1;
                        pvVar52 = (void *)((long)pvVar52 + lVar56 * 4);
                      } while (uVar33 != uVar13);
                    }
                    pvVar54 = (void *)((long)pvVar54 + 1);
                    local_f0 = (void *)((long)local_f0 + (long)local_68);
                    pvVar55 = (void *)((long)pvVar55 + (long)local_60);
                  } while (pvVar54 != pvVar39);
                }
                uVar13 = top_blob->c * (int)top_blob->cstep;
                if (0 < (int)uVar13) {
                  memset(top_blob->data,0,(ulong)uVar13 << 2);
                }
                if (0 < (int)uVar15) {
                  pvVar55 = top_blob->data;
                  pvVar52 = (void *)0x0;
                  pvVar54 = local_58;
                  do {
                    if (0 < (int)uVar14) {
                      uVar41 = 0;
                      do {
                        *(float *)((long)pvVar55 + uVar41 * 4) =
                             *(float *)((long)pvVar54 + uVar41 * 4) +
                             *(float *)((long)pvVar55 + uVar41 * 4);
                        uVar41 = uVar41 + 1;
                      } while (uVar35 != uVar41);
                    }
                    pvVar52 = (void *)((long)pvVar52 + 1);
                    pvVar54 = (void *)((long)pvVar54 +
                                      (long)local_50 *
                                      CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize));
                  } while (pvVar52 != pvVar39);
                }
                in_R11D = 0;
              }
              piVar7 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
              if (piVar7 != (int *)0x0) {
                LOCK();
                *piVar7 = *piVar7 + -1;
                UNLOCK();
                if (*piVar7 == 0) {
                  if (local_b8.allocator == (Allocator *)0x0) goto LAB_0034fb8e;
                  (**(code **)(*(long *)local_b8.allocator + 0x18))();
                }
              }
              goto LAB_0034fba1;
            }
            if ((bVar9 & 1) == 0 && bVar25 == 0) {
              if (iVar11 == 0) {
                Mat::create(top_blob,uVar13,uVar15,sVar18,opt->blob_allocator);
                auVar264 = extraout_XMM0_12;
              }
              else {
                Mat::create(top_blob,1,uVar13,uVar15,sVar18,opt->blob_allocator);
                auVar264 = extraout_XMM0_07;
              }
              if ((int)uVar15 < 1) {
LAB_0034dd83:
                bVar59 = false;
                in_R11D = 0;
              }
              else {
                if (iVar11 == 0) {
                  sVar21 = (size_t)top_blob->w;
                }
                else {
                  sVar21 = top_blob->cstep;
                }
                local_f0 = bottom_blob->data;
                local_50 = top_blob->data;
                local_58 = (void *)(sVar21 * top_blob->elemsize);
                local_60 = (void *)(bottom_blob->elemsize * bottom_blob->cstep);
                local_68 = (void *)0x0;
                do {
                  pvVar55 = local_50;
                  if (0 < (int)uVar13) {
                    lVar20 = (long)local_58 * (long)local_68;
                    uVar51 = 0;
                    pvVar54 = local_f0;
                    do {
                      if ((int)uVar14 < 1) {
                        auVar264 = ZEXT816(0);
                      }
                      else {
                        auVar264 = ZEXT816(0);
                        uVar57 = 0;
                        do {
                          fVar161 = expf(*(float *)((long)pvVar54 + uVar57 * 4));
                          auVar264 = ZEXT416((uint)(auVar264._0_4_ + fVar161));
                          uVar57 = uVar57 + 1;
                        } while (uVar35 != uVar57);
                      }
                      *(int *)((long)pvVar55 + uVar51 * 4 + lVar20) = auVar264._0_4_;
                      uVar51 = uVar51 + 1;
                      pvVar54 = (void *)((long)pvVar54 + lVar56 * 4);
                    } while (uVar51 != uVar41);
                  }
                  local_68 = (void *)((long)local_68 + 1);
                  local_f0 = (void *)((long)local_f0 + (long)local_60);
                  bVar59 = false;
                  in_R11D = 0;
                } while (local_68 != pvVar39);
              }
            }
            else if (((bVar43 | bVar31) & 1) == 0 && bVar8 == 0) {
              if (iVar11 == 0) {
                Mat::create(top_blob,uVar14,uVar13,sVar18,opt->blob_allocator);
                auVar264 = extraout_XMM0_14;
              }
              else {
                Mat::create(top_blob,uVar14,uVar13,1,sVar18,opt->blob_allocator);
                auVar264 = extraout_XMM0_11;
              }
              uVar14 = top_blob->c * (int)top_blob->cstep;
              if (0 < (int)uVar14) {
                memset(top_blob->data,0,(ulong)uVar14 << 2);
                auVar264 = extraout_XMM0_15;
              }
              if ((int)uVar15 < 1) goto LAB_0034dd83;
              sVar21 = bottom_blob->elemsize;
              sVar22 = bottom_blob->cstep;
              pvVar55 = bottom_blob->data;
              pvVar54 = top_blob->data;
              pvVar52 = (void *)0x0;
              do {
                if (0 < (int)uVar33) {
                  uVar41 = 0;
                  do {
                    fVar161 = expf(*(float *)((long)pvVar55 + uVar41 * 4));
                    auVar264._0_4_ = fVar161 + *(float *)((long)pvVar54 + uVar41 * 4);
                    auVar264._4_12_ = extraout_var_00;
                    *(float *)((long)pvVar54 + uVar41 * 4) = auVar264._0_4_;
                    uVar41 = uVar41 + 1;
                  } while (uVar33 != uVar41);
                }
                pvVar52 = (void *)((long)pvVar52 + 1);
                pvVar55 = (void *)((long)pvVar55 + sVar21 * sVar22);
                bVar59 = false;
                in_R11D = 0;
              } while (pvVar52 != pvVar39);
            }
            else {
              bVar59 = true;
              if ((bVar32 & 1) == 0 && bVar25 == 0) {
                if (iVar11 == 0) {
                  Mat::create(top_blob,uVar14,uVar15,sVar18,opt->blob_allocator);
                  auVar264 = extraout_XMM0_17;
                }
                else {
                  Mat::create(top_blob,uVar14,1,uVar15,sVar18,opt->blob_allocator);
                  auVar264 = extraout_XMM0_04;
                }
                sVar21 = top_blob->cstep;
                uVar33 = top_blob->c * (int)sVar21;
                if (0 < (int)uVar33) {
                  memset(top_blob->data,0,(ulong)uVar33 << 2);
                  auVar264 = extraout_XMM0_18;
                }
                if ((int)uVar15 < 1) goto LAB_0034dd83;
                local_130 = (Mat *)bottom_blob->data;
                pvVar55 = top_blob->data;
                if (iVar11 == 0) {
                  sVar21 = (long)top_blob->w;
                }
                sVar22 = top_blob->elemsize;
                local_68 = (void *)(bottom_blob->elemsize * bottom_blob->cstep);
                local_128 = (void *)0x0;
                do {
                  if (0 < (int)uVar13) {
                    uVar15 = 0;
                    pMVar42 = local_130;
                    do {
                      if (0 < (int)uVar14) {
                        uVar41 = 0;
                        do {
                          fVar161 = expf(*(float *)((long)pMVar42 + uVar41 * 4));
                          auVar264._0_4_ = fVar161 + *(float *)((long)pvVar55 + uVar41 * 4);
                          auVar264._4_12_ = extraout_var_01;
                          *(float *)((long)pvVar55 + uVar41 * 4) = auVar264._0_4_;
                          uVar41 = uVar41 + 1;
                        } while (uVar35 != uVar41);
                      }
                      uVar15 = uVar15 + 1;
                      pMVar42 = (Mat *)((long)pMVar42 + (long)(int)uVar14 * 4);
                    } while (uVar15 != uVar13);
                  }
                  local_128 = (void *)((long)local_128 + 1);
                  local_130 = (Mat *)((long)local_130 + (long)local_68);
                  pvVar55 = (void *)((long)pvVar55 + sVar21 * sVar22);
                  bVar59 = false;
                  in_R11D = 0;
                } while (local_128 != pvVar39);
              }
            }
          }
          fVar161 = auVar264._0_4_;
          pMVar44 = (Mat *)((ulong)pMVar44 & 0xffffffff);
          if (!bVar59) goto joined_r0x00352c51;
        }
        if (uVar12 == 4) {
          uVar12 = bottom_blob->w;
          pMVar16 = (Mat *)(long)(int)uVar12;
          uVar14 = bottom_blob->h;
          pMVar42 = (Mat *)(ulong)uVar14;
          uVar13 = bottom_blob->d;
          pMVar17 = (Mat *)(ulong)uVar13;
          uVar15 = bottom_blob->c;
          pMVar29 = (Mat *)(ulong)uVar15;
          uVar33 = uVar14 * uVar12;
          uVar34 = uVar33 * uVar13;
          auVar92._8_4_ = 0xffffffff;
          auVar92._0_8_ = 0xffffffffffffffff;
          auVar92._12_4_ = 0xffffffff;
          auVar150._0_8_ = SUB168(auVar92 ^ auVar273,0) << 0x3f;
          auVar150._8_8_ = SUB168(auVar92 ^ auVar273,8) << 0x3f;
          iVar10 = movmskpd(uVar12,auVar150);
          bVar59 = iVar10 == 0;
          bVar8 = (byte)pMVar44;
          bVar9 = bVar8 ^ 1;
          bVar32 = bVar25 ^ 1;
          pMVar44 = pMVar29;
          if ((bVar59 && bVar9 == 0) && (bVar32 == 0)) {
            if (iVar11 == 0) {
              Mat::create(top_blob,1,sVar18,opt->blob_allocator);
            }
            else {
              Mat::create(top_blob,1,1,1,1,sVar18,opt->blob_allocator);
            }
            local_b8.cstep = 0;
            local_b8.data = (Mat *)0x0;
            local_b8.refcount._0_4_ = 0;
            local_b8.refcount._4_4_ = 0;
            local_b8.elemsize._0_4_ = 0;
            local_b8.elemsize._4_4_ = 0;
            local_b8.elempack = 0;
            local_b8.allocator = (Allocator *)0x0;
            local_b8.dims = 0;
            local_b8.w = 0;
            local_b8.h = 0;
            local_b8.d = 0;
            local_b8.c = 0;
            Mat::create(&local_b8,uVar15,sVar18,opt->workspace_allocator);
            pvVar39 = local_b8.data;
            in_R11D = -100;
            if (((Mat *)local_b8.data != (Mat *)0x0) && ((long)local_b8.c * local_b8.cstep != 0)) {
              if ((int)uVar15 < 1) {
                fVar161 = 0.0;
              }
              else {
                pvVar55 = bottom_blob->data;
                sVar18 = bottom_blob->elemsize;
                sVar21 = bottom_blob->cstep;
                pMVar42 = (Mat *)0x0;
                do {
                  if ((int)uVar34 < 1) {
                    fVar161 = 0.0;
                  }
                  else {
                    fVar161 = 0.0;
                    uVar41 = 0;
                    do {
                      fVar60 = expf(*(float *)((long)pvVar55 + uVar41 * 4));
                      fVar161 = fVar161 + fVar60;
                      uVar41 = uVar41 + 1;
                    } while (uVar34 != uVar41);
                  }
                  *(float *)((long)(void **)pvVar39 + (long)pMVar42 * 4) = fVar161;
                  pMVar42 = (Mat *)((long)&pMVar42->data + 1);
                  pvVar55 = (void *)((long)pvVar55 + sVar18 * sVar21);
                } while (pMVar42 != pMVar29);
                fVar161 = 0.0;
                pMVar42 = (Mat *)0x0;
                do {
                  fVar161 = fVar161 + *(float *)((long)(void **)pvVar39 + (long)pMVar42 * 4);
                  pMVar42 = (Mat *)((long)&pMVar42->data + 1);
                } while (pMVar29 != pMVar42);
              }
              *(float *)top_blob->data = fVar161;
              in_R11D = 0;
            }
            piVar7 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
            if (piVar7 != (int *)0x0) {
              LOCK();
              *piVar7 = *piVar7 + -1;
              UNLOCK();
              if (*piVar7 == 0) {
                pMVar44 = (Mat *)local_b8.data;
                if (local_b8.allocator == (Allocator *)0x0) goto joined_r0x00352c02;
                (**(code **)(*(long *)local_b8.allocator + 0x18))();
                pMVar44 = (Mat *)local_b8.data;
              }
            }
            goto LAB_00352c12;
          }
          if ((bVar59 && bVar9 == 0) && bVar25 == 0) {
            if (iVar11 == 0) {
              Mat::create(top_blob,uVar15,sVar18,opt->blob_allocator);
              auVar150 = extraout_XMM0_10;
            }
            else {
              pMVar44 = (Mat *)0x1;
              Mat::create(top_blob,1,1,1,uVar15,sVar18,opt->blob_allocator);
              auVar150 = extraout_XMM0_09;
            }
            if (0 < (int)uVar15) {
              pvVar39 = bottom_blob->data;
              sVar18 = bottom_blob->elemsize;
              pvVar55 = top_blob->data;
              sVar21 = top_blob->elemsize;
              sVar22 = top_blob->cstep;
              sVar5 = bottom_blob->cstep;
              pMVar42 = (Mat *)0x0;
              do {
                if ((int)uVar34 < 1) {
                  auVar150 = ZEXT816(0);
                }
                else {
                  auVar150 = ZEXT816(0);
                  uVar41 = 0;
                  do {
                    fVar161 = expf(*(float *)((long)pvVar39 + uVar41 * 4));
                    auVar150 = ZEXT416((uint)(auVar150._0_4_ + fVar161));
                    uVar41 = uVar41 + 1;
                  } while (uVar34 != uVar41);
                }
                lVar56 = sVar21 * sVar22 * (long)pMVar42;
                if (iVar11 == 0) {
                  lVar56 = (long)pMVar42 * 4;
                }
                *(int *)((long)pvVar55 + lVar56) = auVar150._0_4_;
                pMVar42 = (Mat *)((long)&pMVar42->data + 1);
                pvVar39 = (void *)((long)pvVar39 + sVar18 * sVar5);
              } while (pMVar42 != pMVar29);
            }
            goto LAB_0035006a;
          }
          if ((bVar59 && bVar8 == 0) && bVar32 == 0) {
            if (iVar11 == 0) {
              Mat::create(top_blob,uVar13,sVar18,opt->blob_allocator);
            }
            else {
              Mat::create(top_blob,1,1,uVar13,1,sVar18,opt->blob_allocator);
            }
            local_b8.cstep = 0;
            local_b8.data = (Mat *)0x0;
            local_b8.refcount._0_4_ = 0;
            local_b8.refcount._4_4_ = 0;
            local_b8.elemsize._0_4_ = 0;
            local_b8.elemsize._4_4_ = 0;
            local_b8.elempack = 0;
            local_b8.allocator = (Allocator *)0x0;
            local_b8.dims = 0;
            local_b8.w = 0;
            local_b8.h = 0;
            local_b8.d = 0;
            local_b8.c = 0;
            pMVar44 = (Mat *)0x1;
            Mat::create(&local_b8,1,uVar13,uVar15,sVar18,opt->workspace_allocator);
            sVar18 = local_b8.cstep;
            pMVar42 = (Mat *)local_b8.data;
            in_R11D = -100;
            if (((Mat *)local_b8.data != (Mat *)0x0) && (local_b8.cstep * (long)local_b8.c != 0)) {
              uVar12 = (int)local_b8.cstep * local_b8.c;
              if (0 < (int)uVar12) {
                memset(local_b8.data,0,(ulong)uVar12 << 2);
              }
              if (0 < (int)uVar15) {
                local_130 = (Mat *)bottom_blob->data;
                sVar21 = bottom_blob->elemsize;
                lVar56 = CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize);
                sVar22 = bottom_blob->cstep;
                local_f8 = (Mat *)0x0;
                do {
                  if (0 < (int)uVar13) {
                    pMVar16 = (Mat *)0x0;
                    pMVar44 = local_130;
                    do {
                      if ((int)uVar33 < 1) {
                        fVar161 = 0.0;
                      }
                      else {
                        fVar161 = 0.0;
                        uVar41 = 0;
                        do {
                          fVar60 = expf(*(float *)((long)pMVar44 + uVar41 * 4));
                          fVar161 = fVar161 + fVar60;
                          uVar41 = uVar41 + 1;
                        } while (uVar33 != uVar41);
                      }
                      *(float *)((long)&pMVar42->data +
                                (long)pMVar16 * 4 + lVar56 * sVar18 * (long)local_f8) = fVar161;
                      pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                      pMVar44 = (Mat *)((long)pMVar44 + (long)(int)uVar33 * 4);
                    } while (pMVar16 != pMVar17);
                  }
                  local_f8 = (Mat *)((long)&local_f8->data + 1);
                  local_130 = (Mat *)((long)local_130 + sVar21 * sVar22);
                } while (local_f8 != pMVar29);
              }
              uVar12 = top_blob->c * (int)top_blob->cstep;
              if (0 < (int)uVar12) {
                memset(top_blob->data,0,(ulong)uVar12 << 2);
              }
              if (0 < (int)uVar15) {
                pvVar39 = top_blob->data;
                pMVar44 = (Mat *)0x0;
                do {
                  if (0 < (int)uVar13) {
                    pMVar16 = (Mat *)0x0;
                    do {
                      *(float *)((long)pvVar39 + (long)pMVar16 * 4) =
                           *(float *)((long)&pMVar42->data + (long)pMVar16 * 4) +
                           *(float *)((long)pvVar39 + (long)pMVar16 * 4);
                      pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                    } while (pMVar17 != pMVar16);
                  }
                  pMVar44 = (Mat *)((long)&pMVar44->data + 1);
                  pMVar42 = (Mat *)((long)&pMVar42->data +
                                   sVar18 * CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize)
                                   );
                } while (pMVar44 != pMVar29);
              }
              in_R11D = 0;
              pMVar44 = pMVar29;
            }
            piVar7 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
            if (piVar7 != (int *)0x0) {
              LOCK();
              *piVar7 = *piVar7 + -1;
              UNLOCK();
              if (*piVar7 == 0) {
                pMVar44 = (Mat *)local_b8.data;
                if (local_b8.allocator == (Allocator *)0x0) {
joined_r0x00352c02:
                  if (pMVar44 != (Mat *)0x0) {
                    local_b8.data = pMVar44;
                    free(pMVar44);
                  }
                }
                else {
                  (**(code **)(*(long *)local_b8.allocator + 0x18))();
                  pMVar44 = (Mat *)local_b8.data;
                }
              }
            }
LAB_00352c12:
            local_b8.cstep = 0;
            auVar150 = ZEXT816(0);
            local_b8.data = (void *)0x0;
            local_b8.refcount._0_4_ = 0;
            local_b8.refcount._4_4_ = 0;
            local_b8.elemsize._0_4_ = 0;
            local_b8.elemsize._4_4_ = 0;
            local_b8.elempack = 0;
            local_b8.h = 0;
            local_b8.d = 0;
            local_b8.c = 0;
            bVar59 = false;
            local_b8.dims = local_b8.refcount._4_4_;
            local_b8.w = (int)local_b8.elemsize;
          }
          else {
            pMVar38 = (Mat *)(ulong)uVar12;
            bVar47 = (byte)iVar10 >> 1 | bVar43;
            if (((bVar47 & 1) == 0 && bVar9 == 0) && bVar32 == 0) {
              if (iVar11 == 0) {
                Mat::create(top_blob,uVar14,sVar18,opt->blob_allocator);
              }
              else {
                Mat::create(top_blob,1,uVar14,1,1,sVar18,opt->blob_allocator);
              }
              local_b8.cstep = 0;
              local_b8.data = (Mat *)0x0;
              local_b8.refcount._0_4_ = 0;
              local_b8.refcount._4_4_ = 0;
              local_b8.elemsize._0_4_ = 0;
              local_b8.elemsize._4_4_ = 0;
              local_b8.elempack = 0;
              local_b8.allocator = (Allocator *)0x0;
              local_b8.dims = 0;
              local_b8.w = 0;
              local_b8.h = 0;
              local_b8.d = 0;
              local_b8.c = 0;
              pMVar44 = (Mat *)0x1;
              Mat::create(&local_b8,1,uVar14,uVar15,sVar18,opt->workspace_allocator);
              sVar18 = local_b8.cstep;
              pvVar39 = local_b8.data;
              in_R11D = -100;
              if (((Mat *)local_b8.data != (Mat *)0x0) &&
                 (pMVar44 = (Mat *)local_b8.cstep, local_b8.cstep * (long)local_b8.c != 0)) {
                uVar33 = (int)local_b8.cstep * local_b8.c;
                if (0 < (int)uVar33) {
                  pMVar44 = (Mat *)0x0;
                  memset(local_b8.data,0,(ulong)uVar33 << 2);
                }
                if (0 < (int)uVar15) {
                  pvVar55 = bottom_blob->data;
                  sVar21 = bottom_blob->elemsize;
                  sVar22 = bottom_blob->cstep;
                  lVar56 = CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize);
                  local_e8 = (Mat *)0x0;
                  do {
                    if (0 < (int)uVar13) {
                      lVar20 = lVar56 * sVar18 * (long)local_e8;
                      pvVar54 = (void *)(sVar21 * sVar22 * (long)local_e8 + (long)pvVar55);
                      uVar33 = 0;
                      do {
                        if (0 < (int)uVar14) {
                          pMVar17 = (Mat *)0x0;
                          do {
                            if (0 < (int)uVar12) {
                              fVar161 = *(float *)((long)(void **)pvVar39 +
                                                  (long)pMVar17 * 4 + lVar20);
                              pMVar23 = (Mat *)0x0;
                              do {
                                fVar60 = expf(*(float *)((long)pvVar54 + (long)pMVar23 * 4));
                                fVar161 = fVar161 + fVar60;
                                *(float *)((long)(void **)pvVar39 + (long)pMVar17 * 4 + lVar20) =
                                     fVar161;
                                pMVar23 = (Mat *)((long)&pMVar23->data + 1);
                              } while (pMVar38 != pMVar23);
                            }
                            pvVar54 = (void *)((long)pvVar54 + (long)pMVar16 * 4);
                            pMVar17 = (Mat *)((long)&pMVar17->data + 1);
                          } while (pMVar17 != pMVar42);
                        }
                        uVar33 = uVar33 + 1;
                      } while (uVar33 != uVar13);
                    }
                    local_e8 = (Mat *)((long)&local_e8->data + 1);
                  } while (local_e8 != pMVar29);
                }
                uVar12 = top_blob->c * (int)top_blob->cstep;
                if (0 < (int)uVar12) {
                  pMVar44 = (Mat *)0x0;
                  memset(top_blob->data,0,(ulong)uVar12 << 2);
                }
                if (0 < (int)uVar15) {
                  pvVar55 = top_blob->data;
                  pMVar16 = (Mat *)0x0;
                  pMVar44 = (Mat *)pvVar39;
                  do {
                    if (0 < (int)uVar14) {
                      pMVar17 = (Mat *)0x0;
                      do {
                        *(float *)((long)pvVar55 + (long)pMVar17 * 4) =
                             *(float *)((long)&pMVar44->data + (long)pMVar17 * 4) +
                             *(float *)((long)pvVar55 + (long)pMVar17 * 4);
                        pMVar17 = (Mat *)((long)&pMVar17->data + 1);
                      } while (pMVar42 != pMVar17);
                    }
                    pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                    pMVar44 = (Mat *)((long)&pMVar44->data +
                                     sVar18 * CONCAT44(local_b8.elemsize._4_4_,
                                                       (int)local_b8.elemsize));
                  } while (pMVar16 != pMVar29);
                }
                in_R11D = 0;
              }
              piVar7 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
              if (piVar7 != (int *)0x0) {
                LOCK();
                *piVar7 = *piVar7 + -1;
                UNLOCK();
                if (*piVar7 == 0) {
                  pMVar44 = (Mat *)local_b8.data;
                  if (local_b8.allocator == (Allocator *)0x0) goto joined_r0x00352c02;
                  (**(code **)(*(long *)local_b8.allocator + 0x18))();
                  pMVar44 = (Mat *)local_b8.data;
                }
              }
              goto LAB_00352c12;
            }
            bVar27 = (byte)iVar10 | bVar31;
            if (((bVar27 & 1) == 0 && bVar9 == 0) && bVar32 == 0) {
              if (iVar11 == 0) {
                Mat::create(top_blob,uVar12,sVar18,opt->blob_allocator);
              }
              else {
                Mat::create(top_blob,uVar12,1,1,1,sVar18,opt->blob_allocator);
              }
              local_b8.cstep = 0;
              local_b8.data = (Mat *)0x0;
              local_b8.refcount._0_4_ = 0;
              local_b8.refcount._4_4_ = 0;
              local_b8.elemsize._0_4_ = 0;
              local_b8.elemsize._4_4_ = 0;
              local_b8.elempack = 0;
              local_b8.allocator = (Allocator *)0x0;
              local_b8.dims = 0;
              local_b8.w = 0;
              local_b8.h = 0;
              local_b8.d = 0;
              local_b8.c = 0;
              pMVar44 = pMVar16;
              Mat::create(&local_b8,uVar12,1,uVar15,sVar18,opt->workspace_allocator);
              sVar18 = local_b8.cstep;
              pMVar42 = (Mat *)local_b8.data;
              in_R11D = -100;
              if (((Mat *)local_b8.data != (Mat *)0x0) && (local_b8.cstep * (long)local_b8.c != 0))
              {
                uVar33 = (int)local_b8.cstep * local_b8.c;
                if (0 < (int)uVar33) {
                  memset(local_b8.data,0,(ulong)uVar33 << 2);
                }
                if (0 < (int)uVar15) {
                  pvVar39 = bottom_blob->data;
                  sVar21 = bottom_blob->elemsize;
                  sVar22 = bottom_blob->cstep;
                  lVar56 = CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize);
                  local_120 = (Mat *)0x0;
                  pMVar44 = pMVar42;
                  do {
                    if (0 < (int)uVar13) {
                      pvVar55 = (void *)(sVar21 * sVar22 * (long)local_120 + (long)pvVar39);
                      uVar33 = 0;
                      do {
                        if (0 < (int)uVar14) {
                          uVar34 = 0;
                          do {
                            if (0 < (int)uVar12) {
                              pMVar17 = (Mat *)0x0;
                              do {
                                fVar161 = expf(*(float *)((long)pvVar55 + (long)pMVar17 * 4));
                                *(float *)((long)&pMVar44->data + (long)pMVar17 * 4) =
                                     fVar161 + *(float *)((long)&pMVar44->data + (long)pMVar17 * 4);
                                pMVar17 = (Mat *)((long)&pMVar17->data + 1);
                              } while (pMVar38 != pMVar17);
                            }
                            pvVar55 = (void *)((long)pvVar55 + (long)pMVar16 * 4);
                            uVar34 = uVar34 + 1;
                          } while (uVar34 != uVar14);
                        }
                        uVar33 = uVar33 + 1;
                      } while (uVar33 != uVar13);
                    }
                    local_120 = (Mat *)((long)&local_120->data + 1);
                    pMVar44 = (Mat *)((long)&pMVar44->data + lVar56 * sVar18);
                  } while (local_120 != pMVar29);
                }
                uVar14 = top_blob->c * (int)top_blob->cstep;
                if (0 < (int)uVar14) {
                  memset(top_blob->data,0,(ulong)uVar14 << 2);
                }
                if (0 < (int)uVar15) {
                  pvVar39 = top_blob->data;
                  pMVar44 = (Mat *)0x0;
                  do {
                    if (0 < (int)uVar12) {
                      pMVar16 = (Mat *)0x0;
                      do {
                        *(float *)((long)pvVar39 + (long)pMVar16 * 4) =
                             *(float *)((long)&pMVar42->data + (long)pMVar16 * 4) +
                             *(float *)((long)pvVar39 + (long)pMVar16 * 4);
                        pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                      } while (pMVar38 != pMVar16);
                    }
                    pMVar44 = (Mat *)((long)&pMVar44->data + 1);
                    pMVar42 = (Mat *)((long)&pMVar42->data +
                                     sVar18 * CONCAT44(local_b8.elemsize._4_4_,
                                                       (int)local_b8.elemsize));
                  } while (pMVar44 != pMVar29);
                }
                in_R11D = 0;
                pMVar44 = pMVar29;
              }
              piVar7 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
              if (piVar7 != (int *)0x0) {
                LOCK();
                *piVar7 = *piVar7 + -1;
                UNLOCK();
                if (*piVar7 == 0) {
                  pMVar44 = (Mat *)local_b8.data;
                  if (local_b8.allocator == (Allocator *)0x0) goto joined_r0x00352c02;
                  (**(code **)(*(long *)local_b8.allocator + 0x18))();
                  pMVar44 = (Mat *)local_b8.data;
                }
              }
              goto LAB_00352c12;
            }
            if ((bVar59 && bVar8 == 0) && bVar25 == 0) {
              if (iVar11 == 0) {
                pMVar44 = pMVar17;
                Mat::create(top_blob,uVar13,uVar15,sVar18,opt->blob_allocator);
                auVar150 = extraout_XMM0_16;
              }
              else {
                pMVar44 = (Mat *)0x1;
                Mat::create(top_blob,1,1,uVar13,uVar15,sVar18,opt->blob_allocator);
                auVar150 = extraout_XMM0_13;
              }
              if ((int)uVar15 < 1) goto LAB_0035006a;
              sVar18 = bottom_blob->elemsize;
              if (iVar11 == 0) {
                sVar21 = (size_t)top_blob->w;
              }
              else {
                sVar21 = top_blob->cstep;
              }
              local_f8 = (Mat *)bottom_blob->data;
              pvVar39 = top_blob->data;
              sVar22 = top_blob->elemsize;
              sVar5 = bottom_blob->cstep;
              local_130 = (Mat *)0x0;
              do {
                if (0 < (int)uVar13) {
                  pMVar16 = (Mat *)0x0;
                  pMVar42 = local_f8;
                  do {
                    if ((int)uVar33 < 1) {
                      auVar150 = ZEXT816(0);
                    }
                    else {
                      auVar150 = ZEXT816(0);
                      uVar41 = 0;
                      do {
                        fVar161 = expf(*(float *)((long)pMVar42 + uVar41 * 4));
                        auVar150 = ZEXT416((uint)(auVar150._0_4_ + fVar161));
                        uVar41 = uVar41 + 1;
                      } while (uVar33 != uVar41);
                    }
                    *(int *)((long)pvVar39 + (long)pMVar16 * 4 + sVar21 * sVar22 * (long)local_130)
                         = auVar150._0_4_;
                    pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                    pMVar42 = (Mat *)((long)pMVar42 + (long)(int)uVar33 * 4);
                  } while (pMVar16 != pMVar17);
                }
                local_130 = (Mat *)((long)&local_130->data + 1);
                local_f8 = (Mat *)((long)local_f8 + sVar18 * sVar5);
                bVar59 = false;
                in_R11D = 0;
              } while (local_130 != pMVar29);
              goto LAB_00352c3d;
            }
            if (((bVar47 & 1) == 0 && bVar8 == 0) && bVar32 == 0) {
              if (iVar11 == 0) {
                Mat::create(top_blob,uVar14,uVar13,sVar18,opt->blob_allocator);
              }
              else {
                Mat::create(top_blob,1,uVar14,uVar13,1,sVar18,opt->blob_allocator);
              }
              local_b8.cstep = 0;
              local_b8.data = (Mat *)0x0;
              local_b8.refcount._0_4_ = 0;
              local_b8.refcount._4_4_ = 0;
              local_b8.elemsize._0_4_ = 0;
              local_b8.elemsize._4_4_ = 0;
              local_b8.elempack = 0;
              local_b8.allocator = (Allocator *)0x0;
              local_b8.dims = 0;
              local_b8.w = 0;
              local_b8.h = 0;
              local_b8.d = 0;
              local_b8.c = 0;
              pMVar44 = (Mat *)(ulong)uVar14;
              Mat::create(&local_b8,uVar14,uVar13,uVar15,sVar18,opt->workspace_allocator);
              pMVar23 = (Mat *)local_b8.data;
              in_R11D = -100;
              if (((Mat *)local_b8.data != (Mat *)0x0) && (local_b8.cstep * (long)local_b8.c != 0))
              {
                local_60 = (void *)local_b8.cstep;
                uVar33 = (int)local_b8.cstep * local_b8.c;
                if (0 < (int)uVar33) {
                  pMVar44 = (Mat *)0x0;
                  memset(local_b8.data,0,(ulong)uVar33 << 2);
                }
                if (0 < (int)uVar15) {
                  pvVar39 = bottom_blob->data;
                  sVar18 = bottom_blob->elemsize;
                  sVar21 = bottom_blob->cstep;
                  lVar20 = (long)local_b8.w;
                  lVar56 = CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize);
                  local_68 = (void *)(lVar56 * (long)local_60);
                  local_d0 = (Mat *)0x0;
                  do {
                    if (0 < (int)uVar13) {
                      lVar30 = (long)local_68 * (long)local_d0;
                      pvVar55 = (void *)(sVar18 * sVar21 * (long)local_d0 + (long)pvVar39);
                      pMVar19 = (Mat *)0x0;
                      do {
                        if (0 < (int)uVar14) {
                          lVar45 = lVar20 * lVar56 * (long)pMVar19 + lVar30;
                          pMVar48 = (Mat *)0x0;
                          do {
                            if (0 < (int)uVar12) {
                              fVar161 = *(float *)((long)&pMVar23->data + (long)pMVar48 * 4 + lVar45
                                                  );
                              pMVar58 = (Mat *)0x0;
                              do {
                                fVar60 = expf(*(float *)((long)pvVar55 + (long)pMVar58 * 4));
                                fVar161 = fVar161 + fVar60;
                                *(float *)((long)&pMVar23->data + (long)pMVar48 * 4 + lVar45) =
                                     fVar161;
                                pMVar58 = (Mat *)((long)&pMVar58->data + 1);
                              } while (pMVar38 != pMVar58);
                            }
                            pvVar55 = (void *)((long)pvVar55 + (long)pMVar16 * 4);
                            pMVar48 = (Mat *)((long)&pMVar48->data + 1);
                          } while (pMVar48 != pMVar42);
                        }
                        pMVar19 = (Mat *)((long)&pMVar19->data + 1);
                      } while (pMVar19 != pMVar17);
                    }
                    local_d0 = (Mat *)((long)&local_d0->data + 1);
                  } while (local_d0 != pMVar29);
                }
                uVar12 = top_blob->c * (int)top_blob->cstep;
                if (0 < (int)uVar12) {
                  pMVar44 = (Mat *)0x0;
                  memset(top_blob->data,0,(ulong)uVar12 << 2);
                }
                if (0 < (int)uVar15) {
                  pMVar16 = (Mat *)0x0;
                  do {
                    if (0 < (int)uVar13) {
                      iVar10 = 1;
                      if (iVar11 != 0) {
                        iVar10 = top_blob->h;
                      }
                      iVar265 = top_blob->w;
                      sVar18 = top_blob->elemsize;
                      pMVar44 = (Mat *)top_blob->data;
                      pMVar19 = (Mat *)0x0;
                      pMVar38 = pMVar23;
                      do {
                        if (0 < (int)uVar14) {
                          pMVar48 = (Mat *)0x0;
                          do {
                            *(float *)((long)&pMVar44->data + (long)pMVar48 * 4) =
                                 *(float *)((long)&pMVar38->data + (long)pMVar48 * 4) +
                                 *(float *)((long)&pMVar44->data + (long)pMVar48 * 4);
                            pMVar48 = (Mat *)((long)&pMVar48->data + 1);
                          } while (pMVar42 != pMVar48);
                        }
                        pMVar19 = (Mat *)((long)&pMVar19->data + 1);
                        pMVar38 = (Mat *)((long)&pMVar38->data +
                                         (long)local_b8.w *
                                         CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize));
                        pMVar44 = (Mat *)((long)&pMVar44->data +
                                         (long)iVar10 * sVar18 * (long)iVar265);
                      } while (pMVar19 != pMVar17);
                    }
                    pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                    pMVar23 = (Mat *)((long)&pMVar23->data +
                                     (long)local_60 *
                                     CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize));
                  } while (pMVar16 != pMVar29);
                }
                in_R11D = 0;
              }
              piVar7 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
              if (piVar7 != (int *)0x0) {
                LOCK();
                *piVar7 = *piVar7 + -1;
                UNLOCK();
                if (*piVar7 == 0) {
                  if (local_b8.allocator == (Allocator *)0x0) {
LAB_00358a45:
                    pMVar44 = (Mat *)local_b8.data;
                    if ((Mat *)local_b8.data != (Mat *)0x0) {
                      free(local_b8.data);
                      pMVar44 = (Mat *)local_b8.data;
                    }
                  }
                  else {
                    (**(code **)(*(long *)local_b8.allocator + 0x18))();
                    pMVar44 = (Mat *)local_b8.data;
                  }
                }
              }
LAB_00358a52:
              local_b8.cstep = 0;
              auVar150 = ZEXT816(0);
              local_b8.data = (void *)0x0;
              local_b8.refcount._0_4_ = 0;
              local_b8.refcount._4_4_ = 0;
              local_b8.elemsize._0_4_ = 0;
              local_b8.elemsize._4_4_ = 0;
              local_b8.elempack = 0;
              local_b8.h = 0;
              local_b8.d = 0;
              local_b8.c = 0;
              bVar59 = false;
              local_b8.dims = local_b8.refcount._4_4_;
              local_b8.w = (int)local_b8.elemsize;
            }
            else {
              bVar43 = bVar43 | bVar31;
              pMVar44 = (Mat *)(ulong)CONCAT31(auVar273._1_3_,bVar43);
              if ((bVar9 == 0 && (bVar43 & 1) == 0) && bVar32 == 0) {
                if (iVar11 == 0) {
                  Mat::create(top_blob,uVar12,uVar14,sVar18,opt->blob_allocator);
                }
                else {
                  Mat::create(top_blob,uVar12,uVar14,1,1,sVar18,opt->blob_allocator);
                }
                local_b8.cstep = 0;
                local_b8.data = (Mat *)0x0;
                local_b8.refcount._0_4_ = 0;
                local_b8.refcount._4_4_ = 0;
                local_b8.elemsize._0_4_ = 0;
                local_b8.elemsize._4_4_ = 0;
                local_b8.elempack = 0;
                local_b8.allocator = (Allocator *)0x0;
                local_b8.dims = 0;
                local_b8.w = 0;
                local_b8.h = 0;
                local_b8.d = 0;
                local_b8.c = 0;
                pMVar44 = pMVar16;
                Mat::create(&local_b8,uVar12,uVar14,uVar15,sVar18,opt->workspace_allocator);
                pMVar17 = (Mat *)local_b8.data;
                in_R11D = -100;
                if (((Mat *)local_b8.data != (Mat *)0x0) &&
                   (local_68 = (void *)local_b8.cstep, local_b8.cstep * (long)local_b8.c != 0)) {
                  uVar33 = (int)local_b8.cstep * local_b8.c;
                  if (0 < (int)uVar33) {
                    pMVar44 = (Mat *)0x0;
                    memset(local_b8.data,0,(ulong)uVar33 << 2);
                  }
                  if (0 < (int)uVar15) {
                    pvVar39 = bottom_blob->data;
                    sVar18 = bottom_blob->elemsize;
                    sVar21 = bottom_blob->cstep;
                    lVar30 = (long)local_b8.w;
                    lVar56 = CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize);
                    lVar20 = lVar56 * (long)local_68;
                    local_118 = (Mat *)0x0;
                    local_e8 = pMVar17;
                    do {
                      if (0 < (int)uVar13) {
                        pvVar55 = (void *)(sVar18 * sVar21 * (long)local_118 + (long)pvVar39);
                        uVar33 = 0;
                        do {
                          if (0 < (int)uVar14) {
                            pMVar19 = (Mat *)0x0;
                            pMVar23 = local_e8;
                            do {
                              if (0 < (int)uVar12) {
                                pMVar48 = (Mat *)0x0;
                                do {
                                  fVar161 = expf(*(float *)((long)pvVar55 + (long)pMVar48 * 4));
                                  *(float *)((long)&pMVar23->data + (long)pMVar48 * 4) =
                                       fVar161 + *(float *)((long)&pMVar23->data + (long)pMVar48 * 4
                                                           );
                                  pMVar48 = (Mat *)((long)&pMVar48->data + 1);
                                } while (pMVar38 != pMVar48);
                              }
                              pvVar55 = (void *)((long)pvVar55 + (long)pMVar16 * 4);
                              pMVar19 = (Mat *)((long)&pMVar19->data + 1);
                              pMVar23 = (Mat *)((long)&pMVar23->data + lVar30 * lVar56);
                            } while (pMVar19 != pMVar42);
                          }
                          uVar33 = uVar33 + 1;
                        } while (uVar33 != uVar13);
                      }
                      local_118 = (Mat *)((long)&local_118->data + 1);
                      local_e8 = (Mat *)((long)&local_e8->data + lVar20);
                    } while (local_118 != pMVar29);
                  }
                  uVar13 = top_blob->c * (int)top_blob->cstep;
                  if (0 < (int)uVar13) {
                    pMVar44 = (Mat *)0x0;
                    memset(top_blob->data,0,(ulong)uVar13 << 2);
                  }
                  if (0 < (int)uVar15) {
                    pvVar39 = top_blob->data;
                    iVar11 = top_blob->w;
                    sVar18 = top_blob->elemsize;
                    pMVar44 = (Mat *)0x0;
                    do {
                      if (0 < (int)uVar14) {
                        pMVar23 = (Mat *)0x0;
                        pvVar55 = pvVar39;
                        pMVar16 = pMVar17;
                        do {
                          if (0 < (int)uVar12) {
                            pMVar19 = (Mat *)0x0;
                            do {
                              *(float *)((long)pvVar55 + (long)pMVar19 * 4) =
                                   *(float *)((long)&pMVar16->data + (long)pMVar19 * 4) +
                                   *(float *)((long)pvVar55 + (long)pMVar19 * 4);
                              pMVar19 = (Mat *)((long)&pMVar19->data + 1);
                            } while (pMVar38 != pMVar19);
                          }
                          pMVar23 = (Mat *)((long)&pMVar23->data + 1);
                          pMVar16 = (Mat *)((long)&pMVar16->data +
                                           (long)local_b8.w *
                                           CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize))
                          ;
                          pvVar55 = (void *)((long)pvVar55 + (long)iVar11 * sVar18);
                        } while (pMVar23 != pMVar42);
                      }
                      pMVar44 = (Mat *)((long)&pMVar44->data + 1);
                      pMVar17 = (Mat *)((long)&pMVar17->data +
                                       (long)local_68 *
                                       CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize));
                    } while (pMVar44 != pMVar29);
                  }
                  in_R11D = 0;
                }
                piVar7 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
                if (piVar7 != (int *)0x0) {
                  LOCK();
                  *piVar7 = *piVar7 + -1;
                  UNLOCK();
                  if (*piVar7 == 0) {
                    if (local_b8.allocator == (Allocator *)0x0) goto LAB_00358a45;
                    (**(code **)(*(long *)local_b8.allocator + 0x18))();
                    pMVar44 = (Mat *)local_b8.data;
                  }
                }
                goto LAB_00358a52;
              }
              if (((bVar47 & 1) == 0 && bVar9 == 0) && bVar25 == 0) {
                if (iVar11 == 0) {
                  pMVar44 = pMVar42;
                  Mat::create(top_blob,uVar14,uVar15,sVar18,opt->blob_allocator);
                  auVar150 = extraout_XMM0_20;
                }
                else {
                  pMVar44 = (Mat *)0x1;
                  Mat::create(top_blob,1,uVar14,1,uVar15,sVar18,opt->blob_allocator);
                  auVar150 = extraout_XMM0_19;
                }
                if ((int)uVar15 < 1) goto LAB_0035006a;
                sVar18 = bottom_blob->elemsize;
                if (iVar11 == 0) {
                  sVar21 = (size_t)top_blob->w;
                }
                else {
                  sVar21 = top_blob->cstep;
                }
                pvVar39 = bottom_blob->data;
                sVar22 = bottom_blob->cstep;
                sVar5 = top_blob->elemsize;
                pvVar55 = top_blob->data;
                pMVar17 = (Mat *)0x0;
                do {
                  pvVar54 = (void *)(sVar21 * sVar5 * (long)pMVar17 + (long)pvVar55);
                  if (0 < (int)uVar14) {
                    pMVar44 = (Mat *)0x0;
                    memset(pvVar54,0,(long)pMVar42 * 4);
                    auVar150 = extraout_XMM0_21;
                  }
                  if (0 < (int)uVar13) {
                    pvVar52 = (void *)(sVar18 * sVar22 * (long)pMVar17 + (long)pvVar39);
                    uVar15 = 0;
                    do {
                      if (0 < (int)uVar14) {
                        pMVar23 = (Mat *)0x0;
                        do {
                          if (0 < (int)uVar12) {
                            auVar150 = ZEXT416(*(uint *)((long)pvVar54 + (long)pMVar23 * 4));
                            pMVar19 = (Mat *)0x0;
                            do {
                              fVar161 = expf(*(float *)((long)pvVar52 + (long)pMVar19 * 4));
                              fVar161 = auVar150._0_4_ + fVar161;
                              auVar150 = ZEXT416((uint)fVar161);
                              *(float *)((long)pvVar54 + (long)pMVar23 * 4) = fVar161;
                              pMVar19 = (Mat *)((long)&pMVar19->data + 1);
                            } while (pMVar38 != pMVar19);
                          }
                          pvVar52 = (void *)((long)pvVar52 + (long)pMVar16 * 4);
                          pMVar23 = (Mat *)((long)&pMVar23->data + 1);
                        } while (pMVar23 != pMVar42);
                      }
                      uVar15 = uVar15 + 1;
                    } while (uVar15 != uVar13);
                  }
                  pMVar17 = (Mat *)((long)&pMVar17->data + 1);
                  bVar59 = false;
                  in_R11D = 0;
                } while (pMVar17 != pMVar29);
              }
              else {
                if (((bVar27 & 1) == 0 && bVar8 == 0) && bVar32 == 0) {
                  if (iVar11 == 0) {
                    Mat::create(top_blob,uVar12,uVar13,sVar18,opt->blob_allocator);
                  }
                  else {
                    Mat::create(top_blob,uVar12,1,uVar13,1,sVar18,opt->blob_allocator);
                  }
                  local_b8.cstep = 0;
                  local_b8.data = (Mat *)0x0;
                  local_b8.refcount._0_4_ = 0;
                  local_b8.refcount._4_4_ = 0;
                  local_b8.elemsize._0_4_ = 0;
                  local_b8.elemsize._4_4_ = 0;
                  local_b8.elempack = 0;
                  local_b8.allocator = (Allocator *)0x0;
                  local_b8.dims = 0;
                  local_b8.w = 0;
                  local_b8.h = 0;
                  local_b8.d = 0;
                  local_b8.c = 0;
                  pMVar44 = pMVar38;
                  Mat::create(&local_b8,uVar12,uVar13,uVar15,sVar18,opt->workspace_allocator);
                  pMVar42 = (Mat *)local_b8.data;
                  in_R11D = -100;
                  if (((Mat *)local_b8.data != (Mat *)0x0) &&
                     (local_68 = (void *)local_b8.cstep, local_b8.cstep * (long)local_b8.c != 0)) {
                    uVar33 = (int)local_b8.cstep * local_b8.c;
                    if (0 < (int)uVar33) {
                      pMVar44 = (Mat *)0x0;
                      memset(local_b8.data,0,(ulong)uVar33 << 2);
                    }
                    if (0 < (int)uVar15) {
                      pvVar39 = bottom_blob->data;
                      sVar18 = bottom_blob->elemsize;
                      sVar21 = bottom_blob->cstep;
                      lVar30 = (long)local_b8.w;
                      lVar56 = CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize);
                      lVar20 = lVar56 * (long)local_68;
                      local_e8 = (Mat *)0x0;
                      local_118 = pMVar42;
                      do {
                        if (0 < (int)uVar13) {
                          pvVar55 = (void *)(sVar18 * sVar21 * (long)local_e8 + (long)pvVar39);
                          pMVar19 = (Mat *)0x0;
                          pMVar23 = local_118;
                          do {
                            if (0 < (int)uVar14) {
                              uVar33 = 0;
                              do {
                                if (0 < (int)uVar12) {
                                  pMVar48 = (Mat *)0x0;
                                  do {
                                    fVar161 = expf(*(float *)((long)pvVar55 + (long)pMVar48 * 4));
                                    *(float *)((long)&pMVar23->data + (long)pMVar48 * 4) =
                                         fVar161 + *(float *)((long)&pMVar23->data +
                                                             (long)pMVar48 * 4);
                                    pMVar48 = (Mat *)((long)&pMVar48->data + 1);
                                  } while (pMVar38 != pMVar48);
                                }
                                pvVar55 = (void *)((long)pvVar55 + (long)pMVar16 * 4);
                                uVar33 = uVar33 + 1;
                              } while (uVar33 != uVar14);
                            }
                            pMVar19 = (Mat *)((long)&pMVar19->data + 1);
                            pMVar23 = (Mat *)((long)&pMVar23->data + lVar30 * lVar56);
                          } while (pMVar19 != pMVar17);
                        }
                        local_e8 = (Mat *)((long)&local_e8->data + 1);
                        local_118 = (Mat *)((long)&local_118->data + lVar20);
                      } while (local_e8 != pMVar29);
                    }
                    uVar14 = top_blob->c * (int)top_blob->cstep;
                    if (0 < (int)uVar14) {
                      pMVar44 = (Mat *)0x0;
                      memset(top_blob->data,0,(ulong)uVar14 << 2);
                    }
                    if (0 < (int)uVar15) {
                      pvVar39 = top_blob->data;
                      iVar11 = top_blob->w;
                      sVar18 = top_blob->elemsize;
                      pMVar44 = (Mat *)0x0;
                      do {
                        if (0 < (int)uVar13) {
                          pMVar23 = (Mat *)0x0;
                          pvVar55 = pvVar39;
                          pMVar16 = pMVar42;
                          do {
                            if (0 < (int)uVar12) {
                              pMVar19 = (Mat *)0x0;
                              do {
                                *(float *)((long)pvVar55 + (long)pMVar19 * 4) =
                                     *(float *)((long)&pMVar16->data + (long)pMVar19 * 4) +
                                     *(float *)((long)pvVar55 + (long)pMVar19 * 4);
                                pMVar19 = (Mat *)((long)&pMVar19->data + 1);
                              } while (pMVar38 != pMVar19);
                            }
                            pMVar23 = (Mat *)((long)&pMVar23->data + 1);
                            pMVar16 = (Mat *)((long)&pMVar16->data +
                                             (long)local_b8.w *
                                             CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize
                                                     ));
                            pvVar55 = (void *)((long)pvVar55 + (long)iVar11 * sVar18);
                          } while (pMVar23 != pMVar17);
                        }
                        pMVar44 = (Mat *)((long)&pMVar44->data + 1);
                        pMVar42 = (Mat *)((long)&pMVar42->data +
                                         (long)local_68 *
                                         CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize));
                      } while (pMVar44 != pMVar29);
                    }
                    in_R11D = 0;
                  }
                  piVar7 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
                  if (piVar7 != (int *)0x0) {
                    LOCK();
                    *piVar7 = *piVar7 + -1;
                    UNLOCK();
                    if (*piVar7 == 0) {
                      if (local_b8.allocator == (Allocator *)0x0) goto LAB_00358a45;
                      (**(code **)(*(long *)local_b8.allocator + 0x18))();
                      pMVar44 = (Mat *)local_b8.data;
                    }
                  }
                  goto LAB_00358a52;
                }
                if (((bVar27 & 1) == 0 && bVar9 == 0) && bVar25 == 0) {
                  if (iVar11 == 0) {
                    pMVar44 = pMVar38;
                    Mat::create(top_blob,uVar12,uVar15,sVar18,opt->blob_allocator);
                    auVar150 = extraout_XMM0_24;
                  }
                  else {
                    pMVar44 = pMVar16;
                    Mat::create(top_blob,uVar12,1,1,uVar15,sVar18,opt->blob_allocator);
                    auVar150 = extraout_XMM0_22;
                  }
                  if ((int)uVar15 < 1) {
LAB_0035006a:
                    bVar59 = false;
                    in_R11D = 0;
                  }
                  else {
                    sVar18 = bottom_blob->elemsize;
                    if (iVar11 == 0) {
                      sVar21 = (size_t)top_blob->w;
                    }
                    else {
                      sVar21 = top_blob->cstep;
                    }
                    sVar22 = bottom_blob->cstep;
                    pvVar39 = bottom_blob->data;
                    pvVar55 = top_blob->data;
                    lVar56 = sVar21 * top_blob->elemsize;
                    pMVar42 = (Mat *)0x0;
                    pvVar54 = pvVar55;
                    do {
                      if (0 < (int)uVar12) {
                        pMVar44 = (Mat *)0x0;
                        memset((void *)(lVar56 * (long)pMVar42 + (long)pvVar55),0,(long)pMVar38 * 4)
                        ;
                        auVar150 = extraout_XMM0_25;
                      }
                      if (0 < (int)uVar13) {
                        pvVar52 = (void *)(sVar18 * sVar22 * (long)pMVar42 + (long)pvVar39);
                        uVar15 = 0;
                        do {
                          if (0 < (int)uVar14) {
                            uVar33 = 0;
                            do {
                              if (0 < (int)uVar12) {
                                pMVar17 = (Mat *)0x0;
                                do {
                                  fVar161 = expf(*(float *)((long)pvVar52 + (long)pMVar17 * 4));
                                  auVar150._0_4_ =
                                       fVar161 + *(float *)((long)pvVar54 + (long)pMVar17 * 4);
                                  auVar150._4_12_ = extraout_var_02;
                                  *(float *)((long)pvVar54 + (long)pMVar17 * 4) = auVar150._0_4_;
                                  pMVar17 = (Mat *)((long)&pMVar17->data + 1);
                                } while (pMVar38 != pMVar17);
                              }
                              pvVar52 = (void *)((long)pvVar52 + (long)pMVar16 * 4);
                              uVar33 = uVar33 + 1;
                            } while (uVar33 != uVar14);
                          }
                          uVar15 = uVar15 + 1;
                        } while (uVar15 != uVar13);
                      }
                      pMVar42 = (Mat *)((long)&pMVar42->data + 1);
                      pvVar54 = (void *)((long)pvVar54 + lVar56);
                      bVar59 = false;
                      in_R11D = 0;
                    } while (pMVar42 != pMVar29);
                  }
                }
                else if (((bVar47 & 1) == 0 && bVar8 == 0) && bVar25 == 0) {
                  if (iVar11 == 0) {
                    Mat::create(top_blob,uVar14,uVar13,uVar15,sVar18,opt->blob_allocator);
                    pMVar44 = pMVar42;
                    auVar150 = extraout_XMM0_27;
                  }
                  else {
                    pMVar44 = (Mat *)0x1;
                    Mat::create(top_blob,1,uVar14,uVar13,uVar15,sVar18,opt->blob_allocator);
                    auVar150 = extraout_XMM0_23;
                  }
                  if ((int)uVar15 < 1) goto LAB_0035006a;
                  local_120 = (Mat *)bottom_blob->data;
                  sVar18 = bottom_blob->elemsize;
                  pvVar39 = top_blob->data;
                  sVar21 = top_blob->elemsize;
                  sVar22 = top_blob->cstep;
                  sVar5 = bottom_blob->cstep;
                  local_110 = (Mat *)0x0;
                  do {
                    if (0 < (int)(uVar14 * uVar13)) {
                      uVar41 = 0;
                      pMVar42 = local_120;
                      do {
                        if ((int)uVar12 < 1) {
                          auVar150 = ZEXT816(0);
                        }
                        else {
                          auVar150 = ZEXT816(0);
                          pMVar17 = (Mat *)0x0;
                          do {
                            fVar161 = expf(*(float *)((long)pMVar42 + (long)pMVar17 * 4));
                            auVar150 = ZEXT416((uint)(auVar150._0_4_ + fVar161));
                            pMVar17 = (Mat *)((long)&pMVar17->data + 1);
                          } while (pMVar38 != pMVar17);
                        }
                        *(int *)((long)pvVar39 + uVar41 * 4 + sVar21 * sVar22 * (long)local_110) =
                             auVar150._0_4_;
                        uVar41 = uVar41 + 1;
                        pMVar42 = (Mat *)((long)pMVar42 + (long)pMVar16 * 4);
                      } while (uVar41 != uVar14 * uVar13);
                    }
                    local_110 = (Mat *)((long)&local_110->data + 1);
                    local_120 = (Mat *)((long)local_120 + sVar18 * sVar5);
                    bVar59 = false;
                    in_R11D = 0;
                  } while (local_110 != pMVar29);
                }
                else if ((bVar8 == 0 && (bVar43 & 1) == 0) && bVar32 == 0) {
                  if (iVar11 == 0) {
                    pMVar44 = pMVar38;
                    Mat::create(top_blob,uVar12,uVar14,uVar13,sVar18,opt->blob_allocator);
                    auVar150 = extraout_XMM0_29;
                  }
                  else {
                    pMVar44 = pMVar16;
                    Mat::create(top_blob,uVar12,uVar14,uVar13,1,sVar18,opt->blob_allocator);
                    auVar150 = extraout_XMM0_26;
                  }
                  uVar33 = top_blob->c * (int)top_blob->cstep;
                  if (0 < (int)uVar33) {
                    pMVar44 = (Mat *)0x0;
                    memset(top_blob->data,0,(ulong)uVar33 << 2);
                    auVar150 = extraout_XMM0_30;
                  }
                  if ((int)uVar15 < 1) goto LAB_0035006a;
                  pvVar39 = bottom_blob->data;
                  sVar18 = bottom_blob->elemsize;
                  sVar21 = bottom_blob->cstep;
                  local_d0 = (Mat *)0x0;
                  do {
                    if (0 < (int)uVar13) {
                      iVar10 = top_blob->w;
                      if (iVar11 == 0) {
                        sVar22 = top_blob->cstep;
                      }
                      else {
                        sVar22 = (long)top_blob->h * (long)iVar10;
                      }
                      pvVar54 = (void *)(sVar18 * sVar21 * (long)local_d0 + (long)pvVar39);
                      pvVar55 = top_blob->data;
                      sVar5 = top_blob->elemsize;
                      pMVar23 = (Mat *)0x0;
                      do {
                        if (0 < (int)uVar14) {
                          pMVar19 = (Mat *)0x0;
                          pvVar52 = pvVar55;
                          do {
                            if (0 < (int)uVar12) {
                              pMVar48 = (Mat *)0x0;
                              do {
                                fVar161 = expf(*(float *)((long)pvVar54 + (long)pMVar48 * 4));
                                auVar150._0_4_ =
                                     fVar161 + *(float *)((long)pvVar52 + (long)pMVar48 * 4);
                                auVar150._4_12_ = extraout_var_03;
                                *(float *)((long)pvVar52 + (long)pMVar48 * 4) = auVar150._0_4_;
                                pMVar48 = (Mat *)((long)&pMVar48->data + 1);
                              } while (pMVar38 != pMVar48);
                            }
                            pvVar54 = (void *)((long)pvVar54 + (long)pMVar16 * 4);
                            pMVar19 = (Mat *)((long)&pMVar19->data + 1);
                            pvVar52 = (void *)((long)pvVar52 + (long)iVar10 * sVar5);
                          } while (pMVar19 != pMVar42);
                        }
                        pMVar23 = (Mat *)((long)&pMVar23->data + 1);
                        pvVar55 = (void *)((long)pvVar55 + sVar22 * sVar5);
                      } while (pMVar23 != pMVar17);
                    }
                    local_d0 = (Mat *)((long)&local_d0->data + 1);
                    bVar59 = false;
                    in_R11D = 0;
                  } while (local_d0 != pMVar29);
                }
                else if (((bVar27 & 1) == 0 && bVar8 == 0) && bVar25 == 0) {
                  if (iVar11 == 0) {
                    pMVar44 = pMVar38;
                    Mat::create(top_blob,uVar12,uVar13,uVar15,sVar18,opt->blob_allocator);
                    auVar150 = extraout_XMM0_31;
                  }
                  else {
                    Mat::create(top_blob,uVar12,1,uVar13,uVar15,sVar18,opt->blob_allocator);
                    pMVar44 = pMVar16;
                    auVar150 = extraout_XMM0_28;
                  }
                  if ((int)uVar15 < 1) goto LAB_0035006a;
                  pvVar39 = bottom_blob->data;
                  sVar18 = bottom_blob->elemsize;
                  sVar21 = bottom_blob->cstep;
                  iVar11 = top_blob->w;
                  pvVar55 = top_blob->data;
                  uVar41 = top_blob->elemsize;
                  lVar56 = top_blob->cstep * uVar41;
                  pMVar44 = (Mat *)((long)top_blob->h * (long)iVar11);
                  local_120 = (Mat *)0x0;
                  iVar10 = (int)((uVar41 * (long)pMVar44 + 0xf & 0xfffffffffffffff0) / uVar41);
                  if (top_blob->dims == 4) {
                    iVar10 = (int)pMVar44;
                  }
                  uVar15 = iVar10 * top_blob->d;
                  local_e8 = (Mat *)pvVar55;
                  do {
                    if (0 < (int)uVar15) {
                      pMVar44 = (Mat *)0x0;
                      memset((void *)(lVar56 * (long)local_120 + (long)pvVar55),0,(ulong)uVar15 * 4)
                      ;
                      auVar150 = extraout_XMM0_32;
                    }
                    if (0 < (int)uVar13) {
                      pvVar54 = (void *)(sVar18 * sVar21 * (long)local_120 + (long)pvVar39);
                      pMVar16 = (Mat *)0x0;
                      pMVar42 = local_e8;
                      do {
                        if (0 < (int)uVar14) {
                          uVar33 = 0;
                          do {
                            if (0 < (int)uVar12) {
                              pMVar23 = (Mat *)0x0;
                              do {
                                fVar161 = expf(*(float *)((long)pvVar54 + (long)pMVar23 * 4));
                                auVar150._0_4_ =
                                     fVar161 + *(float *)((long)pMVar42 + (long)pMVar23 * 4);
                                auVar150._4_12_ = extraout_var_04;
                                *(float *)((long)pMVar42 + (long)pMVar23 * 4) = auVar150._0_4_;
                                pMVar23 = (Mat *)((long)&pMVar23->data + 1);
                              } while (pMVar38 != pMVar23);
                            }
                            pvVar54 = (void *)((long)pvVar54 + (long)(int)uVar12 * 4);
                            uVar33 = uVar33 + 1;
                          } while (uVar33 != uVar14);
                        }
                        pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                        pMVar42 = (Mat *)((long)pMVar42 + uVar41 * (long)iVar11);
                      } while (pMVar16 != pMVar17);
                    }
                    local_120 = (Mat *)((long)&local_120->data + 1);
                    local_e8 = (Mat *)((long)local_e8 + lVar56);
                    bVar59 = false;
                    in_R11D = 0;
                  } while (local_120 != pMVar29);
                }
                else {
                  bVar59 = true;
                  if (bVar25 == 0 && (bVar9 == 0 && (bVar43 & 1) == 0)) {
                    if (iVar11 == 0) {
                      pMVar44 = pMVar38;
                      Mat::create(top_blob,uVar12,uVar14,uVar15,sVar18,opt->blob_allocator);
                      auVar150 = extraout_XMM0_33;
                    }
                    else {
                      pMVar44 = pMVar38;
                      Mat::create(top_blob,uVar12,uVar14,1,uVar15,sVar18,opt->blob_allocator);
                      auVar150 = extraout_XMM0_08;
                    }
                    if ((int)uVar15 < 1) goto LAB_0035006a;
                    pvVar39 = bottom_blob->data;
                    sVar18 = bottom_blob->elemsize;
                    sVar21 = bottom_blob->cstep;
                    iVar11 = top_blob->w;
                    pvVar55 = top_blob->data;
                    uVar41 = top_blob->elemsize;
                    lVar56 = top_blob->cstep * uVar41;
                    pMVar44 = (Mat *)((long)top_blob->h * (long)iVar11);
                    local_e8 = (Mat *)0x0;
                    iVar10 = (int)((uVar41 * (long)pMVar44 + 0xf & 0xfffffffffffffff0) / uVar41);
                    if (top_blob->dims == 4) {
                      iVar10 = (int)pMVar44;
                    }
                    uVar15 = iVar10 * top_blob->d;
                    local_120 = (Mat *)pvVar55;
                    do {
                      if (0 < (int)uVar15) {
                        pMVar44 = (Mat *)0x0;
                        memset((void *)(lVar56 * (long)local_e8 + (long)pvVar55),0,(ulong)uVar15 * 4
                              );
                        auVar150 = extraout_XMM0_34;
                      }
                      if (0 < (int)uVar13) {
                        pvVar54 = (void *)(sVar18 * sVar21 * (long)local_e8 + (long)pvVar39);
                        uVar33 = 0;
                        do {
                          if (0 < (int)uVar14) {
                            pMVar17 = (Mat *)0x0;
                            pMVar16 = local_120;
                            do {
                              if (0 < (int)uVar12) {
                                pMVar23 = (Mat *)0x0;
                                do {
                                  fVar161 = expf(*(float *)((long)pvVar54 + (long)pMVar23 * 4));
                                  auVar150._0_4_ =
                                       fVar161 + *(float *)((long)pMVar16 + (long)pMVar23 * 4);
                                  auVar150._4_12_ = extraout_var_05;
                                  *(float *)((long)pMVar16 + (long)pMVar23 * 4) = auVar150._0_4_;
                                  pMVar23 = (Mat *)((long)&pMVar23->data + 1);
                                } while (pMVar38 != pMVar23);
                              }
                              pvVar54 = (void *)((long)pvVar54 + (long)(int)uVar12 * 4);
                              pMVar17 = (Mat *)((long)&pMVar17->data + 1);
                              pMVar16 = (Mat *)((long)pMVar16 + uVar41 * (long)iVar11);
                            } while (pMVar17 != pMVar42);
                          }
                          uVar33 = uVar33 + 1;
                        } while (uVar33 != uVar13);
                      }
                      local_e8 = (Mat *)((long)&local_e8->data + 1);
                      local_120 = (Mat *)((long)local_120 + lVar56);
                      bVar59 = false;
                      in_R11D = 0;
                    } while (local_e8 != pMVar29);
                  }
                }
              }
            }
          }
LAB_00352c3d:
          fVar161 = auVar150._0_4_;
          if (!bVar59) goto joined_r0x00352c51;
        }
      }
      in_R11D = 0;
    }
joined_r0x00352c51:
    if (in_R11D != 0) {
      return -100;
    }
    reduction_post_process<ncnn::post_process_log<float>>(top_blob,fVar161,(Option *)pMVar44);
  default:
    goto switchD_0034b4f3_default;
  }
  if (unaff_R15D != 0) {
    return -100;
  }
  if (1.1920929e-07 < ABS(fVar161 + -1.0)) {
LAB_00358760:
    reduction_post_process<ncnn::post_process_identity<float>>(top_blob,fVar161,(Option *)pMVar44);
  }
switchD_0034b4f3_default:
  return 0;
}

Assistant:

int Reduction::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int dims = bottom_blob.dims;
    int axes_flag[4] = {0};
    bool reduce_w = false;
    bool reduce_h = false;
    bool reduce_d = false;
    bool reduce_c = false;

    if (reduce_all)
    {
        reduce_w = true;
        reduce_h = true;
        reduce_d = true;
        reduce_c = true;
    }
    else
    {
        const int* axes_ptr = axes;
        int reduced_axes_num = axes.w;

        for (int i = 0; i < reduced_axes_num; i++)
        {
            int axis = axes_ptr[i];
            // handle negative axis
            if (axis < 0)
                axis += dims;
            axes_flag[axis] = 1;
        }

        if (dims == 1)
        {
            reduce_w = true;
        }
        else if (dims == 2)
        {
            if (axes_flag[0] == 1) reduce_h = true;
            if (axes_flag[1] == 1) reduce_w = true;
        }
        else if (dims == 3)
        {
            if (axes_flag[0] == 1) reduce_c = true;
            if (axes_flag[1] == 1) reduce_h = true;
            if (axes_flag[2] == 1) reduce_w = true;
        }
        else if (dims == 4)
        {
            if (axes_flag[0] == 1) reduce_c = true;
            if (axes_flag[1] == 1) reduce_d = true;
            if (axes_flag[2] == 1) reduce_h = true;
            if (axes_flag[3] == 1) reduce_w = true;
        }
    }

    if (operation == ReductionOp_SUM)
        return reduction<reduction_op_add<float>, reduction_op_add<float>, post_process_identity<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_d, reduce_c, false, coeff, keepdims, opt);

    if (operation == ReductionOp_ASUM)
        return reduction<reduction_op_asum<float>, reduction_op_add<float>, post_process_identity<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_d, reduce_c, false, coeff, keepdims, opt);

    if (operation == ReductionOp_SUMSQ)
        return reduction<reduction_op_sumsq<float>, reduction_op_add<float>, post_process_identity<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_d, reduce_c, false, coeff, keepdims, opt);

    if (operation == ReductionOp_MEAN)
    {
        int scale = 1;
        int dims = bottom_blob.dims;
        if (dims == 1)
        {
            scale = bottom_blob.w;
        }
        else if (dims == 2)
        {
            if (reduce_w) scale *= bottom_blob.w;
            if (reduce_h) scale *= bottom_blob.h;
        }
        else if (dims == 3)
        {
            if (reduce_w) scale *= bottom_blob.w;
            if (reduce_h) scale *= bottom_blob.h;
            if (reduce_c) scale *= bottom_blob.c;
        }
        else if (dims == 4)
        {
            if (reduce_w) scale *= bottom_blob.w;
            if (reduce_h) scale *= bottom_blob.h;
            if (reduce_d) scale *= bottom_blob.d;
            if (reduce_c) scale *= bottom_blob.c;
        }

        float coeff_mean = coeff / scale;
        return reduction<reduction_op_add<float>, reduction_op_add<float>, post_process_identity<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_d, reduce_c, true, coeff_mean, keepdims, opt);
    }

    if (operation == ReductionOp_MAX)
        return reduction<reduction_op_max<float>, reduction_op_max<float>, post_process_identity<float> >(bottom_blob, top_blob, -FLT_MAX, reduce_w, reduce_h, reduce_d, reduce_c, false, coeff, keepdims, opt);

    if (operation == ReductionOp_MIN)
        return reduction<reduction_op_min<float>, reduction_op_min<float>, post_process_identity<float> >(bottom_blob, top_blob, FLT_MAX, reduce_w, reduce_h, reduce_d, reduce_c, false, coeff, keepdims, opt);

    if (operation == ReductionOp_PROD)
        return reduction<reduction_op_mul<float>, reduction_op_mul<float>, post_process_identity<float> >(bottom_blob, top_blob, 1.f, reduce_w, reduce_h, reduce_d, reduce_c, false, coeff, keepdims, opt);

    if (operation == ReductionOp_L1)
        return reduction<reduction_op_asum<float>, reduction_op_add<float>, post_process_identity<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_d, reduce_c, false, 1.f, keepdims, opt);

    if (operation == ReductionOp_L2)
        return reduction<reduction_op_sumsq<float>, reduction_op_add<float>, post_process_sqrt<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_d, reduce_c, true, 1.f, keepdims, opt);

    if (operation == ReductionOp_LogSum)
        return reduction<reduction_op_add<float>, reduction_op_add<float>, post_process_log<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_d, reduce_c, true, 1.f, keepdims, opt);

    if (operation == ReductionOp_LogSumExp)
        return reduction<reduction_op_sumsexp<float>, reduction_op_add<float>, post_process_log<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_d, reduce_c, true, 1.f, keepdims, opt);

    return 0;
}